

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_fp16s.h
# Opt level: O0

void ncnn::innerproduct_fp16s_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_fp16,Mat *bias_data,
               int activation_type,Mat *activation_params,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined8 uVar177;
  undefined8 uVar178;
  undefined8 uVar179;
  undefined8 uVar180;
  undefined8 uVar181;
  undefined8 uVar182;
  undefined8 uVar183;
  undefined8 uVar184;
  undefined8 uVar185;
  undefined8 uVar186;
  undefined8 uVar187;
  undefined8 uVar188;
  undefined8 uVar189;
  undefined8 uVar190;
  undefined8 uVar191;
  undefined8 uVar192;
  undefined8 uVar193;
  undefined8 uVar194;
  undefined8 uVar195;
  undefined8 uVar196;
  undefined8 uVar197;
  undefined8 uVar198;
  undefined8 uVar199;
  undefined8 uVar200;
  undefined8 uVar201;
  undefined8 uVar202;
  undefined8 uVar203;
  undefined8 uVar204;
  undefined8 uVar205;
  undefined8 uVar206;
  undefined8 uVar207;
  undefined8 uVar208;
  undefined1 auVar209 [24];
  undefined1 auVar210 [24];
  undefined8 uVar211;
  undefined8 uVar212;
  undefined8 uVar213;
  undefined8 uVar214;
  undefined8 uVar215;
  undefined8 uVar216;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float *pfVar217;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  long *in_R9;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  float fVar223;
  float fVar224;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  double dVar225;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar238 [32];
  undefined1 in_ZMM16 [64];
  float *outptr_2;
  __m128 _w_1;
  __m128 _m_4;
  __m128 _suml;
  __m256 _w;
  __m256 _m_3;
  __m256 _sum;
  int i_2;
  float *m_2;
  unsigned_short *w;
  float sum;
  int p_2;
  float *outptr_1;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _sums_1;
  __m128 _w3_2;
  __m128 _w2_2;
  __m128 _w1_2;
  __m128 _w0_2;
  __m128 _m_2;
  __m128 _sum3l;
  __m128 _sum2l;
  __m128 _sum1l;
  __m128 _sum0l;
  __m256 _w3_1;
  __m256 _w2_1;
  __m256 _w1_1;
  __m256 _w0_1;
  __m256 _m_1;
  __m256 _sum3_1;
  __m256 _sum2_1;
  __m256 _sum1_1;
  __m256 _sum0_1;
  int i_1;
  float *m_1;
  unsigned_short *w3_1;
  unsigned_short *w2_1;
  unsigned_short *w1_1;
  unsigned_short *w0_1;
  float sums_1 [4];
  int p_1;
  int pp_1;
  float *outptr;
  __m256 _sums_f;
  __m256 _sums;
  __m256 _w7;
  __m256 _w6;
  __m256 _w5;
  __m256 _w4;
  __m256 _w3;
  __m256 _w2;
  __m256 _w1;
  __m256 _w0;
  __m256 _m;
  int i;
  __m256 _sum7;
  __m256 _sum6;
  __m256 _sum5;
  __m256 _sum4;
  __m256 _sum3;
  __m256 _sum2;
  __m256 _sum1;
  __m256 _sum0;
  float *m;
  unsigned_short *w7;
  unsigned_short *w6;
  unsigned_short *w5;
  unsigned_short *w4;
  unsigned_short *w3;
  unsigned_short *w2;
  unsigned_short *w1;
  unsigned_short *w0;
  float sums [8];
  int p;
  int pp;
  int nn_num_output;
  int remain_num_output_start;
  float *bias_data_ptr;
  int num_output;
  int num_input;
  __m128 _b_1;
  __m128 _a_1;
  __m128 max_1;
  __m128 min_1;
  __m256 _b;
  __m256 _a;
  __m256 max;
  __m256 min;
  __m128 x32;
  __m128 x64;
  __m128 x128;
  __m128 x32_1;
  __m128 x64_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max_2;
  float min_2;
  float slope;
  __m256 vb1;
  __m256 vb0;
  __m256 s4556;
  __m256 s0123;
  __m256 s67;
  __m256 s45;
  __m256 s23;
  __m256 s01;
  __m256 s0123_1;
  __m256 s23_1;
  __m256 s01_1;
  __m128 neg_1;
  __m128 pos_1;
  __m128 one_8;
  __m128 one_15;
  v4sf pow2n_4;
  v4sf y_5;
  v4sf mask_5;
  v4sf one_10;
  v4si emm0_1;
  v4sf fx_4;
  v4sf tmp_5;
  v4sf pow2n_3;
  v4sf y_4;
  v4sf mask_4;
  v4sf one_9;
  v4si emm0;
  v4sf fx_3;
  v4sf tmp_4;
  __m128 two_1;
  __m128 one_12;
  __m128 one_13;
  v4sf pow2n_5;
  v4sf y_7;
  v4sf mask_7;
  v4sf one_14;
  v4si emm0_3;
  v4sf fx_5;
  v4sf tmp_7;
  v4sf y_6;
  v4sf z_1;
  v4sf tmp_6;
  v4sf mask_6;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_11;
  v4si emm0_2;
  __m256 neg;
  __m256 pos;
  __m256 one;
  __m256 one_7;
  __m256 pow2n_1;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_2;
  __m256i imm0_1;
  __m256 fx_1;
  __m256 tmp_1;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one_1;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  __m256 two;
  __m256 one_4;
  __m256 one_5;
  __m256 pow2n_2;
  __m256 y_3;
  __m256 mask_3;
  __m256 one_6;
  __m256i imm0_3;
  __m256 fx_2;
  __m256 tmp_3;
  __m256 y_2;
  __m256 z;
  __m256 tmp_2;
  __m256 mask_2;
  __m256 e;
  __m256 invalid_mask;
  __m256 one_3;
  __m256i imm0_2;
  float local_7b5c;
  undefined8 local_7a70;
  undefined8 uStack_7a68;
  undefined1 local_7a50 [16];
  undefined8 local_7a40;
  undefined8 uStack_7a38;
  undefined8 uStack_7a30;
  undefined8 uStack_7a28;
  undefined1 local_7a00 [32];
  int local_79c4;
  undefined1 (*local_79c0) [32];
  undefined1 (*local_79b8) [16];
  float local_79b0;
  int local_79ac;
  undefined8 local_79a0;
  undefined8 uStack_7998;
  undefined8 local_7990;
  undefined8 uStack_7988;
  undefined8 local_7980;
  undefined8 uStack_7978;
  undefined8 local_7970;
  undefined8 uStack_7968;
  undefined8 local_7960;
  undefined8 uStack_7958;
  undefined8 local_7950;
  undefined8 uStack_7948;
  undefined8 local_7940;
  undefined8 uStack_7938;
  undefined8 local_7930;
  undefined8 uStack_7928;
  undefined8 local_7920;
  undefined8 uStack_7918;
  undefined1 local_7900 [16];
  undefined1 local_78f0 [16];
  undefined1 local_78e0 [16];
  undefined1 local_78d0 [16];
  undefined8 local_78c0;
  undefined8 uStack_78b8;
  undefined8 uStack_78b0;
  undefined8 uStack_78a8;
  undefined8 local_78a0;
  undefined8 uStack_7898;
  undefined8 uStack_7890;
  undefined8 uStack_7888;
  undefined8 local_7880;
  undefined8 uStack_7878;
  undefined8 uStack_7870;
  undefined8 uStack_7868;
  undefined8 local_7860;
  undefined8 uStack_7858;
  undefined8 uStack_7850;
  undefined8 uStack_7848;
  undefined1 local_7820 [32];
  undefined1 local_7800 [32];
  undefined1 local_77e0 [32];
  undefined1 local_77c0 [32];
  int local_778c;
  undefined1 (*local_7788) [32];
  undefined1 (*local_7780) [16];
  undefined1 (*local_7778) [16];
  undefined1 (*local_7770) [16];
  undefined1 (*local_7768) [16];
  float local_7760;
  float fStack_775c;
  float fStack_7758;
  float fStack_7754;
  int local_7750;
  int local_774c;
  long local_7748;
  undefined8 local_7740;
  undefined8 uStack_7738;
  undefined8 uStack_7730;
  undefined8 uStack_7728;
  undefined8 local_7720;
  undefined8 uStack_7718;
  undefined8 uStack_7710;
  undefined8 uStack_7708;
  undefined1 local_7700 [32];
  undefined1 local_76e0 [32];
  undefined1 local_76c0 [32];
  undefined1 local_76a0 [32];
  undefined1 local_7680 [32];
  undefined1 local_7660 [32];
  undefined1 local_7640 [32];
  undefined1 local_7620 [32];
  undefined8 local_7600;
  undefined8 uStack_75f8;
  undefined8 uStack_75f0;
  undefined8 uStack_75e8;
  int local_75c4;
  undefined1 local_75c0 [32];
  undefined1 local_75a0 [32];
  undefined1 local_7580 [32];
  undefined1 local_7560 [32];
  undefined1 local_7540 [32];
  undefined1 local_7520 [32];
  undefined1 local_7500 [32];
  undefined1 local_74e0 [32];
  undefined1 (*local_74b8) [32];
  undefined1 (*local_74b0) [16];
  undefined1 (*local_74a8) [16];
  undefined1 (*local_74a0) [16];
  undefined1 (*local_7498) [16];
  undefined1 (*local_7490) [16];
  undefined1 (*local_7488) [16];
  undefined1 (*local_7480) [16];
  undefined1 (*local_7478) [16];
  float local_7470;
  float fStack_746c;
  float fStack_7468;
  float fStack_7464;
  float fStack_7460;
  float fStack_745c;
  float fStack_7458;
  float fStack_7454;
  int local_7448;
  int local_7444;
  int local_7440;
  int local_743c;
  long local_7438;
  int local_7430;
  int local_742c;
  long *local_7428;
  undefined4 local_741c;
  long *local_7410;
  long *local_7408;
  undefined8 *local_7400;
  undefined8 *local_73f8;
  undefined8 *local_73f0;
  undefined8 *local_73e8;
  undefined1 (*local_73d8) [32];
  float *local_73d0;
  undefined1 (*local_73c8) [32];
  undefined8 local_73c0;
  undefined8 uStack_73b8;
  undefined8 local_73b0;
  undefined8 uStack_73a8;
  undefined8 local_73a0;
  undefined8 uStack_7398;
  undefined8 local_7390;
  undefined8 uStack_7388;
  undefined8 local_7370;
  undefined8 uStack_7368;
  undefined1 local_7360 [8];
  undefined8 uStack_7358;
  undefined8 local_7350;
  long *local_7348;
  undefined8 local_7340;
  long *local_7338;
  undefined8 local_7330;
  long *local_7328;
  undefined8 local_7320;
  long *local_7318;
  undefined8 local_7310;
  long *local_7308;
  float local_7300;
  float fStack_72fc;
  float fStack_72f8;
  float fStack_72f4;
  float local_72e4;
  float local_72e0;
  float fStack_72dc;
  float fStack_72d8;
  float fStack_72d4;
  float local_72c4;
  undefined4 local_72c0;
  undefined4 uStack_72bc;
  undefined4 uStack_72b8;
  undefined4 uStack_72b4;
  undefined4 local_72a4;
  undefined4 local_72a0;
  undefined4 uStack_729c;
  undefined4 uStack_7298;
  undefined4 uStack_7294;
  undefined4 local_7284;
  undefined8 local_7280;
  undefined8 uStack_7278;
  undefined8 *local_7268;
  undefined1 (*local_7260) [32];
  undefined1 (*local_7258) [32];
  float *local_7250;
  undefined1 (*local_7248) [32];
  undefined8 local_7240;
  undefined8 uStack_7238;
  undefined8 uStack_7230;
  undefined8 uStack_7228;
  undefined8 local_7220;
  undefined8 uStack_7218;
  undefined8 uStack_7210;
  undefined8 uStack_7208;
  undefined8 local_7200;
  undefined8 uStack_71f8;
  undefined8 uStack_71f0;
  undefined8 uStack_71e8;
  undefined8 local_71e0;
  undefined8 uStack_71d8;
  undefined8 uStack_71d0;
  undefined8 uStack_71c8;
  undefined8 local_71a0;
  undefined8 uStack_7198;
  undefined8 uStack_7190;
  undefined8 uStack_7188;
  undefined1 local_7180 [8];
  undefined8 uStack_7178;
  undefined8 uStack_7170;
  undefined8 uStack_7168;
  undefined8 local_7160;
  long *local_7158;
  undefined8 local_7150;
  long *local_7148;
  undefined8 local_7140;
  long *local_7138;
  undefined8 local_7130;
  long *local_7128;
  undefined8 local_7120;
  long *local_7118;
  uint local_7110;
  uint local_710c;
  uint local_7108;
  uint local_7104;
  undefined8 local_7100;
  undefined8 uStack_70f8;
  undefined8 uStack_70f0;
  undefined8 uStack_70e8;
  undefined8 *local_70c8;
  undefined8 local_70c0;
  undefined8 uStack_70b8;
  undefined8 uStack_70b0;
  undefined8 uStack_70a8;
  undefined8 local_70a0;
  undefined8 uStack_7098;
  undefined8 uStack_7090;
  undefined8 uStack_7088;
  undefined8 local_7080;
  undefined8 uStack_7078;
  undefined8 uStack_7070;
  undefined8 uStack_7068;
  undefined8 local_7060;
  undefined8 uStack_7058;
  undefined8 uStack_7050;
  undefined8 uStack_7048;
  undefined8 local_7040;
  undefined8 uStack_7038;
  undefined8 uStack_7030;
  undefined8 uStack_7028;
  undefined8 local_7020;
  undefined8 uStack_7018;
  undefined8 uStack_7010;
  undefined8 uStack_7008;
  undefined8 local_7000;
  undefined8 uStack_6ff8;
  undefined8 uStack_6ff0;
  undefined8 uStack_6fe8;
  undefined8 local_6fe0;
  undefined8 uStack_6fd8;
  undefined8 uStack_6fd0;
  undefined8 uStack_6fc8;
  undefined8 local_6fc0;
  undefined8 uStack_6fb8;
  undefined8 uStack_6fb0;
  undefined8 uStack_6fa8;
  undefined8 local_6fa0;
  undefined8 uStack_6f98;
  undefined8 uStack_6f90;
  undefined8 uStack_6f88;
  undefined8 local_6f80;
  undefined8 uStack_6f78;
  undefined8 uStack_6f70;
  undefined8 uStack_6f68;
  undefined8 local_6f60;
  undefined8 uStack_6f58;
  undefined8 uStack_6f50;
  undefined8 uStack_6f48;
  undefined8 local_6f40;
  undefined8 uStack_6f38;
  undefined8 uStack_6f30;
  undefined8 uStack_6f28;
  undefined8 local_6f20;
  undefined8 uStack_6f18;
  undefined8 uStack_6f10;
  undefined8 uStack_6f08;
  undefined8 local_6f00;
  undefined8 uStack_6ef8;
  undefined8 uStack_6ef0;
  undefined8 uStack_6ee8;
  undefined8 local_6ee0;
  undefined8 uStack_6ed8;
  undefined8 uStack_6ed0;
  undefined8 uStack_6ec8;
  undefined8 local_6ec0;
  undefined8 uStack_6eb8;
  undefined8 uStack_6eb0;
  undefined8 uStack_6ea8;
  undefined8 local_6ea0;
  undefined8 uStack_6e98;
  undefined8 uStack_6e90;
  undefined8 uStack_6e88;
  undefined8 local_6e80;
  undefined8 uStack_6e78;
  undefined8 uStack_6e70;
  undefined8 uStack_6e68;
  undefined8 local_6e60;
  undefined8 uStack_6e58;
  undefined8 uStack_6e50;
  undefined8 uStack_6e48;
  undefined8 local_6e40;
  undefined8 uStack_6e38;
  undefined8 uStack_6e30;
  undefined8 uStack_6e28;
  undefined8 local_6e20;
  undefined8 uStack_6e18;
  undefined8 uStack_6e10;
  undefined8 uStack_6e08;
  undefined8 local_6e00;
  undefined8 uStack_6df8;
  undefined8 uStack_6df0;
  undefined8 uStack_6de8;
  undefined8 local_6de0;
  undefined8 uStack_6dd8;
  undefined8 uStack_6dd0;
  undefined8 uStack_6dc8;
  undefined8 local_6dc0;
  undefined8 uStack_6db8;
  undefined8 uStack_6db0;
  undefined8 uStack_6da8;
  undefined8 local_6da0;
  undefined8 uStack_6d98;
  undefined8 uStack_6d90;
  undefined8 uStack_6d88;
  undefined8 local_6d80;
  undefined8 uStack_6d78;
  undefined8 uStack_6d70;
  undefined8 uStack_6d68;
  undefined8 local_6d60;
  undefined8 uStack_6d58;
  undefined8 uStack_6d50;
  undefined8 uStack_6d48;
  undefined8 local_6d40;
  undefined8 uStack_6d38;
  undefined8 uStack_6d30;
  undefined8 uStack_6d28;
  undefined8 local_6d20;
  undefined8 uStack_6d18;
  undefined8 uStack_6d10;
  undefined8 uStack_6d08;
  undefined8 local_6d00;
  undefined8 uStack_6cf8;
  undefined8 uStack_6cf0;
  undefined8 uStack_6ce8;
  undefined8 local_6ce0;
  undefined8 uStack_6cd8;
  undefined8 uStack_6cd0;
  undefined8 uStack_6cc8;
  undefined8 local_6cc0;
  undefined8 uStack_6cb8;
  undefined8 uStack_6cb0;
  undefined8 uStack_6ca8;
  undefined8 local_6ca0;
  undefined8 uStack_6c98;
  undefined8 uStack_6c90;
  undefined8 uStack_6c88;
  undefined8 local_6c80;
  undefined8 uStack_6c78;
  undefined8 uStack_6c70;
  undefined8 uStack_6c68;
  undefined8 local_6c60;
  undefined8 uStack_6c58;
  undefined8 uStack_6c50;
  undefined8 uStack_6c48;
  undefined8 local_6c40;
  undefined8 uStack_6c38;
  undefined8 uStack_6c30;
  undefined8 uStack_6c28;
  undefined8 local_6c20;
  undefined8 uStack_6c18;
  undefined8 uStack_6c10;
  undefined8 uStack_6c08;
  undefined8 local_6c00;
  undefined8 uStack_6bf8;
  undefined8 uStack_6bf0;
  undefined8 uStack_6be8;
  undefined8 local_6be0;
  undefined8 uStack_6bd8;
  undefined8 uStack_6bd0;
  undefined8 uStack_6bc8;
  undefined8 local_6bc0;
  undefined8 uStack_6bb8;
  undefined8 uStack_6bb0;
  undefined8 uStack_6ba8;
  undefined8 local_6ba0;
  undefined8 uStack_6b98;
  undefined8 uStack_6b90;
  undefined8 uStack_6b88;
  undefined8 local_6b80;
  undefined8 uStack_6b78;
  undefined8 uStack_6b70;
  undefined8 uStack_6b68;
  undefined8 local_6b60;
  undefined8 uStack_6b58;
  undefined8 uStack_6b50;
  undefined8 uStack_6b48;
  undefined8 local_6b40;
  undefined8 uStack_6b38;
  undefined8 uStack_6b30;
  undefined8 uStack_6b28;
  undefined8 local_6b20;
  undefined8 uStack_6b18;
  undefined8 uStack_6b10;
  undefined8 uStack_6b08;
  undefined8 local_6b00;
  undefined8 uStack_6af8;
  undefined8 uStack_6af0;
  undefined8 uStack_6ae8;
  undefined8 local_6ae0;
  undefined8 uStack_6ad8;
  undefined8 uStack_6ad0;
  undefined8 uStack_6ac8;
  undefined8 local_6ac0;
  undefined8 uStack_6ab8;
  undefined8 uStack_6ab0;
  undefined8 uStack_6aa8;
  undefined8 local_6aa0;
  undefined8 uStack_6a98;
  undefined8 uStack_6a90;
  undefined8 uStack_6a88;
  undefined8 local_6a80;
  undefined8 uStack_6a78;
  undefined8 uStack_6a70;
  undefined8 uStack_6a68;
  undefined8 local_6a60;
  undefined8 uStack_6a58;
  undefined8 uStack_6a50;
  undefined8 uStack_6a48;
  undefined8 local_6a40;
  undefined8 uStack_6a38;
  undefined8 uStack_6a30;
  undefined8 uStack_6a28;
  undefined8 local_6a20;
  undefined8 uStack_6a18;
  undefined8 uStack_6a10;
  undefined8 uStack_6a08;
  undefined8 local_6a00;
  undefined8 uStack_69f8;
  undefined8 uStack_69f0;
  undefined8 uStack_69e8;
  undefined8 local_69e0;
  undefined8 uStack_69d8;
  undefined8 uStack_69d0;
  undefined8 uStack_69c8;
  undefined8 local_69c0;
  undefined8 uStack_69b8;
  undefined8 uStack_69b0;
  undefined8 uStack_69a8;
  undefined8 local_69a0;
  undefined8 uStack_6998;
  undefined8 uStack_6990;
  undefined8 uStack_6988;
  undefined8 local_6980;
  undefined8 uStack_6978;
  undefined8 uStack_6970;
  undefined8 uStack_6968;
  undefined8 local_6960;
  undefined8 uStack_6958;
  undefined8 uStack_6950;
  undefined8 uStack_6948;
  undefined8 local_6940;
  undefined8 uStack_6938;
  undefined8 uStack_6930;
  undefined8 uStack_6928;
  undefined8 local_6920;
  undefined8 uStack_6918;
  undefined8 uStack_6910;
  undefined8 uStack_6908;
  undefined8 local_6900;
  undefined8 uStack_68f8;
  undefined8 uStack_68f0;
  undefined8 uStack_68e8;
  undefined8 local_68e0;
  undefined8 uStack_68d8;
  undefined8 uStack_68d0;
  undefined8 uStack_68c8;
  undefined8 local_68c0;
  undefined8 uStack_68b8;
  undefined8 uStack_68b0;
  undefined8 uStack_68a8;
  undefined8 local_68a0;
  undefined8 uStack_6898;
  undefined8 uStack_6890;
  undefined8 uStack_6888;
  undefined8 local_6880;
  undefined8 uStack_6878;
  undefined8 uStack_6870;
  undefined8 uStack_6868;
  undefined8 local_6860;
  undefined8 uStack_6858;
  undefined8 uStack_6850;
  undefined8 uStack_6848;
  undefined8 local_6840;
  undefined8 uStack_6838;
  undefined8 uStack_6830;
  undefined8 uStack_6828;
  undefined8 local_6820;
  undefined8 uStack_6818;
  undefined8 uStack_6810;
  undefined8 uStack_6808;
  undefined8 local_6800;
  undefined8 uStack_67f8;
  undefined8 uStack_67f0;
  undefined8 uStack_67e8;
  undefined8 local_67e0;
  undefined8 uStack_67d8;
  undefined8 uStack_67d0;
  undefined8 uStack_67c8;
  undefined8 local_67c0;
  undefined8 uStack_67b8;
  undefined8 uStack_67b0;
  undefined8 uStack_67a8;
  undefined8 local_67a0;
  undefined8 uStack_6798;
  undefined8 uStack_6790;
  undefined8 uStack_6788;
  undefined8 local_6780;
  undefined8 uStack_6778;
  undefined8 uStack_6770;
  undefined8 uStack_6768;
  undefined8 local_6760;
  undefined8 uStack_6758;
  undefined8 uStack_6750;
  undefined8 uStack_6748;
  undefined8 local_6740;
  undefined8 uStack_6738;
  undefined8 uStack_6730;
  undefined8 uStack_6728;
  undefined8 local_6720;
  undefined8 uStack_6718;
  undefined8 uStack_6710;
  undefined8 uStack_6708;
  undefined8 local_6700;
  undefined8 uStack_66f8;
  undefined8 local_66f0;
  undefined8 uStack_66e8;
  undefined8 local_66e0;
  undefined8 uStack_66d8;
  undefined8 local_66d0;
  undefined8 uStack_66c8;
  undefined8 local_66c0;
  undefined8 uStack_66b8;
  undefined8 local_66b0;
  undefined8 uStack_66a8;
  undefined8 local_66a0;
  undefined8 uStack_6698;
  undefined8 local_6690;
  undefined8 uStack_6688;
  undefined8 local_6680;
  undefined8 uStack_6678;
  undefined8 local_6670;
  undefined8 uStack_6668;
  undefined8 local_6660;
  undefined8 uStack_6658;
  undefined8 local_6650;
  undefined8 uStack_6648;
  undefined8 local_6640;
  undefined8 uStack_6638;
  undefined8 local_6630;
  undefined8 uStack_6628;
  undefined8 local_6620;
  undefined8 uStack_6618;
  undefined8 local_6610;
  undefined8 uStack_6608;
  undefined8 local_6600;
  undefined8 uStack_65f8;
  undefined8 local_65f0;
  undefined8 uStack_65e8;
  undefined8 local_65e0;
  undefined8 uStack_65d8;
  undefined8 local_65d0;
  undefined8 uStack_65c8;
  undefined8 local_65c0;
  undefined8 uStack_65b8;
  undefined8 local_65b0;
  undefined8 uStack_65a8;
  undefined8 local_65a0;
  undefined8 uStack_6598;
  undefined8 local_6590;
  undefined8 uStack_6588;
  undefined8 local_6580;
  undefined8 uStack_6578;
  undefined8 local_6570;
  undefined8 uStack_6568;
  undefined8 local_6560;
  undefined8 uStack_6558;
  undefined8 local_6550;
  undefined8 uStack_6548;
  undefined8 local_6540;
  undefined8 uStack_6538;
  undefined8 local_6530;
  undefined8 uStack_6528;
  undefined8 local_6520;
  undefined8 uStack_6518;
  undefined8 uStack_6510;
  undefined8 uStack_6508;
  undefined8 local_6500;
  undefined8 uStack_64f8;
  undefined8 uStack_64f0;
  undefined8 uStack_64e8;
  undefined8 local_64d0;
  undefined8 uStack_64c8;
  undefined8 local_64c0;
  undefined8 uStack_64b8;
  undefined8 local_64b0;
  undefined8 uStack_64a8;
  undefined8 local_64a0;
  undefined8 uStack_6498;
  undefined8 local_6490;
  undefined8 uStack_6488;
  undefined8 local_6480;
  undefined8 uStack_6478;
  undefined8 local_6470;
  undefined8 uStack_6468;
  undefined8 local_6460;
  undefined8 uStack_6458;
  undefined8 local_6450;
  undefined8 uStack_6448;
  float local_6440;
  float fStack_643c;
  float fStack_6438;
  float fStack_6434;
  ulong local_6430;
  undefined8 uStack_6428;
  float local_6420;
  float fStack_641c;
  float fStack_6418;
  float fStack_6414;
  float local_6410;
  float fStack_640c;
  float fStack_6408;
  float fStack_6404;
  undefined8 local_6400;
  undefined8 uStack_63f8;
  undefined8 uStack_63f0;
  undefined8 uStack_63e8;
  undefined1 local_63d0 [8];
  float fStack_63c8;
  float fStack_63c4;
  undefined8 local_63c0;
  undefined8 uStack_63b8;
  undefined8 local_63b0;
  undefined8 uStack_63a8;
  undefined8 local_63a0;
  undefined8 uStack_6398;
  ulong local_6390;
  undefined8 uStack_6388;
  float local_6380;
  float fStack_637c;
  float fStack_6378;
  float fStack_6374;
  undefined8 local_6370;
  undefined8 uStack_6368;
  undefined1 local_6360 [8];
  float fStack_6358;
  float fStack_6354;
  undefined8 local_6350;
  undefined8 uStack_6348;
  float local_633c;
  float local_6338;
  float local_6334;
  float local_6330;
  float local_632c;
  float local_6328;
  float local_6324;
  float local_6320;
  float local_631c;
  long *local_6318;
  undefined4 local_6310;
  float local_630c [3];
  long *local_6300;
  undefined8 local_62f8;
  long *local_62f0;
  undefined8 local_62e8;
  long *local_62e0;
  undefined8 local_62d8;
  long *local_62d0;
  undefined8 local_62c8;
  long *local_62c0;
  undefined1 local_62a0 [32];
  undefined1 local_6280 [32];
  undefined1 local_6260 [32];
  undefined1 local_6240 [32];
  undefined1 local_6220 [32];
  undefined1 local_6200 [32];
  undefined1 local_61e0 [32];
  undefined1 local_61c0 [32];
  undefined1 *local_61a0;
  undefined1 *local_6198;
  undefined1 *local_6190;
  undefined1 *local_6188;
  undefined1 *local_6180;
  undefined1 *local_6178;
  undefined1 *local_6170;
  undefined1 *local_6168;
  undefined8 local_6160;
  undefined8 uStack_6158;
  undefined8 uStack_6150;
  undefined8 uStack_6148;
  undefined8 local_6140;
  undefined8 uStack_6138;
  undefined8 uStack_6130;
  undefined8 uStack_6128;
  undefined1 local_6120 [32];
  undefined1 local_6100 [32];
  undefined1 local_60e0 [32];
  undefined1 *local_60c0;
  undefined1 *local_60b8;
  undefined1 *local_60b0;
  undefined1 *local_60a8;
  undefined8 local_60a0;
  undefined8 uStack_6098;
  undefined8 local_6090;
  undefined8 uStack_6088;
  undefined8 local_6080;
  undefined8 uStack_6078;
  undefined8 local_6070;
  undefined8 uStack_6068;
  undefined8 local_6060;
  undefined8 uStack_6058;
  undefined8 local_6050;
  undefined8 uStack_6048;
  undefined8 local_6040;
  undefined8 uStack_6038;
  undefined8 local_6030;
  undefined8 uStack_6028;
  undefined8 local_6020;
  undefined8 uStack_6018;
  undefined8 local_6010;
  undefined8 uStack_6008;
  undefined8 local_6000;
  undefined8 uStack_5ff8;
  undefined8 local_5ff0;
  undefined8 uStack_5fe8;
  undefined8 local_5fe0;
  undefined8 uStack_5fd8;
  undefined8 local_5fd0;
  undefined8 uStack_5fc8;
  undefined8 local_5fc0;
  undefined8 uStack_5fb8;
  undefined8 local_5fb0;
  undefined8 uStack_5fa8;
  undefined8 local_5fa0;
  undefined8 uStack_5f98;
  undefined8 local_5f90;
  undefined8 uStack_5f88;
  undefined8 local_5f80;
  undefined8 uStack_5f78;
  undefined8 local_5f70;
  undefined8 uStack_5f68;
  undefined8 local_5f60;
  undefined8 uStack_5f58;
  undefined8 local_5f50;
  undefined8 uStack_5f48;
  ulong local_5f40;
  undefined8 uStack_5f38;
  undefined1 (*local_5f28) [16];
  ulong local_5f20;
  undefined8 uStack_5f18;
  undefined1 (*local_5f08) [16];
  ulong local_5f00;
  undefined8 uStack_5ef8;
  undefined1 (*local_5ee8) [16];
  ulong local_5ee0;
  undefined8 uStack_5ed8;
  undefined1 (*local_5ec8) [16];
  ulong local_5ec0;
  undefined8 uStack_5eb8;
  undefined1 (*local_5ea8) [16];
  undefined8 local_5ea0;
  undefined8 uStack_5e98;
  undefined8 local_5e90;
  undefined8 uStack_5e88;
  undefined8 local_5e80;
  undefined8 uStack_5e78;
  undefined8 local_5e70;
  undefined8 uStack_5e68;
  undefined1 local_5e60 [16];
  undefined1 local_5e50 [16];
  undefined1 local_5e40 [16];
  undefined1 local_5e30 [16];
  undefined1 local_5e20 [16];
  undefined1 local_5e10 [16];
  undefined1 local_5e00 [16];
  undefined1 local_5df0 [16];
  float local_5dd4;
  undefined8 local_5dd0;
  undefined8 uStack_5dc8;
  float local_5dc0;
  float fStack_5dbc;
  float fStack_5db8;
  float fStack_5db4;
  float local_5da4;
  float local_5da0;
  float fStack_5d9c;
  float fStack_5d98;
  float fStack_5d94;
  undefined8 local_5d90;
  undefined8 uStack_5d88;
  undefined8 local_5d80;
  undefined8 uStack_5d78;
  undefined1 local_5d70 [16];
  undefined8 local_5d60;
  undefined8 uStack_5d58;
  undefined8 local_5d50;
  undefined8 uStack_5d48;
  undefined1 local_5d40 [16];
  undefined1 local_5d30 [16];
  undefined8 local_5d20;
  undefined8 uStack_5d18;
  undefined8 local_5d10;
  undefined8 uStack_5d08;
  undefined8 local_5d00;
  undefined8 uStack_5cf8;
  undefined1 local_5cf0 [16];
  undefined8 local_5ce0;
  undefined8 uStack_5cd8;
  undefined8 local_5cd0;
  undefined8 uStack_5cc8;
  undefined4 local_5cc0;
  undefined4 uStack_5cbc;
  undefined4 uStack_5cb8;
  undefined4 uStack_5cb4;
  undefined4 local_5ca4;
  undefined8 local_5ca0;
  undefined8 uStack_5c98;
  undefined1 local_5c90 [16];
  undefined1 local_5c80 [16];
  undefined8 local_5c70;
  undefined8 uStack_5c68;
  undefined4 local_5c60;
  undefined4 uStack_5c5c;
  undefined4 uStack_5c58;
  undefined4 uStack_5c54;
  undefined4 local_5c44;
  undefined8 local_5c40;
  undefined8 uStack_5c38;
  undefined8 local_5c30;
  undefined8 uStack_5c28;
  undefined1 local_5c20 [8];
  float fStack_5c18;
  float fStack_5c14;
  undefined8 local_5c10;
  undefined8 uStack_5c08;
  undefined8 local_5c00;
  undefined8 uStack_5bf8;
  undefined1 local_5bf0 [8];
  undefined8 uStack_5be8;
  undefined8 local_5be0;
  undefined8 uStack_5bd8;
  undefined1 local_5bd0 [16];
  undefined4 local_5bc0;
  undefined4 uStack_5bbc;
  undefined4 uStack_5bb8;
  undefined4 uStack_5bb4;
  undefined4 local_5ba4;
  undefined8 local_5ba0;
  undefined8 uStack_5b98;
  float local_5b90;
  float fStack_5b8c;
  float fStack_5b88;
  float fStack_5b84;
  undefined8 local_5b80;
  undefined8 uStack_5b78;
  undefined8 local_5b70;
  undefined8 uStack_5b68;
  undefined8 local_5b60;
  undefined8 uStack_5b58;
  undefined8 local_5b50;
  undefined8 uStack_5b48;
  undefined8 local_5b40;
  undefined8 uStack_5b38;
  undefined8 local_5b30;
  undefined8 uStack_5b28;
  undefined1 local_5b20 [16];
  undefined8 local_5b10;
  undefined8 uStack_5b08;
  undefined8 local_5b00;
  undefined8 uStack_5af8;
  float local_5af0;
  float fStack_5aec;
  float fStack_5ae8;
  float fStack_5ae4;
  undefined1 local_5ae0 [16];
  undefined8 local_5ad0;
  undefined8 uStack_5ac8;
  undefined8 local_5ac0;
  undefined8 uStack_5ab8;
  undefined1 local_5ab0 [16];
  undefined4 local_5aa0;
  undefined4 uStack_5a9c;
  undefined4 uStack_5a98;
  undefined4 uStack_5a94;
  undefined1 local_5a90 [16];
  undefined1 local_5a80 [8];
  undefined8 uStack_5a78;
  undefined8 local_5a70;
  undefined8 uStack_5a68;
  undefined1 local_5a60 [16];
  undefined8 local_5a50;
  undefined8 uStack_5a48;
  undefined8 local_5a40;
  undefined8 uStack_5a38;
  undefined8 local_5a30;
  undefined8 uStack_5a28;
  undefined8 local_5a20;
  undefined8 uStack_5a18;
  undefined8 local_5a10;
  undefined8 uStack_5a08;
  undefined8 local_5a00;
  undefined8 uStack_59f8;
  undefined4 local_59f0;
  undefined4 uStack_59ec;
  undefined4 uStack_59e8;
  undefined4 uStack_59e4;
  undefined8 local_59e0;
  undefined8 uStack_59d8;
  undefined8 local_59d0;
  undefined8 uStack_59c8;
  undefined8 local_59c0;
  undefined8 uStack_59b8;
  undefined8 local_59b0;
  undefined8 uStack_59a8;
  undefined8 local_59a0;
  undefined8 uStack_5998;
  undefined4 local_5990;
  undefined4 uStack_598c;
  undefined4 uStack_5988;
  undefined4 uStack_5984;
  undefined8 local_5980;
  undefined8 uStack_5978;
  undefined8 local_5970;
  undefined8 uStack_5968;
  undefined8 local_5960;
  undefined8 uStack_5958;
  undefined8 local_5950;
  undefined8 uStack_5948;
  undefined8 local_5940;
  undefined8 uStack_5938;
  undefined4 local_5930;
  undefined4 uStack_592c;
  undefined4 uStack_5928;
  undefined4 uStack_5924;
  undefined8 local_5920;
  undefined8 uStack_5918;
  undefined8 local_5910;
  undefined8 uStack_5908;
  undefined8 local_5900;
  undefined8 uStack_58f8;
  undefined8 local_58f0;
  undefined8 uStack_58e8;
  undefined8 local_58e0;
  undefined8 uStack_58d8;
  undefined4 local_58d0;
  undefined4 uStack_58cc;
  undefined4 uStack_58c8;
  undefined4 uStack_58c4;
  undefined8 local_58c0;
  undefined8 uStack_58b8;
  undefined8 local_58b0;
  undefined8 uStack_58a8;
  undefined8 local_58a0;
  undefined8 uStack_5898;
  undefined8 local_5890;
  undefined8 uStack_5888;
  undefined8 local_5880;
  undefined8 uStack_5878;
  undefined4 local_5870;
  undefined4 uStack_586c;
  undefined4 uStack_5868;
  undefined4 uStack_5864;
  undefined8 local_5860;
  undefined8 uStack_5858;
  undefined8 local_5850;
  undefined8 uStack_5848;
  undefined8 local_5840;
  undefined8 uStack_5838;
  undefined8 local_5830;
  undefined8 uStack_5828;
  undefined8 local_5820;
  undefined8 uStack_5818;
  undefined8 local_5810;
  undefined8 uStack_5808;
  undefined8 local_5800;
  undefined8 uStack_57f8;
  undefined4 local_57f0;
  undefined4 uStack_57ec;
  undefined4 uStack_57e8;
  undefined4 uStack_57e4;
  undefined8 local_57e0;
  undefined8 uStack_57d8;
  undefined8 local_57d0;
  undefined8 uStack_57c8;
  undefined8 local_57c0;
  undefined8 uStack_57b8;
  undefined8 local_57b0;
  undefined8 uStack_57a8;
  undefined8 local_57a0;
  undefined8 uStack_5798;
  undefined4 local_5790;
  undefined4 uStack_578c;
  undefined4 uStack_5788;
  undefined4 uStack_5784;
  undefined8 local_5780;
  undefined8 uStack_5778;
  undefined8 local_5770;
  undefined8 uStack_5768;
  undefined8 local_5760;
  undefined8 uStack_5758;
  undefined8 local_5750;
  undefined8 uStack_5748;
  undefined4 local_5740;
  undefined4 uStack_573c;
  undefined4 uStack_5738;
  undefined4 uStack_5734;
  undefined8 local_5730;
  undefined8 uStack_5728;
  undefined1 local_5720 [16];
  undefined4 local_5710;
  undefined4 uStack_570c;
  undefined4 uStack_5708;
  undefined4 uStack_5704;
  undefined8 local_5700;
  undefined8 uStack_56f8;
  undefined8 local_56f0;
  undefined8 uStack_56e8;
  undefined1 local_56e0 [8];
  undefined8 uStack_56d8;
  undefined1 local_56d0 [16];
  undefined4 local_56c0;
  undefined4 uStack_56bc;
  undefined4 uStack_56b8;
  undefined4 uStack_56b4;
  undefined1 local_56b0 [16];
  undefined1 local_56a0 [8];
  undefined8 uStack_5698;
  undefined8 local_5690;
  undefined8 uStack_5688;
  undefined1 local_5680 [16];
  undefined8 local_5670;
  undefined8 uStack_5668;
  undefined8 local_5660;
  undefined8 uStack_5658;
  undefined8 local_5650;
  undefined8 uStack_5648;
  undefined8 local_5640;
  undefined8 uStack_5638;
  undefined8 local_5630;
  undefined8 uStack_5628;
  undefined8 local_5620;
  undefined8 uStack_5618;
  undefined4 local_5610;
  undefined4 uStack_560c;
  undefined4 uStack_5608;
  undefined4 uStack_5604;
  undefined8 local_5600;
  undefined8 uStack_55f8;
  undefined8 local_55f0;
  undefined8 uStack_55e8;
  undefined8 local_55e0;
  undefined8 uStack_55d8;
  undefined8 local_55d0;
  undefined8 uStack_55c8;
  undefined8 local_55c0;
  undefined8 uStack_55b8;
  undefined4 local_55b0;
  undefined4 uStack_55ac;
  undefined4 uStack_55a8;
  undefined4 uStack_55a4;
  undefined8 local_55a0;
  undefined8 uStack_5598;
  undefined8 local_5590;
  undefined8 uStack_5588;
  undefined8 local_5580;
  undefined8 uStack_5578;
  undefined8 local_5570;
  undefined8 uStack_5568;
  undefined8 local_5560;
  undefined8 uStack_5558;
  undefined4 local_5550;
  undefined4 uStack_554c;
  undefined4 uStack_5548;
  undefined4 uStack_5544;
  undefined8 local_5540;
  undefined8 uStack_5538;
  undefined8 local_5530;
  undefined8 uStack_5528;
  undefined8 local_5520;
  undefined8 uStack_5518;
  undefined8 local_5510;
  undefined8 uStack_5508;
  undefined8 local_5500;
  undefined8 uStack_54f8;
  undefined4 local_54f0;
  undefined4 uStack_54ec;
  undefined4 uStack_54e8;
  undefined4 uStack_54e4;
  undefined8 local_54e0;
  undefined8 uStack_54d8;
  undefined8 local_54d0;
  undefined8 uStack_54c8;
  undefined8 local_54c0;
  undefined8 uStack_54b8;
  undefined8 local_54b0;
  undefined8 uStack_54a8;
  undefined8 local_54a0;
  undefined8 uStack_5498;
  undefined4 local_5490;
  undefined4 uStack_548c;
  undefined4 uStack_5488;
  undefined4 uStack_5484;
  undefined8 local_5480;
  undefined8 uStack_5478;
  undefined8 local_5470;
  undefined8 uStack_5468;
  undefined8 local_5460;
  undefined8 uStack_5458;
  undefined8 local_5450;
  undefined8 uStack_5448;
  undefined8 local_5440;
  undefined8 uStack_5438;
  undefined8 local_5430;
  undefined8 uStack_5428;
  undefined8 local_5420;
  undefined8 uStack_5418;
  undefined4 local_5410;
  undefined4 uStack_540c;
  undefined4 uStack_5408;
  undefined4 uStack_5404;
  undefined8 local_5400;
  undefined8 uStack_53f8;
  undefined8 local_53f0;
  undefined8 uStack_53e8;
  undefined1 local_53e0 [16];
  undefined8 local_53d0;
  undefined8 uStack_53c8;
  undefined8 local_53c0;
  undefined8 uStack_53b8;
  undefined4 local_53b0;
  undefined4 uStack_53ac;
  undefined4 uStack_53a8;
  undefined4 uStack_53a4;
  undefined8 local_53a0;
  undefined8 uStack_5398;
  undefined8 local_5390;
  undefined8 uStack_5388;
  undefined8 local_5380;
  undefined8 uStack_5378;
  undefined8 local_5370;
  undefined8 uStack_5368;
  undefined4 local_5360;
  undefined4 uStack_535c;
  undefined4 uStack_5358;
  undefined4 uStack_5354;
  undefined8 local_5350;
  undefined8 uStack_5348;
  undefined1 local_5340 [16];
  undefined4 local_5330;
  undefined4 uStack_532c;
  undefined4 uStack_5328;
  undefined4 uStack_5324;
  undefined8 local_5320;
  undefined8 uStack_5318;
  undefined8 local_5310;
  undefined8 uStack_5308;
  undefined8 local_5300;
  undefined8 uStack_52f8;
  undefined8 local_52f0;
  undefined8 uStack_52e8;
  undefined8 local_52e0;
  undefined8 uStack_52d8;
  undefined8 local_52d0;
  undefined8 uStack_52c8;
  undefined8 local_52c0;
  undefined8 uStack_52b8;
  undefined8 local_52b0;
  undefined8 uStack_52a8;
  undefined8 local_52a0;
  undefined8 uStack_5298;
  undefined8 local_5290;
  undefined8 uStack_5288;
  undefined8 local_5280;
  undefined8 uStack_5278;
  undefined8 local_5270;
  undefined8 uStack_5268;
  undefined8 local_5260;
  undefined8 uStack_5258;
  undefined8 local_5250;
  undefined8 uStack_5248;
  undefined8 local_5240;
  undefined8 uStack_5238;
  undefined8 local_5230;
  undefined8 uStack_5228;
  undefined8 local_5220;
  undefined8 uStack_5218;
  undefined8 local_5210;
  undefined8 uStack_5208;
  undefined8 local_5200;
  undefined8 uStack_51f8;
  undefined8 local_51f0;
  undefined8 uStack_51e8;
  undefined4 local_51e0;
  undefined4 uStack_51dc;
  undefined4 uStack_51d8;
  undefined4 uStack_51d4;
  undefined8 local_51d0;
  undefined8 uStack_51c8;
  undefined8 local_51c0;
  undefined8 uStack_51b8;
  undefined4 local_51b0;
  undefined4 uStack_51ac;
  undefined4 uStack_51a8;
  undefined4 uStack_51a4;
  undefined8 local_51a0;
  undefined8 uStack_5198;
  undefined8 local_5190;
  undefined8 uStack_5188;
  undefined4 local_5180;
  undefined4 uStack_517c;
  undefined4 uStack_5178;
  undefined4 uStack_5174;
  undefined8 local_5170;
  undefined8 uStack_5168;
  undefined8 local_5160;
  undefined8 uStack_5158;
  undefined4 local_5150;
  undefined4 uStack_514c;
  undefined4 uStack_5148;
  undefined4 uStack_5144;
  undefined8 local_5140;
  undefined8 uStack_5138;
  undefined4 local_5124;
  undefined8 local_5120;
  undefined8 uStack_5118;
  undefined4 local_5104;
  undefined8 local_5100;
  undefined8 uStack_50f8;
  undefined8 local_50f0;
  undefined8 uStack_50e8;
  undefined8 local_50e0;
  undefined8 uStack_50d8;
  undefined8 local_50d0;
  undefined8 uStack_50c8;
  undefined8 local_50c0;
  undefined8 uStack_50b8;
  undefined8 local_50b0;
  undefined8 uStack_50a8;
  undefined8 local_50a0;
  undefined8 uStack_5098;
  undefined8 local_5090;
  undefined8 uStack_5088;
  undefined8 local_5080;
  undefined8 uStack_5078;
  undefined8 local_5070;
  undefined8 uStack_5068;
  undefined8 local_5060;
  undefined8 uStack_5058;
  undefined8 local_5050;
  undefined8 uStack_5048;
  undefined8 local_5040;
  undefined8 uStack_5038;
  undefined8 local_5030;
  undefined8 uStack_5028;
  undefined8 local_5020;
  undefined8 uStack_5018;
  undefined8 local_5010;
  undefined8 uStack_5008;
  undefined8 local_5000;
  undefined8 uStack_4ff8;
  undefined8 local_4ff0;
  undefined8 uStack_4fe8;
  undefined4 local_4fe0;
  undefined4 uStack_4fdc;
  undefined4 uStack_4fd8;
  undefined4 uStack_4fd4;
  undefined4 local_4fc4;
  undefined4 local_4fc0;
  undefined4 uStack_4fbc;
  undefined4 uStack_4fb8;
  undefined4 uStack_4fb4;
  undefined4 local_4fa4;
  undefined8 local_4fa0;
  undefined8 uStack_4f98;
  undefined1 local_4f90 [8];
  float fStack_4f88;
  float fStack_4f84;
  undefined8 local_4f80;
  undefined8 uStack_4f78;
  undefined8 local_4f70;
  undefined8 uStack_4f68;
  undefined8 local_4f60;
  undefined8 uStack_4f58;
  float local_4f50;
  float fStack_4f4c;
  float fStack_4f48;
  float fStack_4f44;
  undefined4 local_4f40;
  undefined4 uStack_4f3c;
  undefined4 uStack_4f38;
  undefined4 uStack_4f34;
  undefined4 local_4f24;
  undefined8 local_4f20;
  undefined8 uStack_4f18;
  undefined1 local_4f10 [16];
  undefined1 local_4f00 [16];
  float local_4ef0;
  float fStack_4eec;
  float fStack_4ee8;
  float fStack_4ee4;
  undefined1 local_4ee0 [16];
  undefined8 local_4ed0;
  undefined8 uStack_4ec8;
  undefined1 local_4ec0 [8];
  undefined8 uStack_4eb8;
  undefined1 local_4eb0 [16];
  undefined4 local_4ea0;
  undefined4 uStack_4e9c;
  undefined4 uStack_4e98;
  undefined4 uStack_4e94;
  undefined1 local_4e90 [16];
  undefined1 local_4e80 [8];
  undefined8 uStack_4e78;
  undefined8 local_4e70;
  undefined8 uStack_4e68;
  undefined1 local_4e60 [16];
  undefined8 local_4e50;
  undefined8 uStack_4e48;
  undefined8 local_4e40;
  undefined8 uStack_4e38;
  undefined8 local_4e30;
  undefined8 uStack_4e28;
  undefined8 local_4e20;
  undefined8 uStack_4e18;
  undefined8 local_4e10;
  undefined8 uStack_4e08;
  undefined8 local_4e00;
  undefined8 uStack_4df8;
  undefined4 local_4df0;
  undefined4 uStack_4dec;
  undefined4 uStack_4de8;
  undefined4 uStack_4de4;
  undefined8 local_4de0;
  undefined8 uStack_4dd8;
  undefined8 local_4dd0;
  undefined8 uStack_4dc8;
  undefined8 local_4dc0;
  undefined8 uStack_4db8;
  undefined8 local_4db0;
  undefined8 uStack_4da8;
  undefined8 local_4da0;
  undefined8 uStack_4d98;
  undefined4 local_4d90;
  undefined4 uStack_4d8c;
  undefined4 uStack_4d88;
  undefined4 uStack_4d84;
  undefined8 local_4d80;
  undefined8 uStack_4d78;
  undefined8 local_4d70;
  undefined8 uStack_4d68;
  undefined8 local_4d60;
  undefined8 uStack_4d58;
  undefined8 local_4d50;
  undefined8 uStack_4d48;
  undefined8 local_4d40;
  undefined8 uStack_4d38;
  undefined4 local_4d30;
  undefined4 uStack_4d2c;
  undefined4 uStack_4d28;
  undefined4 uStack_4d24;
  undefined8 local_4d20;
  undefined8 uStack_4d18;
  undefined8 local_4d10;
  undefined8 uStack_4d08;
  undefined8 local_4d00;
  undefined8 uStack_4cf8;
  undefined8 local_4cf0;
  undefined8 uStack_4ce8;
  undefined8 local_4ce0;
  undefined8 uStack_4cd8;
  undefined4 local_4cd0;
  undefined4 uStack_4ccc;
  undefined4 uStack_4cc8;
  undefined4 uStack_4cc4;
  undefined8 local_4cc0;
  undefined8 uStack_4cb8;
  undefined8 local_4cb0;
  undefined8 uStack_4ca8;
  undefined8 local_4ca0;
  undefined8 uStack_4c98;
  undefined8 local_4c90;
  undefined8 uStack_4c88;
  undefined8 local_4c80;
  undefined8 uStack_4c78;
  undefined4 local_4c70;
  undefined4 uStack_4c6c;
  undefined4 uStack_4c68;
  undefined4 uStack_4c64;
  undefined8 local_4c60;
  undefined8 uStack_4c58;
  undefined8 local_4c50;
  undefined8 uStack_4c48;
  undefined8 local_4c40;
  undefined8 uStack_4c38;
  undefined8 local_4c30;
  undefined8 uStack_4c28;
  undefined8 local_4c20;
  undefined8 uStack_4c18;
  undefined8 local_4c10;
  undefined8 uStack_4c08;
  undefined8 local_4c00;
  undefined8 uStack_4bf8;
  undefined4 local_4bf0;
  undefined4 uStack_4bec;
  undefined4 uStack_4be8;
  undefined4 uStack_4be4;
  undefined8 local_4be0;
  undefined8 uStack_4bd8;
  undefined8 local_4bd0;
  undefined8 uStack_4bc8;
  undefined1 local_4bc0 [16];
  undefined8 local_4bb0;
  undefined8 uStack_4ba8;
  undefined8 local_4ba0;
  undefined8 uStack_4b98;
  undefined4 local_4b90;
  undefined4 uStack_4b8c;
  undefined4 uStack_4b88;
  undefined4 uStack_4b84;
  undefined8 local_4b80;
  undefined8 uStack_4b78;
  undefined8 local_4b70;
  undefined8 uStack_4b68;
  undefined8 local_4b60;
  undefined8 uStack_4b58;
  undefined8 local_4b50;
  undefined8 uStack_4b48;
  undefined4 local_4b40;
  undefined4 uStack_4b3c;
  undefined4 uStack_4b38;
  undefined4 uStack_4b34;
  undefined8 local_4b30;
  undefined8 uStack_4b28;
  undefined1 local_4b20 [16];
  undefined4 local_4b10;
  undefined4 uStack_4b0c;
  undefined4 uStack_4b08;
  undefined4 uStack_4b04;
  undefined8 local_4b00;
  undefined8 uStack_4af8;
  undefined8 local_4af0;
  undefined8 uStack_4ae8;
  undefined8 local_4ae0;
  undefined8 uStack_4ad8;
  undefined8 local_4ad0;
  undefined8 uStack_4ac8;
  undefined8 local_4ac0;
  undefined8 uStack_4ab8;
  undefined8 local_4ab0;
  undefined8 uStack_4aa8;
  undefined1 local_4aa0 [16];
  undefined8 local_4a90;
  undefined8 uStack_4a88;
  undefined8 local_4a80;
  undefined8 uStack_4a78;
  undefined8 local_4a70;
  undefined8 uStack_4a68;
  undefined8 local_4a60;
  undefined8 uStack_4a58;
  undefined8 local_4a50;
  undefined8 uStack_4a48;
  undefined8 local_4a40;
  undefined8 uStack_4a38;
  undefined8 local_4a30;
  undefined8 uStack_4a28;
  undefined4 local_4a20;
  undefined4 uStack_4a1c;
  undefined4 uStack_4a18;
  undefined4 uStack_4a14;
  undefined8 local_4a10;
  undefined8 uStack_4a08;
  undefined8 local_4a00;
  undefined8 uStack_49f8;
  undefined4 local_49f0;
  undefined4 uStack_49ec;
  undefined4 uStack_49e8;
  undefined4 uStack_49e4;
  undefined8 local_49e0;
  undefined8 uStack_49d8;
  undefined4 local_49c4;
  undefined8 local_49c0;
  undefined8 uStack_49b8;
  undefined8 local_49b0;
  undefined8 uStack_49a8;
  undefined8 local_49a0;
  undefined8 uStack_4998;
  undefined8 local_4990;
  undefined8 uStack_4988;
  undefined8 local_4980;
  undefined8 uStack_4978;
  undefined8 local_4970;
  undefined8 uStack_4968;
  undefined8 local_4960;
  undefined8 uStack_4958;
  undefined8 local_4950;
  undefined8 uStack_4948;
  undefined1 local_4940 [8];
  undefined8 uStack_4938;
  float local_4930;
  float fStack_492c;
  float fStack_4928;
  float fStack_4924;
  undefined1 local_4920 [16];
  undefined1 local_4910 [16];
  undefined1 local_4900 [8];
  undefined8 uStack_48f8;
  undefined1 local_48f0 [16];
  undefined4 local_48e0;
  undefined4 uStack_48dc;
  undefined4 uStack_48d8;
  undefined4 uStack_48d4;
  undefined1 local_48d0 [16];
  undefined1 local_48c0 [8];
  undefined8 uStack_48b8;
  undefined8 local_48b0;
  undefined8 uStack_48a8;
  undefined4 local_48a0;
  undefined4 uStack_489c;
  undefined4 uStack_4898;
  undefined4 uStack_4894;
  undefined8 local_4890;
  undefined8 uStack_4888;
  undefined8 local_4880;
  undefined8 uStack_4878;
  undefined8 local_4870;
  undefined8 uStack_4868;
  undefined8 local_4860;
  undefined8 uStack_4858;
  undefined8 local_4850;
  undefined8 uStack_4848;
  undefined4 local_4840;
  undefined4 uStack_483c;
  undefined4 uStack_4838;
  undefined4 uStack_4834;
  undefined8 local_4830;
  undefined8 uStack_4828;
  undefined8 local_4820;
  undefined8 uStack_4818;
  undefined8 local_4810;
  undefined8 uStack_4808;
  undefined8 local_4800;
  undefined8 uStack_47f8;
  undefined4 local_47f0;
  undefined4 uStack_47ec;
  undefined4 uStack_47e8;
  undefined4 uStack_47e4;
  undefined8 local_47e0;
  undefined8 uStack_47d8;
  undefined8 local_47d0;
  undefined8 uStack_47c8;
  undefined8 local_47c0;
  undefined8 uStack_47b8;
  undefined8 local_47b0;
  undefined8 uStack_47a8;
  undefined8 local_47a0;
  undefined8 uStack_4798;
  undefined4 local_4790;
  undefined4 uStack_478c;
  undefined4 uStack_4788;
  undefined4 uStack_4784;
  undefined8 local_4780;
  undefined8 uStack_4778;
  undefined8 local_4770;
  undefined8 uStack_4768;
  undefined8 local_4760;
  undefined8 uStack_4758;
  undefined8 local_4750;
  undefined8 uStack_4748;
  undefined8 local_4740;
  undefined8 uStack_4738;
  undefined4 local_4730;
  undefined4 uStack_472c;
  undefined4 uStack_4728;
  undefined4 uStack_4724;
  undefined8 local_4720;
  undefined8 uStack_4718;
  undefined8 local_4710;
  undefined8 uStack_4708;
  undefined8 local_4700;
  undefined8 uStack_46f8;
  undefined8 local_46f0;
  undefined8 uStack_46e8;
  undefined8 local_46e0;
  undefined8 uStack_46d8;
  undefined4 local_46d0;
  undefined4 uStack_46cc;
  undefined4 uStack_46c8;
  undefined4 uStack_46c4;
  undefined8 local_46c0;
  undefined8 uStack_46b8;
  undefined8 local_46b0;
  undefined8 uStack_46a8;
  undefined8 local_46a0;
  undefined8 uStack_4698;
  undefined8 local_4690;
  undefined8 uStack_4688;
  undefined8 local_4680;
  undefined8 uStack_4678;
  undefined4 local_4670;
  undefined4 uStack_466c;
  undefined4 uStack_4668;
  undefined4 uStack_4664;
  undefined8 local_4660;
  undefined8 uStack_4658;
  undefined8 local_4650;
  undefined8 uStack_4648;
  undefined8 local_4640;
  undefined8 uStack_4638;
  undefined8 local_4630;
  undefined8 uStack_4628;
  undefined8 local_4620;
  undefined8 uStack_4618;
  undefined4 local_4610;
  undefined4 uStack_460c;
  undefined4 uStack_4608;
  undefined4 uStack_4604;
  undefined8 local_4600;
  undefined8 uStack_45f8;
  undefined8 local_45f0;
  undefined8 uStack_45e8;
  undefined8 local_45e0;
  undefined8 uStack_45d8;
  undefined8 local_45d0;
  undefined8 uStack_45c8;
  undefined8 local_45c0;
  undefined8 uStack_45b8;
  undefined4 local_45b0;
  undefined4 uStack_45ac;
  undefined4 uStack_45a8;
  undefined4 uStack_45a4;
  undefined8 local_45a0;
  undefined8 uStack_4598;
  undefined8 local_4590;
  undefined8 uStack_4588;
  undefined8 local_4580;
  undefined8 uStack_4578;
  undefined8 local_4570;
  undefined8 uStack_4568;
  undefined8 local_4560;
  undefined8 uStack_4558;
  undefined4 local_4550;
  undefined4 uStack_454c;
  undefined4 uStack_4548;
  undefined4 uStack_4544;
  undefined8 local_4540;
  undefined8 uStack_4538;
  undefined8 local_4530;
  undefined8 uStack_4528;
  undefined8 local_4520;
  undefined8 uStack_4518;
  undefined8 local_4510;
  undefined8 uStack_4508;
  undefined8 local_4500;
  undefined8 uStack_44f8;
  undefined8 local_44f0;
  undefined8 uStack_44e8;
  undefined8 local_44e0;
  undefined8 uStack_44d8;
  undefined8 local_44d0;
  undefined8 uStack_44c8;
  undefined8 local_44c0;
  undefined8 uStack_44b8;
  undefined8 local_44b0;
  undefined8 uStack_44a8;
  undefined8 local_44a0;
  undefined8 uStack_4498;
  undefined8 local_4490;
  undefined8 uStack_4488;
  undefined8 local_4480;
  undefined8 uStack_4478;
  undefined8 local_4470;
  undefined8 uStack_4468;
  undefined8 local_4460;
  undefined8 uStack_4458;
  undefined8 local_4450;
  undefined8 uStack_4448;
  undefined8 local_4440;
  undefined8 uStack_4438;
  undefined8 local_4430;
  undefined8 uStack_4428;
  undefined4 local_4420;
  undefined4 uStack_441c;
  undefined4 uStack_4418;
  undefined4 uStack_4414;
  undefined8 local_4410;
  undefined8 uStack_4408;
  undefined1 local_4400 [16];
  undefined1 local_43f0 [16];
  undefined8 local_43e0;
  undefined8 uStack_43d8;
  undefined8 local_43d0;
  undefined8 uStack_43c8;
  undefined8 local_43c0;
  undefined8 uStack_43b8;
  undefined8 local_43b0;
  undefined8 uStack_43a8;
  undefined8 local_43a0;
  undefined8 uStack_4398;
  undefined8 local_4390;
  undefined8 uStack_4388;
  undefined8 local_4380;
  undefined8 uStack_4378;
  undefined4 local_4370;
  undefined4 uStack_436c;
  undefined4 uStack_4368;
  undefined4 uStack_4364;
  undefined8 local_4360;
  undefined8 uStack_4358;
  undefined8 local_4350;
  undefined8 uStack_4348;
  undefined4 local_4340;
  undefined4 uStack_433c;
  undefined4 uStack_4338;
  undefined4 uStack_4334;
  undefined8 local_4330;
  undefined8 uStack_4328;
  undefined8 local_4320;
  undefined8 uStack_4318;
  undefined8 local_4310;
  undefined8 uStack_4308;
  undefined8 local_4300;
  undefined8 uStack_42f8;
  undefined8 local_42f0;
  undefined8 uStack_42e8;
  undefined8 local_42e0;
  undefined8 uStack_42d8;
  undefined4 local_42c4;
  undefined8 local_42c0;
  undefined8 uStack_42b8;
  undefined8 local_42b0;
  undefined8 uStack_42a8;
  undefined8 local_42a0;
  undefined8 uStack_4298;
  undefined8 local_4290;
  undefined8 uStack_4288;
  undefined4 local_4280;
  undefined4 uStack_427c;
  undefined4 uStack_4278;
  undefined4 uStack_4274;
  undefined8 local_4270;
  undefined8 uStack_4268;
  undefined8 local_4260;
  undefined8 uStack_4258;
  undefined8 local_4250;
  undefined8 uStack_4248;
  undefined4 local_4240;
  undefined4 uStack_423c;
  undefined4 uStack_4238;
  undefined4 uStack_4234;
  undefined8 local_4230;
  undefined8 uStack_4228;
  undefined1 local_4220 [32];
  uint local_4200;
  uint local_41fc;
  uint local_41f8;
  uint local_41f4;
  uint local_41f0;
  uint local_41ec;
  uint local_41e8;
  uint local_41e4;
  undefined1 local_41e0 [16];
  undefined1 auStack_41d0 [16];
  uint local_41c0;
  uint local_41bc;
  uint local_41b8;
  uint local_41b4;
  uint local_41b0;
  uint local_41ac;
  uint local_41a8;
  uint local_41a4;
  undefined1 local_41a0 [16];
  undefined1 auStack_4190 [16];
  uint local_4180;
  uint local_417c;
  uint local_4178;
  uint local_4174;
  uint local_4170;
  uint local_416c;
  uint local_4168;
  uint local_4164;
  undefined1 local_4160 [16];
  undefined1 auStack_4150 [16];
  uint local_4140;
  uint local_413c;
  uint local_4138;
  uint local_4134;
  uint local_4130;
  uint local_412c;
  uint local_4128;
  uint local_4124;
  undefined8 local_4120;
  undefined8 uStack_4118;
  undefined8 uStack_4110;
  undefined8 uStack_4108;
  undefined8 local_4100;
  undefined8 uStack_40f8;
  undefined8 uStack_40f0;
  undefined8 uStack_40e8;
  undefined8 local_40e0;
  undefined8 uStack_40d8;
  undefined8 uStack_40d0;
  undefined8 uStack_40c8;
  undefined8 local_40c0;
  undefined8 uStack_40b8;
  undefined8 uStack_40b0;
  undefined8 uStack_40a8;
  undefined8 local_40a0;
  undefined8 uStack_4098;
  undefined8 uStack_4090;
  undefined8 uStack_4088;
  undefined8 local_4080;
  undefined8 uStack_4078;
  undefined8 uStack_4070;
  undefined8 uStack_4068;
  undefined8 local_4060;
  undefined8 uStack_4058;
  undefined8 uStack_4050;
  undefined8 uStack_4048;
  undefined8 local_4040;
  undefined8 uStack_4038;
  undefined8 uStack_4030;
  undefined8 uStack_4028;
  undefined8 local_4020;
  undefined8 uStack_4018;
  undefined8 uStack_4010;
  undefined8 uStack_4008;
  undefined8 local_4000;
  undefined8 uStack_3ff8;
  undefined8 uStack_3ff0;
  undefined8 uStack_3fe8;
  undefined8 local_3fe0;
  undefined8 uStack_3fd8;
  undefined8 uStack_3fd0;
  undefined8 uStack_3fc8;
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  undefined8 local_3fa0;
  undefined8 uStack_3f98;
  undefined8 uStack_3f90;
  undefined8 uStack_3f88;
  undefined8 local_3f80;
  undefined8 uStack_3f78;
  undefined8 uStack_3f70;
  undefined8 uStack_3f68;
  undefined8 local_3f60;
  undefined8 uStack_3f58;
  undefined8 uStack_3f50;
  undefined8 uStack_3f48;
  undefined8 local_3f40;
  undefined8 uStack_3f38;
  undefined8 uStack_3f30;
  undefined8 uStack_3f28;
  undefined8 local_3f20;
  undefined8 uStack_3f18;
  undefined8 uStack_3f10;
  undefined8 uStack_3f08;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  undefined1 local_3ee0 [32];
  undefined1 local_3ec0 [32];
  uint local_3e84;
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  uint local_3e44;
  float local_3e40;
  float fStack_3e3c;
  float fStack_3e38;
  float fStack_3e34;
  float fStack_3e30;
  float fStack_3e2c;
  float fStack_3e28;
  float fStack_3e24;
  undefined8 local_3e20;
  undefined8 uStack_3e18;
  undefined8 uStack_3e10;
  undefined8 uStack_3e08;
  undefined1 local_3e00 [32];
  uint local_3de0;
  uint local_3ddc;
  uint local_3dd8;
  uint local_3dd4;
  uint local_3dd0;
  uint local_3dcc;
  uint local_3dc8;
  uint local_3dc4;
  undefined8 local_3dc0;
  undefined8 uStack_3db8;
  undefined8 uStack_3db0;
  undefined8 uStack_3da8;
  undefined8 local_3da0;
  undefined8 uStack_3d98;
  undefined8 uStack_3d90;
  undefined8 uStack_3d88;
  undefined8 local_3d80;
  undefined8 uStack_3d78;
  undefined8 uStack_3d70;
  undefined8 uStack_3d68;
  undefined8 local_3d60;
  undefined8 uStack_3d58;
  undefined8 uStack_3d50;
  undefined8 uStack_3d48;
  undefined8 local_3d40;
  undefined8 uStack_3d38;
  undefined8 uStack_3d30;
  undefined8 uStack_3d28;
  undefined8 local_3d20;
  undefined8 uStack_3d18;
  undefined8 uStack_3d10;
  undefined8 uStack_3d08;
  undefined8 local_3d00;
  undefined8 uStack_3cf8;
  undefined8 uStack_3cf0;
  undefined8 uStack_3ce8;
  undefined1 local_3ce0 [32];
  undefined8 local_3cc0;
  undefined8 uStack_3cb8;
  undefined8 uStack_3cb0;
  undefined8 uStack_3ca8;
  undefined8 local_3ca0;
  undefined8 uStack_3c98;
  undefined8 uStack_3c90;
  undefined8 uStack_3c88;
  undefined4 local_3c64;
  undefined8 local_3c60;
  undefined8 uStack_3c58;
  undefined8 uStack_3c50;
  undefined8 uStack_3c48;
  undefined1 local_3c40 [8];
  float fStack_3c38;
  float fStack_3c34;
  float fStack_3c30;
  float fStack_3c2c;
  float fStack_3c28;
  float fStack_3c24;
  undefined1 local_3c20 [16];
  undefined1 auStack_3c10 [16];
  undefined4 local_3c00;
  undefined4 local_3bfc;
  undefined4 local_3bf8;
  undefined4 local_3bf4;
  undefined4 local_3bf0;
  undefined4 local_3bec;
  undefined4 local_3be8;
  undefined4 local_3be4;
  undefined8 local_3be0;
  undefined8 uStack_3bd8;
  undefined8 uStack_3bd0;
  undefined8 uStack_3bc8;
  undefined8 local_3bc0;
  undefined8 uStack_3bb8;
  undefined8 uStack_3bb0;
  undefined8 uStack_3ba8;
  undefined4 local_3b84;
  undefined8 local_3b80;
  undefined8 uStack_3b78;
  undefined8 uStack_3b70;
  undefined8 uStack_3b68;
  undefined8 local_3b60;
  undefined8 uStack_3b58;
  undefined8 uStack_3b50;
  undefined8 uStack_3b48;
  undefined1 local_3b40 [16];
  undefined1 auStack_3b30 [16];
  undefined4 local_3b20;
  undefined4 local_3b1c;
  undefined4 uStack_3b18;
  undefined4 local_3b14;
  undefined4 uStack_3b10;
  undefined4 local_3b0c;
  undefined4 uStack_3b08;
  undefined4 local_3b04;
  undefined8 uStack_3b00;
  undefined8 uStack_3af8;
  undefined8 uStack_3af0;
  undefined8 uStack_3ae8;
  undefined1 local_3ae0 [32];
  undefined8 local_3ac0;
  undefined8 uStack_3ab8;
  undefined8 uStack_3ab0;
  undefined8 uStack_3aa8;
  undefined8 local_3aa0;
  undefined8 uStack_3a98;
  undefined8 uStack_3a90;
  undefined8 uStack_3a88;
  undefined4 local_3a64;
  undefined8 local_3a60;
  undefined8 uStack_3a58;
  undefined8 uStack_3a50;
  undefined8 uStack_3a48;
  undefined8 local_3a40;
  undefined8 uStack_3a38;
  undefined8 uStack_3a30;
  undefined8 uStack_3a28;
  undefined8 local_3a20;
  undefined8 uStack_3a18;
  undefined8 uStack_3a10;
  undefined8 uStack_3a08;
  undefined8 local_3a00;
  undefined8 uStack_39f8;
  undefined8 uStack_39f0;
  undefined8 uStack_39e8;
  undefined8 local_39e0;
  undefined8 uStack_39d8;
  undefined8 uStack_39d0;
  undefined8 uStack_39c8;
  undefined8 local_39c0;
  undefined8 uStack_39b8;
  undefined8 uStack_39b0;
  undefined8 uStack_39a8;
  undefined1 local_39a0 [16];
  undefined1 auStack_3990 [16];
  undefined4 local_3980;
  undefined4 local_397c;
  undefined4 local_3978;
  undefined4 local_3974;
  undefined4 local_3970;
  undefined4 local_396c;
  undefined4 local_3968;
  undefined4 local_3964;
  undefined8 local_3960;
  undefined8 uStack_3958;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  undefined8 local_3940;
  undefined8 uStack_3938;
  undefined8 uStack_3930;
  undefined8 uStack_3928;
  undefined8 local_3920;
  undefined8 uStack_3918;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  undefined8 local_3900;
  undefined8 uStack_38f8;
  undefined8 uStack_38f0;
  undefined8 uStack_38e8;
  undefined8 local_38e0;
  undefined8 uStack_38d8;
  undefined8 uStack_38d0;
  undefined8 uStack_38c8;
  undefined8 local_38c0;
  undefined8 uStack_38b8;
  undefined8 uStack_38b0;
  undefined8 uStack_38a8;
  undefined8 local_38a0;
  undefined8 uStack_3898;
  undefined8 uStack_3890;
  undefined8 uStack_3888;
  undefined1 local_3880 [8];
  float fStack_3878;
  float fStack_3874;
  undefined8 local_3860;
  undefined8 uStack_3858;
  undefined8 uStack_3850;
  undefined8 uStack_3848;
  undefined8 local_3840;
  undefined8 uStack_3838;
  undefined8 uStack_3830;
  undefined8 uStack_3828;
  undefined1 local_3820 [8];
  float fStack_3818;
  float fStack_3814;
  float fStack_3810;
  float fStack_380c;
  float fStack_3808;
  float fStack_3804;
  float local_3800;
  float fStack_37fc;
  float fStack_37f8;
  float fStack_37f4;
  float fStack_37f0;
  float fStack_37ec;
  float fStack_37e8;
  float fStack_37e4;
  undefined1 local_37e0 [32];
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 uStack_37b0;
  undefined8 uStack_37a8;
  undefined1 local_37a0 [8];
  undefined8 uStack_3798;
  undefined8 uStack_3790;
  undefined8 uStack_3788;
  undefined1 local_3780 [32];
  undefined4 local_3760;
  undefined4 uStack_375c;
  undefined4 uStack_3758;
  undefined4 uStack_3754;
  undefined4 uStack_3750;
  undefined4 uStack_374c;
  undefined4 uStack_3748;
  undefined4 uStack_3744;
  undefined1 local_3740 [32];
  undefined1 local_3720 [32];
  undefined1 local_3700 [8];
  undefined8 uStack_36f8;
  undefined8 uStack_36f0;
  undefined8 uStack_36e8;
  undefined1 local_36e0 [32];
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined8 local_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined8 local_3660;
  undefined8 uStack_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined8 local_3620;
  undefined8 uStack_3618;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  undefined4 local_3600;
  undefined4 uStack_35fc;
  undefined4 uStack_35f8;
  undefined4 uStack_35f4;
  undefined4 uStack_35f0;
  undefined4 uStack_35ec;
  undefined4 uStack_35e8;
  undefined4 uStack_35e4;
  undefined8 local_35e0;
  undefined8 uStack_35d8;
  undefined8 uStack_35d0;
  undefined8 uStack_35c8;
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 uStack_35b0;
  undefined8 uStack_35a8;
  undefined8 local_35a0;
  undefined8 uStack_3598;
  undefined8 uStack_3590;
  undefined8 uStack_3588;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  undefined8 local_3560;
  undefined8 uStack_3558;
  undefined8 uStack_3550;
  undefined8 uStack_3548;
  undefined4 local_3540;
  undefined4 uStack_353c;
  undefined4 uStack_3538;
  undefined4 uStack_3534;
  undefined4 uStack_3530;
  undefined4 uStack_352c;
  undefined4 uStack_3528;
  undefined4 uStack_3524;
  undefined8 local_3520;
  undefined8 uStack_3518;
  undefined8 uStack_3510;
  undefined8 uStack_3508;
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  undefined8 local_34e0;
  undefined8 uStack_34d8;
  undefined8 uStack_34d0;
  undefined8 uStack_34c8;
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  undefined8 local_34a0;
  undefined8 uStack_3498;
  undefined8 uStack_3490;
  undefined8 uStack_3488;
  undefined4 local_3480;
  undefined4 uStack_347c;
  undefined4 uStack_3478;
  undefined4 uStack_3474;
  undefined4 uStack_3470;
  undefined4 uStack_346c;
  undefined4 uStack_3468;
  undefined4 uStack_3464;
  undefined8 local_3460;
  undefined8 uStack_3458;
  undefined8 uStack_3450;
  undefined8 uStack_3448;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 local_33e0;
  undefined8 uStack_33d8;
  undefined8 uStack_33d0;
  undefined8 uStack_33c8;
  undefined4 local_33c0;
  undefined4 uStack_33bc;
  undefined4 uStack_33b8;
  undefined4 uStack_33b4;
  undefined4 uStack_33b0;
  undefined4 uStack_33ac;
  undefined4 uStack_33a8;
  undefined4 uStack_33a4;
  undefined8 local_33a0;
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  undefined8 local_3380;
  undefined8 uStack_3378;
  undefined8 uStack_3370;
  undefined8 uStack_3368;
  undefined8 local_3360;
  undefined8 uStack_3358;
  undefined8 uStack_3350;
  undefined8 uStack_3348;
  undefined8 local_3340;
  undefined8 uStack_3338;
  undefined8 uStack_3330;
  undefined8 uStack_3328;
  undefined8 local_3320;
  undefined8 uStack_3318;
  undefined8 uStack_3310;
  undefined8 uStack_3308;
  undefined4 local_3300;
  undefined4 uStack_32fc;
  undefined4 uStack_32f8;
  undefined4 uStack_32f4;
  undefined4 uStack_32f0;
  undefined4 uStack_32ec;
  undefined4 uStack_32e8;
  undefined4 uStack_32e4;
  undefined8 local_32e0;
  undefined8 uStack_32d8;
  undefined8 uStack_32d0;
  undefined8 uStack_32c8;
  undefined8 local_32c0;
  undefined8 uStack_32b8;
  undefined8 uStack_32b0;
  undefined8 uStack_32a8;
  undefined8 local_32a0;
  undefined8 uStack_3298;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  undefined8 local_3260;
  undefined8 uStack_3258;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  undefined4 local_3240;
  undefined4 uStack_323c;
  undefined4 uStack_3238;
  undefined4 uStack_3234;
  undefined4 uStack_3230;
  undefined4 uStack_322c;
  undefined4 uStack_3228;
  undefined4 uStack_3224;
  undefined4 local_3220;
  undefined4 uStack_321c;
  undefined4 uStack_3218;
  undefined4 uStack_3214;
  undefined4 uStack_3210;
  undefined4 uStack_320c;
  undefined4 uStack_3208;
  undefined4 uStack_3204;
  undefined8 local_3200;
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  undefined4 local_3140;
  undefined4 uStack_313c;
  undefined4 uStack_3138;
  undefined4 uStack_3134;
  undefined4 uStack_3130;
  undefined4 uStack_312c;
  undefined4 uStack_3128;
  undefined4 uStack_3124;
  undefined8 local_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined4 local_30e0;
  undefined4 uStack_30dc;
  undefined4 uStack_30d8;
  undefined4 uStack_30d4;
  undefined4 uStack_30d0;
  undefined4 uStack_30cc;
  undefined4 uStack_30c8;
  undefined4 uStack_30c4;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 local_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  undefined8 local_3080;
  undefined8 uStack_3078;
  undefined8 uStack_3070;
  undefined8 uStack_3068;
  undefined8 local_3060;
  undefined8 uStack_3058;
  undefined8 uStack_3050;
  undefined8 uStack_3048;
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  undefined8 local_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  undefined1 local_3000 [8];
  undefined8 uStack_2ff8;
  undefined8 uStack_2ff0;
  undefined8 uStack_2fe8;
  undefined1 local_2fe0 [32];
  undefined4 local_2fc0;
  undefined4 uStack_2fbc;
  undefined4 uStack_2fb8;
  undefined4 uStack_2fb4;
  undefined4 uStack_2fb0;
  undefined4 uStack_2fac;
  undefined4 uStack_2fa8;
  undefined4 uStack_2fa4;
  undefined1 local_2fa0 [32];
  undefined1 local_2f80 [32];
  undefined1 local_2f60 [8];
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined1 local_2f40 [32];
  undefined8 local_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  undefined8 local_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  undefined8 local_2ea0;
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  undefined4 local_2e60;
  undefined4 uStack_2e5c;
  undefined4 uStack_2e58;
  undefined4 uStack_2e54;
  undefined4 uStack_2e50;
  undefined4 uStack_2e4c;
  undefined4 uStack_2e48;
  undefined4 uStack_2e44;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 local_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined4 local_2da0;
  undefined4 uStack_2d9c;
  undefined4 uStack_2d98;
  undefined4 uStack_2d94;
  undefined4 uStack_2d90;
  undefined4 uStack_2d8c;
  undefined4 uStack_2d88;
  undefined4 uStack_2d84;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 local_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined8 local_2d20;
  undefined8 uStack_2d18;
  undefined8 uStack_2d10;
  undefined8 uStack_2d08;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined4 local_2ce0;
  undefined4 uStack_2cdc;
  undefined4 uStack_2cd8;
  undefined4 uStack_2cd4;
  undefined4 uStack_2cd0;
  undefined4 uStack_2ccc;
  undefined4 uStack_2cc8;
  undefined4 uStack_2cc4;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 local_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 local_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined4 local_2c20;
  undefined4 uStack_2c1c;
  undefined4 uStack_2c18;
  undefined4 uStack_2c14;
  undefined4 uStack_2c10;
  undefined4 uStack_2c0c;
  undefined4 uStack_2c08;
  undefined4 uStack_2c04;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  undefined8 local_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 local_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined4 local_2b60;
  undefined4 uStack_2b5c;
  undefined4 uStack_2b58;
  undefined4 uStack_2b54;
  undefined4 uStack_2b50;
  undefined4 uStack_2b4c;
  undefined4 uStack_2b48;
  undefined4 uStack_2b44;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 local_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined4 local_2aa0;
  undefined4 uStack_2a9c;
  undefined4 uStack_2a98;
  undefined4 uStack_2a94;
  undefined4 uStack_2a90;
  undefined4 uStack_2a8c;
  undefined4 uStack_2a88;
  undefined4 uStack_2a84;
  undefined4 local_2a80;
  undefined4 uStack_2a7c;
  undefined4 uStack_2a78;
  undefined4 uStack_2a74;
  undefined4 uStack_2a70;
  undefined4 uStack_2a6c;
  undefined4 uStack_2a68;
  undefined4 uStack_2a64;
  undefined8 local_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined4 local_29a0;
  undefined4 uStack_299c;
  undefined4 uStack_2998;
  undefined4 uStack_2994;
  undefined4 uStack_2990;
  undefined4 uStack_298c;
  undefined4 uStack_2988;
  undefined4 uStack_2984;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined4 local_2940;
  undefined4 uStack_293c;
  undefined4 uStack_2938;
  undefined4 uStack_2934;
  undefined4 uStack_2930;
  undefined4 uStack_292c;
  undefined4 uStack_2928;
  undefined4 uStack_2924;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined1 local_28e0 [32];
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined8 local_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined4 local_2720;
  undefined4 uStack_271c;
  undefined4 uStack_2718;
  undefined4 uStack_2714;
  undefined4 uStack_2710;
  undefined4 uStack_270c;
  undefined4 uStack_2708;
  undefined4 uStack_2704;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined4 local_26c0;
  undefined4 uStack_26bc;
  undefined4 uStack_26b8;
  undefined4 uStack_26b4;
  undefined4 uStack_26b0;
  undefined4 uStack_26ac;
  undefined4 uStack_26a8;
  undefined4 uStack_26a4;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined4 local_2660;
  undefined4 uStack_265c;
  undefined4 uStack_2658;
  undefined4 uStack_2654;
  undefined4 uStack_2650;
  undefined4 uStack_264c;
  undefined4 uStack_2648;
  undefined4 uStack_2644;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined4 local_2600;
  undefined4 uStack_25fc;
  undefined4 uStack_25f8;
  undefined4 uStack_25f4;
  undefined4 uStack_25f0;
  undefined4 uStack_25ec;
  undefined4 uStack_25e8;
  undefined4 uStack_25e4;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined4 local_24e4;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined4 local_24a4;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined4 local_2224;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined4 local_21e4;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined4 local_2148;
  undefined4 local_2144;
  undefined1 local_2140 [16];
  undefined1 auStack_2130 [16];
  undefined4 local_2120;
  undefined4 local_211c;
  undefined4 uStack_2118;
  undefined4 local_2114;
  undefined4 uStack_2110;
  undefined4 local_210c;
  undefined4 uStack_2108;
  undefined4 local_2104;
  undefined1 auStack_2100 [16];
  undefined1 auStack_20f0 [16];
  undefined4 local_20e0;
  undefined4 local_20dc;
  undefined4 uStack_20d8;
  undefined4 local_20d4;
  undefined4 uStack_20d0;
  undefined4 local_20cc;
  undefined4 uStack_20c8;
  undefined4 local_20c4;
  undefined8 uStack_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined1 local_20a0 [32];
  undefined4 local_2064;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  float local_2040;
  float fStack_203c;
  float fStack_2038;
  float fStack_2034;
  float fStack_2030;
  float fStack_202c;
  float fStack_2028;
  float fStack_2024;
  undefined1 local_2020 [16];
  undefined1 auStack_2010 [16];
  undefined4 local_2000;
  undefined4 local_1ffc;
  undefined4 uStack_1ff8;
  undefined4 local_1ff4;
  undefined4 uStack_1ff0;
  undefined4 local_1fec;
  undefined4 uStack_1fe8;
  undefined4 local_1fe4;
  undefined8 uStack_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  float local_1f80;
  float fStack_1f7c;
  float fStack_1f78;
  float fStack_1f74;
  float fStack_1f70;
  float fStack_1f6c;
  float fStack_1f68;
  float fStack_1f64;
  float local_1f60;
  float fStack_1f5c;
  float fStack_1f58;
  float fStack_1f54;
  float fStack_1f50;
  float fStack_1f4c;
  float fStack_1f48;
  float fStack_1f44;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined1 local_1f20 [8];
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined1 local_1f00 [32];
  undefined4 local_1ee0;
  undefined4 uStack_1edc;
  undefined4 uStack_1ed8;
  undefined4 uStack_1ed4;
  undefined4 uStack_1ed0;
  undefined4 uStack_1ecc;
  undefined4 uStack_1ec8;
  undefined4 uStack_1ec4;
  undefined1 local_1ec0 [32];
  undefined1 local_1ea0 [32];
  undefined1 local_1e80 [8];
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined1 local_1e60 [32];
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined4 local_1d80;
  undefined4 uStack_1d7c;
  undefined4 uStack_1d78;
  undefined4 uStack_1d74;
  undefined4 uStack_1d70;
  undefined4 uStack_1d6c;
  undefined4 uStack_1d68;
  undefined4 uStack_1d64;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined4 local_1cc0;
  undefined4 uStack_1cbc;
  undefined4 uStack_1cb8;
  undefined4 uStack_1cb4;
  undefined4 uStack_1cb0;
  undefined4 uStack_1cac;
  undefined4 uStack_1ca8;
  undefined4 uStack_1ca4;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined4 local_1c00;
  undefined4 uStack_1bfc;
  undefined4 uStack_1bf8;
  undefined4 uStack_1bf4;
  undefined4 uStack_1bf0;
  undefined4 uStack_1bec;
  undefined4 uStack_1be8;
  undefined4 uStack_1be4;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined4 local_1b40;
  undefined4 uStack_1b3c;
  undefined4 uStack_1b38;
  undefined4 uStack_1b34;
  undefined4 uStack_1b30;
  undefined4 uStack_1b2c;
  undefined4 uStack_1b28;
  undefined4 uStack_1b24;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined4 local_1a80;
  undefined4 uStack_1a7c;
  undefined4 uStack_1a78;
  undefined4 uStack_1a74;
  undefined4 uStack_1a70;
  undefined4 uStack_1a6c;
  undefined4 uStack_1a68;
  undefined4 uStack_1a64;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined4 local_19c0;
  undefined4 uStack_19bc;
  undefined4 uStack_19b8;
  undefined4 uStack_19b4;
  undefined4 uStack_19b0;
  undefined4 uStack_19ac;
  undefined4 uStack_19a8;
  undefined4 uStack_19a4;
  undefined4 local_19a0;
  undefined4 uStack_199c;
  undefined4 uStack_1998;
  undefined4 uStack_1994;
  undefined4 uStack_1990;
  undefined4 uStack_198c;
  undefined4 uStack_1988;
  undefined4 uStack_1984;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined4 local_18c0;
  undefined4 uStack_18bc;
  undefined4 uStack_18b8;
  undefined4 uStack_18b4;
  undefined4 uStack_18b0;
  undefined4 uStack_18ac;
  undefined4 uStack_18a8;
  undefined4 uStack_18a4;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined4 local_1860;
  undefined4 uStack_185c;
  undefined4 uStack_1858;
  undefined4 uStack_1854;
  undefined4 uStack_1850;
  undefined4 uStack_184c;
  undefined4 uStack_1848;
  undefined4 uStack_1844;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined4 local_16c0;
  undefined4 uStack_16bc;
  undefined4 uStack_16b8;
  undefined4 uStack_16b4;
  undefined4 uStack_16b0;
  undefined4 uStack_16ac;
  undefined4 uStack_16a8;
  undefined4 uStack_16a4;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined4 local_1660;
  undefined4 uStack_165c;
  undefined4 uStack_1658;
  undefined4 uStack_1654;
  undefined4 uStack_1650;
  undefined4 uStack_164c;
  undefined4 uStack_1648;
  undefined4 uStack_1644;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined4 local_15a4;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined4 local_1444;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [8];
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined1 local_1380 [32];
  undefined4 local_1360;
  undefined4 uStack_135c;
  undefined4 uStack_1358;
  undefined4 uStack_1354;
  undefined4 uStack_1350;
  undefined4 uStack_134c;
  undefined4 uStack_1348;
  undefined4 uStack_1344;
  undefined1 local_1340 [32];
  undefined1 local_1320 [8];
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined4 local_12e0;
  undefined4 uStack_12dc;
  undefined4 uStack_12d8;
  undefined4 uStack_12d4;
  undefined4 uStack_12d0;
  undefined4 uStack_12cc;
  undefined4 uStack_12c8;
  undefined4 uStack_12c4;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined4 local_1220;
  undefined4 uStack_121c;
  undefined4 uStack_1218;
  undefined4 uStack_1214;
  undefined4 uStack_1210;
  undefined4 uStack_120c;
  undefined4 uStack_1208;
  undefined4 uStack_1204;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined4 local_1180;
  undefined4 uStack_117c;
  undefined4 uStack_1178;
  undefined4 uStack_1174;
  undefined4 uStack_1170;
  undefined4 uStack_116c;
  undefined4 uStack_1168;
  undefined4 uStack_1164;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined4 local_10c0;
  undefined4 uStack_10bc;
  undefined4 uStack_10b8;
  undefined4 uStack_10b4;
  undefined4 uStack_10b0;
  undefined4 uStack_10ac;
  undefined4 uStack_10a8;
  undefined4 uStack_10a4;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined4 local_1000;
  undefined4 uStack_ffc;
  undefined4 uStack_ff8;
  undefined4 uStack_ff4;
  undefined4 uStack_ff0;
  undefined4 uStack_fec;
  undefined4 uStack_fe8;
  undefined4 uStack_fe4;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined4 local_f40;
  undefined4 uStack_f3c;
  undefined4 uStack_f38;
  undefined4 uStack_f34;
  undefined4 uStack_f30;
  undefined4 uStack_f2c;
  undefined4 uStack_f28;
  undefined4 uStack_f24;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined4 local_e80;
  undefined4 uStack_e7c;
  undefined4 uStack_e78;
  undefined4 uStack_e74;
  undefined4 uStack_e70;
  undefined4 uStack_e6c;
  undefined4 uStack_e68;
  undefined4 uStack_e64;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined4 local_dc0;
  undefined4 uStack_dbc;
  undefined4 uStack_db8;
  undefined4 uStack_db4;
  undefined4 uStack_db0;
  undefined4 uStack_dac;
  undefined4 uStack_da8;
  undefined4 uStack_da4;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined4 local_d00;
  undefined4 uStack_cfc;
  undefined4 uStack_cf8;
  undefined4 uStack_cf4;
  undefined4 uStack_cf0;
  undefined4 uStack_cec;
  undefined4 uStack_ce8;
  undefined4 uStack_ce4;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined4 local_c40;
  undefined4 uStack_c3c;
  undefined4 uStack_c38;
  undefined4 uStack_c34;
  undefined4 uStack_c30;
  undefined4 uStack_c2c;
  undefined4 uStack_c28;
  undefined4 uStack_c24;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined4 local_ac0;
  undefined4 uStack_abc;
  undefined4 uStack_ab8;
  undefined4 uStack_ab4;
  undefined4 uStack_ab0;
  undefined4 uStack_aac;
  undefined4 uStack_aa8;
  undefined4 uStack_aa4;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined1 local_9a0 [32];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined4 local_840;
  undefined4 uStack_83c;
  undefined4 uStack_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined4 uStack_828;
  undefined4 uStack_824;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined1 local_760 [32];
  undefined4 local_724;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined4 local_6a0;
  undefined4 uStack_69c;
  undefined4 uStack_698;
  undefined4 uStack_694;
  undefined4 uStack_690;
  undefined4 uStack_68c;
  undefined4 uStack_688;
  undefined4 uStack_684;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined4 local_5e4;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  undefined1 local_530 [16];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [16];
  ulong local_500;
  undefined8 uStack_4f8;
  ulong local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  int local_28c;
  long *local_288;
  int local_27c;
  long *local_278;
  int local_26c;
  long *local_268;
  int local_25c;
  long *local_258;
  int local_24c;
  long *local_248;
  int local_23c;
  long *local_238;
  int local_22c;
  long *local_228;
  int local_21c;
  long *local_218;
  int local_20c;
  long *local_208;
  int local_1fc;
  long *local_1f8;
  int local_1ec;
  long *local_1e8;
  int local_1dc;
  long *local_1d8;
  int local_1cc;
  long *local_1c8;
  ulong local_1c0;
  undefined8 uStack_1b8;
  ulong local_1b0;
  undefined8 uStack_1a8;
  ulong local_1a0;
  undefined8 uStack_198;
  ulong local_190;
  undefined8 uStack_188;
  ulong local_180;
  undefined8 uStack_178;
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined1 (*local_98) [16];
  undefined1 (*local_90) [16];
  undefined1 (*local_88) [16];
  undefined1 (*local_80) [16];
  undefined1 (*local_78) [16];
  undefined1 (*local_70) [16];
  undefined1 (*local_68) [16];
  undefined1 (*local_60) [16];
  undefined1 (*local_58) [16];
  undefined1 (*local_50) [16];
  undefined1 (*local_48) [16];
  undefined1 (*local_40) [16];
  undefined1 (*local_38) [16];
  
  local_742c = *(int *)((long)in_RDI + 0x2c) * *(int *)(in_RDI + 3);
  local_7430 = *(int *)((long)in_RSI + 0x2c);
  local_7438 = *in_RCX;
  local_743c = 0;
  local_7440 = local_7430 >> 3;
  local_7428 = in_R9;
  local_741c = in_R8D;
  local_7410 = in_RDX;
  local_7408 = in_RSI;
  local_7400 = in_RDI;
  for (local_7444 = 0; local_7444 < local_7440; local_7444 = local_7444 + 1) {
    local_7448 = local_7444 << 3;
    memset(&local_7470,0,0x20);
    if (local_7438 != 0) {
      local_7470 = *(float *)(local_7438 + (long)local_7448 * 4);
      fStack_746c = *(float *)(local_7438 + (long)(local_7448 + 1) * 4);
      fStack_7468 = *(float *)(local_7438 + (long)(local_7448 + 2) * 4);
      fStack_7464 = *(float *)(local_7438 + (long)(local_7448 + 3) * 4);
      fStack_7460 = *(float *)(local_7438 + (long)(local_7448 + 4) * 4);
      fStack_745c = *(float *)(local_7438 + (long)(local_7448 + 5) * 4);
      fStack_7458 = *(float *)(local_7438 + (long)(local_7448 + 6) * 4);
      fStack_7454 = *(float *)(local_7438 + (long)(local_7448 + 7) * 4);
    }
    local_1c8 = local_7410;
    local_1cc = local_7448;
    local_7478 = (undefined1 (*) [16])
                 (*local_7410 +
                 (long)*(int *)((long)local_7410 + 0x2c) * (long)local_7448 * local_7410[2]);
    local_1dc = local_7448 + 1;
    local_1d8 = local_7410;
    local_7480 = (undefined1 (*) [16])
                 (*local_7410 +
                 (long)*(int *)((long)local_7410 + 0x2c) * (long)local_1dc * local_7410[2]);
    local_1ec = local_7448 + 2;
    local_1e8 = local_7410;
    local_7488 = (undefined1 (*) [16])
                 (*local_7410 +
                 (long)*(int *)((long)local_7410 + 0x2c) * (long)local_1ec * local_7410[2]);
    local_1fc = local_7448 + 3;
    local_1f8 = local_7410;
    local_7490 = (undefined1 (*) [16])
                 (*local_7410 +
                 (long)*(int *)((long)local_7410 + 0x2c) * (long)local_1fc * local_7410[2]);
    local_20c = local_7448 + 4;
    local_208 = local_7410;
    local_7498 = (undefined1 (*) [16])
                 (*local_7410 +
                 (long)*(int *)((long)local_7410 + 0x2c) * (long)local_20c * local_7410[2]);
    local_21c = local_7448 + 5;
    local_218 = local_7410;
    local_74a0 = (undefined1 (*) [16])
                 (*local_7410 +
                 (long)*(int *)((long)local_7410 + 0x2c) * (long)local_21c * local_7410[2]);
    local_22c = local_7448 + 6;
    local_228 = local_7410;
    local_74a8 = (undefined1 (*) [16])
                 (*local_7410 +
                 (long)*(int *)((long)local_7410 + 0x2c) * (long)local_22c * local_7410[2]);
    local_23c = local_7448 + 7;
    local_238 = local_7410;
    local_74b0 = (undefined1 (*) [16])
                 (*local_7410 +
                 (long)*(int *)((long)local_7410 + 0x2c) * (long)local_23c * local_7410[2]);
    local_73e8 = local_7400;
    local_74b8 = (undefined1 (*) [32])*local_7400;
    local_3f00 = 0;
    uStack_3ef8 = 0;
    uStack_3ef0 = 0;
    uStack_3ee8 = 0;
    local_74e0._0_16_ = ZEXT816(0);
    local_3f20 = 0;
    uStack_3f18 = 0;
    uStack_3f10 = 0;
    uStack_3f08 = 0;
    local_7500._0_16_ = ZEXT816(0);
    local_3f40 = 0;
    uStack_3f38 = 0;
    uStack_3f30 = 0;
    uStack_3f28 = 0;
    local_7520._0_16_ = ZEXT816(0);
    local_3f60 = 0;
    uStack_3f58 = 0;
    uStack_3f50 = 0;
    uStack_3f48 = 0;
    local_7540._0_16_ = ZEXT816(0);
    local_3f80 = 0;
    uStack_3f78 = 0;
    uStack_3f70 = 0;
    uStack_3f68 = 0;
    local_7560._0_16_ = ZEXT816(0);
    local_3fa0 = 0;
    uStack_3f98 = 0;
    uStack_3f90 = 0;
    uStack_3f88 = 0;
    local_7580._0_16_ = ZEXT816(0);
    local_3fc0 = 0;
    uStack_3fb8 = 0;
    uStack_3fb0 = 0;
    uStack_3fa8 = 0;
    local_75a0._0_16_ = ZEXT816(0);
    local_3fe0 = 0;
    uStack_3fd8 = 0;
    uStack_3fd0 = 0;
    uStack_3fc8 = 0;
    local_75c0._0_16_ = ZEXT816(0);
    local_75c4 = 0;
    auVar10 = local_75c0._0_16_;
    auVar9 = local_75a0._0_16_;
    auVar8 = local_7580._0_16_;
    auVar7 = local_7560._0_16_;
    auVar6 = local_7540._0_16_;
    auVar5 = local_7520._0_16_;
    auVar218 = local_7500._0_16_;
    auVar219 = local_74e0._0_16_;
    while( true ) {
      local_74e0 = ZEXT1632(auVar219);
      auVar4 = local_74e0;
      local_7500 = ZEXT1632(auVar218);
      auVar3 = local_7500;
      local_7520 = ZEXT1632(auVar5);
      auVar2 = local_7520;
      local_7540 = ZEXT1632(auVar6);
      auVar1 = local_7540;
      local_7560 = ZEXT1632(auVar7);
      auVar106 = local_7560;
      local_7580 = ZEXT1632(auVar8);
      auVar222 = local_7580;
      local_75a0 = ZEXT1632(auVar9);
      auVar221 = local_75a0;
      local_75c0 = ZEXT1632(auVar10);
      auVar220 = local_75c0;
      if (local_742c <= local_75c4 + 7) break;
      local_7248 = local_74b8;
      local_7600 = *(undefined8 *)*local_74b8;
      uStack_75f8 = *(undefined8 *)(*local_74b8 + 8);
      uStack_75f0 = *(undefined8 *)(*local_74b8 + 0x10);
      uStack_75e8 = *(undefined8 *)(*local_74b8 + 0x18);
      local_38 = local_7478;
      local_b0 = vlddqu_avx(*local_7478);
      local_7620 = vcvtph2ps_f16c(local_b0);
      local_40 = local_7480;
      local_c0 = vlddqu_avx(*local_7480);
      local_7640 = vcvtph2ps_f16c(local_c0);
      local_48 = local_7488;
      local_d0 = vlddqu_avx(*local_7488);
      local_7660 = vcvtph2ps_f16c(local_d0);
      local_50 = local_7490;
      local_e0 = vlddqu_avx(*local_7490);
      local_7680 = vcvtph2ps_f16c(local_e0);
      local_58 = local_7498;
      local_f0 = vlddqu_avx(*local_7498);
      local_76a0 = vcvtph2ps_f16c(local_f0);
      local_60 = local_74a0;
      local_100 = vlddqu_avx(*local_74a0);
      local_76c0 = vcvtph2ps_f16c(local_100);
      local_68 = local_74a8;
      local_110 = vlddqu_avx(*local_74a8);
      local_76e0 = vcvtph2ps_f16c(local_110);
      local_70 = local_74b0;
      local_120 = vlddqu_avx(*local_74b0);
      local_7700 = vcvtph2ps_f16c(local_120);
      local_67a0 = local_7620._0_8_;
      uStack_6798 = local_7620._8_8_;
      uStack_6790 = local_7620._16_8_;
      uStack_6788 = local_7620._24_8_;
      local_74e0._0_8_ = auVar219._0_8_;
      local_67c0 = local_74e0._0_8_;
      local_74e0._8_8_ = auVar219._8_8_;
      uStack_67b8 = local_74e0._8_8_;
      uStack_67b0 = 0;
      uStack_67a8 = 0;
      local_6740 = local_7620._0_8_;
      uStack_6738 = local_7620._8_8_;
      uStack_6730 = local_7620._16_8_;
      uStack_6728 = local_7620._24_8_;
      local_6760 = local_74e0._0_8_;
      uStack_6758 = local_74e0._8_8_;
      uStack_6750 = 0;
      uStack_6748 = 0;
      auVar219 = vfmadd213ps_fma(local_7620,*local_74b8,auVar4);
      local_6860 = local_7640._0_8_;
      uStack_6858 = local_7640._8_8_;
      uStack_6850 = local_7640._16_8_;
      uStack_6848 = local_7640._24_8_;
      local_7500._0_8_ = auVar218._0_8_;
      local_6880 = local_7500._0_8_;
      local_7500._8_8_ = auVar218._8_8_;
      uStack_6878 = local_7500._8_8_;
      uStack_6870 = 0;
      uStack_6868 = 0;
      local_6800 = local_7640._0_8_;
      uStack_67f8 = local_7640._8_8_;
      uStack_67f0 = local_7640._16_8_;
      uStack_67e8 = local_7640._24_8_;
      local_6820 = local_7500._0_8_;
      uStack_6818 = local_7500._8_8_;
      uStack_6810 = 0;
      uStack_6808 = 0;
      auVar218 = vfmadd213ps_fma(local_7640,*local_74b8,auVar3);
      local_6920 = local_7660._0_8_;
      uStack_6918 = local_7660._8_8_;
      uStack_6910 = local_7660._16_8_;
      uStack_6908 = local_7660._24_8_;
      local_7520._0_8_ = auVar5._0_8_;
      local_6940 = local_7520._0_8_;
      local_7520._8_8_ = auVar5._8_8_;
      uStack_6938 = local_7520._8_8_;
      uStack_6930 = 0;
      uStack_6928 = 0;
      local_68c0 = local_7660._0_8_;
      uStack_68b8 = local_7660._8_8_;
      uStack_68b0 = local_7660._16_8_;
      uStack_68a8 = local_7660._24_8_;
      local_68e0 = local_7520._0_8_;
      uStack_68d8 = local_7520._8_8_;
      uStack_68d0 = 0;
      uStack_68c8 = 0;
      auVar5 = vfmadd213ps_fma(local_7660,*local_74b8,auVar2);
      local_69e0 = local_7680._0_8_;
      uStack_69d8 = local_7680._8_8_;
      uStack_69d0 = local_7680._16_8_;
      uStack_69c8 = local_7680._24_8_;
      local_7540._0_8_ = auVar6._0_8_;
      local_6a00 = local_7540._0_8_;
      local_7540._8_8_ = auVar6._8_8_;
      uStack_69f8 = local_7540._8_8_;
      uStack_69f0 = 0;
      uStack_69e8 = 0;
      local_6980 = local_7680._0_8_;
      uStack_6978 = local_7680._8_8_;
      uStack_6970 = local_7680._16_8_;
      uStack_6968 = local_7680._24_8_;
      local_69a0 = local_7540._0_8_;
      uStack_6998 = local_7540._8_8_;
      uStack_6990 = 0;
      uStack_6988 = 0;
      auVar6 = vfmadd213ps_fma(local_7680,*local_74b8,auVar1);
      local_6aa0 = local_76a0._0_8_;
      uStack_6a98 = local_76a0._8_8_;
      uStack_6a90 = local_76a0._16_8_;
      uStack_6a88 = local_76a0._24_8_;
      local_7560._0_8_ = auVar7._0_8_;
      local_6ac0 = local_7560._0_8_;
      local_7560._8_8_ = auVar7._8_8_;
      uStack_6ab8 = local_7560._8_8_;
      uStack_6ab0 = 0;
      uStack_6aa8 = 0;
      local_6a40 = local_76a0._0_8_;
      uStack_6a38 = local_76a0._8_8_;
      uStack_6a30 = local_76a0._16_8_;
      uStack_6a28 = local_76a0._24_8_;
      local_6a60 = local_7560._0_8_;
      uStack_6a58 = local_7560._8_8_;
      uStack_6a50 = 0;
      uStack_6a48 = 0;
      auVar7 = vfmadd213ps_fma(local_76a0,*local_74b8,auVar106);
      local_6b60 = local_76c0._0_8_;
      uStack_6b58 = local_76c0._8_8_;
      uStack_6b50 = local_76c0._16_8_;
      uStack_6b48 = local_76c0._24_8_;
      local_7580._0_8_ = auVar8._0_8_;
      local_6b80 = local_7580._0_8_;
      local_7580._8_8_ = auVar8._8_8_;
      uStack_6b78 = local_7580._8_8_;
      uStack_6b70 = 0;
      uStack_6b68 = 0;
      local_6b00 = local_76c0._0_8_;
      uStack_6af8 = local_76c0._8_8_;
      uStack_6af0 = local_76c0._16_8_;
      uStack_6ae8 = local_76c0._24_8_;
      local_6b20 = local_7580._0_8_;
      uStack_6b18 = local_7580._8_8_;
      uStack_6b10 = 0;
      uStack_6b08 = 0;
      auVar8 = vfmadd213ps_fma(local_76c0,*local_74b8,auVar222);
      local_6c20 = local_76e0._0_8_;
      uStack_6c18 = local_76e0._8_8_;
      uStack_6c10 = local_76e0._16_8_;
      uStack_6c08 = local_76e0._24_8_;
      local_75a0._0_8_ = auVar9._0_8_;
      local_6c40 = local_75a0._0_8_;
      local_75a0._8_8_ = auVar9._8_8_;
      uStack_6c38 = local_75a0._8_8_;
      uStack_6c30 = 0;
      uStack_6c28 = 0;
      local_6bc0 = local_76e0._0_8_;
      uStack_6bb8 = local_76e0._8_8_;
      uStack_6bb0 = local_76e0._16_8_;
      uStack_6ba8 = local_76e0._24_8_;
      local_6be0 = local_75a0._0_8_;
      uStack_6bd8 = local_75a0._8_8_;
      uStack_6bd0 = 0;
      uStack_6bc8 = 0;
      auVar9 = vfmadd213ps_fma(local_76e0,*local_74b8,auVar221);
      local_6ce0 = local_7700._0_8_;
      uStack_6cd8 = local_7700._8_8_;
      uStack_6cd0 = local_7700._16_8_;
      uStack_6cc8 = local_7700._24_8_;
      local_75c0._0_8_ = auVar10._0_8_;
      local_6d00 = local_75c0._0_8_;
      local_75c0._8_8_ = auVar10._8_8_;
      uStack_6cf8 = local_75c0._8_8_;
      uStack_6cf0 = 0;
      uStack_6ce8 = 0;
      local_6c80 = local_7700._0_8_;
      uStack_6c78 = local_7700._8_8_;
      uStack_6c70 = local_7700._16_8_;
      uStack_6c68 = local_7700._24_8_;
      local_6ca0 = local_75c0._0_8_;
      uStack_6c98 = local_75c0._8_8_;
      uStack_6c90 = 0;
      uStack_6c88 = 0;
      auVar10 = vfmadd213ps_fma(local_7700,*local_74b8,auVar220);
      local_74b8 = local_74b8 + 1;
      local_7478 = local_7478 + 1;
      local_7480 = local_7480 + 1;
      local_7488 = local_7488 + 1;
      local_7490 = local_7490 + 1;
      local_7498 = local_7498 + 1;
      local_74a0 = local_74a0 + 1;
      local_74a8 = local_74a8 + 1;
      local_74b0 = local_74b0 + 1;
      local_75c4 = local_75c4 + 8;
      local_6cc0 = local_7600;
      uStack_6cb8 = uStack_75f8;
      uStack_6cb0 = uStack_75f0;
      uStack_6ca8 = uStack_75e8;
      local_6c60 = local_7600;
      uStack_6c58 = uStack_75f8;
      uStack_6c50 = uStack_75f0;
      uStack_6c48 = uStack_75e8;
      local_6c00 = local_7600;
      uStack_6bf8 = uStack_75f8;
      uStack_6bf0 = uStack_75f0;
      uStack_6be8 = uStack_75e8;
      local_6ba0 = local_7600;
      uStack_6b98 = uStack_75f8;
      uStack_6b90 = uStack_75f0;
      uStack_6b88 = uStack_75e8;
      local_6b40 = local_7600;
      uStack_6b38 = uStack_75f8;
      uStack_6b30 = uStack_75f0;
      uStack_6b28 = uStack_75e8;
      local_6ae0 = local_7600;
      uStack_6ad8 = uStack_75f8;
      uStack_6ad0 = uStack_75f0;
      uStack_6ac8 = uStack_75e8;
      local_6a80 = local_7600;
      uStack_6a78 = uStack_75f8;
      uStack_6a70 = uStack_75f0;
      uStack_6a68 = uStack_75e8;
      local_6a20 = local_7600;
      uStack_6a18 = uStack_75f8;
      uStack_6a10 = uStack_75f0;
      uStack_6a08 = uStack_75e8;
      local_69c0 = local_7600;
      uStack_69b8 = uStack_75f8;
      uStack_69b0 = uStack_75f0;
      uStack_69a8 = uStack_75e8;
      local_6960 = local_7600;
      uStack_6958 = uStack_75f8;
      uStack_6950 = uStack_75f0;
      uStack_6948 = uStack_75e8;
      local_6900 = local_7600;
      uStack_68f8 = uStack_75f8;
      uStack_68f0 = uStack_75f0;
      uStack_68e8 = uStack_75e8;
      local_68a0 = local_7600;
      uStack_6898 = uStack_75f8;
      uStack_6890 = uStack_75f0;
      uStack_6888 = uStack_75e8;
      local_6840 = local_7600;
      uStack_6838 = uStack_75f8;
      uStack_6830 = uStack_75f0;
      uStack_6828 = uStack_75e8;
      local_67e0 = local_7600;
      uStack_67d8 = uStack_75f8;
      uStack_67d0 = uStack_75f0;
      uStack_67c8 = uStack_75e8;
      local_6780 = local_7600;
      uStack_6778 = uStack_75f8;
      uStack_6770 = uStack_75f0;
      uStack_6768 = uStack_75e8;
      local_6720 = local_7600;
      uStack_6718 = uStack_75f8;
      uStack_6710 = uStack_75f0;
      uStack_6708 = uStack_75e8;
    }
    for (; local_75c4 < local_742c; local_75c4 = local_75c4 + 1) {
      fVar224 = *(float *)*local_74b8;
      fVar223 = float16_to_float32(*(unsigned_short *)*local_7478);
      local_7470 = fVar224 * fVar223 + local_7470;
      fVar224 = *(float *)*local_74b8;
      fVar223 = float16_to_float32(*(unsigned_short *)*local_7480);
      fStack_746c = fVar224 * fVar223 + fStack_746c;
      fVar224 = *(float *)*local_74b8;
      fVar223 = float16_to_float32(*(unsigned_short *)*local_7488);
      fStack_7468 = fVar224 * fVar223 + fStack_7468;
      fVar224 = *(float *)*local_74b8;
      fVar223 = float16_to_float32(*(unsigned_short *)*local_7490);
      fStack_7464 = fVar224 * fVar223 + fStack_7464;
      fVar224 = *(float *)*local_74b8;
      fVar223 = float16_to_float32(*(unsigned_short *)*local_7498);
      fStack_7460 = fVar224 * fVar223 + fStack_7460;
      fVar224 = *(float *)*local_74b8;
      fVar223 = float16_to_float32(*(unsigned_short *)*local_74a0);
      fStack_745c = fVar224 * fVar223 + fStack_745c;
      fVar224 = *(float *)*local_74b8;
      fVar223 = float16_to_float32(*(unsigned_short *)*local_74a8);
      fStack_7458 = fVar224 * fVar223 + fStack_7458;
      fVar224 = *(float *)*local_74b8;
      fVar223 = float16_to_float32(*(unsigned_short *)*local_74b0);
      fStack_7454 = fVar224 * fVar223 + fStack_7454;
      local_74b8 = (undefined1 (*) [32])(*local_74b8 + 4);
      local_7478 = (undefined1 (*) [16])(*local_7478 + 2);
      local_7480 = (undefined1 (*) [16])(*local_7480 + 2);
      local_7488 = (undefined1 (*) [16])(*local_7488 + 2);
      local_7490 = (undefined1 (*) [16])(*local_7490 + 2);
      local_7498 = (undefined1 (*) [16])(*local_7498 + 2);
      local_74a0 = (undefined1 (*) [16])(*local_74a0 + 2);
      local_74a8 = (undefined1 (*) [16])(*local_74a8 + 2);
      local_74b0 = (undefined1 (*) [16])(*local_74b0 + 2);
    }
    local_6168 = local_74e0;
    local_6170 = local_7500;
    local_6178 = local_7520;
    local_6180 = local_7540;
    local_6188 = local_7560;
    local_6190 = local_7580;
    local_6198 = local_75a0;
    local_61a0 = local_75c0;
    local_2c0 = local_74e0._0_8_;
    uStack_2b8 = local_74e0._8_8_;
    uStack_2b0 = local_74e0._16_8_;
    uStack_2a8 = local_74e0._24_8_;
    local_2e0 = local_7500._0_8_;
    uStack_2d8 = local_7500._8_8_;
    uStack_2d0 = local_7500._16_8_;
    uStack_2c8 = local_7500._24_8_;
    local_61c0 = vhaddps_avx(local_74e0,local_7500);
    local_300 = local_7520._0_8_;
    uStack_2f8 = local_7520._8_8_;
    uStack_2f0 = local_7520._16_8_;
    uStack_2e8 = local_7520._24_8_;
    local_320 = local_7540._0_8_;
    uStack_318 = local_7540._8_8_;
    uStack_310 = local_7540._16_8_;
    uStack_308 = local_7540._24_8_;
    local_61e0 = vhaddps_avx(local_7520,local_7540);
    local_340 = local_7560._0_8_;
    uStack_338 = local_7560._8_8_;
    uStack_330 = local_7560._16_8_;
    uStack_328 = local_7560._24_8_;
    local_360 = local_7580._0_8_;
    uStack_358 = local_7580._8_8_;
    uStack_350 = local_7580._16_8_;
    uStack_348 = local_7580._24_8_;
    local_6200 = vhaddps_avx(local_7560,local_7580);
    local_380 = local_75a0._0_8_;
    uStack_378 = local_75a0._8_8_;
    uStack_370 = local_75a0._16_8_;
    uStack_368 = local_75a0._24_8_;
    local_3a0 = local_75c0._0_8_;
    uStack_398 = local_75c0._8_8_;
    uStack_390 = local_75c0._16_8_;
    uStack_388 = local_75c0._24_8_;
    local_6220 = vhaddps_avx(local_75a0,local_75c0);
    local_3c0 = local_61c0._0_8_;
    uStack_3b8 = local_61c0._8_8_;
    uStack_3b0 = local_61c0._16_8_;
    uStack_3a8 = local_61c0._24_8_;
    local_3e0 = local_61e0._0_8_;
    uStack_3d8 = local_61e0._8_8_;
    uStack_3d0 = local_61e0._16_8_;
    uStack_3c8 = local_61e0._24_8_;
    local_6240 = vhaddps_avx(local_61c0,local_61e0);
    local_400 = local_6200._0_8_;
    uStack_3f8 = local_6200._8_8_;
    uStack_3f0 = local_6200._16_8_;
    uStack_3e8 = local_6200._24_8_;
    local_420 = local_6220._0_8_;
    uStack_418 = local_6220._8_8_;
    uStack_410 = local_6220._16_8_;
    uStack_408 = local_6220._24_8_;
    local_6260 = vhaddps_avx(local_6200,local_6220);
    local_6280 = vblendps_avx(local_6240,local_6260,0xf0);
    local_62a0 = vperm2f128_avx(local_6240,local_6260,0x21);
    local_6140._0_4_ = local_6280._0_4_;
    local_6140._4_4_ = local_6280._4_4_;
    uStack_6138._0_4_ = local_6280._8_4_;
    uStack_6138._4_4_ = local_6280._12_4_;
    uStack_6130._0_4_ = local_6280._16_4_;
    uStack_6130._4_4_ = local_6280._20_4_;
    uStack_6128._0_4_ = local_6280._24_4_;
    uStack_6128._4_4_ = local_6280._28_4_;
    local_6160._0_4_ = local_62a0._0_4_;
    local_6160._4_4_ = local_62a0._4_4_;
    uStack_6158._0_4_ = local_62a0._8_4_;
    uStack_6158._4_4_ = local_62a0._12_4_;
    uStack_6150._0_4_ = local_62a0._16_4_;
    uStack_6150._4_4_ = local_62a0._20_4_;
    uStack_6148._0_4_ = local_62a0._24_4_;
    uStack_6148._4_4_ = local_62a0._28_4_;
    local_7720 = CONCAT44(local_6140._4_4_ + local_6160._4_4_,(float)local_6140 + (float)local_6160)
    ;
    uStack_7718 = CONCAT44(uStack_6138._4_4_ + uStack_6158._4_4_,
                           (float)uStack_6138 + (float)uStack_6158);
    uStack_7710 = CONCAT44(uStack_6130._4_4_ + uStack_6150._4_4_,
                           (float)uStack_6130 + (float)uStack_6150);
    uStack_7708 = CONCAT44(uStack_6128._4_4_ + uStack_6148._4_4_,
                           (float)uStack_6128 + (float)uStack_6148);
    local_7250 = &local_7470;
    local_7740 = CONCAT44(fStack_746c,local_7470);
    uStack_7738 = CONCAT44(fStack_7464,fStack_7468);
    uStack_7730 = CONCAT44(fStack_745c,fStack_7460);
    uStack_7728 = CONCAT44(fStack_7454,fStack_7458);
    local_6520 = local_7720;
    uStack_6518 = uStack_7718;
    uStack_6510 = uStack_7710;
    uStack_6508 = uStack_7708;
    fVar224 = local_7470 + (float)local_6140 + (float)local_6160;
    fVar223 = fStack_746c + local_6140._4_4_ + local_6160._4_4_;
    fVar233 = fStack_7468 + (float)uStack_6138 + (float)uStack_6158;
    fVar234 = fStack_7464 + uStack_6138._4_4_ + uStack_6158._4_4_;
    fVar235 = fStack_7460 + (float)uStack_6130 + (float)uStack_6150;
    fVar236 = fStack_745c + uStack_6130._4_4_ + uStack_6150._4_4_;
    fVar237 = fStack_7458 + (float)uStack_6128 + (float)uStack_6148;
    uStack_7168._4_4_ = fStack_7454 + uStack_6128._4_4_ + uStack_6148._4_4_;
    local_7720 = CONCAT44(fVar223,fVar224);
    uStack_7718 = CONCAT44(fVar234,fVar233);
    uStack_7710 = CONCAT44(fVar236,fVar235);
    uStack_7708 = CONCAT44(uStack_7168._4_4_,fVar237);
    local_71a0 = local_7720;
    uStack_7198 = uStack_7718;
    uStack_7190 = uStack_7710;
    uStack_7188 = uStack_7708;
    switch(local_741c) {
    case 1:
      local_40a0 = 0;
      uStack_4098 = 0;
      uStack_4090 = 0;
      uStack_4088 = 0;
      local_4100 = local_7720;
      uStack_40f8 = uStack_7718;
      uStack_40f0 = uStack_7710;
      uStack_40e8 = uStack_7708;
      local_4120 = 0;
      uStack_4118 = 0;
      uStack_4110 = 0;
      uStack_4108 = 0;
      auVar100._8_8_ = uStack_7718;
      auVar100._0_8_ = local_7720;
      auVar100._16_8_ = uStack_7710;
      auVar100._24_8_ = uStack_7708;
      _local_7180 = vmaxps_avx(auVar100,ZEXT1632(ZEXT816(0)));
      break;
    case 2:
      local_7118 = local_7428;
      local_7120 = 0;
      local_3e84 = *(uint *)*local_7428;
      local_3e80 = local_7720;
      uStack_3e78 = uStack_7718;
      uStack_3e70 = uStack_7710;
      uStack_3e68 = uStack_7708;
      local_3d60 = 0;
      uStack_3d58 = 0;
      uStack_3d50 = 0;
      uStack_3d48 = 0;
      local_3da0 = 0;
      uStack_3d98 = 0;
      uStack_3d90 = 0;
      uStack_3d88 = 0;
      local_3dc0 = local_7720;
      uStack_3db8 = uStack_7718;
      uStack_3db0 = uStack_7710;
      uStack_3da8 = uStack_7708;
      auVar103._8_8_ = uStack_7718;
      auVar103._0_8_ = local_7720;
      auVar103._16_8_ = uStack_7710;
      auVar103._24_8_ = uStack_7708;
      local_3ec0 = vmaxps_avx(ZEXT1632(ZEXT816(0)),auVar103);
      local_3d80 = 0;
      uStack_3d78 = 0;
      uStack_3d70 = 0;
      uStack_3d68 = 0;
      local_3d20 = 0;
      uStack_3d18 = 0;
      uStack_3d10 = 0;
      uStack_3d08 = 0;
      local_3d40 = local_7720;
      uStack_3d38 = uStack_7718;
      uStack_3d30 = uStack_7710;
      uStack_3d28 = uStack_7708;
      auVar104._8_8_ = uStack_7718;
      auVar104._0_8_ = local_7720;
      auVar104._16_8_ = uStack_7710;
      auVar104._24_8_ = uStack_7708;
      local_3ee0 = vminps_avx(ZEXT1632(ZEXT816(0)),auVar104);
      auVar219 = vinsertps_avx(ZEXT416(local_3e84),ZEXT416(local_3e84),0x10);
      auVar219 = vinsertps_avx(auVar219,ZEXT416(local_3e84),0x20);
      auVar219 = vinsertps_avx(auVar219,ZEXT416(local_3e84),0x30);
      auVar218 = vinsertps_avx(ZEXT416(local_3e84),ZEXT416(local_3e84),0x10);
      auVar218 = vinsertps_avx(auVar218,ZEXT416(local_3e84),0x20);
      auVar218 = vinsertps_avx(auVar218,ZEXT416(local_3e84),0x30);
      local_3e00._16_16_ = auVar219;
      local_3e00._0_16_ = auVar218;
      local_3840 = local_3ee0._0_8_;
      uVar181 = local_3840;
      uStack_3838 = local_3ee0._8_8_;
      uVar182 = uStack_3838;
      uStack_3830 = local_3ee0._16_8_;
      uVar183 = uStack_3830;
      uStack_3828 = local_3ee0._24_8_;
      uVar184 = uStack_3828;
      local_3820._0_4_ = auVar218._0_4_;
      local_3820._4_4_ = auVar218._4_4_;
      fStack_3818 = auVar218._8_4_;
      fStack_3814 = auVar218._12_4_;
      fStack_3810 = auVar219._0_4_;
      fStack_380c = auVar219._4_4_;
      fStack_3808 = auVar219._8_4_;
      fStack_3804 = auVar219._12_4_;
      local_3840._0_4_ = local_3ee0._0_4_;
      local_3840._4_4_ = local_3ee0._4_4_;
      uStack_3838._0_4_ = local_3ee0._8_4_;
      uStack_3838._4_4_ = local_3ee0._12_4_;
      uStack_3830._0_4_ = local_3ee0._16_4_;
      uStack_3830._4_4_ = local_3ee0._20_4_;
      uStack_3828._0_4_ = local_3ee0._24_4_;
      local_3e40 = (float)local_3820._0_4_ * (float)local_3840;
      fStack_3e3c = (float)local_3820._4_4_ * local_3840._4_4_;
      fStack_3e38 = fStack_3818 * (float)uStack_3838;
      fStack_3e34 = fStack_3814 * uStack_3838._4_4_;
      fStack_3e30 = fStack_3810 * (float)uStack_3830;
      fStack_3e2c = fStack_380c * uStack_3830._4_4_;
      fStack_3e28 = fStack_3808 * (float)uStack_3828;
      local_3e20 = local_3ec0._0_8_;
      uVar177 = local_3e20;
      uStack_3e18 = local_3ec0._8_8_;
      uVar178 = uStack_3e18;
      uStack_3e10 = local_3ec0._16_8_;
      uVar179 = uStack_3e10;
      uStack_3e08 = local_3ec0._24_8_;
      uVar180 = uStack_3e08;
      fStack_3e24 = fStack_3804;
      local_3e20._0_4_ = local_3ec0._0_4_;
      local_3e20._4_4_ = local_3ec0._4_4_;
      uStack_3e18._0_4_ = local_3ec0._8_4_;
      uStack_3e18._4_4_ = local_3ec0._12_4_;
      uStack_3e10._0_4_ = local_3ec0._16_4_;
      uStack_3e10._4_4_ = local_3ec0._20_4_;
      uStack_3e08._0_4_ = local_3ec0._24_4_;
      uStack_3e08._4_4_ = local_3ec0._28_4_;
      local_7180._4_4_ = local_3e20._4_4_ + fStack_3e3c;
      local_7180._0_4_ = (float)local_3e20 + local_3e40;
      uStack_7178._0_4_ = (float)uStack_3e18 + fStack_3e38;
      uStack_7178._4_4_ = uStack_3e18._4_4_ + fStack_3e34;
      uStack_7170._0_4_ = (float)uStack_3e10 + fStack_3e30;
      uStack_7170._4_4_ = uStack_3e10._4_4_ + fStack_3e2c;
      uStack_7168._0_4_ = (float)uStack_3e08 + fStack_3e28;
      uStack_7168._4_4_ = uStack_3e08._4_4_ + fStack_3804;
      local_3e44 = local_3e84;
      local_3e20 = uVar177;
      uStack_3e18 = uVar178;
      uStack_3e10 = uVar179;
      uStack_3e08 = uVar180;
      local_3de0 = local_3e84;
      local_3ddc = local_3e84;
      local_3dd8 = local_3e84;
      local_3dd4 = local_3e84;
      local_3dd0 = local_3e84;
      local_3dcc = local_3e84;
      local_3dc8 = local_3e84;
      local_3dc4 = local_3e84;
      local_3840 = uVar181;
      uStack_3838 = uVar182;
      uStack_3830 = uVar183;
      uStack_3828 = uVar184;
      _local_3820 = local_3e00;
      break;
    case 3:
      local_7128 = local_7428;
      local_7130 = 0;
      local_7104 = *(uint *)*local_7428;
      auVar219 = vinsertps_avx(ZEXT416(local_7104),ZEXT416(local_7104),0x10);
      auVar219 = vinsertps_avx(auVar219,ZEXT416(local_7104),0x20);
      local_41e0 = vinsertps_avx(auVar219,ZEXT416(local_7104),0x30);
      auVar219 = vinsertps_avx(ZEXT416(local_7104),ZEXT416(local_7104),0x10);
      auVar219 = vinsertps_avx(auVar219,ZEXT416(local_7104),0x20);
      auStack_41d0 = vinsertps_avx(auVar219,ZEXT416(local_7104),0x30);
      local_71e0 = local_41e0._0_8_;
      uStack_71d8 = local_41e0._8_8_;
      uStack_71d0 = auStack_41d0._0_8_;
      uStack_71c8 = auStack_41d0._8_8_;
      local_7138 = local_7428;
      local_7140 = 1;
      local_7108 = *(uint *)(*local_7428 + 4);
      auVar219 = vinsertps_avx(ZEXT416(local_7108),ZEXT416(local_7108),0x10);
      auVar219 = vinsertps_avx(auVar219,ZEXT416(local_7108),0x20);
      auVar219 = vinsertps_avx(auVar219,ZEXT416(local_7108),0x30);
      auVar218 = vinsertps_avx(ZEXT416(local_7108),ZEXT416(local_7108),0x10);
      auVar218 = vinsertps_avx(auVar218,ZEXT416(local_7108),0x20);
      auVar218 = vinsertps_avx(auVar218,ZEXT416(local_7108),0x30);
      auVar231._16_16_ = auVar219;
      auVar231._0_16_ = auVar218;
      local_4220._0_8_ = auVar218._0_8_;
      local_4220._8_8_ = auVar218._8_8_;
      local_4220._16_8_ = auVar219._0_8_;
      local_4220._24_8_ = auVar219._8_8_;
      local_7200 = local_4220._0_8_;
      uStack_71f8 = local_4220._8_8_;
      uStack_71f0 = local_4220._16_8_;
      uStack_71e8 = local_4220._24_8_;
      local_40c0 = local_7720;
      uStack_40b8 = uStack_7718;
      uStack_40b0 = uStack_7710;
      uStack_40a8 = uStack_7708;
      local_40e0 = local_41e0._0_8_;
      uStack_40d8 = local_41e0._8_8_;
      uStack_40d0 = auStack_41d0._0_8_;
      uStack_40c8 = auStack_41d0._8_8_;
      auVar102._8_8_ = uStack_7718;
      auVar102._0_8_ = local_7720;
      auVar102._16_8_ = uStack_7710;
      auVar102._24_8_ = uStack_7708;
      auVar101._16_8_ = auStack_41d0._0_8_;
      auVar101._0_16_ = local_41e0;
      auVar101._24_8_ = auStack_41d0._8_8_;
      local_3ce0 = vmaxps_avx(auVar102,auVar101);
      local_3d00 = local_4220._0_8_;
      uStack_3cf8 = local_4220._8_8_;
      uStack_3cf0 = local_4220._16_8_;
      uStack_3ce8 = local_4220._24_8_;
      auVar105._16_8_ = local_4220._16_8_;
      auVar105._0_16_ = auVar218;
      auVar105._24_8_ = local_4220._24_8_;
      _local_7180 = vminps_avx(local_3ce0,auVar105);
      local_4220 = auVar231;
      local_4200 = local_7108;
      local_41fc = local_7108;
      local_41f8 = local_7108;
      local_41f4 = local_7108;
      local_41f0 = local_7108;
      local_41ec = local_7108;
      local_41e8 = local_7108;
      local_41e4 = local_7108;
      local_41c0 = local_7104;
      local_41bc = local_7104;
      local_41b8 = local_7104;
      local_41b4 = local_7104;
      local_41b0 = local_7104;
      local_41ac = local_7104;
      local_41a8 = local_7104;
      local_41a4 = local_7104;
      break;
    case 4:
      local_3ca0 = local_7720;
      uStack_3c98 = uStack_7718;
      uStack_3c90 = uStack_7710;
      uStack_3c88 = uStack_7708;
      local_3c64 = 0x3f800000;
      local_3be4 = 0x3f800000;
      local_3be8 = 0x3f800000;
      local_3bec = 0x3f800000;
      local_3bf0 = 0x3f800000;
      local_3bf4 = 0x3f800000;
      local_3bf8 = 0x3f800000;
      local_3bfc = 0x3f800000;
      local_3c00 = 0x3f800000;
      auVar219 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar219 = vinsertps_avx(auVar219,ZEXT416(0x3f800000),0x20);
      local_3c20 = vinsertps_avx(auVar219,ZEXT416(0x3f800000),0x30);
      auVar219 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar219 = vinsertps_avx(auVar219,ZEXT416(0x3f800000),0x20);
      auStack_3c10 = vinsertps_avx(auVar219,ZEXT416(0x3f800000),0x30);
      local_3cc0 = local_3c20._0_8_;
      uStack_3cb8 = local_3c20._8_8_;
      uStack_3cb0 = auStack_3c10._0_8_;
      uStack_3ca8 = auStack_3c10._8_8_;
      local_37e0._16_8_ = auStack_3c10._0_8_;
      local_37e0._0_16_ = local_3c20;
      local_37e0._24_8_ = auStack_3c10._8_8_;
      local_3be0 = 0;
      uStack_3bd8 = 0;
      uStack_3bd0 = 0;
      uStack_3bc8 = 0;
      local_27e0 = 0;
      uStack_27d8 = 0;
      uStack_27d0 = 0;
      uStack_27c8 = 0;
      local_2800 = local_7720;
      uStack_27f8 = uStack_7718;
      uStack_27f0 = uStack_7710;
      uStack_27e8 = uStack_7708;
      auVar126._8_8_ = uStack_7718;
      auVar126._0_8_ = local_7720;
      auVar126._16_8_ = uStack_7710;
      auVar126._24_8_ = uStack_7708;
      auVar220 = vsubps_avx(ZEXT1632(ZEXT816(0)),auVar126);
      local_2960 = 0;
      uStack_2958 = 0;
      uStack_2950 = 0;
      uStack_2948 = 0;
      local_2fc0 = 0x3f800000;
      uStack_2fbc = 0x3f800000;
      uStack_2fb8 = 0x3f800000;
      uStack_2fb4 = 0x3f800000;
      uStack_2fb0 = 0x3f800000;
      uStack_2fac = 0x3f800000;
      uStack_2fa8 = 0x3f800000;
      uStack_2fa4 = 0x3f800000;
      local_2f40._0_8_ = auVar220._0_8_;
      local_2f40._8_8_ = auVar220._8_8_;
      local_2f40._16_8_ = auVar220._16_8_;
      local_2f40._24_8_ = auVar220._24_8_;
      local_2920 = local_2f40._0_8_;
      uStack_2918 = local_2f40._8_8_;
      uStack_2910 = local_2f40._16_8_;
      uStack_2908 = local_2f40._24_8_;
      local_2940 = 0x42b0c0a5;
      uStack_293c = 0x42b0c0a5;
      uStack_2938 = 0x42b0c0a5;
      uStack_2934 = 0x42b0c0a5;
      uStack_2930 = 0x42b0c0a5;
      uStack_292c = 0x42b0c0a5;
      uStack_2928 = 0x42b0c0a5;
      uStack_2924 = 0x42b0c0a5;
      auVar125._8_4_ = 0x42b0c0a5;
      auVar125._0_8_ = 0x42b0c0a542b0c0a5;
      auVar125._12_4_ = 0x42b0c0a5;
      auVar125._16_4_ = 0x42b0c0a5;
      auVar125._20_4_ = 0x42b0c0a5;
      auVar125._24_4_ = 0x42b0c0a5;
      auVar125._28_4_ = 0x42b0c0a5;
      auVar220 = vminps_avx(auVar220,auVar125);
      local_2f40._0_8_ = auVar220._0_8_;
      local_2f40._8_8_ = auVar220._8_8_;
      local_2f40._16_8_ = auVar220._16_8_;
      local_2f40._24_8_ = auVar220._24_8_;
      local_2980 = local_2f40._0_8_;
      uStack_2978 = local_2f40._8_8_;
      uStack_2970 = local_2f40._16_8_;
      uStack_2968 = local_2f40._24_8_;
      local_29a0 = 0xc2b0c0a5;
      uStack_299c = 0xc2b0c0a5;
      uStack_2998 = 0xc2b0c0a5;
      uStack_2994 = 0xc2b0c0a5;
      uStack_2990 = 0xc2b0c0a5;
      uStack_298c = 0xc2b0c0a5;
      uStack_2988 = 0xc2b0c0a5;
      uStack_2984 = 0xc2b0c0a5;
      auVar124._8_4_ = 0xc2b0c0a5;
      auVar124._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar124._12_4_ = 0xc2b0c0a5;
      auVar124._16_4_ = 0xc2b0c0a5;
      auVar124._20_4_ = 0xc2b0c0a5;
      auVar124._24_4_ = 0xc2b0c0a5;
      auVar124._28_4_ = 0xc2b0c0a5;
      auVar221 = vmaxps_avx(auVar220,auVar124);
      local_2f40._0_8_ = auVar221._0_8_;
      local_2f40._8_8_ = auVar221._8_8_;
      local_2f40._16_8_ = auVar221._16_8_;
      local_2f40._24_8_ = auVar221._24_8_;
      local_2a60 = local_2f40._0_8_;
      uStack_2a58 = local_2f40._8_8_;
      uStack_2a50 = local_2f40._16_8_;
      uStack_2a48 = local_2f40._24_8_;
      local_2a80 = 0x3fb8aa3b;
      uStack_2a7c = 0x3fb8aa3b;
      uStack_2a78 = 0x3fb8aa3b;
      uStack_2a74 = 0x3fb8aa3b;
      uStack_2a70 = 0x3fb8aa3b;
      uStack_2a6c = 0x3fb8aa3b;
      uStack_2a68 = 0x3fb8aa3b;
      uStack_2a64 = 0x3fb8aa3b;
      local_2aa0 = 0x3f000000;
      uStack_2a9c = 0x3f000000;
      uStack_2a98 = 0x3f000000;
      uStack_2a94 = 0x3f000000;
      uStack_2a90 = 0x3f000000;
      uStack_2a8c = 0x3f000000;
      uStack_2a88 = 0x3f000000;
      uStack_2a84 = 0x3f000000;
      local_2a20 = 0x3fb8aa3b3fb8aa3b;
      uStack_2a18 = 0x3fb8aa3b3fb8aa3b;
      uStack_2a10 = 0x3fb8aa3b3fb8aa3b;
      uStack_2a08 = 0x3fb8aa3b3fb8aa3b;
      local_2a40 = 0x3f0000003f000000;
      uStack_2a38 = 0x3f0000003f000000;
      uStack_2a30 = 0x3f0000003f000000;
      uStack_2a28 = 0x3f0000003f000000;
      local_2a00 = local_2f40._0_8_;
      uStack_29f8 = local_2f40._8_8_;
      uStack_29f0 = local_2f40._16_8_;
      uStack_29e8 = local_2f40._24_8_;
      auVar123._8_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar123._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar123._16_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar123._24_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar122._8_8_ = 0x3f0000003f000000;
      auVar122._0_8_ = 0x3f0000003f000000;
      auVar122._16_8_ = 0x3f0000003f000000;
      auVar122._24_8_ = 0x3f0000003f000000;
      auVar219 = vfmadd213ps_fma(auVar123,auVar221,auVar122);
      auVar222 = vroundps_avx(ZEXT1632(auVar219),1);
      auVar220 = vcmpps_avx(ZEXT1632(auVar219),auVar222,1);
      local_2fe0._0_8_ = auVar220._0_8_;
      local_2fe0._8_8_ = auVar220._8_8_;
      local_2fe0._16_8_ = auVar220._16_8_;
      local_2fe0._24_8_ = auVar220._24_8_;
      local_27c0 = 0x3f8000003f800000;
      uStack_27b8 = 0x3f8000003f800000;
      uStack_27b0 = 0x3f8000003f800000;
      uStack_27a8 = 0x3f8000003f800000;
      local_27a0 = local_2fe0._0_8_;
      uStack_2798 = local_2fe0._8_8_;
      uStack_2790 = local_2fe0._16_8_;
      uStack_2788 = local_2fe0._24_8_;
      auVar127._8_8_ = 0x3f8000003f800000;
      auVar127._0_8_ = 0x3f8000003f800000;
      auVar127._16_8_ = 0x3f8000003f800000;
      auVar127._24_8_ = 0x3f8000003f800000;
      local_2fe0 = vpand_avx2(auVar220,auVar127);
      local_2f60 = auVar222._0_8_;
      uStack_2f58 = auVar222._8_8_;
      uStack_2f50 = auVar222._16_8_;
      uStack_2f48 = auVar222._24_8_;
      local_2860 = local_2f60;
      uStack_2858 = uStack_2f58;
      uStack_2850 = uStack_2f50;
      uStack_2848 = uStack_2f48;
      local_2880 = local_2fe0._0_8_;
      uStack_2878 = local_2fe0._8_8_;
      uStack_2870 = local_2fe0._16_8_;
      uStack_2868 = local_2fe0._24_8_;
      local_2f80 = vsubps_avx(auVar222,local_2fe0);
      local_26a0 = local_2f80._0_8_;
      uStack_2698 = local_2f80._8_8_;
      uStack_2690 = local_2f80._16_8_;
      uStack_2688 = local_2f80._24_8_;
      local_26c0 = 0x3f318000;
      uStack_26bc = 0x3f318000;
      uStack_26b8 = 0x3f318000;
      uStack_26b4 = 0x3f318000;
      uStack_26b0 = 0x3f318000;
      uStack_26ac = 0x3f318000;
      uStack_26a8 = 0x3f318000;
      uStack_26a4 = 0x3f318000;
      local_26e0 = local_2f40._0_8_;
      uStack_26d8 = local_2f40._8_8_;
      uStack_26d0 = local_2f40._16_8_;
      uStack_26c8 = local_2f40._24_8_;
      local_2360 = 0x3f3180003f318000;
      uStack_2358 = 0x3f3180003f318000;
      uStack_2350 = 0x3f3180003f318000;
      uStack_2348 = 0x3f3180003f318000;
      local_2340 = local_2f80._0_8_;
      uStack_2338 = local_2f80._8_8_;
      uStack_2330 = local_2f80._16_8_;
      uStack_2328 = local_2f80._24_8_;
      local_2380 = local_2f40._0_8_;
      uStack_2378 = local_2f40._8_8_;
      uStack_2370 = local_2f40._16_8_;
      uStack_2368 = local_2f40._24_8_;
      auVar131._8_8_ = 0x3f3180003f318000;
      auVar131._0_8_ = 0x3f3180003f318000;
      auVar131._16_8_ = 0x3f3180003f318000;
      auVar131._24_8_ = 0x3f3180003f318000;
      auVar219 = vfnmadd213ps_fma(auVar131,local_2f80,auVar221);
      local_2f40._0_8_ = auVar219._0_8_;
      local_2f40._8_8_ = auVar219._8_8_;
      local_2700 = local_2f80._0_8_;
      uStack_26f8 = local_2f80._8_8_;
      uStack_26f0 = local_2f80._16_8_;
      uStack_26e8 = local_2f80._24_8_;
      local_2720 = 0xb95e8083;
      uStack_271c = 0xb95e8083;
      uStack_2718 = 0xb95e8083;
      uStack_2714 = 0xb95e8083;
      uStack_2710 = 0xb95e8083;
      uStack_270c = 0xb95e8083;
      uStack_2708 = 0xb95e8083;
      uStack_2704 = 0xb95e8083;
      local_2740 = local_2f40._0_8_;
      uStack_2738 = local_2f40._8_8_;
      uStack_2730 = 0;
      uStack_2728 = 0;
      local_2300 = 0xb95e8083b95e8083;
      uStack_22f8 = 0xb95e8083b95e8083;
      uStack_22f0 = 0xb95e8083b95e8083;
      uStack_22e8 = 0xb95e8083b95e8083;
      local_22e0 = local_2f80._0_8_;
      uStack_22d8 = local_2f80._8_8_;
      uStack_22d0 = local_2f80._16_8_;
      uStack_22c8 = local_2f80._24_8_;
      local_2320 = local_2f40._0_8_;
      uStack_2318 = local_2f40._8_8_;
      uStack_2310 = 0;
      uStack_2308 = 0;
      auVar132._8_8_ = 0xb95e8083b95e8083;
      auVar132._0_8_ = 0xb95e8083b95e8083;
      auVar132._16_8_ = 0xb95e8083b95e8083;
      auVar132._24_8_ = 0xb95e8083b95e8083;
      auVar218 = vfnmadd213ps_fma(auVar132,local_2f80,ZEXT1632(auVar219));
      local_2f40._0_8_ = auVar218._0_8_;
      local_2f40._8_8_ = auVar218._8_8_;
      local_28a0 = local_2f40._0_8_;
      uVar183 = local_28a0;
      uStack_2898 = local_2f40._8_8_;
      uVar184 = uStack_2898;
      uStack_2890 = 0;
      uStack_2888 = 0;
      local_28c0 = local_2f40._0_8_;
      uStack_28b8 = local_2f40._8_8_;
      uStack_28b0 = 0;
      uStack_28a8 = 0;
      local_28a0._0_4_ = auVar218._0_4_;
      local_28a0._4_4_ = auVar218._4_4_;
      uStack_2898._0_4_ = auVar218._8_4_;
      uStack_2898._4_4_ = auVar218._12_4_;
      local_2f60._4_4_ = local_28a0._4_4_ * local_28a0._4_4_;
      local_2f60._0_4_ = (float)local_28a0 * (float)local_28a0;
      local_2f00 = local_2f60;
      uStack_2f58._0_4_ = (float)uStack_2898 * (float)uStack_2898;
      uStack_2f58._4_4_ = uStack_2898._4_4_ * uStack_2898._4_4_;
      auVar5 = _local_2f60;
      _local_2f60 = ZEXT1632(_local_2f60);
      auVar221 = _local_2f60;
      uStack_2ff8._0_4_ = 0x39506967;
      local_3000 = (undefined1  [8])0x3950696739506967;
      uStack_2ff8._4_4_ = 0x39506967;
      uStack_2ff0._0_4_ = 0x39506967;
      uStack_2ff0._4_4_ = 0x39506967;
      auVar209 = _local_3000;
      uStack_2fe8._0_4_ = 0x39506967;
      uStack_2fe8._4_4_ = 0x39506967;
      auVar220 = _local_3000;
      uStack_2ff0 = auVar209._16_8_;
      uStack_2fe8 = auVar220._24_8_;
      local_2b20 = 0x3950696739506967;
      uStack_2b18 = uStack_2ff8;
      uStack_2b10 = uStack_2ff0;
      uStack_2b08 = uStack_2fe8;
      local_2b40 = local_2f40._0_8_;
      uStack_2b38 = local_2f40._8_8_;
      uStack_2b30 = 0;
      uStack_2b28 = 0;
      local_2b60 = 0x3ab743ce;
      uStack_2b5c = 0x3ab743ce;
      uStack_2b58 = 0x3ab743ce;
      uStack_2b54 = 0x3ab743ce;
      uStack_2b50 = 0x3ab743ce;
      uStack_2b4c = 0x3ab743ce;
      uStack_2b48 = 0x3ab743ce;
      uStack_2b44 = 0x3ab743ce;
      local_2b00 = 0x3ab743ce3ab743ce;
      uStack_2af8 = 0x3ab743ce3ab743ce;
      uStack_2af0 = 0x3ab743ce3ab743ce;
      uStack_2ae8 = 0x3ab743ce3ab743ce;
      local_2ac0 = 0x3950696739506967;
      uStack_2ab8 = uStack_2ff8;
      uStack_2ab0 = uStack_2ff0;
      uStack_2aa8 = uStack_2fe8;
      local_2ae0 = local_2f40._0_8_;
      uStack_2ad8 = local_2f40._8_8_;
      uStack_2ad0 = 0;
      uStack_2ac8 = 0;
      auVar121._16_8_ = uStack_2ff0;
      auVar121._0_16_ = _local_3000;
      auVar121._24_8_ = uStack_2fe8;
      auVar120._8_8_ = 0x3ab743ce3ab743ce;
      auVar120._0_8_ = 0x3ab743ce3ab743ce;
      auVar120._16_8_ = 0x3ab743ce3ab743ce;
      auVar120._24_8_ = 0x3ab743ce3ab743ce;
      auVar219 = vfmadd213ps_fma(ZEXT1632(auVar218),auVar121,auVar120);
      local_3000 = auVar219._0_8_;
      uStack_2ff8 = auVar219._8_8_;
      local_2be0 = local_3000;
      uStack_2bd8 = uStack_2ff8;
      uStack_2bd0 = 0;
      uStack_2bc8 = 0;
      local_2c00 = local_2f40._0_8_;
      uStack_2bf8 = local_2f40._8_8_;
      uStack_2bf0 = 0;
      uStack_2be8 = 0;
      local_2c20 = 0x3c088908;
      uStack_2c1c = 0x3c088908;
      uStack_2c18 = 0x3c088908;
      uStack_2c14 = 0x3c088908;
      uStack_2c10 = 0x3c088908;
      uStack_2c0c = 0x3c088908;
      uStack_2c08 = 0x3c088908;
      uStack_2c04 = 0x3c088908;
      local_2bc0 = 0x3c0889083c088908;
      uStack_2bb8 = 0x3c0889083c088908;
      uStack_2bb0 = 0x3c0889083c088908;
      uStack_2ba8 = 0x3c0889083c088908;
      local_2b80 = local_3000;
      uStack_2b78 = uStack_2ff8;
      uStack_2b70 = 0;
      uStack_2b68 = 0;
      local_2ba0 = local_2f40._0_8_;
      uStack_2b98 = local_2f40._8_8_;
      uStack_2b90 = 0;
      uStack_2b88 = 0;
      auVar119._8_8_ = 0x3c0889083c088908;
      auVar119._0_8_ = 0x3c0889083c088908;
      auVar119._16_8_ = 0x3c0889083c088908;
      auVar119._24_8_ = 0x3c0889083c088908;
      auVar219 = vfmadd213ps_fma(ZEXT1632(auVar218),ZEXT1632(auVar219),auVar119);
      local_3000 = auVar219._0_8_;
      uStack_2ff8 = auVar219._8_8_;
      local_2ca0 = local_3000;
      uStack_2c98 = uStack_2ff8;
      uStack_2c90 = 0;
      uStack_2c88 = 0;
      local_2cc0 = local_2f40._0_8_;
      uStack_2cb8 = local_2f40._8_8_;
      uStack_2cb0 = 0;
      uStack_2ca8 = 0;
      local_2ce0 = 0x3d2aa9c1;
      uStack_2cdc = 0x3d2aa9c1;
      uStack_2cd8 = 0x3d2aa9c1;
      uStack_2cd4 = 0x3d2aa9c1;
      uStack_2cd0 = 0x3d2aa9c1;
      uStack_2ccc = 0x3d2aa9c1;
      uStack_2cc8 = 0x3d2aa9c1;
      uStack_2cc4 = 0x3d2aa9c1;
      local_2c80 = 0x3d2aa9c13d2aa9c1;
      uStack_2c78 = 0x3d2aa9c13d2aa9c1;
      uStack_2c70 = 0x3d2aa9c13d2aa9c1;
      uStack_2c68 = 0x3d2aa9c13d2aa9c1;
      local_2c40 = local_3000;
      uStack_2c38 = uStack_2ff8;
      uStack_2c30 = 0;
      uStack_2c28 = 0;
      local_2c60 = local_2f40._0_8_;
      uStack_2c58 = local_2f40._8_8_;
      uStack_2c50 = 0;
      uStack_2c48 = 0;
      auVar118._8_8_ = 0x3d2aa9c13d2aa9c1;
      auVar118._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar118._16_8_ = 0x3d2aa9c13d2aa9c1;
      auVar118._24_8_ = 0x3d2aa9c13d2aa9c1;
      auVar219 = vfmadd213ps_fma(ZEXT1632(auVar218),ZEXT1632(auVar219),auVar118);
      local_3000 = auVar219._0_8_;
      uStack_2ff8 = auVar219._8_8_;
      local_2d60 = local_3000;
      uStack_2d58 = uStack_2ff8;
      uStack_2d50 = 0;
      uStack_2d48 = 0;
      local_2d80 = local_2f40._0_8_;
      uStack_2d78 = local_2f40._8_8_;
      uStack_2d70 = 0;
      uStack_2d68 = 0;
      local_2da0 = 0x3e2aaaaa;
      uStack_2d9c = 0x3e2aaaaa;
      uStack_2d98 = 0x3e2aaaaa;
      uStack_2d94 = 0x3e2aaaaa;
      uStack_2d90 = 0x3e2aaaaa;
      uStack_2d8c = 0x3e2aaaaa;
      uStack_2d88 = 0x3e2aaaaa;
      uStack_2d84 = 0x3e2aaaaa;
      local_2d40 = 0x3e2aaaaa3e2aaaaa;
      uStack_2d38 = 0x3e2aaaaa3e2aaaaa;
      uStack_2d30 = 0x3e2aaaaa3e2aaaaa;
      uStack_2d28 = 0x3e2aaaaa3e2aaaaa;
      local_2d00 = local_3000;
      uStack_2cf8 = uStack_2ff8;
      uStack_2cf0 = 0;
      uStack_2ce8 = 0;
      local_2d20 = local_2f40._0_8_;
      uStack_2d18 = local_2f40._8_8_;
      uStack_2d10 = 0;
      uStack_2d08 = 0;
      auVar117._8_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar117._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar117._16_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar117._24_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar219 = vfmadd213ps_fma(ZEXT1632(auVar218),ZEXT1632(auVar219),auVar117);
      local_3000 = auVar219._0_8_;
      uStack_2ff8 = auVar219._8_8_;
      local_2e20 = local_3000;
      uStack_2e18 = uStack_2ff8;
      uStack_2e10 = 0;
      uStack_2e08 = 0;
      local_2e40 = local_2f40._0_8_;
      uStack_2e38 = local_2f40._8_8_;
      uStack_2e30 = 0;
      uStack_2e28 = 0;
      local_2e60 = 0x3f000000;
      uStack_2e5c = 0x3f000000;
      uStack_2e58 = 0x3f000000;
      uStack_2e54 = 0x3f000000;
      uStack_2e50 = 0x3f000000;
      uStack_2e4c = 0x3f000000;
      uStack_2e48 = 0x3f000000;
      uStack_2e44 = 0x3f000000;
      local_2e00 = 0x3f0000003f000000;
      uStack_2df8 = 0x3f0000003f000000;
      uStack_2df0 = 0x3f0000003f000000;
      uStack_2de8 = 0x3f0000003f000000;
      local_2dc0 = local_3000;
      uStack_2db8 = uStack_2ff8;
      uStack_2db0 = 0;
      uStack_2da8 = 0;
      local_2de0 = local_2f40._0_8_;
      uStack_2dd8 = local_2f40._8_8_;
      uStack_2dd0 = 0;
      uStack_2dc8 = 0;
      auVar116._8_8_ = 0x3f0000003f000000;
      auVar116._0_8_ = 0x3f0000003f000000;
      auVar116._16_8_ = 0x3f0000003f000000;
      auVar116._24_8_ = 0x3f0000003f000000;
      auVar219 = vfmadd213ps_fma(ZEXT1632(auVar218),ZEXT1632(auVar219),auVar116);
      local_3000 = auVar219._0_8_;
      uStack_2ff8 = auVar219._8_8_;
      uStack_2f58 = auVar5._8_8_;
      local_2ee0 = local_3000;
      uStack_2ed8 = uStack_2ff8;
      uStack_2ed0 = 0;
      uStack_2ec8 = 0;
      uStack_2ef8 = uStack_2f58;
      uStack_2ef0 = 0;
      uStack_2ee8 = 0;
      local_2f20 = local_2f40._0_8_;
      uStack_2f18 = local_2f40._8_8_;
      uStack_2f10 = 0;
      uStack_2f08 = 0;
      local_2e80 = local_3000;
      uStack_2e78 = uStack_2ff8;
      uStack_2e70 = 0;
      uStack_2e68 = 0;
      local_2ea0 = local_2f00;
      uStack_2e98 = uStack_2f58;
      uStack_2e90 = 0;
      uStack_2e88 = 0;
      local_2ec0 = local_2f40._0_8_;
      uStack_2eb8 = local_2f40._8_8_;
      uStack_2eb0 = 0;
      uStack_2ea8 = 0;
      auVar219 = vfmadd213ps_fma(ZEXT1632(auVar5),ZEXT1632(auVar219),ZEXT1632(auVar218));
      local_3000 = auVar219._0_8_;
      uStack_2ff8 = auVar219._8_8_;
      local_29e0 = 0x3f8000003f800000;
      uStack_29d8 = 0x3f8000003f800000;
      uStack_29d0 = 0x3f8000003f800000;
      uStack_29c8 = 0x3f8000003f800000;
      local_29c0 = local_3000;
      uVar177 = local_29c0;
      uStack_29b8 = uStack_2ff8;
      uVar178 = uStack_29b8;
      uStack_29b0 = 0;
      uStack_29a8 = 0;
      local_29c0._0_4_ = auVar219._0_4_;
      local_29c0._4_4_ = auVar219._4_4_;
      uStack_29b8._0_4_ = auVar219._8_4_;
      uStack_29b8._4_4_ = auVar219._12_4_;
      local_3000._4_4_ = local_29c0._4_4_ + 1.0;
      local_3000._0_4_ = (float)local_29c0 + 1.0;
      uStack_2ff8._0_4_ = (float)uStack_29b8 + 1.0;
      uStack_2ff8._4_4_ = uStack_29b8._4_4_ + 1.0;
      uStack_2ff0._0_4_ = 0x3f800000;
      uStack_2ff0._4_4_ = 0x3f800000;
      uStack_2fe8._0_4_ = 0x3f800000;
      uStack_2fe8._4_4_ = 0x3f800000;
      local_25c0 = local_2f80._0_8_;
      uVar185 = local_25c0;
      uStack_25b8 = local_2f80._8_8_;
      uVar186 = uStack_25b8;
      uStack_25b0 = local_2f80._16_8_;
      uVar187 = uStack_25b0;
      uStack_25a8 = local_2f80._24_8_;
      uVar188 = uStack_25a8;
      local_25c0._0_4_ = local_2f80._0_4_;
      local_25c0._4_4_ = local_2f80._4_4_;
      uStack_25b8._0_4_ = local_2f80._8_4_;
      uStack_25b8._4_4_ = local_2f80._12_4_;
      uStack_25b0._0_4_ = local_2f80._16_4_;
      uStack_25b0._4_4_ = local_2f80._20_4_;
      uStack_25a8._0_4_ = local_2f80._24_4_;
      uStack_25a8._4_4_ = local_2f80._28_4_;
      local_2fa0._4_4_ = (int)local_25c0._4_4_;
      local_2fa0._0_4_ = (int)(float)local_25c0;
      local_2fa0._8_4_ = (int)(float)uStack_25b8;
      local_2fa0._12_4_ = (int)uStack_25b8._4_4_;
      local_2fa0._16_4_ = (int)(float)uStack_25b0;
      local_2fa0._20_4_ = (int)uStack_25b0._4_4_;
      auVar209 = local_2fa0._0_24_;
      local_2fa0._24_4_ = (int)(float)uStack_25a8;
      local_2fa0._28_4_ = (int)uStack_25a8._4_4_;
      auVar220 = local_2fa0;
      local_2fa0._16_8_ = auVar209._16_8_;
      local_2fa0._24_8_ = auVar220._24_8_;
      local_2560 = local_2fa0._0_8_;
      uStack_2558 = local_2fa0._8_8_;
      uStack_2550 = local_2fa0._16_8_;
      uStack_2548 = local_2fa0._24_8_;
      local_2580 = 0x7f0000007f;
      uStack_2578 = 0x7f0000007f;
      uStack_2570 = 0x7f0000007f;
      uStack_2568 = 0x7f0000007f;
      local_2260 = local_2fa0._0_8_;
      uStack_2258 = local_2fa0._8_8_;
      uStack_2250 = local_2fa0._16_8_;
      uStack_2248 = local_2fa0._24_8_;
      local_2280 = 0x7f0000007f;
      uStack_2278 = 0x7f0000007f;
      uStack_2270 = 0x7f0000007f;
      uStack_2268 = 0x7f0000007f;
      auVar136._16_8_ = local_2fa0._16_8_;
      auVar136._0_16_ = local_2fa0._0_16_;
      auVar136._24_8_ = local_2fa0._24_8_;
      auVar135._8_8_ = 0x7f0000007f;
      auVar135._0_8_ = 0x7f0000007f;
      auVar135._16_8_ = 0x7f0000007f;
      auVar135._24_8_ = 0x7f0000007f;
      auVar220 = vpaddd_avx2(auVar136,auVar135);
      local_2fa0._0_8_ = auVar220._0_8_;
      local_2fa0._8_8_ = auVar220._8_8_;
      local_2fa0._16_8_ = auVar220._16_8_;
      local_2fa0._24_8_ = auVar220._24_8_;
      local_24e0 = local_2fa0._0_8_;
      uStack_24d8 = local_2fa0._8_8_;
      uStack_24d0 = local_2fa0._16_8_;
      uStack_24c8 = local_2fa0._24_8_;
      local_24e4 = 0x17;
      local_21e0 = local_2fa0._0_8_;
      uStack_21d8 = local_2fa0._8_8_;
      uStack_21d0 = local_2fa0._16_8_;
      uStack_21c8 = local_2fa0._24_8_;
      local_21e4 = 0x17;
      local_2fa0 = vpslld_avx2(auVar220,ZEXT416(0x17));
      local_2480 = local_2fa0._0_8_;
      uStack_2478 = local_2fa0._8_8_;
      uStack_2470 = local_2fa0._16_8_;
      uStack_2468 = local_2fa0._24_8_;
      local_3020 = local_2fa0._0_8_;
      uStack_3018 = local_2fa0._8_8_;
      uStack_3010 = local_2fa0._16_8_;
      uStack_3008 = local_2fa0._24_8_;
      local_28e0 = _local_3000;
      local_2900 = local_2fa0._0_8_;
      uVar179 = local_2900;
      uStack_28f8 = local_2fa0._8_8_;
      uVar180 = uStack_28f8;
      uStack_28f0 = local_2fa0._16_8_;
      uVar181 = uStack_28f0;
      uStack_28e8 = local_2fa0._24_8_;
      uVar182 = uStack_28e8;
      local_2900._0_4_ = local_2fa0._0_4_;
      local_2900._4_4_ = local_2fa0._4_4_;
      uStack_28f8._0_4_ = local_2fa0._8_4_;
      uStack_28f8._4_4_ = local_2fa0._12_4_;
      uStack_28f0._0_4_ = local_2fa0._16_4_;
      uStack_28f0._4_4_ = local_2fa0._20_4_;
      uStack_28e8._0_4_ = local_2fa0._24_4_;
      local_3000._0_4_ = ((float)local_29c0 + 1.0) * (float)local_2900;
      local_3000._4_4_ = (local_29c0._4_4_ + 1.0) * local_2900._4_4_;
      uStack_28f8._0_4_ = ((float)uStack_29b8 + 1.0) * (float)uStack_28f8;
      uStack_28f8._4_4_ = (uStack_29b8._4_4_ + 1.0) * uStack_28f8._4_4_;
      uStack_2ff8._0_4_ = (float)uStack_28f8;
      uStack_2ff8._4_4_ = uStack_28f8._4_4_;
      uStack_2ff0._0_4_ = (float)uStack_28f0 * 1.0;
      uStack_2ff0._4_4_ = uStack_28f0._4_4_ * 1.0;
      auVar209 = _local_3000;
      uStack_2fe8._0_4_ = (float)uStack_28e8 * 1.0;
      uStack_2fe8._4_4_ = 0x3f800000;
      auVar220 = _local_3000;
      uStack_2ff0 = auVar209._16_8_;
      uStack_2fe8 = auVar220._24_8_;
      local_3c60 = local_3000;
      uStack_3c58 = uStack_2ff8;
      uStack_3c50 = uStack_2ff0;
      uStack_3c48 = uStack_2fe8;
      local_3c40._0_4_ = local_3c20._0_4_;
      local_3c40._4_4_ = local_3c20._4_4_;
      fStack_3c38 = local_3c20._8_4_;
      fStack_3c34 = local_3c20._12_4_;
      fStack_3c30 = auStack_3c10._0_4_;
      fStack_3c2c = auStack_3c10._4_4_;
      fStack_3c28 = auStack_3c10._8_4_;
      fStack_3c24 = auStack_3c10._12_4_;
      local_3800 = (float)local_3c40._0_4_ + (float)local_3000._0_4_;
      fStack_37fc = (float)local_3c40._4_4_ + (float)local_3000._4_4_;
      fStack_37f8 = fStack_3c38 + (float)uStack_28f8;
      fStack_37f4 = fStack_3c34 + uStack_28f8._4_4_;
      fStack_37f0 = fStack_3c30 + (float)uStack_28f0 * 1.0;
      fStack_37ec = fStack_3c2c + uStack_28f0._4_4_ * 1.0;
      fStack_37e8 = fStack_3c28 + (float)uStack_28e8 * 1.0;
      fStack_37e4 = fStack_3c24 + 1.0;
      auVar107._4_4_ = fStack_37fc;
      auVar107._0_4_ = local_3800;
      auVar107._8_4_ = fStack_37f8;
      auVar107._12_4_ = fStack_37f4;
      auVar107._16_4_ = fStack_37f0;
      auVar107._20_4_ = fStack_37ec;
      auVar107._24_4_ = fStack_37e8;
      auVar107._28_4_ = fStack_37e4;
      _local_7180 = vdivps_avx(local_37e0,auVar107);
      _local_3c40 = local_37e0;
      _local_3000 = auVar220;
      _local_2f60 = auVar221;
      local_2f40 = ZEXT1632(auVar218);
      local_29c0 = uVar177;
      uStack_29b8 = uVar178;
      local_2900 = uVar179;
      uStack_28f8 = uVar180;
      uStack_28f0 = uVar181;
      uStack_28e8 = uVar182;
      local_28a0 = uVar183;
      uStack_2898 = uVar184;
      local_25c0 = uVar185;
      uStack_25b8 = uVar186;
      uStack_25b0 = uVar187;
      uStack_25a8 = uVar188;
      break;
    case 5:
      local_3bc0 = local_7720;
      uStack_3bb8 = uStack_7718;
      uStack_3bb0 = uStack_7710;
      uStack_3ba8 = uStack_7708;
      local_36e0._8_8_ = uStack_7718;
      local_36e0._0_8_ = local_7720;
      local_3100 = 0;
      uStack_30f8 = 0;
      uStack_30f0 = 0;
      uStack_30e8 = 0;
      local_3760 = 0x3f800000;
      uStack_375c = 0x3f800000;
      uStack_3758 = 0x3f800000;
      uStack_3754 = 0x3f800000;
      uStack_3750 = 0x3f800000;
      uStack_374c = 0x3f800000;
      uStack_3748 = 0x3f800000;
      uStack_3744 = 0x3f800000;
      local_30c0 = local_7720;
      uStack_30b8 = uStack_7718;
      uStack_30b0 = uStack_7710;
      uStack_30a8 = uStack_7708;
      local_30e0 = 0x42b0c0a5;
      uStack_30dc = 0x42b0c0a5;
      uStack_30d8 = 0x42b0c0a5;
      uStack_30d4 = 0x42b0c0a5;
      uStack_30d0 = 0x42b0c0a5;
      uStack_30cc = 0x42b0c0a5;
      uStack_30c8 = 0x42b0c0a5;
      uStack_30c4 = 0x42b0c0a5;
      auVar115._16_8_ = uStack_7710;
      auVar115._0_16_ = local_36e0._0_16_;
      auVar115._24_8_ = uStack_7708;
      auVar114._8_4_ = 0x42b0c0a5;
      auVar114._0_8_ = 0x42b0c0a542b0c0a5;
      auVar114._12_4_ = 0x42b0c0a5;
      auVar114._16_4_ = 0x42b0c0a5;
      auVar114._20_4_ = 0x42b0c0a5;
      auVar114._24_4_ = 0x42b0c0a5;
      auVar114._28_4_ = 0x42b0c0a5;
      auVar220 = vminps_avx(auVar115,auVar114);
      local_36e0._0_8_ = auVar220._0_8_;
      local_36e0._8_8_ = auVar220._8_8_;
      local_36e0._16_8_ = auVar220._16_8_;
      local_36e0._24_8_ = auVar220._24_8_;
      local_3120 = local_36e0._0_8_;
      uStack_3118 = local_36e0._8_8_;
      uStack_3110 = local_36e0._16_8_;
      uStack_3108 = local_36e0._24_8_;
      local_3140 = 0xc2b0c0a5;
      uStack_313c = 0xc2b0c0a5;
      uStack_3138 = 0xc2b0c0a5;
      uStack_3134 = 0xc2b0c0a5;
      uStack_3130 = 0xc2b0c0a5;
      uStack_312c = 0xc2b0c0a5;
      uStack_3128 = 0xc2b0c0a5;
      uStack_3124 = 0xc2b0c0a5;
      auVar113._8_4_ = 0xc2b0c0a5;
      auVar113._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar113._12_4_ = 0xc2b0c0a5;
      auVar113._16_4_ = 0xc2b0c0a5;
      auVar113._20_4_ = 0xc2b0c0a5;
      auVar113._24_4_ = 0xc2b0c0a5;
      auVar113._28_4_ = 0xc2b0c0a5;
      auVar221 = vmaxps_avx(auVar220,auVar113);
      local_36e0._0_8_ = auVar221._0_8_;
      local_36e0._8_8_ = auVar221._8_8_;
      local_36e0._16_8_ = auVar221._16_8_;
      local_36e0._24_8_ = auVar221._24_8_;
      local_3200 = local_36e0._0_8_;
      uStack_31f8 = local_36e0._8_8_;
      uStack_31f0 = local_36e0._16_8_;
      uStack_31e8 = local_36e0._24_8_;
      local_3220 = 0x3fb8aa3b;
      uStack_321c = 0x3fb8aa3b;
      uStack_3218 = 0x3fb8aa3b;
      uStack_3214 = 0x3fb8aa3b;
      uStack_3210 = 0x3fb8aa3b;
      uStack_320c = 0x3fb8aa3b;
      uStack_3208 = 0x3fb8aa3b;
      uStack_3204 = 0x3fb8aa3b;
      local_3240 = 0x3f000000;
      uStack_323c = 0x3f000000;
      uStack_3238 = 0x3f000000;
      uStack_3234 = 0x3f000000;
      uStack_3230 = 0x3f000000;
      uStack_322c = 0x3f000000;
      uStack_3228 = 0x3f000000;
      uStack_3224 = 0x3f000000;
      local_31c0 = 0x3fb8aa3b3fb8aa3b;
      uStack_31b8 = 0x3fb8aa3b3fb8aa3b;
      uStack_31b0 = 0x3fb8aa3b3fb8aa3b;
      uStack_31a8 = 0x3fb8aa3b3fb8aa3b;
      local_31e0 = 0x3f0000003f000000;
      uStack_31d8 = 0x3f0000003f000000;
      uStack_31d0 = 0x3f0000003f000000;
      uStack_31c8 = 0x3f0000003f000000;
      local_31a0 = local_36e0._0_8_;
      uStack_3198 = local_36e0._8_8_;
      uStack_3190 = local_36e0._16_8_;
      uStack_3188 = local_36e0._24_8_;
      auVar112._8_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar112._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar112._16_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar112._24_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar111._8_8_ = 0x3f0000003f000000;
      auVar111._0_8_ = 0x3f0000003f000000;
      auVar111._16_8_ = 0x3f0000003f000000;
      auVar111._24_8_ = 0x3f0000003f000000;
      auVar219 = vfmadd213ps_fma(auVar112,auVar221,auVar111);
      auVar222 = vroundps_avx(ZEXT1632(auVar219),1);
      auVar220 = vcmpps_avx(ZEXT1632(auVar219),auVar222,1);
      local_3780._0_8_ = auVar220._0_8_;
      local_3780._8_8_ = auVar220._8_8_;
      local_3780._16_8_ = auVar220._16_8_;
      local_3780._24_8_ = auVar220._24_8_;
      local_2780 = 0x3f8000003f800000;
      uStack_2778 = 0x3f8000003f800000;
      uStack_2770 = 0x3f8000003f800000;
      uStack_2768 = 0x3f8000003f800000;
      local_2760 = local_3780._0_8_;
      uStack_2758 = local_3780._8_8_;
      uStack_2750 = local_3780._16_8_;
      uStack_2748 = local_3780._24_8_;
      auVar128._8_8_ = 0x3f8000003f800000;
      auVar128._0_8_ = 0x3f8000003f800000;
      auVar128._16_8_ = 0x3f8000003f800000;
      auVar128._24_8_ = 0x3f8000003f800000;
      local_3780 = vpand_avx2(auVar220,auVar128);
      local_3700 = auVar222._0_8_;
      uStack_36f8 = auVar222._8_8_;
      uStack_36f0 = auVar222._16_8_;
      uStack_36e8 = auVar222._24_8_;
      local_2820 = local_3700;
      uStack_2818 = uStack_36f8;
      uStack_2810 = uStack_36f0;
      uStack_2808 = uStack_36e8;
      local_2840 = local_3780._0_8_;
      uStack_2838 = local_3780._8_8_;
      uStack_2830 = local_3780._16_8_;
      uStack_2828 = local_3780._24_8_;
      local_3720 = vsubps_avx(auVar222,local_3780);
      local_25e0 = local_3720._0_8_;
      uStack_25d8 = local_3720._8_8_;
      uStack_25d0 = local_3720._16_8_;
      uStack_25c8 = local_3720._24_8_;
      local_2600 = 0x3f318000;
      uStack_25fc = 0x3f318000;
      uStack_25f8 = 0x3f318000;
      uStack_25f4 = 0x3f318000;
      uStack_25f0 = 0x3f318000;
      uStack_25ec = 0x3f318000;
      uStack_25e8 = 0x3f318000;
      uStack_25e4 = 0x3f318000;
      local_2620 = local_36e0._0_8_;
      uStack_2618 = local_36e0._8_8_;
      uStack_2610 = local_36e0._16_8_;
      uStack_2608 = local_36e0._24_8_;
      local_2420 = 0x3f3180003f318000;
      uStack_2418 = 0x3f3180003f318000;
      uStack_2410 = 0x3f3180003f318000;
      uStack_2408 = 0x3f3180003f318000;
      local_2400 = local_3720._0_8_;
      uStack_23f8 = local_3720._8_8_;
      uStack_23f0 = local_3720._16_8_;
      uStack_23e8 = local_3720._24_8_;
      local_2440 = local_36e0._0_8_;
      uStack_2438 = local_36e0._8_8_;
      uStack_2430 = local_36e0._16_8_;
      uStack_2428 = local_36e0._24_8_;
      auVar129._8_8_ = 0x3f3180003f318000;
      auVar129._0_8_ = 0x3f3180003f318000;
      auVar129._16_8_ = 0x3f3180003f318000;
      auVar129._24_8_ = 0x3f3180003f318000;
      auVar219 = vfnmadd213ps_fma(auVar129,local_3720,auVar221);
      local_36e0._0_8_ = auVar219._0_8_;
      local_36e0._8_8_ = auVar219._8_8_;
      local_2640 = local_3720._0_8_;
      uStack_2638 = local_3720._8_8_;
      uStack_2630 = local_3720._16_8_;
      uStack_2628 = local_3720._24_8_;
      local_2660 = 0xb95e8083;
      uStack_265c = 0xb95e8083;
      uStack_2658 = 0xb95e8083;
      uStack_2654 = 0xb95e8083;
      uStack_2650 = 0xb95e8083;
      uStack_264c = 0xb95e8083;
      uStack_2648 = 0xb95e8083;
      uStack_2644 = 0xb95e8083;
      local_2680 = local_36e0._0_8_;
      uStack_2678 = local_36e0._8_8_;
      uStack_2670 = 0;
      uStack_2668 = 0;
      local_23c0 = 0xb95e8083b95e8083;
      uStack_23b8 = 0xb95e8083b95e8083;
      uStack_23b0 = 0xb95e8083b95e8083;
      uStack_23a8 = 0xb95e8083b95e8083;
      local_23a0 = local_3720._0_8_;
      uStack_2398 = local_3720._8_8_;
      uStack_2390 = local_3720._16_8_;
      uStack_2388 = local_3720._24_8_;
      local_23e0 = local_36e0._0_8_;
      uStack_23d8 = local_36e0._8_8_;
      uStack_23d0 = 0;
      uStack_23c8 = 0;
      auVar130._8_8_ = 0xb95e8083b95e8083;
      auVar130._0_8_ = 0xb95e8083b95e8083;
      auVar130._16_8_ = 0xb95e8083b95e8083;
      auVar130._24_8_ = 0xb95e8083b95e8083;
      auVar218 = vfnmadd213ps_fma(auVar130,local_3720,ZEXT1632(auVar219));
      local_36e0._0_8_ = auVar218._0_8_;
      local_36e0._8_8_ = auVar218._8_8_;
      local_3040 = local_36e0._0_8_;
      uVar189 = local_3040;
      uStack_3038 = local_36e0._8_8_;
      uVar190 = uStack_3038;
      uStack_3030 = 0;
      uStack_3028 = 0;
      local_3060 = local_36e0._0_8_;
      uStack_3058 = local_36e0._8_8_;
      uStack_3050 = 0;
      uStack_3048 = 0;
      local_3040._0_4_ = auVar218._0_4_;
      local_3040._4_4_ = auVar218._4_4_;
      uStack_3038._0_4_ = auVar218._8_4_;
      uStack_3038._4_4_ = auVar218._12_4_;
      local_3700._4_4_ = local_3040._4_4_ * local_3040._4_4_;
      local_3700._0_4_ = (float)local_3040 * (float)local_3040;
      local_36a0 = local_3700;
      uStack_36f8._0_4_ = (float)uStack_3038 * (float)uStack_3038;
      uStack_36f8._4_4_ = uStack_3038._4_4_ * uStack_3038._4_4_;
      auVar5 = _local_3700;
      _local_3700 = ZEXT1632(_local_3700);
      auVar111 = _local_3700;
      uStack_3798._0_4_ = 0x39506967;
      local_37a0 = (undefined1  [8])0x3950696739506967;
      uStack_3798._4_4_ = 0x39506967;
      uStack_3790._0_4_ = 0x39506967;
      uStack_3790._4_4_ = 0x39506967;
      auVar209 = _local_37a0;
      uStack_3788._0_4_ = 0x39506967;
      uStack_3788._4_4_ = 0x39506967;
      auVar220 = _local_37a0;
      uStack_3790 = auVar209._16_8_;
      uStack_3788 = auVar220._24_8_;
      local_32c0 = 0x3950696739506967;
      uStack_32b8 = uStack_3798;
      uStack_32b0 = uStack_3790;
      uStack_32a8 = uStack_3788;
      local_32e0 = local_36e0._0_8_;
      uStack_32d8 = local_36e0._8_8_;
      uStack_32d0 = 0;
      uStack_32c8 = 0;
      local_3300 = 0x3ab743ce;
      uStack_32fc = 0x3ab743ce;
      uStack_32f8 = 0x3ab743ce;
      uStack_32f4 = 0x3ab743ce;
      uStack_32f0 = 0x3ab743ce;
      uStack_32ec = 0x3ab743ce;
      uStack_32e8 = 0x3ab743ce;
      uStack_32e4 = 0x3ab743ce;
      local_32a0 = 0x3ab743ce3ab743ce;
      uStack_3298 = 0x3ab743ce3ab743ce;
      uStack_3290 = 0x3ab743ce3ab743ce;
      uStack_3288 = 0x3ab743ce3ab743ce;
      local_3260 = 0x3950696739506967;
      uStack_3258 = uStack_3798;
      uStack_3250 = uStack_3790;
      uStack_3248 = uStack_3788;
      local_3280 = local_36e0._0_8_;
      uStack_3278 = local_36e0._8_8_;
      uStack_3270 = 0;
      uStack_3268 = 0;
      auVar110._16_8_ = uStack_3790;
      auVar110._0_16_ = _local_37a0;
      auVar110._24_8_ = uStack_3788;
      auVar109._8_8_ = 0x3ab743ce3ab743ce;
      auVar109._0_8_ = 0x3ab743ce3ab743ce;
      auVar109._16_8_ = 0x3ab743ce3ab743ce;
      auVar109._24_8_ = 0x3ab743ce3ab743ce;
      auVar219 = vfmadd213ps_fma(ZEXT1632(auVar218),auVar110,auVar109);
      local_37a0 = auVar219._0_8_;
      uStack_3798 = auVar219._8_8_;
      local_3380 = local_37a0;
      uStack_3378 = uStack_3798;
      uStack_3370 = 0;
      uStack_3368 = 0;
      local_33a0 = local_36e0._0_8_;
      uStack_3398 = local_36e0._8_8_;
      uStack_3390 = 0;
      uStack_3388 = 0;
      local_33c0 = 0x3c088908;
      uStack_33bc = 0x3c088908;
      uStack_33b8 = 0x3c088908;
      uStack_33b4 = 0x3c088908;
      uStack_33b0 = 0x3c088908;
      uStack_33ac = 0x3c088908;
      uStack_33a8 = 0x3c088908;
      uStack_33a4 = 0x3c088908;
      local_3360 = 0x3c0889083c088908;
      uStack_3358 = 0x3c0889083c088908;
      uStack_3350 = 0x3c0889083c088908;
      uStack_3348 = 0x3c0889083c088908;
      local_3320 = local_37a0;
      uStack_3318 = uStack_3798;
      uStack_3310 = 0;
      uStack_3308 = 0;
      local_3340 = local_36e0._0_8_;
      uStack_3338 = local_36e0._8_8_;
      uStack_3330 = 0;
      uStack_3328 = 0;
      auVar108._8_8_ = 0x3c0889083c088908;
      auVar108._0_8_ = 0x3c0889083c088908;
      auVar108._16_8_ = 0x3c0889083c088908;
      auVar108._24_8_ = 0x3c0889083c088908;
      auVar219 = vfmadd213ps_fma(ZEXT1632(auVar218),ZEXT1632(auVar219),auVar108);
      local_37a0 = auVar219._0_8_;
      uStack_3798 = auVar219._8_8_;
      local_3440 = local_37a0;
      uStack_3438 = uStack_3798;
      uStack_3430 = 0;
      uStack_3428 = 0;
      local_3460 = local_36e0._0_8_;
      uStack_3458 = local_36e0._8_8_;
      uStack_3450 = 0;
      uStack_3448 = 0;
      local_3480 = 0x3d2aa9c1;
      uStack_347c = 0x3d2aa9c1;
      uStack_3478 = 0x3d2aa9c1;
      uStack_3474 = 0x3d2aa9c1;
      uStack_3470 = 0x3d2aa9c1;
      uStack_346c = 0x3d2aa9c1;
      uStack_3468 = 0x3d2aa9c1;
      uStack_3464 = 0x3d2aa9c1;
      local_3420 = 0x3d2aa9c13d2aa9c1;
      uStack_3418 = 0x3d2aa9c13d2aa9c1;
      uStack_3410 = 0x3d2aa9c13d2aa9c1;
      uStack_3408 = 0x3d2aa9c13d2aa9c1;
      local_33e0 = local_37a0;
      uStack_33d8 = uStack_3798;
      uStack_33d0 = 0;
      uStack_33c8 = 0;
      local_3400 = local_36e0._0_8_;
      uStack_33f8 = local_36e0._8_8_;
      uStack_33f0 = 0;
      uStack_33e8 = 0;
      auVar4._8_8_ = 0x3d2aa9c13d2aa9c1;
      auVar4._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar4._16_8_ = 0x3d2aa9c13d2aa9c1;
      auVar4._24_8_ = 0x3d2aa9c13d2aa9c1;
      auVar219 = vfmadd213ps_fma(ZEXT1632(auVar218),ZEXT1632(auVar219),auVar4);
      local_37a0 = auVar219._0_8_;
      uStack_3798 = auVar219._8_8_;
      local_3500 = local_37a0;
      uStack_34f8 = uStack_3798;
      uStack_34f0 = 0;
      uStack_34e8 = 0;
      local_3520 = local_36e0._0_8_;
      uStack_3518 = local_36e0._8_8_;
      uStack_3510 = 0;
      uStack_3508 = 0;
      local_3540 = 0x3e2aaaaa;
      uStack_353c = 0x3e2aaaaa;
      uStack_3538 = 0x3e2aaaaa;
      uStack_3534 = 0x3e2aaaaa;
      uStack_3530 = 0x3e2aaaaa;
      uStack_352c = 0x3e2aaaaa;
      uStack_3528 = 0x3e2aaaaa;
      uStack_3524 = 0x3e2aaaaa;
      local_34e0 = 0x3e2aaaaa3e2aaaaa;
      uStack_34d8 = 0x3e2aaaaa3e2aaaaa;
      uStack_34d0 = 0x3e2aaaaa3e2aaaaa;
      uStack_34c8 = 0x3e2aaaaa3e2aaaaa;
      local_34a0 = local_37a0;
      uStack_3498 = uStack_3798;
      uStack_3490 = 0;
      uStack_3488 = 0;
      local_34c0 = local_36e0._0_8_;
      uStack_34b8 = local_36e0._8_8_;
      uStack_34b0 = 0;
      uStack_34a8 = 0;
      auVar3._8_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar3._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar3._16_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar3._24_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar220 = vfmadd213ps_avx512vl(ZEXT1632(auVar218),ZEXT1632(auVar219),auVar3);
      local_37a0 = auVar220._0_8_;
      uStack_3798 = auVar220._8_8_;
      uStack_3790 = auVar220._16_8_;
      uStack_3788 = auVar220._24_8_;
      local_35c0 = local_37a0;
      uStack_35b8 = uStack_3798;
      uStack_35b0 = uStack_3790;
      uStack_35a8 = uStack_3788;
      local_35e0 = local_36e0._0_8_;
      uStack_35d8 = local_36e0._8_8_;
      uStack_35d0 = 0;
      uStack_35c8 = 0;
      local_3600 = 0x3f000000;
      uStack_35fc = 0x3f000000;
      uStack_35f8 = 0x3f000000;
      uStack_35f4 = 0x3f000000;
      uStack_35f0 = 0x3f000000;
      uStack_35ec = 0x3f000000;
      uStack_35e8 = 0x3f000000;
      uStack_35e4 = 0x3f000000;
      local_35a0 = 0x3f0000003f000000;
      uStack_3598 = 0x3f0000003f000000;
      uStack_3590 = 0x3f0000003f000000;
      uStack_3588 = 0x3f0000003f000000;
      local_3560 = local_37a0;
      uStack_3558 = uStack_3798;
      uStack_3550 = uStack_3790;
      uStack_3548 = uStack_3788;
      local_3580 = local_36e0._0_8_;
      uStack_3578 = local_36e0._8_8_;
      uStack_3570 = 0;
      uStack_3568 = 0;
      auVar2._8_8_ = 0x3f0000003f000000;
      auVar2._0_8_ = 0x3f0000003f000000;
      auVar2._16_8_ = 0x3f0000003f000000;
      auVar2._24_8_ = 0x3f0000003f000000;
      auVar220 = vfmadd213ps_avx512vl(ZEXT1632(auVar218),auVar220,auVar2);
      local_37a0 = auVar220._0_8_;
      uStack_3798 = auVar220._8_8_;
      uStack_3790 = auVar220._16_8_;
      uStack_3788 = auVar220._24_8_;
      uStack_36f8 = auVar5._8_8_;
      local_3680 = local_37a0;
      uStack_3678 = uStack_3798;
      uStack_3670 = uStack_3790;
      uStack_3668 = uStack_3788;
      uStack_3698 = uStack_36f8;
      uStack_3690 = 0;
      uStack_3688 = 0;
      local_36c0 = local_36e0._0_8_;
      uStack_36b8 = local_36e0._8_8_;
      uStack_36b0 = 0;
      uStack_36a8 = 0;
      local_3620 = local_37a0;
      uStack_3618 = uStack_3798;
      uStack_3610 = uStack_3790;
      uStack_3608 = uStack_3788;
      local_3640 = local_36a0;
      uStack_3638 = uStack_36f8;
      uStack_3630 = 0;
      uStack_3628 = 0;
      local_3660 = local_36e0._0_8_;
      uStack_3658 = local_36e0._8_8_;
      uStack_3650 = 0;
      uStack_3648 = 0;
      auVar220 = vfmadd213ps_avx512vl(ZEXT1632(auVar5),auVar220,ZEXT1632(auVar218));
      local_37a0 = auVar220._0_8_;
      uStack_3798 = auVar220._8_8_;
      uStack_3790 = auVar220._16_8_;
      uStack_3788 = auVar220._24_8_;
      local_3180 = 0x3f8000003f800000;
      uStack_3178 = 0x3f8000003f800000;
      uStack_3170 = 0x3f8000003f800000;
      uStack_3168 = 0x3f8000003f800000;
      local_3160 = local_37a0;
      uVar181 = local_3160;
      uStack_3158 = uStack_3798;
      uVar182 = uStack_3158;
      uStack_3150 = uStack_3790;
      uVar183 = uStack_3150;
      uStack_3148 = uStack_3788;
      uVar184 = uStack_3148;
      local_3160._0_4_ = auVar220._0_4_;
      local_3160._4_4_ = auVar220._4_4_;
      uStack_3158._0_4_ = auVar220._8_4_;
      uStack_3158._4_4_ = auVar220._12_4_;
      uStack_3150._0_4_ = auVar220._16_4_;
      uStack_3150._4_4_ = auVar220._20_4_;
      uStack_3148._0_4_ = auVar220._24_4_;
      uStack_3148._4_4_ = auVar220._28_4_;
      uStack_3148._4_4_ = uStack_3148._4_4_ + 1.0;
      local_37a0._4_4_ = local_3160._4_4_ + 1.0;
      local_37a0._0_4_ = (float)local_3160 + 1.0;
      uStack_3798._0_4_ = (float)uStack_3158 + 1.0;
      uStack_3798._4_4_ = uStack_3158._4_4_ + 1.0;
      uStack_3790._0_4_ = (float)uStack_3150 + 1.0;
      uStack_3790._4_4_ = uStack_3150._4_4_ + 1.0;
      auVar209 = _local_37a0;
      uStack_3788._0_4_ = (float)uStack_3148 + 1.0;
      uStack_3788._4_4_ = uStack_3148._4_4_;
      auVar221 = _local_37a0;
      local_25a0 = local_3720._0_8_;
      uVar191 = local_25a0;
      uStack_2598 = local_3720._8_8_;
      uVar192 = uStack_2598;
      uStack_2590 = local_3720._16_8_;
      uVar193 = uStack_2590;
      uStack_2588 = local_3720._24_8_;
      uVar194 = uStack_2588;
      local_25a0._0_4_ = local_3720._0_4_;
      local_25a0._4_4_ = local_3720._4_4_;
      uStack_2598._0_4_ = local_3720._8_4_;
      uStack_2598._4_4_ = local_3720._12_4_;
      uStack_2590._0_4_ = local_3720._16_4_;
      uStack_2590._4_4_ = local_3720._20_4_;
      uStack_2588._0_4_ = local_3720._24_4_;
      uStack_2588._4_4_ = local_3720._28_4_;
      local_3740._4_4_ = (int)local_25a0._4_4_;
      local_3740._0_4_ = (int)(float)local_25a0;
      local_3740._8_4_ = (int)(float)uStack_2598;
      local_3740._12_4_ = (int)uStack_2598._4_4_;
      local_3740._16_4_ = (int)(float)uStack_2590;
      local_3740._20_4_ = (int)uStack_2590._4_4_;
      auVar210 = local_3740._0_24_;
      local_3740._24_4_ = (int)(float)uStack_2588;
      local_3740._28_4_ = (int)uStack_2588._4_4_;
      auVar220 = local_3740;
      local_3740._16_8_ = auVar210._16_8_;
      local_3740._24_8_ = auVar220._24_8_;
      local_2520 = local_3740._0_8_;
      uStack_2518 = local_3740._8_8_;
      uStack_2510 = local_3740._16_8_;
      uStack_2508 = local_3740._24_8_;
      local_2540 = 0x7f0000007f;
      uStack_2538 = 0x7f0000007f;
      uStack_2530 = 0x7f0000007f;
      uStack_2528 = 0x7f0000007f;
      local_22a0 = local_3740._0_8_;
      uStack_2298 = local_3740._8_8_;
      uStack_2290 = local_3740._16_8_;
      uStack_2288 = local_3740._24_8_;
      local_22c0 = 0x7f0000007f;
      uStack_22b8 = 0x7f0000007f;
      uStack_22b0 = 0x7f0000007f;
      uStack_22a8 = 0x7f0000007f;
      auVar134._16_8_ = local_3740._16_8_;
      auVar134._0_16_ = local_3740._0_16_;
      auVar134._24_8_ = local_3740._24_8_;
      auVar133._8_8_ = 0x7f0000007f;
      auVar133._0_8_ = 0x7f0000007f;
      auVar133._16_8_ = 0x7f0000007f;
      auVar133._24_8_ = 0x7f0000007f;
      auVar220 = vpaddd_avx2(auVar134,auVar133);
      local_3740._0_8_ = auVar220._0_8_;
      local_3740._8_8_ = auVar220._8_8_;
      local_3740._16_8_ = auVar220._16_8_;
      local_3740._24_8_ = auVar220._24_8_;
      local_24a0 = local_3740._0_8_;
      uStack_2498 = local_3740._8_8_;
      uStack_2490 = local_3740._16_8_;
      uStack_2488 = local_3740._24_8_;
      local_24a4 = 0x17;
      local_2220 = local_3740._0_8_;
      uStack_2218 = local_3740._8_8_;
      uStack_2210 = local_3740._16_8_;
      uStack_2208 = local_3740._24_8_;
      local_2224 = 0x17;
      local_3740 = vpslld_avx2(auVar220,ZEXT416(0x17));
      local_2460 = local_3740._0_8_;
      uStack_2458 = local_3740._8_8_;
      uStack_2450 = local_3740._16_8_;
      uStack_2448 = local_3740._24_8_;
      local_37c0 = local_3740._0_8_;
      uStack_37b8 = local_3740._8_8_;
      uStack_37b0 = local_3740._16_8_;
      uStack_37a8 = local_3740._24_8_;
      uStack_3790 = auVar209._16_8_;
      uStack_3788 = auVar221._24_8_;
      local_3080 = local_37a0;
      uStack_3078 = uStack_3798;
      uStack_3070 = uStack_3790;
      uStack_3068 = uStack_3788;
      local_30a0 = local_3740._0_8_;
      uVar185 = local_30a0;
      uStack_3098 = local_3740._8_8_;
      uVar186 = uStack_3098;
      uStack_3090 = local_3740._16_8_;
      uVar187 = uStack_3090;
      uStack_3088 = local_3740._24_8_;
      uVar188 = uStack_3088;
      local_30a0._0_4_ = local_3740._0_4_;
      local_30a0._4_4_ = local_3740._4_4_;
      uStack_3098._0_4_ = local_3740._8_4_;
      uStack_3098._4_4_ = local_3740._12_4_;
      uStack_3090._0_4_ = local_3740._16_4_;
      uStack_3090._4_4_ = local_3740._20_4_;
      uStack_3088._0_4_ = local_3740._24_4_;
      local_37a0._0_4_ = ((float)local_3160 + 1.0) * (float)local_30a0;
      local_37a0._4_4_ = (local_3160._4_4_ + 1.0) * local_30a0._4_4_;
      uStack_3098._0_4_ = ((float)uStack_3158 + 1.0) * (float)uStack_3098;
      uStack_3098._4_4_ = (uStack_3158._4_4_ + 1.0) * uStack_3098._4_4_;
      uStack_3090._0_4_ = ((float)uStack_3150 + 1.0) * (float)uStack_3090;
      uStack_3090._4_4_ = (uStack_3150._4_4_ + 1.0) * uStack_3090._4_4_;
      uStack_3088._0_4_ = ((float)uStack_3148 + 1.0) * (float)uStack_3088;
      uStack_3798._0_4_ = (float)uStack_3098;
      uStack_3798._4_4_ = uStack_3098._4_4_;
      uStack_3790._0_4_ = (float)uStack_3090;
      uStack_3790._4_4_ = uStack_3090._4_4_;
      auVar209 = _local_37a0;
      uStack_3788._0_4_ = (float)uStack_3088;
      auVar106 = _local_37a0;
      uStack_3790 = auVar209._16_8_;
      uStack_3788 = auVar106._24_8_;
      local_3b84 = 0x3f800000;
      local_3b04 = 0x3f800000;
      uStack_3b08 = 0x3f800000;
      local_3b0c = 0x3f800000;
      uStack_3b10 = 0x3f800000;
      local_3b14 = 0x3f800000;
      uStack_3b18 = 0x3f800000;
      local_3b1c = 0x3f800000;
      local_3b20 = 0x3f800000;
      auVar219 = vinsertps_avx512f(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar219 = vinsertps_avx512f(auVar219,ZEXT416(0x3f800000),0x20);
      local_3b40 = vinsertps_avx512f(auVar219,ZEXT416(0x3f800000),0x30);
      auVar219 = vinsertps_avx512f(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar219 = vinsertps_avx512f(auVar219,ZEXT416(0x3f800000),0x20);
      auStack_3b30 = vinsertps_avx512f(auVar219,ZEXT416(0x3f800000),0x30);
      local_3b60 = local_37a0;
      uStack_3b58 = uStack_3798;
      uStack_3b50 = uStack_3790;
      uStack_3b48 = uStack_3788;
      local_3b80 = local_3b40._0_8_;
      uVar177 = local_3b80;
      uStack_3b78 = local_3b40._8_8_;
      uVar178 = uStack_3b78;
      uStack_3b70 = auStack_3b30._0_8_;
      uVar179 = uStack_3b70;
      uStack_3b68 = auStack_3b30._8_8_;
      uVar180 = uStack_3b68;
      local_3b80._0_4_ = local_3b40._0_4_;
      local_3b80._4_4_ = local_3b40._4_4_;
      uStack_3b78._0_4_ = local_3b40._8_4_;
      uStack_3b78._4_4_ = local_3b40._12_4_;
      uStack_3b70._0_4_ = auStack_3b30._0_4_;
      uStack_3b70._4_4_ = auStack_3b30._4_4_;
      uStack_3b68._0_4_ = auStack_3b30._8_4_;
      uStack_3b68._4_4_ = auStack_3b30._12_4_;
      local_1320._4_4_ = (float)local_37a0._4_4_ + local_3b80._4_4_;
      local_1320._0_4_ = (float)local_37a0._0_4_ + (float)local_3b80;
      uStack_1318._0_4_ = (float)uStack_3098 + (float)uStack_3b78;
      uStack_1318._4_4_ = uStack_3098._4_4_ + uStack_3b78._4_4_;
      uStack_1310._0_4_ = (float)uStack_3090 + (float)uStack_3b70;
      uStack_1310._4_4_ = uStack_3090._4_4_ + uStack_3b70._4_4_;
      auVar209 = _local_1320;
      uStack_1308._0_4_ = (float)uStack_3088 + (float)uStack_3b68;
      uStack_1308._4_4_ = uStack_3148._4_4_ + uStack_3b68._4_4_;
      auVar220 = _local_1320;
      local_1360 = 0x3f800000;
      uStack_135c = 0x3f800000;
      uStack_1358 = 0x3f800000;
      uStack_1354 = 0x3f800000;
      uStack_1350 = 0x3f800000;
      uStack_134c = 0x3f800000;
      uStack_1348 = 0x3f800000;
      uStack_1344 = 0x3f800000;
      local_a80 = 0;
      uStack_a78 = 0;
      uStack_a70 = 0;
      uStack_a68 = 0;
      local_1380 = vcmpps_avx(_local_1320,ZEXT1632(ZEXT816(0)),2);
      uStack_1310 = auVar209._16_8_;
      uStack_1308 = auVar220._24_8_;
      local_aa0 = local_1320;
      uStack_a98 = uStack_1318;
      uStack_a90 = uStack_1310;
      uStack_a88 = uStack_1308;
      local_ac0 = 0x800000;
      uStack_abc = 0x800000;
      uStack_ab8 = 0x800000;
      uStack_ab4 = 0x800000;
      uStack_ab0 = 0x800000;
      uStack_aac = 0x800000;
      uStack_aa8 = 0x800000;
      uStack_aa4 = 0x800000;
      auVar167._16_8_ = uStack_1310;
      auVar167._0_16_ = _local_1320;
      auVar167._24_8_ = uStack_1308;
      auVar166._8_4_ = 0x800000;
      auVar166._0_8_ = 0x80000000800000;
      auVar166._12_4_ = 0x800000;
      auVar166._16_4_ = 0x800000;
      auVar166._20_4_ = 0x800000;
      auVar166._24_4_ = 0x800000;
      auVar166._28_4_ = 0x800000;
      auVar220 = vmaxps_avx512vl(auVar167,auVar166);
      local_1320 = auVar220._0_8_;
      uStack_1318 = auVar220._8_8_;
      uStack_1310 = auVar220._16_8_;
      uStack_1308 = auVar220._24_8_;
      local_700 = local_1320;
      uStack_6f8 = uStack_1318;
      uStack_6f0 = uStack_1310;
      uStack_6e8 = uStack_1308;
      local_720 = local_1320;
      uStack_718 = uStack_1318;
      uStack_710 = uStack_1310;
      uStack_708 = uStack_1308;
      local_724 = 0x17;
      local_5e0 = local_1320;
      uStack_5d8 = uStack_1318;
      uStack_5d0 = uStack_1310;
      uStack_5c8 = uStack_1308;
      local_5e4 = 0x17;
      auVar221 = vpsrld_avx512vl(auVar220,ZEXT416(0x17));
      local_880 = local_1320;
      uStack_878 = uStack_1318;
      uStack_870 = uStack_1310;
      uStack_868 = uStack_1308;
      local_8a0 = 0x807fffff;
      uStack_89c = 0x807fffff;
      uStack_898 = 0x807fffff;
      uStack_894 = 0x807fffff;
      uStack_890 = 0x807fffff;
      uStack_88c = 0x807fffff;
      uStack_888 = 0x807fffff;
      uStack_884 = 0x807fffff;
      auVar171._8_4_ = 0x807fffff;
      auVar171._0_8_ = 0x807fffff807fffff;
      auVar171._12_4_ = 0x807fffff;
      auVar171._16_4_ = 0x807fffff;
      auVar171._20_4_ = 0x807fffff;
      auVar171._24_4_ = 0x807fffff;
      auVar171._28_4_ = 0x807fffff;
      auVar222 = vmovdqa64_avx512vl(auVar171);
      auVar220 = vpandd_avx512vl(auVar220,auVar222);
      local_1320 = auVar220._0_8_;
      uStack_1318 = auVar220._8_8_;
      uStack_1310 = auVar220._16_8_;
      uStack_1308 = auVar220._24_8_;
      local_680 = local_1320;
      uStack_678 = uStack_1318;
      uStack_670 = uStack_1310;
      uStack_668 = uStack_1308;
      local_6a0 = 0x3f000000;
      uStack_69c = 0x3f000000;
      uStack_698 = 0x3f000000;
      uStack_694 = 0x3f000000;
      uStack_690 = 0x3f000000;
      uStack_68c = 0x3f000000;
      uStack_688 = 0x3f000000;
      uStack_684 = 0x3f000000;
      auVar175._8_4_ = 0x3f000000;
      auVar175._0_8_ = 0x3f0000003f000000;
      auVar175._12_4_ = 0x3f000000;
      auVar175._16_4_ = 0x3f000000;
      auVar175._20_4_ = 0x3f000000;
      auVar175._24_4_ = 0x3f000000;
      auVar175._28_4_ = 0x3f000000;
      auVar222 = vmovdqa64_avx512vl(auVar175);
      auVar222 = vpord_avx512vl(auVar220,auVar222);
      local_1340._0_8_ = auVar221._0_8_;
      local_1340._8_8_ = auVar221._8_8_;
      local_1340._16_8_ = auVar221._16_8_;
      local_1340._24_8_ = auVar221._24_8_;
      local_640 = local_1340._0_8_;
      uStack_638 = local_1340._8_8_;
      uStack_630 = local_1340._16_8_;
      uStack_628 = local_1340._24_8_;
      local_660 = 0x7f0000007f;
      uStack_658 = 0x7f0000007f;
      uStack_650 = 0x7f0000007f;
      uStack_648 = 0x7f0000007f;
      local_5a0 = local_1340._0_8_;
      uStack_598 = local_1340._8_8_;
      uStack_590 = local_1340._16_8_;
      uStack_588 = local_1340._24_8_;
      local_5c0 = 0x7f0000007f;
      uStack_5b8 = 0x7f0000007f;
      uStack_5b0 = 0x7f0000007f;
      uStack_5a8 = 0x7f0000007f;
      auVar176._8_8_ = 0x7f0000007f;
      auVar176._0_8_ = 0x7f0000007f;
      auVar176._16_8_ = 0x7f0000007f;
      auVar176._24_8_ = 0x7f0000007f;
      local_1340 = vpsubd_avx2(auVar221,auVar176);
      local_620 = local_1340._0_8_;
      uStack_618 = local_1340._8_8_;
      uStack_610 = local_1340._16_8_;
      uStack_608 = local_1340._24_8_;
      auVar220 = vcvtdq2ps_avx(local_1340);
      local_13a0 = auVar220._0_8_;
      uStack_1398 = auVar220._8_8_;
      uStack_1390 = auVar220._16_8_;
      uStack_1388 = auVar220._24_8_;
      local_b00 = 0x3f8000003f800000;
      uStack_af8 = 0x3f8000003f800000;
      uStack_af0 = 0x3f8000003f800000;
      uStack_ae8 = 0x3f8000003f800000;
      local_ae0 = local_13a0;
      uVar213 = local_ae0;
      uStack_ad8 = uStack_1398;
      uVar214 = uStack_ad8;
      uStack_ad0 = uStack_1390;
      uVar215 = uStack_ad0;
      uStack_ac8 = uStack_1388;
      uVar216 = uStack_ac8;
      local_ae0._0_4_ = auVar220._0_4_;
      local_ae0._4_4_ = auVar220._4_4_;
      uStack_ad8._0_4_ = auVar220._8_4_;
      uStack_ad8._4_4_ = auVar220._12_4_;
      uStack_ad0._0_4_ = auVar220._16_4_;
      uStack_ad0._4_4_ = auVar220._20_4_;
      uStack_ac8._0_4_ = auVar220._24_4_;
      uStack_ac8._4_4_ = auVar220._28_4_;
      local_13a0._4_4_ = local_ae0._4_4_ + 1.0;
      local_13a0._0_4_ = (float)local_ae0 + 1.0;
      uStack_1398._0_4_ = (float)uStack_ad8 + 1.0;
      uStack_1398._4_4_ = uStack_ad8._4_4_ + 1.0;
      uStack_1390._0_4_ = (float)uStack_ad0 + 1.0;
      uStack_1390._4_4_ = uStack_ad0._4_4_ + 1.0;
      auVar209 = _local_13a0;
      uStack_1388._0_4_ = (float)uStack_ac8 + 1.0;
      uStack_1388._4_4_ = uStack_ac8._4_4_ + 1.0;
      auVar220 = _local_13a0;
      auVar232._8_4_ = 0x3f3504f3;
      auVar232._0_8_ = 0x3f3504f33f3504f3;
      auVar232._12_4_ = 0x3f3504f3;
      auVar232._16_4_ = 0x3f3504f3;
      auVar232._20_4_ = 0x3f3504f3;
      auVar232._24_4_ = 0x3f3504f3;
      auVar232._28_4_ = 0x3f3504f3;
      local_13c0 = vcmpps_avx(auVar222,auVar232,1);
      local_1320 = auVar222._0_8_;
      uStack_1318 = auVar222._8_8_;
      uStack_1310 = auVar222._16_8_;
      uStack_1308 = auVar222._24_8_;
      local_8c0 = local_1320;
      uStack_8b8 = uStack_1318;
      uStack_8b0 = uStack_1310;
      uStack_8a8 = uStack_1308;
      local_8e0 = local_13c0._0_8_;
      uStack_8d8 = local_13c0._8_8_;
      uStack_8d0 = local_13c0._16_8_;
      uStack_8c8 = local_13c0._24_8_;
      auVar221 = vmovdqa64_avx512vl(local_13c0);
      local_13e0 = vpandd_avx512vl(auVar222,auVar221);
      local_960 = 0x3f8000003f800000;
      uStack_958 = 0x3f8000003f800000;
      uStack_950 = 0x3f8000003f800000;
      uStack_948 = 0x3f8000003f800000;
      local_940 = local_1320;
      uStack_938 = uStack_1318;
      uStack_930 = uStack_1310;
      uStack_928 = uStack_1308;
      auVar169._8_8_ = 0x3f8000003f800000;
      auVar169._0_8_ = 0x3f8000003f800000;
      auVar169._16_8_ = 0x3f8000003f800000;
      auVar169._24_8_ = 0x3f8000003f800000;
      auVar221 = vsubps_avx512vl(auVar222,auVar169);
      uStack_1390 = auVar209._16_8_;
      uStack_1388 = auVar220._24_8_;
      local_900 = 0x3f8000003f800000;
      uStack_8f8 = 0x3f8000003f800000;
      uStack_8f0 = 0x3f8000003f800000;
      uStack_8e8 = 0x3f8000003f800000;
      local_920 = local_13c0._0_8_;
      uStack_918 = local_13c0._8_8_;
      uStack_910 = local_13c0._16_8_;
      uStack_908 = local_13c0._24_8_;
      auVar170._8_8_ = 0x3f8000003f800000;
      auVar170._0_8_ = 0x3f8000003f800000;
      auVar170._16_8_ = 0x3f8000003f800000;
      auVar170._24_8_ = 0x3f8000003f800000;
      auVar220 = vmovdqa64_avx512vl(local_13c0);
      local_9a0 = vpandd_avx512vl(auVar170,auVar220);
      local_980 = local_13a0;
      uStack_978 = uStack_1398;
      uStack_970 = uStack_1390;
      uStack_968 = uStack_1388;
      auVar168._16_8_ = uStack_1390;
      auVar168._0_16_ = _local_13a0;
      auVar168._24_8_ = uStack_1388;
      _local_13a0 = vsubps_avx512vl(auVar168,local_9a0);
      local_1320 = auVar221._0_8_;
      uStack_1318 = auVar221._8_8_;
      uStack_1310 = auVar221._16_8_;
      uStack_1308 = auVar221._24_8_;
      local_b20 = local_1320;
      uStack_b18 = uStack_1318;
      uStack_b10 = uStack_1310;
      uStack_b08 = uStack_1308;
      local_b40 = local_13e0._0_8_;
      uStack_b38 = local_13e0._8_8_;
      uStack_b30 = local_13e0._16_8_;
      uStack_b28 = local_13e0._24_8_;
      auVar221 = vaddps_avx512vl(auVar221,local_13e0);
      local_1320 = auVar221._0_8_;
      uStack_1318 = auVar221._8_8_;
      uStack_1310 = auVar221._16_8_;
      uStack_1308 = auVar221._24_8_;
      local_9c0 = local_1320;
      uStack_9b8 = uStack_1318;
      uStack_9b0 = uStack_1310;
      uStack_9a8 = uStack_1308;
      local_9e0 = local_1320;
      uStack_9d8 = uStack_1318;
      uStack_9d0 = uStack_1310;
      uStack_9c8 = uStack_1308;
      local_1400 = vmulps_avx512vl(auVar221,auVar221);
      local_1420._8_4_ = 0x3d9021bb;
      local_1420._0_8_ = 0x3d9021bb3d9021bb;
      local_1420._12_4_ = 0x3d9021bb;
      local_1420._16_4_ = 0x3d9021bb;
      local_1420._20_4_ = 0x3d9021bb;
      auVar209 = local_1420._0_24_;
      local_1420._24_4_ = 0x3d9021bb;
      local_1420._28_4_ = 0x3d9021bb;
      auVar220 = local_1420;
      local_1420._16_8_ = auVar209._16_8_;
      local_1420._24_8_ = auVar220._24_8_;
      local_c00 = 0x3d9021bb3d9021bb;
      uStack_bf8 = local_1420._8_8_;
      uStack_bf0 = local_1420._16_8_;
      uStack_be8 = local_1420._24_8_;
      local_c20 = local_1320;
      uStack_c18 = uStack_1318;
      uStack_c10 = uStack_1310;
      uStack_c08 = uStack_1308;
      local_c40 = 0xbdebd1b8;
      uStack_c3c = 0xbdebd1b8;
      uStack_c38 = 0xbdebd1b8;
      uStack_c34 = 0xbdebd1b8;
      uStack_c30 = 0xbdebd1b8;
      uStack_c2c = 0xbdebd1b8;
      uStack_c28 = 0xbdebd1b8;
      uStack_c24 = 0xbdebd1b8;
      local_be0 = 0xbdebd1b8bdebd1b8;
      uStack_bd8 = 0xbdebd1b8bdebd1b8;
      uStack_bd0 = 0xbdebd1b8bdebd1b8;
      uStack_bc8 = 0xbdebd1b8bdebd1b8;
      local_ba0 = 0x3d9021bb3d9021bb;
      uStack_b98 = local_1420._8_8_;
      uStack_b90 = local_1420._16_8_;
      uStack_b88 = local_1420._24_8_;
      local_bc0 = local_1320;
      uStack_bb8 = uStack_1318;
      uStack_bb0 = uStack_1310;
      uStack_ba8 = uStack_1308;
      auVar165._16_8_ = local_1420._16_8_;
      auVar165._0_16_ = local_1420._0_16_;
      auVar165._24_8_ = local_1420._24_8_;
      auVar164._8_8_ = 0xbdebd1b8bdebd1b8;
      auVar164._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar164._16_8_ = 0xbdebd1b8bdebd1b8;
      auVar164._24_8_ = 0xbdebd1b8bdebd1b8;
      auVar220 = vfmadd213ps_avx512vl(auVar221,auVar165,auVar164);
      local_1420._0_8_ = auVar220._0_8_;
      local_1420._8_8_ = auVar220._8_8_;
      local_1420._16_8_ = auVar220._16_8_;
      local_1420._24_8_ = auVar220._24_8_;
      local_cc0 = local_1420._0_8_;
      uStack_cb8 = local_1420._8_8_;
      uStack_cb0 = local_1420._16_8_;
      uStack_ca8 = local_1420._24_8_;
      local_ce0 = local_1320;
      uStack_cd8 = uStack_1318;
      uStack_cd0 = uStack_1310;
      uStack_cc8 = uStack_1308;
      local_d00 = 0x3def251a;
      uStack_cfc = 0x3def251a;
      uStack_cf8 = 0x3def251a;
      uStack_cf4 = 0x3def251a;
      uStack_cf0 = 0x3def251a;
      uStack_cec = 0x3def251a;
      uStack_ce8 = 0x3def251a;
      uStack_ce4 = 0x3def251a;
      local_ca0 = 0x3def251a3def251a;
      uStack_c98 = 0x3def251a3def251a;
      uStack_c90 = 0x3def251a3def251a;
      uStack_c88 = 0x3def251a3def251a;
      local_c60 = local_1420._0_8_;
      uStack_c58 = local_1420._8_8_;
      uStack_c50 = local_1420._16_8_;
      uStack_c48 = local_1420._24_8_;
      local_c80 = local_1320;
      uStack_c78 = uStack_1318;
      uStack_c70 = uStack_1310;
      uStack_c68 = uStack_1308;
      auVar163._8_8_ = 0x3def251a3def251a;
      auVar163._0_8_ = 0x3def251a3def251a;
      auVar163._16_8_ = 0x3def251a3def251a;
      auVar163._24_8_ = 0x3def251a3def251a;
      auVar220 = vfmadd213ps_avx512vl(auVar221,auVar220,auVar163);
      local_1420._0_8_ = auVar220._0_8_;
      local_1420._8_8_ = auVar220._8_8_;
      local_1420._16_8_ = auVar220._16_8_;
      local_1420._24_8_ = auVar220._24_8_;
      local_d80 = local_1420._0_8_;
      uStack_d78 = local_1420._8_8_;
      uStack_d70 = local_1420._16_8_;
      uStack_d68 = local_1420._24_8_;
      local_da0 = local_1320;
      uStack_d98 = uStack_1318;
      uStack_d90 = uStack_1310;
      uStack_d88 = uStack_1308;
      local_dc0 = 0xbdfe5d4f;
      uStack_dbc = 0xbdfe5d4f;
      uStack_db8 = 0xbdfe5d4f;
      uStack_db4 = 0xbdfe5d4f;
      uStack_db0 = 0xbdfe5d4f;
      uStack_dac = 0xbdfe5d4f;
      uStack_da8 = 0xbdfe5d4f;
      uStack_da4 = 0xbdfe5d4f;
      local_d60 = 0xbdfe5d4fbdfe5d4f;
      uStack_d58 = 0xbdfe5d4fbdfe5d4f;
      uStack_d50 = 0xbdfe5d4fbdfe5d4f;
      uStack_d48 = 0xbdfe5d4fbdfe5d4f;
      local_d20 = local_1420._0_8_;
      uStack_d18 = local_1420._8_8_;
      uStack_d10 = local_1420._16_8_;
      uStack_d08 = local_1420._24_8_;
      local_d40 = local_1320;
      uStack_d38 = uStack_1318;
      uStack_d30 = uStack_1310;
      uStack_d28 = uStack_1308;
      auVar162._8_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar162._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar162._16_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar162._24_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar220 = vfmadd213ps_avx512vl(auVar221,auVar220,auVar162);
      local_1420._0_8_ = auVar220._0_8_;
      local_1420._8_8_ = auVar220._8_8_;
      local_1420._16_8_ = auVar220._16_8_;
      local_1420._24_8_ = auVar220._24_8_;
      local_e40 = local_1420._0_8_;
      uStack_e38 = local_1420._8_8_;
      uStack_e30 = local_1420._16_8_;
      uStack_e28 = local_1420._24_8_;
      local_e60 = local_1320;
      uStack_e58 = uStack_1318;
      uStack_e50 = uStack_1310;
      uStack_e48 = uStack_1308;
      local_e80 = 0x3e11e9bf;
      uStack_e7c = 0x3e11e9bf;
      uStack_e78 = 0x3e11e9bf;
      uStack_e74 = 0x3e11e9bf;
      uStack_e70 = 0x3e11e9bf;
      uStack_e6c = 0x3e11e9bf;
      uStack_e68 = 0x3e11e9bf;
      uStack_e64 = 0x3e11e9bf;
      local_e20 = 0x3e11e9bf3e11e9bf;
      uStack_e18 = 0x3e11e9bf3e11e9bf;
      uStack_e10 = 0x3e11e9bf3e11e9bf;
      uStack_e08 = 0x3e11e9bf3e11e9bf;
      local_de0 = local_1420._0_8_;
      uStack_dd8 = local_1420._8_8_;
      uStack_dd0 = local_1420._16_8_;
      uStack_dc8 = local_1420._24_8_;
      local_e00 = local_1320;
      uStack_df8 = uStack_1318;
      uStack_df0 = uStack_1310;
      uStack_de8 = uStack_1308;
      auVar161._8_8_ = 0x3e11e9bf3e11e9bf;
      auVar161._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar161._16_8_ = 0x3e11e9bf3e11e9bf;
      auVar161._24_8_ = 0x3e11e9bf3e11e9bf;
      auVar220 = vfmadd213ps_avx512vl(auVar221,auVar220,auVar161);
      local_1420._0_8_ = auVar220._0_8_;
      local_1420._8_8_ = auVar220._8_8_;
      local_1420._16_8_ = auVar220._16_8_;
      local_1420._24_8_ = auVar220._24_8_;
      local_f00 = local_1420._0_8_;
      uStack_ef8 = local_1420._8_8_;
      uStack_ef0 = local_1420._16_8_;
      uStack_ee8 = local_1420._24_8_;
      local_f20 = local_1320;
      uStack_f18 = uStack_1318;
      uStack_f10 = uStack_1310;
      uStack_f08 = uStack_1308;
      local_f40 = 0xbe2aae50;
      uStack_f3c = 0xbe2aae50;
      uStack_f38 = 0xbe2aae50;
      uStack_f34 = 0xbe2aae50;
      uStack_f30 = 0xbe2aae50;
      uStack_f2c = 0xbe2aae50;
      uStack_f28 = 0xbe2aae50;
      uStack_f24 = 0xbe2aae50;
      local_ee0 = 0xbe2aae50be2aae50;
      uStack_ed8 = 0xbe2aae50be2aae50;
      uStack_ed0 = 0xbe2aae50be2aae50;
      uStack_ec8 = 0xbe2aae50be2aae50;
      local_ea0 = local_1420._0_8_;
      uStack_e98 = local_1420._8_8_;
      uStack_e90 = local_1420._16_8_;
      uStack_e88 = local_1420._24_8_;
      local_ec0 = local_1320;
      uStack_eb8 = uStack_1318;
      uStack_eb0 = uStack_1310;
      uStack_ea8 = uStack_1308;
      auVar160._8_8_ = 0xbe2aae50be2aae50;
      auVar160._0_8_ = 0xbe2aae50be2aae50;
      auVar160._16_8_ = 0xbe2aae50be2aae50;
      auVar160._24_8_ = 0xbe2aae50be2aae50;
      auVar220 = vfmadd213ps_avx512vl(auVar221,auVar220,auVar160);
      local_1420._0_8_ = auVar220._0_8_;
      local_1420._8_8_ = auVar220._8_8_;
      local_1420._16_8_ = auVar220._16_8_;
      local_1420._24_8_ = auVar220._24_8_;
      local_fc0 = local_1420._0_8_;
      uStack_fb8 = local_1420._8_8_;
      uStack_fb0 = local_1420._16_8_;
      uStack_fa8 = local_1420._24_8_;
      local_fe0 = local_1320;
      uStack_fd8 = uStack_1318;
      uStack_fd0 = uStack_1310;
      uStack_fc8 = uStack_1308;
      local_1000 = 0x3e4cceac;
      uStack_ffc = 0x3e4cceac;
      uStack_ff8 = 0x3e4cceac;
      uStack_ff4 = 0x3e4cceac;
      uStack_ff0 = 0x3e4cceac;
      uStack_fec = 0x3e4cceac;
      uStack_fe8 = 0x3e4cceac;
      uStack_fe4 = 0x3e4cceac;
      local_fa0 = 0x3e4cceac3e4cceac;
      uStack_f98 = 0x3e4cceac3e4cceac;
      uStack_f90 = 0x3e4cceac3e4cceac;
      uStack_f88 = 0x3e4cceac3e4cceac;
      local_f60 = local_1420._0_8_;
      uStack_f58 = local_1420._8_8_;
      uStack_f50 = local_1420._16_8_;
      uStack_f48 = local_1420._24_8_;
      local_f80 = local_1320;
      uStack_f78 = uStack_1318;
      uStack_f70 = uStack_1310;
      uStack_f68 = uStack_1308;
      auVar159._8_8_ = 0x3e4cceac3e4cceac;
      auVar159._0_8_ = 0x3e4cceac3e4cceac;
      auVar159._16_8_ = 0x3e4cceac3e4cceac;
      auVar159._24_8_ = 0x3e4cceac3e4cceac;
      auVar220 = vfmadd213ps_avx512vl(auVar221,auVar220,auVar159);
      local_1420._0_8_ = auVar220._0_8_;
      local_1420._8_8_ = auVar220._8_8_;
      local_1420._16_8_ = auVar220._16_8_;
      local_1420._24_8_ = auVar220._24_8_;
      local_1080 = local_1420._0_8_;
      uStack_1078 = local_1420._8_8_;
      uStack_1070 = local_1420._16_8_;
      uStack_1068 = local_1420._24_8_;
      local_10a0 = local_1320;
      uStack_1098 = uStack_1318;
      uStack_1090 = uStack_1310;
      uStack_1088 = uStack_1308;
      local_10c0 = 0xbe7ffffc;
      uStack_10bc = 0xbe7ffffc;
      uStack_10b8 = 0xbe7ffffc;
      uStack_10b4 = 0xbe7ffffc;
      uStack_10b0 = 0xbe7ffffc;
      uStack_10ac = 0xbe7ffffc;
      uStack_10a8 = 0xbe7ffffc;
      uStack_10a4 = 0xbe7ffffc;
      local_1060 = 0xbe7ffffcbe7ffffc;
      uStack_1058 = 0xbe7ffffcbe7ffffc;
      uStack_1050 = 0xbe7ffffcbe7ffffc;
      uStack_1048 = 0xbe7ffffcbe7ffffc;
      local_1020 = local_1420._0_8_;
      uStack_1018 = local_1420._8_8_;
      uStack_1010 = local_1420._16_8_;
      uStack_1008 = local_1420._24_8_;
      local_1040 = local_1320;
      uStack_1038 = uStack_1318;
      uStack_1030 = uStack_1310;
      uStack_1028 = uStack_1308;
      auVar158._8_8_ = 0xbe7ffffcbe7ffffc;
      auVar158._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar158._16_8_ = 0xbe7ffffcbe7ffffc;
      auVar158._24_8_ = 0xbe7ffffcbe7ffffc;
      auVar220 = vfmadd213ps_avx512vl(auVar221,auVar220,auVar158);
      local_1420._0_8_ = auVar220._0_8_;
      local_1420._8_8_ = auVar220._8_8_;
      local_1420._16_8_ = auVar220._16_8_;
      local_1420._24_8_ = auVar220._24_8_;
      local_1140 = local_1420._0_8_;
      uStack_1138 = local_1420._8_8_;
      uStack_1130 = local_1420._16_8_;
      uStack_1128 = local_1420._24_8_;
      local_1160 = local_1320;
      uStack_1158 = uStack_1318;
      uStack_1150 = uStack_1310;
      uStack_1148 = uStack_1308;
      local_1180 = 0x3eaaaaaa;
      uStack_117c = 0x3eaaaaaa;
      uStack_1178 = 0x3eaaaaaa;
      uStack_1174 = 0x3eaaaaaa;
      uStack_1170 = 0x3eaaaaaa;
      uStack_116c = 0x3eaaaaaa;
      uStack_1168 = 0x3eaaaaaa;
      uStack_1164 = 0x3eaaaaaa;
      local_1120 = 0x3eaaaaaa3eaaaaaa;
      uStack_1118 = 0x3eaaaaaa3eaaaaaa;
      uStack_1110 = 0x3eaaaaaa3eaaaaaa;
      uStack_1108 = 0x3eaaaaaa3eaaaaaa;
      local_10e0 = local_1420._0_8_;
      uStack_10d8 = local_1420._8_8_;
      uStack_10d0 = local_1420._16_8_;
      uStack_10c8 = local_1420._24_8_;
      local_1100 = local_1320;
      uStack_10f8 = uStack_1318;
      uStack_10f0 = uStack_1310;
      uStack_10e8 = uStack_1308;
      auVar157._8_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar157._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar157._16_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar157._24_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar220 = vfmadd213ps_avx512vl(auVar221,auVar220,auVar157);
      local_1420._0_8_ = auVar220._0_8_;
      local_1420._8_8_ = auVar220._8_8_;
      local_1420._16_8_ = auVar220._16_8_;
      local_1420._24_8_ = auVar220._24_8_;
      local_a00 = local_1420._0_8_;
      uStack_9f8 = local_1420._8_8_;
      uStack_9f0 = local_1420._16_8_;
      uStack_9e8 = local_1420._24_8_;
      local_a20 = local_1320;
      uStack_a18 = uStack_1318;
      uStack_a10 = uStack_1310;
      uStack_a08 = uStack_1308;
      auVar220 = vmulps_avx512vl(auVar220,auVar221);
      local_1420._0_8_ = auVar220._0_8_;
      local_1420._8_8_ = auVar220._8_8_;
      local_1420._16_8_ = auVar220._16_8_;
      local_1420._24_8_ = auVar220._24_8_;
      local_a40 = local_1420._0_8_;
      uStack_a38 = local_1420._8_8_;
      uStack_a30 = local_1420._16_8_;
      uStack_a28 = local_1420._24_8_;
      local_a60 = local_1400._0_8_;
      uStack_a58 = local_1400._8_8_;
      uStack_a50 = local_1400._16_8_;
      uStack_a48 = local_1400._24_8_;
      auVar220 = vmulps_avx512vl(auVar220,local_1400);
      local_1420._0_8_ = auVar220._0_8_;
      local_1420._8_8_ = auVar220._8_8_;
      local_1420._16_8_ = auVar220._16_8_;
      local_1420._24_8_ = auVar220._24_8_;
      local_1200 = local_13a0;
      uStack_11f8 = uStack_1398;
      uStack_11f0 = uStack_1390;
      uStack_11e8 = uStack_1388;
      local_1220 = 0xb95e8083;
      uStack_121c = 0xb95e8083;
      uStack_1218 = 0xb95e8083;
      uStack_1214 = 0xb95e8083;
      uStack_1210 = 0xb95e8083;
      uStack_120c = 0xb95e8083;
      uStack_1208 = 0xb95e8083;
      uStack_1204 = 0xb95e8083;
      local_1240 = local_1420._0_8_;
      uStack_1238 = local_1420._8_8_;
      uStack_1230 = local_1420._16_8_;
      uStack_1228 = local_1420._24_8_;
      local_11c0 = 0xb95e8083b95e8083;
      uStack_11b8 = 0xb95e8083b95e8083;
      uStack_11b0 = 0xb95e8083b95e8083;
      uStack_11a8 = 0xb95e8083b95e8083;
      local_11a0 = local_13a0;
      uStack_1198 = uStack_1398;
      uStack_1190 = uStack_1390;
      uStack_1188 = uStack_1388;
      local_11e0 = local_1420._0_8_;
      uStack_11d8 = local_1420._8_8_;
      uStack_11d0 = local_1420._16_8_;
      uStack_11c8 = local_1420._24_8_;
      auVar156._8_8_ = 0xb95e8083b95e8083;
      auVar156._0_8_ = 0xb95e8083b95e8083;
      auVar156._16_8_ = 0xb95e8083b95e8083;
      auVar156._24_8_ = 0xb95e8083b95e8083;
      auVar220 = vfmadd213ps_avx512vl(auVar156,_local_13a0,auVar220);
      local_1420._0_8_ = auVar220._0_8_;
      local_1420._8_8_ = auVar220._8_8_;
      local_1420._16_8_ = auVar220._16_8_;
      local_1420._24_8_ = auVar220._24_8_;
      local_820 = local_1400._0_8_;
      uStack_818 = local_1400._8_8_;
      uStack_810 = local_1400._16_8_;
      uStack_808 = local_1400._24_8_;
      local_840 = 0x3f000000;
      uStack_83c = 0x3f000000;
      uStack_838 = 0x3f000000;
      uStack_834 = 0x3f000000;
      uStack_830 = 0x3f000000;
      uStack_82c = 0x3f000000;
      uStack_828 = 0x3f000000;
      uStack_824 = 0x3f000000;
      local_860 = local_1420._0_8_;
      uStack_858 = local_1420._8_8_;
      uStack_850 = local_1420._16_8_;
      uStack_848 = local_1420._24_8_;
      local_7e0 = 0x3f0000003f000000;
      uStack_7d8 = 0x3f0000003f000000;
      uStack_7d0 = 0x3f0000003f000000;
      uStack_7c8 = 0x3f0000003f000000;
      local_7c0 = local_1400._0_8_;
      uStack_7b8 = local_1400._8_8_;
      uStack_7b0 = local_1400._16_8_;
      uStack_7a8 = local_1400._24_8_;
      local_800 = local_1420._0_8_;
      uStack_7f8 = local_1420._8_8_;
      uStack_7f0 = local_1420._16_8_;
      uStack_7e8 = local_1420._24_8_;
      auVar172._8_8_ = 0x3f0000003f000000;
      auVar172._0_8_ = 0x3f0000003f000000;
      auVar172._16_8_ = 0x3f0000003f000000;
      auVar172._24_8_ = 0x3f0000003f000000;
      auVar220 = vfnmadd213ps_avx512vl(auVar172,local_1400,auVar220);
      local_1420._0_8_ = auVar220._0_8_;
      local_1420._8_8_ = auVar220._8_8_;
      local_1420._16_8_ = auVar220._16_8_;
      local_1420._24_8_ = auVar220._24_8_;
      local_b60 = local_1320;
      uStack_b58 = uStack_1318;
      uStack_b50 = uStack_1310;
      uStack_b48 = uStack_1308;
      local_b80 = local_1420._0_8_;
      uStack_b78 = local_1420._8_8_;
      uStack_b70 = local_1420._16_8_;
      uStack_b68 = local_1420._24_8_;
      auVar220 = vaddps_avx512vl(auVar221,auVar220);
      local_1320 = auVar220._0_8_;
      uStack_1318 = auVar220._8_8_;
      uStack_1310 = auVar220._16_8_;
      uStack_1308 = auVar220._24_8_;
      local_12c0 = local_13a0;
      uStack_12b8 = uStack_1398;
      uStack_12b0 = uStack_1390;
      uStack_12a8 = uStack_1388;
      local_12e0 = 0x3f318000;
      uStack_12dc = 0x3f318000;
      uStack_12d8 = 0x3f318000;
      uStack_12d4 = 0x3f318000;
      uStack_12d0 = 0x3f318000;
      uStack_12cc = 0x3f318000;
      uStack_12c8 = 0x3f318000;
      uStack_12c4 = 0x3f318000;
      local_1300 = local_1320;
      uStack_12f8 = uStack_1318;
      uStack_12f0 = uStack_1310;
      uStack_12e8 = uStack_1308;
      local_1280 = 0x3f3180003f318000;
      uStack_1278 = 0x3f3180003f318000;
      uStack_1270 = 0x3f3180003f318000;
      uStack_1268 = 0x3f3180003f318000;
      local_1260 = local_13a0;
      uStack_1258 = uStack_1398;
      uStack_1250 = uStack_1390;
      uStack_1248 = uStack_1388;
      local_12a0 = local_1320;
      uStack_1298 = uStack_1318;
      uStack_1290 = uStack_1310;
      uStack_1288 = uStack_1308;
      auVar155._8_8_ = 0x3f3180003f318000;
      auVar155._0_8_ = 0x3f3180003f318000;
      auVar155._16_8_ = 0x3f3180003f318000;
      auVar155._24_8_ = 0x3f3180003f318000;
      _local_1320 = vfmadd213ps_avx512vl(auVar155,_local_13a0,auVar220);
      local_6c0 = local_1320;
      uStack_6b8 = uStack_1318;
      uStack_6b0 = uStack_1310;
      uStack_6a8 = uStack_1308;
      local_6e0 = local_1380._0_8_;
      uStack_6d8 = local_1380._8_8_;
      uStack_6d0 = local_1380._16_8_;
      uStack_6c8 = local_1380._24_8_;
      auVar220 = vmovdqa64_avx512vl(local_1380);
      local_1420 = vpord_avx512vl(_local_1320,auVar220);
      local_2180 = local_1420._0_8_;
      uStack_2178 = local_1420._8_8_;
      uStack_2170 = local_1420._16_8_;
      uStack_2168 = local_1420._24_8_;
      local_2144 = 0x3f800000;
      local_2104 = 0x3f800000;
      uStack_2108 = 0x3f800000;
      local_210c = 0x3f800000;
      uStack_2110 = 0x3f800000;
      local_2114 = 0x3f800000;
      uStack_2118 = 0x3f800000;
      local_211c = 0x3f800000;
      local_2120 = 0x3f800000;
      auVar219 = vinsertps_avx512f(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar219 = vinsertps_avx512f(auVar219,ZEXT416(0x3f800000),0x20);
      local_2140 = vinsertps_avx512f(auVar219,ZEXT416(0x3f800000),0x30);
      auVar219 = vinsertps_avx512f(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar219 = vinsertps_avx512f(auVar219,ZEXT416(0x3f800000),0x20);
      auStack_2130 = vinsertps_avx512f(auVar219,ZEXT416(0x3f800000),0x30);
      local_21a0 = local_2140._0_8_;
      uStack_2198 = local_2140._8_8_;
      uStack_2190 = auStack_2130._0_8_;
      uStack_2188 = auStack_2130._8_8_;
      local_2148 = 0x40000000;
      local_20c4 = 0x40000000;
      uStack_20c8 = 0x40000000;
      local_20cc = 0x40000000;
      uStack_20d0 = 0x40000000;
      local_20d4 = 0x40000000;
      uStack_20d8 = 0x40000000;
      local_20dc = 0x40000000;
      local_20e0 = 0x40000000;
      auVar219 = vinsertps_avx512f(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar219 = vinsertps_avx512f(auVar219,ZEXT416(0x40000000),0x20);
      auStack_2100 = vinsertps_avx512f(auVar219,ZEXT416(0x40000000),0x30);
      auVar219 = vinsertps_avx512f(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar219 = vinsertps_avx512f(auVar219,ZEXT416(0x40000000),0x20);
      auStack_20f0 = vinsertps_avx512f(auVar219,ZEXT416(0x40000000),0x30);
      local_21c0 = auStack_2100._0_8_;
      uStack_21b8 = auStack_2100._8_8_;
      uStack_21b0 = auStack_20f0._0_8_;
      uStack_21a8 = auStack_20f0._8_8_;
      local_1fa0 = local_1420._0_8_;
      uStack_1f98 = local_1420._8_8_;
      uStack_1f90 = local_1420._16_8_;
      uStack_1f88 = local_1420._24_8_;
      local_1fc0 = auStack_2100._0_8_;
      uStack_1fb8 = auStack_2100._8_8_;
      uStack_1fb0 = auStack_20f0._0_8_;
      uStack_1fa8 = auStack_20f0._8_8_;
      auVar137._16_8_ = auStack_20f0._0_8_;
      auVar137._0_16_ = auStack_2100;
      auVar137._24_8_ = auStack_20f0._8_8_;
      local_20a0 = vmulps_avx512vl(local_1420,auVar137);
      local_2064 = 0x3f800000;
      local_1fe4 = 0x3f800000;
      uStack_1fe8 = 0x3f800000;
      local_1fec = 0x3f800000;
      uStack_1ff0 = 0x3f800000;
      local_1ff4 = 0x3f800000;
      uStack_1ff8 = 0x3f800000;
      local_1ffc = 0x3f800000;
      local_2000 = 0x3f800000;
      auVar219 = vinsertps_avx512f(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar219 = vinsertps_avx512f(auVar219,ZEXT416(0x3f800000),0x20);
      local_2020 = vinsertps_avx512f(auVar219,ZEXT416(0x3f800000),0x30);
      auVar219 = vinsertps_avx512f(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar219 = vinsertps_avx512f(auVar219,ZEXT416(0x3f800000),0x20);
      auStack_2010 = vinsertps_avx512f(auVar219,ZEXT416(0x3f800000),0x30);
      uStack_20c0 = local_2020._0_8_;
      uVar195 = uStack_20c0;
      uStack_20b8 = local_2020._8_8_;
      uVar196 = uStack_20b8;
      uStack_20b0 = auStack_2010._0_8_;
      uVar197 = uStack_20b0;
      uStack_20a8 = auStack_2010._8_8_;
      uVar198 = uStack_20a8;
      uStack_20c0._0_4_ = local_2020._0_4_;
      uStack_20c0._4_4_ = local_2020._4_4_;
      uStack_20b8._0_4_ = local_2020._8_4_;
      uStack_20b8._4_4_ = local_2020._12_4_;
      uStack_20b0._0_4_ = auStack_2010._0_4_;
      uStack_20b0._4_4_ = auStack_2010._4_4_;
      uStack_20a8._0_4_ = auStack_2010._8_4_;
      uStack_20a8._4_4_ = auStack_2010._12_4_;
      uStack_1fe0 = 0;
      uStack_1fd8 = 0;
      uStack_1fd0 = 0;
      uStack_1fc8 = 0;
      local_1740 = 0;
      uStack_1738 = 0;
      uStack_1730 = 0;
      uStack_1728 = 0;
      local_1760 = local_20a0._0_8_;
      uStack_1758 = local_20a0._8_8_;
      uStack_1750 = local_20a0._16_8_;
      uStack_1748 = local_20a0._24_8_;
      auVar220 = vsubps_avx512vl(ZEXT1632(ZEXT816(0)),local_20a0);
      in_ZMM16 = ZEXT3264(auVar220);
      local_1880 = 0;
      uStack_1878 = 0;
      uStack_1870 = 0;
      uStack_1868 = 0;
      local_1ee0 = 0x3f800000;
      uStack_1edc = 0x3f800000;
      uStack_1ed8 = 0x3f800000;
      uStack_1ed4 = 0x3f800000;
      uStack_1ed0 = 0x3f800000;
      uStack_1ecc = 0x3f800000;
      uStack_1ec8 = 0x3f800000;
      uStack_1ec4 = 0x3f800000;
      local_1e60._0_8_ = auVar220._0_8_;
      local_1e60._8_8_ = auVar220._8_8_;
      local_1e60._16_8_ = auVar220._16_8_;
      local_1e60._24_8_ = auVar220._24_8_;
      local_1840 = local_1e60._0_8_;
      uStack_1838 = local_1e60._8_8_;
      uStack_1830 = local_1e60._16_8_;
      uStack_1828 = local_1e60._24_8_;
      local_1860 = 0x42b0c0a5;
      uStack_185c = 0x42b0c0a5;
      uStack_1858 = 0x42b0c0a5;
      uStack_1854 = 0x42b0c0a5;
      uStack_1850 = 0x42b0c0a5;
      uStack_184c = 0x42b0c0a5;
      uStack_1848 = 0x42b0c0a5;
      uStack_1844 = 0x42b0c0a5;
      auVar149._8_4_ = 0x42b0c0a5;
      auVar149._0_8_ = 0x42b0c0a542b0c0a5;
      auVar149._12_4_ = 0x42b0c0a5;
      auVar149._16_4_ = 0x42b0c0a5;
      auVar149._20_4_ = 0x42b0c0a5;
      auVar149._24_4_ = 0x42b0c0a5;
      auVar149._28_4_ = 0x42b0c0a5;
      auVar220 = vminps_avx(auVar220,auVar149);
      local_1e60._0_8_ = auVar220._0_8_;
      local_1e60._8_8_ = auVar220._8_8_;
      local_1e60._16_8_ = auVar220._16_8_;
      local_1e60._24_8_ = auVar220._24_8_;
      local_18a0 = local_1e60._0_8_;
      uStack_1898 = local_1e60._8_8_;
      uStack_1890 = local_1e60._16_8_;
      uStack_1888 = local_1e60._24_8_;
      local_18c0 = 0xc2b0c0a5;
      uStack_18bc = 0xc2b0c0a5;
      uStack_18b8 = 0xc2b0c0a5;
      uStack_18b4 = 0xc2b0c0a5;
      uStack_18b0 = 0xc2b0c0a5;
      uStack_18ac = 0xc2b0c0a5;
      uStack_18a8 = 0xc2b0c0a5;
      uStack_18a4 = 0xc2b0c0a5;
      auVar148._8_4_ = 0xc2b0c0a5;
      auVar148._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar148._12_4_ = 0xc2b0c0a5;
      auVar148._16_4_ = 0xc2b0c0a5;
      auVar148._20_4_ = 0xc2b0c0a5;
      auVar148._24_4_ = 0xc2b0c0a5;
      auVar148._28_4_ = 0xc2b0c0a5;
      auVar221 = vmaxps_avx(auVar220,auVar148);
      local_1e60._0_8_ = auVar221._0_8_;
      local_1e60._8_8_ = auVar221._8_8_;
      local_1e60._16_8_ = auVar221._16_8_;
      local_1e60._24_8_ = auVar221._24_8_;
      local_1980 = local_1e60._0_8_;
      uStack_1978 = local_1e60._8_8_;
      uStack_1970 = local_1e60._16_8_;
      uStack_1968 = local_1e60._24_8_;
      local_19a0 = 0x3fb8aa3b;
      uStack_199c = 0x3fb8aa3b;
      uStack_1998 = 0x3fb8aa3b;
      uStack_1994 = 0x3fb8aa3b;
      uStack_1990 = 0x3fb8aa3b;
      uStack_198c = 0x3fb8aa3b;
      uStack_1988 = 0x3fb8aa3b;
      uStack_1984 = 0x3fb8aa3b;
      local_19c0 = 0x3f000000;
      uStack_19bc = 0x3f000000;
      uStack_19b8 = 0x3f000000;
      uStack_19b4 = 0x3f000000;
      uStack_19b0 = 0x3f000000;
      uStack_19ac = 0x3f000000;
      uStack_19a8 = 0x3f000000;
      uStack_19a4 = 0x3f000000;
      local_1940 = 0x3fb8aa3b3fb8aa3b;
      uStack_1938 = 0x3fb8aa3b3fb8aa3b;
      uStack_1930 = 0x3fb8aa3b3fb8aa3b;
      uStack_1928 = 0x3fb8aa3b3fb8aa3b;
      local_1960 = 0x3f0000003f000000;
      uStack_1958 = 0x3f0000003f000000;
      uStack_1950 = 0x3f0000003f000000;
      uStack_1948 = 0x3f0000003f000000;
      local_1920 = local_1e60._0_8_;
      uStack_1918 = local_1e60._8_8_;
      uStack_1910 = local_1e60._16_8_;
      uStack_1908 = local_1e60._24_8_;
      auVar147._8_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar147._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar147._16_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar147._24_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar146._8_8_ = 0x3f0000003f000000;
      auVar146._0_8_ = 0x3f0000003f000000;
      auVar146._16_8_ = 0x3f0000003f000000;
      auVar146._24_8_ = 0x3f0000003f000000;
      auVar219 = vfmadd213ps_fma(auVar147,auVar221,auVar146);
      auVar222 = vroundps_avx(ZEXT1632(auVar219),1);
      auVar220 = vcmpps_avx(ZEXT1632(auVar219),auVar222,1);
      local_1f00._0_8_ = auVar220._0_8_;
      local_1f00._8_8_ = auVar220._8_8_;
      local_1f00._16_8_ = auVar220._16_8_;
      local_1f00._24_8_ = auVar220._24_8_;
      local_1720 = 0x3f8000003f800000;
      uStack_1718 = 0x3f8000003f800000;
      uStack_1710 = 0x3f8000003f800000;
      uStack_1708 = 0x3f8000003f800000;
      local_1700 = local_1f00._0_8_;
      uStack_16f8 = local_1f00._8_8_;
      uStack_16f0 = local_1f00._16_8_;
      uStack_16e8 = local_1f00._24_8_;
      auVar150._8_8_ = 0x3f8000003f800000;
      auVar150._0_8_ = 0x3f8000003f800000;
      auVar150._16_8_ = 0x3f8000003f800000;
      auVar150._24_8_ = 0x3f8000003f800000;
      local_1f00 = vpand_avx2(auVar220,auVar150);
      local_1e80 = auVar222._0_8_;
      uStack_1e78 = auVar222._8_8_;
      uStack_1e70 = auVar222._16_8_;
      uStack_1e68 = auVar222._24_8_;
      local_1780 = local_1e80;
      uStack_1778 = uStack_1e78;
      uStack_1770 = uStack_1e70;
      uStack_1768 = uStack_1e68;
      local_17a0 = local_1f00._0_8_;
      uStack_1798 = local_1f00._8_8_;
      uStack_1790 = local_1f00._16_8_;
      uStack_1788 = local_1f00._24_8_;
      local_1ea0 = vsubps_avx(auVar222,local_1f00);
      local_1640 = local_1ea0._0_8_;
      uStack_1638 = local_1ea0._8_8_;
      uStack_1630 = local_1ea0._16_8_;
      uStack_1628 = local_1ea0._24_8_;
      local_1660 = 0x3f318000;
      uStack_165c = 0x3f318000;
      uStack_1658 = 0x3f318000;
      uStack_1654 = 0x3f318000;
      uStack_1650 = 0x3f318000;
      uStack_164c = 0x3f318000;
      uStack_1648 = 0x3f318000;
      uStack_1644 = 0x3f318000;
      local_1680 = local_1e60._0_8_;
      uStack_1678 = local_1e60._8_8_;
      uStack_1670 = local_1e60._16_8_;
      uStack_1668 = local_1e60._24_8_;
      local_1540 = 0x3f3180003f318000;
      uStack_1538 = 0x3f3180003f318000;
      uStack_1530 = 0x3f3180003f318000;
      uStack_1528 = 0x3f3180003f318000;
      local_1520 = local_1ea0._0_8_;
      uStack_1518 = local_1ea0._8_8_;
      uStack_1510 = local_1ea0._16_8_;
      uStack_1508 = local_1ea0._24_8_;
      local_1560 = local_1e60._0_8_;
      uStack_1558 = local_1e60._8_8_;
      uStack_1550 = local_1e60._16_8_;
      uStack_1548 = local_1e60._24_8_;
      auVar151._8_8_ = 0x3f3180003f318000;
      auVar151._0_8_ = 0x3f3180003f318000;
      auVar151._16_8_ = 0x3f3180003f318000;
      auVar151._24_8_ = 0x3f3180003f318000;
      auVar219 = vfnmadd213ps_fma(auVar151,local_1ea0,auVar221);
      local_1e60._0_8_ = auVar219._0_8_;
      local_1e60._8_8_ = auVar219._8_8_;
      local_16a0 = local_1ea0._0_8_;
      uStack_1698 = local_1ea0._8_8_;
      uStack_1690 = local_1ea0._16_8_;
      uStack_1688 = local_1ea0._24_8_;
      local_16c0 = 0xb95e8083;
      uStack_16bc = 0xb95e8083;
      uStack_16b8 = 0xb95e8083;
      uStack_16b4 = 0xb95e8083;
      uStack_16b0 = 0xb95e8083;
      uStack_16ac = 0xb95e8083;
      uStack_16a8 = 0xb95e8083;
      uStack_16a4 = 0xb95e8083;
      local_16e0 = local_1e60._0_8_;
      uStack_16d8 = local_1e60._8_8_;
      uStack_16d0 = 0;
      uStack_16c8 = 0;
      local_14e0 = 0xb95e8083b95e8083;
      uStack_14d8 = 0xb95e8083b95e8083;
      uStack_14d0 = 0xb95e8083b95e8083;
      uStack_14c8 = 0xb95e8083b95e8083;
      local_14c0 = local_1ea0._0_8_;
      uStack_14b8 = local_1ea0._8_8_;
      uStack_14b0 = local_1ea0._16_8_;
      uStack_14a8 = local_1ea0._24_8_;
      local_1500 = local_1e60._0_8_;
      uStack_14f8 = local_1e60._8_8_;
      uStack_14f0 = 0;
      uStack_14e8 = 0;
      auVar152._8_8_ = 0xb95e8083b95e8083;
      auVar152._0_8_ = 0xb95e8083b95e8083;
      auVar152._16_8_ = 0xb95e8083b95e8083;
      auVar152._24_8_ = 0xb95e8083b95e8083;
      auVar5 = vfnmadd213ps_fma(auVar152,local_1ea0,ZEXT1632(auVar219));
      local_1e60._0_8_ = auVar5._0_8_;
      local_1e60._8_8_ = auVar5._8_8_;
      local_17c0 = local_1e60._0_8_;
      uVar205 = local_17c0;
      uStack_17b8 = local_1e60._8_8_;
      uVar206 = uStack_17b8;
      uStack_17b0 = 0;
      uStack_17a8 = 0;
      local_17e0 = local_1e60._0_8_;
      uStack_17d8 = local_1e60._8_8_;
      uStack_17d0 = 0;
      uStack_17c8 = 0;
      local_17c0._0_4_ = auVar5._0_4_;
      local_17c0._4_4_ = auVar5._4_4_;
      uStack_17b8._0_4_ = auVar5._8_4_;
      uStack_17b8._4_4_ = auVar5._12_4_;
      local_1e80._4_4_ = local_17c0._4_4_ * local_17c0._4_4_;
      local_1e80._0_4_ = (float)local_17c0 * (float)local_17c0;
      local_1e20 = local_1e80;
      uStack_1e78._0_4_ = (float)uStack_17b8 * (float)uStack_17b8;
      uStack_1e78._4_4_ = uStack_17b8._4_4_ * uStack_17b8._4_4_;
      auVar6 = _local_1e80;
      _local_1e80 = ZEXT1632(_local_1e80);
      auVar222 = _local_1e80;
      uStack_1f18._0_4_ = 0x39506967;
      local_1f20 = (undefined1  [8])0x3950696739506967;
      uStack_1f18._4_4_ = 0x39506967;
      uStack_1f10._0_4_ = 0x39506967;
      uStack_1f10._4_4_ = 0x39506967;
      auVar209 = _local_1f20;
      uStack_1f08._0_4_ = 0x39506967;
      uStack_1f08._4_4_ = 0x39506967;
      auVar220 = _local_1f20;
      uStack_1f10 = auVar209._16_8_;
      uStack_1f08 = auVar220._24_8_;
      local_1a40 = 0x3950696739506967;
      uStack_1a38 = uStack_1f18;
      uStack_1a30 = uStack_1f10;
      uStack_1a28 = uStack_1f08;
      local_1a60 = local_1e60._0_8_;
      uStack_1a58 = local_1e60._8_8_;
      uStack_1a50 = 0;
      uStack_1a48 = 0;
      local_1a80 = 0x3ab743ce;
      uStack_1a7c = 0x3ab743ce;
      uStack_1a78 = 0x3ab743ce;
      uStack_1a74 = 0x3ab743ce;
      uStack_1a70 = 0x3ab743ce;
      uStack_1a6c = 0x3ab743ce;
      uStack_1a68 = 0x3ab743ce;
      uStack_1a64 = 0x3ab743ce;
      local_1a20 = 0x3ab743ce3ab743ce;
      uStack_1a18 = 0x3ab743ce3ab743ce;
      uStack_1a10 = 0x3ab743ce3ab743ce;
      uStack_1a08 = 0x3ab743ce3ab743ce;
      local_19e0 = 0x3950696739506967;
      uStack_19d8 = uStack_1f18;
      uStack_19d0 = uStack_1f10;
      uStack_19c8 = uStack_1f08;
      local_1a00 = local_1e60._0_8_;
      uStack_19f8 = local_1e60._8_8_;
      uStack_19f0 = 0;
      uStack_19e8 = 0;
      auVar145._16_8_ = uStack_1f10;
      auVar145._0_16_ = _local_1f20;
      auVar145._24_8_ = uStack_1f08;
      auVar144._8_8_ = 0x3ab743ce3ab743ce;
      auVar144._0_8_ = 0x3ab743ce3ab743ce;
      auVar144._16_8_ = 0x3ab743ce3ab743ce;
      auVar144._24_8_ = 0x3ab743ce3ab743ce;
      auVar219 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar145,auVar144);
      local_1f20 = auVar219._0_8_;
      uStack_1f18 = auVar219._8_8_;
      local_1b00 = local_1f20;
      uStack_1af8 = uStack_1f18;
      uStack_1af0 = 0;
      uStack_1ae8 = 0;
      local_1b20 = local_1e60._0_8_;
      uStack_1b18 = local_1e60._8_8_;
      uStack_1b10 = 0;
      uStack_1b08 = 0;
      local_1b40 = 0x3c088908;
      uStack_1b3c = 0x3c088908;
      uStack_1b38 = 0x3c088908;
      uStack_1b34 = 0x3c088908;
      uStack_1b30 = 0x3c088908;
      uStack_1b2c = 0x3c088908;
      uStack_1b28 = 0x3c088908;
      uStack_1b24 = 0x3c088908;
      local_1ae0 = 0x3c0889083c088908;
      uStack_1ad8 = 0x3c0889083c088908;
      uStack_1ad0 = 0x3c0889083c088908;
      uStack_1ac8 = 0x3c0889083c088908;
      local_1aa0 = local_1f20;
      uStack_1a98 = uStack_1f18;
      uStack_1a90 = 0;
      uStack_1a88 = 0;
      local_1ac0 = local_1e60._0_8_;
      uStack_1ab8 = local_1e60._8_8_;
      uStack_1ab0 = 0;
      uStack_1aa8 = 0;
      auVar143._8_8_ = 0x3c0889083c088908;
      auVar143._0_8_ = 0x3c0889083c088908;
      auVar143._16_8_ = 0x3c0889083c088908;
      auVar143._24_8_ = 0x3c0889083c088908;
      auVar219 = vfmadd213ps_fma(ZEXT1632(auVar5),ZEXT1632(auVar219),auVar143);
      local_1f20 = auVar219._0_8_;
      uStack_1f18 = auVar219._8_8_;
      local_1bc0 = local_1f20;
      uStack_1bb8 = uStack_1f18;
      uStack_1bb0 = 0;
      uStack_1ba8 = 0;
      local_1be0 = local_1e60._0_8_;
      uStack_1bd8 = local_1e60._8_8_;
      uStack_1bd0 = 0;
      uStack_1bc8 = 0;
      local_1c00 = 0x3d2aa9c1;
      uStack_1bfc = 0x3d2aa9c1;
      uStack_1bf8 = 0x3d2aa9c1;
      uStack_1bf4 = 0x3d2aa9c1;
      uStack_1bf0 = 0x3d2aa9c1;
      uStack_1bec = 0x3d2aa9c1;
      uStack_1be8 = 0x3d2aa9c1;
      uStack_1be4 = 0x3d2aa9c1;
      local_1ba0 = 0x3d2aa9c13d2aa9c1;
      uStack_1b98 = 0x3d2aa9c13d2aa9c1;
      uStack_1b90 = 0x3d2aa9c13d2aa9c1;
      uStack_1b88 = 0x3d2aa9c13d2aa9c1;
      local_1b60 = local_1f20;
      uStack_1b58 = uStack_1f18;
      uStack_1b50 = 0;
      uStack_1b48 = 0;
      local_1b80 = local_1e60._0_8_;
      uStack_1b78 = local_1e60._8_8_;
      uStack_1b70 = 0;
      uStack_1b68 = 0;
      auVar142._8_8_ = 0x3d2aa9c13d2aa9c1;
      auVar142._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar142._16_8_ = 0x3d2aa9c13d2aa9c1;
      auVar142._24_8_ = 0x3d2aa9c13d2aa9c1;
      auVar219 = vfmadd213ps_fma(ZEXT1632(auVar5),ZEXT1632(auVar219),auVar142);
      local_1f20 = auVar219._0_8_;
      uStack_1f18 = auVar219._8_8_;
      local_1c80 = local_1f20;
      uStack_1c78 = uStack_1f18;
      uStack_1c70 = 0;
      uStack_1c68 = 0;
      local_1ca0 = local_1e60._0_8_;
      uStack_1c98 = local_1e60._8_8_;
      uStack_1c90 = 0;
      uStack_1c88 = 0;
      local_1cc0 = 0x3e2aaaaa;
      uStack_1cbc = 0x3e2aaaaa;
      uStack_1cb8 = 0x3e2aaaaa;
      uStack_1cb4 = 0x3e2aaaaa;
      uStack_1cb0 = 0x3e2aaaaa;
      uStack_1cac = 0x3e2aaaaa;
      uStack_1ca8 = 0x3e2aaaaa;
      uStack_1ca4 = 0x3e2aaaaa;
      local_1c60 = 0x3e2aaaaa3e2aaaaa;
      uStack_1c58 = 0x3e2aaaaa3e2aaaaa;
      uStack_1c50 = 0x3e2aaaaa3e2aaaaa;
      uStack_1c48 = 0x3e2aaaaa3e2aaaaa;
      local_1c20 = local_1f20;
      uStack_1c18 = uStack_1f18;
      uStack_1c10 = 0;
      uStack_1c08 = 0;
      local_1c40 = local_1e60._0_8_;
      uStack_1c38 = local_1e60._8_8_;
      uStack_1c30 = 0;
      uStack_1c28 = 0;
      auVar141._8_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar141._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar141._16_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar141._24_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar219 = vfmadd213ps_fma(ZEXT1632(auVar5),ZEXT1632(auVar219),auVar141);
      local_1f20 = auVar219._0_8_;
      uStack_1f18 = auVar219._8_8_;
      local_1d40 = local_1f20;
      uStack_1d38 = uStack_1f18;
      uStack_1d30 = 0;
      uStack_1d28 = 0;
      local_1d60 = local_1e60._0_8_;
      uStack_1d58 = local_1e60._8_8_;
      uStack_1d50 = 0;
      uStack_1d48 = 0;
      local_1d80 = 0x3f000000;
      uStack_1d7c = 0x3f000000;
      uStack_1d78 = 0x3f000000;
      uStack_1d74 = 0x3f000000;
      uStack_1d70 = 0x3f000000;
      uStack_1d6c = 0x3f000000;
      uStack_1d68 = 0x3f000000;
      uStack_1d64 = 0x3f000000;
      local_1d20 = 0x3f0000003f000000;
      uStack_1d18 = 0x3f0000003f000000;
      uStack_1d10 = 0x3f0000003f000000;
      uStack_1d08 = 0x3f0000003f000000;
      local_1ce0 = local_1f20;
      uStack_1cd8 = uStack_1f18;
      uStack_1cd0 = 0;
      uStack_1cc8 = 0;
      local_1d00 = local_1e60._0_8_;
      uStack_1cf8 = local_1e60._8_8_;
      uStack_1cf0 = 0;
      uStack_1ce8 = 0;
      auVar140._8_8_ = 0x3f0000003f000000;
      auVar140._0_8_ = 0x3f0000003f000000;
      auVar140._16_8_ = 0x3f0000003f000000;
      auVar140._24_8_ = 0x3f0000003f000000;
      auVar219 = vfmadd213ps_fma(ZEXT1632(auVar5),ZEXT1632(auVar219),auVar140);
      local_1f20 = auVar219._0_8_;
      uStack_1f18 = auVar219._8_8_;
      uStack_1e78 = auVar6._8_8_;
      local_1e00 = local_1f20;
      uStack_1df8 = uStack_1f18;
      uStack_1df0 = 0;
      uStack_1de8 = 0;
      uStack_1e18 = uStack_1e78;
      uStack_1e10 = 0;
      uStack_1e08 = 0;
      local_1e40 = local_1e60._0_8_;
      uStack_1e38 = local_1e60._8_8_;
      uStack_1e30 = 0;
      uStack_1e28 = 0;
      local_1da0 = local_1f20;
      uStack_1d98 = uStack_1f18;
      uStack_1d90 = 0;
      uStack_1d88 = 0;
      local_1dc0 = local_1e20;
      uStack_1db8 = uStack_1e78;
      uStack_1db0 = 0;
      uStack_1da8 = 0;
      local_1de0 = local_1e60._0_8_;
      uStack_1dd8 = local_1e60._8_8_;
      uStack_1dd0 = 0;
      uStack_1dc8 = 0;
      auVar219 = vfmadd213ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar219),ZEXT1632(auVar5));
      local_1f20 = auVar219._0_8_;
      uStack_1f18 = auVar219._8_8_;
      local_1900 = 0x3f8000003f800000;
      uStack_18f8 = 0x3f8000003f800000;
      uStack_18f0 = 0x3f8000003f800000;
      uStack_18e8 = 0x3f8000003f800000;
      local_18e0 = local_1f20;
      uVar199 = local_18e0;
      uStack_18d8 = uStack_1f18;
      uVar200 = uStack_18d8;
      uStack_18d0 = 0;
      uStack_18c8 = 0;
      local_18e0._0_4_ = auVar219._0_4_;
      local_18e0._4_4_ = auVar219._4_4_;
      uStack_18d8._0_4_ = auVar219._8_4_;
      uStack_18d8._4_4_ = auVar219._12_4_;
      local_1f20._4_4_ = local_18e0._4_4_ + 1.0;
      local_1f20._0_4_ = (float)local_18e0 + 1.0;
      uStack_1f18._0_4_ = (float)uStack_18d8 + 1.0;
      uStack_1f18._4_4_ = uStack_18d8._4_4_ + 1.0;
      uStack_1f10._0_4_ = 0x3f800000;
      uStack_1f10._4_4_ = 0x3f800000;
      auVar209 = _local_1f20;
      uStack_1f08._0_4_ = 0x3f800000;
      uStack_1f08._4_4_ = 0x3f800000;
      auVar221 = _local_1f20;
      local_1620 = local_1ea0._0_8_;
      uVar207 = local_1620;
      uStack_1618 = local_1ea0._8_8_;
      uVar208 = uStack_1618;
      uStack_1610 = local_1ea0._16_8_;
      uVar211 = uStack_1610;
      uStack_1608 = local_1ea0._24_8_;
      uVar212 = uStack_1608;
      local_1620._0_4_ = local_1ea0._0_4_;
      local_1620._4_4_ = local_1ea0._4_4_;
      uStack_1618._0_4_ = local_1ea0._8_4_;
      uStack_1618._4_4_ = local_1ea0._12_4_;
      uStack_1610._0_4_ = local_1ea0._16_4_;
      uStack_1610._4_4_ = local_1ea0._20_4_;
      uStack_1608._0_4_ = local_1ea0._24_4_;
      uStack_1608._4_4_ = local_1ea0._28_4_;
      local_1ec0._4_4_ = (int)local_1620._4_4_;
      local_1ec0._0_4_ = (int)(float)local_1620;
      local_1ec0._8_4_ = (int)(float)uStack_1618;
      local_1ec0._12_4_ = (int)uStack_1618._4_4_;
      local_1ec0._16_4_ = (int)(float)uStack_1610;
      local_1ec0._20_4_ = (int)uStack_1610._4_4_;
      auVar210 = local_1ec0._0_24_;
      local_1ec0._24_4_ = (int)(float)uStack_1608;
      local_1ec0._28_4_ = (int)uStack_1608._4_4_;
      auVar220 = local_1ec0;
      local_1ec0._16_8_ = auVar210._16_8_;
      local_1ec0._24_8_ = auVar220._24_8_;
      local_15e0 = local_1ec0._0_8_;
      uStack_15d8 = local_1ec0._8_8_;
      uStack_15d0 = local_1ec0._16_8_;
      uStack_15c8 = local_1ec0._24_8_;
      local_1600 = 0x7f0000007f;
      uStack_15f8 = 0x7f0000007f;
      uStack_15f0 = 0x7f0000007f;
      uStack_15e8 = 0x7f0000007f;
      local_1480 = local_1ec0._0_8_;
      uStack_1478 = local_1ec0._8_8_;
      uStack_1470 = local_1ec0._16_8_;
      uStack_1468 = local_1ec0._24_8_;
      local_14a0 = 0x7f0000007f;
      uStack_1498 = 0x7f0000007f;
      uStack_1490 = 0x7f0000007f;
      uStack_1488 = 0x7f0000007f;
      auVar154._16_8_ = local_1ec0._16_8_;
      auVar154._0_16_ = local_1ec0._0_16_;
      auVar154._24_8_ = local_1ec0._24_8_;
      auVar153._8_8_ = 0x7f0000007f;
      auVar153._0_8_ = 0x7f0000007f;
      auVar153._16_8_ = 0x7f0000007f;
      auVar153._24_8_ = 0x7f0000007f;
      auVar220 = vpaddd_avx2(auVar154,auVar153);
      local_1ec0._0_8_ = auVar220._0_8_;
      local_1ec0._8_8_ = auVar220._8_8_;
      local_1ec0._16_8_ = auVar220._16_8_;
      local_1ec0._24_8_ = auVar220._24_8_;
      local_15a0 = local_1ec0._0_8_;
      uStack_1598 = local_1ec0._8_8_;
      uStack_1590 = local_1ec0._16_8_;
      uStack_1588 = local_1ec0._24_8_;
      local_15a4 = 0x17;
      local_1440 = local_1ec0._0_8_;
      uStack_1438 = local_1ec0._8_8_;
      uStack_1430 = local_1ec0._16_8_;
      uStack_1428 = local_1ec0._24_8_;
      local_1444 = 0x17;
      local_1ec0 = vpslld_avx2(auVar220,ZEXT416(0x17));
      local_1580 = local_1ec0._0_8_;
      uStack_1578 = local_1ec0._8_8_;
      uStack_1570 = local_1ec0._16_8_;
      uStack_1568 = local_1ec0._24_8_;
      local_1f40 = local_1ec0._0_8_;
      uStack_1f38 = local_1ec0._8_8_;
      uStack_1f30 = local_1ec0._16_8_;
      uStack_1f28 = local_1ec0._24_8_;
      uStack_1f10 = auVar209._16_8_;
      uStack_1f08 = auVar221._24_8_;
      local_1800 = local_1f20;
      uStack_17f8 = uStack_1f18;
      uStack_17f0 = uStack_1f10;
      uStack_17e8 = uStack_1f08;
      local_1820 = local_1ec0._0_8_;
      uVar201 = local_1820;
      uStack_1818 = local_1ec0._8_8_;
      uVar202 = uStack_1818;
      uStack_1810 = local_1ec0._16_8_;
      uVar203 = uStack_1810;
      uStack_1808 = local_1ec0._24_8_;
      uVar204 = uStack_1808;
      local_1820._0_4_ = local_1ec0._0_4_;
      local_1820._4_4_ = local_1ec0._4_4_;
      uStack_1818._0_4_ = local_1ec0._8_4_;
      uStack_1818._4_4_ = local_1ec0._12_4_;
      uStack_1810._0_4_ = local_1ec0._16_4_;
      uStack_1810._4_4_ = local_1ec0._20_4_;
      uStack_1808._0_4_ = local_1ec0._24_4_;
      local_1f20._0_4_ = ((float)local_18e0 + 1.0) * (float)local_1820;
      local_1f20._4_4_ = (local_18e0._4_4_ + 1.0) * local_1820._4_4_;
      uStack_1818._0_4_ = ((float)uStack_18d8 + 1.0) * (float)uStack_1818;
      uStack_1818._4_4_ = (uStack_18d8._4_4_ + 1.0) * uStack_1818._4_4_;
      uStack_1f18._0_4_ = (float)uStack_1818;
      uStack_1f18._4_4_ = uStack_1818._4_4_;
      uStack_1f10._0_4_ = (float)uStack_1810 * 1.0;
      uStack_1f10._4_4_ = uStack_1810._4_4_ * 1.0;
      auVar209 = _local_1f20;
      uStack_1f08._0_4_ = (float)uStack_1808 * 1.0;
      uStack_1f08._4_4_ = 0x3f800000;
      auVar221 = _local_1f20;
      uStack_1f10 = auVar209._16_8_;
      uStack_1f08 = auVar221._24_8_;
      local_2040 = (float)uStack_20c0;
      fStack_203c = uStack_20c0._4_4_;
      fStack_2038 = (float)uStack_20b8;
      fStack_2034 = uStack_20b8._4_4_;
      fStack_2030 = (float)uStack_20b0;
      fStack_202c = uStack_20b0._4_4_;
      fStack_2028 = (float)uStack_20a8;
      fStack_2024 = uStack_20a8._4_4_;
      local_2060 = local_1f20;
      uStack_2058 = uStack_1f18;
      uStack_2050 = uStack_1f10;
      uStack_2048 = uStack_1f08;
      local_1f80 = (float)uStack_20c0 + (float)local_1f20._0_4_;
      fStack_1f7c = uStack_20c0._4_4_ + (float)local_1f20._4_4_;
      fStack_1f78 = (float)uStack_20b8 + (float)uStack_1818;
      fStack_1f74 = uStack_20b8._4_4_ + uStack_1818._4_4_;
      fStack_1f70 = (float)uStack_20b0 + (float)uStack_1810 * 1.0;
      fStack_1f6c = uStack_20b0._4_4_ + uStack_1810._4_4_ * 1.0;
      fStack_1f68 = (float)uStack_20a8 + (float)uStack_1808 * 1.0;
      fStack_1f64 = uStack_20a8._4_4_ + 1.0;
      local_1f60 = (float)uStack_20c0;
      fStack_1f5c = uStack_20c0._4_4_;
      fStack_1f58 = (float)uStack_20b8;
      fStack_1f54 = uStack_20b8._4_4_;
      fStack_1f50 = (float)uStack_20b0;
      fStack_1f4c = uStack_20b0._4_4_;
      fStack_1f48 = (float)uStack_20a8;
      fStack_1f44 = uStack_20a8._4_4_;
      auVar139._16_4_ = (float)uStack_20b0;
      auVar139._0_16_ = local_2020;
      auVar139._20_4_ = uStack_20b0._4_4_;
      auVar139._24_4_ = (float)uStack_20a8;
      auVar139._28_4_ = uStack_20a8._4_4_;
      auVar138._4_4_ = fStack_1f7c;
      auVar138._0_4_ = local_1f80;
      auVar138._8_4_ = fStack_1f78;
      auVar138._12_4_ = fStack_1f74;
      auVar138._16_4_ = fStack_1f70;
      auVar138._20_4_ = fStack_1f6c;
      auVar138._24_4_ = fStack_1f68;
      auVar138._28_4_ = fStack_1f64;
      auVar220 = vrcpps_avx(auVar138);
      auVar1._4_4_ = uStack_20c0._4_4_ * auVar220._4_4_;
      auVar1._0_4_ = (float)uStack_20c0 * auVar220._0_4_;
      auVar1._8_4_ = (float)uStack_20b8 * auVar220._8_4_;
      auVar1._12_4_ = uStack_20b8._4_4_ * auVar220._12_4_;
      auVar1._16_4_ = (float)uStack_20b0 * auVar220._16_4_;
      auVar1._20_4_ = uStack_20b0._4_4_ * auVar220._20_4_;
      auVar1._24_4_ = (float)uStack_20a8 * auVar220._24_4_;
      auVar1._28_4_ = uStack_20a8._4_4_;
      auVar219 = vfmsub213ps_fma(auVar1,auVar138,auVar139);
      auVar219 = vfnmadd213ps_fma(ZEXT1632(auVar219),auVar220,auVar1);
      local_760 = ZEXT1632(auVar219);
      local_780 = auStack_2100._0_8_;
      uStack_778 = auStack_2100._8_8_;
      uStack_770 = auStack_20f0._0_8_;
      uStack_768 = auStack_20f0._8_8_;
      local_7a0 = local_2140._0_8_;
      uStack_798 = local_2140._8_8_;
      uStack_790 = auStack_2130._0_8_;
      uStack_788 = auStack_2130._8_8_;
      auVar174._16_8_ = auStack_20f0._0_8_;
      auVar174._0_16_ = auStack_2100;
      auVar174._24_8_ = auStack_20f0._8_8_;
      auVar173._16_8_ = auStack_2130._0_8_;
      auVar173._0_16_ = local_2140;
      auVar173._24_8_ = auStack_2130._8_8_;
      auVar238._8_4_ = 0x80000000;
      auVar238._0_8_ = 0x8000000080000000;
      auVar238._12_4_ = 0x80000000;
      auVar238._16_4_ = 0x80000000;
      auVar238._20_4_ = 0x80000000;
      auVar238._24_4_ = 0x80000000;
      auVar238._28_4_ = 0x80000000;
      auVar219 = vfmadd213ps_fma(auVar174,local_760,auVar173 ^ auVar238);
      local_3860 = local_7720;
      uStack_3858 = uStack_7718;
      uStack_3850 = uStack_7710;
      uStack_3848 = uStack_7708;
      local_3880._0_4_ = auVar219._0_4_;
      local_3880._4_4_ = auVar219._4_4_;
      fStack_3878 = auVar219._8_4_;
      fStack_3874 = auVar219._12_4_;
      local_7180._4_4_ = fVar223 * (float)local_3880._4_4_;
      local_7180._0_4_ = fVar224 * (float)local_3880._0_4_;
      uStack_7178._0_4_ = fVar233 * fStack_3878;
      uStack_7178._4_4_ = fVar234 * fStack_3874;
      uStack_7170._0_4_ = fVar235 * 0.0;
      uStack_7170._4_4_ = fVar236 * 0.0;
      uStack_7168._0_4_ = fVar237 * 0.0;
      local_3b80 = uVar177;
      uStack_3b78 = uVar178;
      uStack_3b70 = uVar179;
      uStack_3b68 = uVar180;
      _local_3880 = ZEXT1632(auVar219);
      _local_37a0 = auVar106;
      _local_3700 = auVar111;
      local_36e0 = ZEXT1632(auVar218);
      local_3160 = uVar181;
      uStack_3158 = uVar182;
      uStack_3150 = uVar183;
      uStack_3148 = uVar184;
      local_30a0 = uVar185;
      uStack_3098 = uVar186;
      uStack_3090 = uVar187;
      uStack_3088 = uVar188;
      local_3040 = uVar189;
      uStack_3038 = uVar190;
      local_25a0 = uVar191;
      uStack_2598 = uVar192;
      uStack_2590 = uVar193;
      uStack_2588 = uVar194;
      uStack_20c0 = uVar195;
      uStack_20b8 = uVar196;
      uStack_20b0 = uVar197;
      uStack_20a8 = uVar198;
      _local_1f20 = auVar221;
      _local_1e80 = auVar222;
      local_1e60 = ZEXT1632(auVar5);
      local_18e0 = uVar199;
      uStack_18d8 = uVar200;
      local_1820 = uVar201;
      uStack_1818 = uVar202;
      uStack_1810 = uVar203;
      uStack_1808 = uVar204;
      local_17c0 = uVar205;
      uStack_17b8 = uVar206;
      local_1620 = uVar207;
      uStack_1618 = uVar208;
      uStack_1610 = uVar211;
      uStack_1608 = uVar212;
      local_ae0 = uVar213;
      uStack_ad8 = uVar214;
      uStack_ad0 = uVar215;
      uStack_ac8 = uVar216;
      break;
    case 6:
      local_7148 = local_7428;
      local_7150 = 0;
      local_710c = *(uint *)*local_7428;
      auVar219 = vinsertps_avx(ZEXT416(local_710c),ZEXT416(local_710c),0x10);
      auVar219 = vinsertps_avx(auVar219,ZEXT416(local_710c),0x20);
      local_4160 = vinsertps_avx(auVar219,ZEXT416(local_710c),0x30);
      auVar219 = vinsertps_avx(ZEXT416(local_710c),ZEXT416(local_710c),0x10);
      auVar219 = vinsertps_avx(auVar219,ZEXT416(local_710c),0x20);
      auStack_4150 = vinsertps_avx(auVar219,ZEXT416(local_710c),0x30);
      local_7220 = local_4160._0_8_;
      uStack_7218 = local_4160._8_8_;
      uStack_7210 = auStack_4150._0_8_;
      uStack_7208 = auStack_4150._8_8_;
      local_7158 = local_7428;
      local_7160 = 1;
      local_7110 = *(uint *)(*local_7428 + 4);
      auVar219 = vinsertps_avx(ZEXT416(local_7110),ZEXT416(local_7110),0x10);
      auVar219 = vinsertps_avx(auVar219,ZEXT416(local_7110),0x20);
      local_41a0 = vinsertps_avx(auVar219,ZEXT416(local_7110),0x30);
      auVar219 = vinsertps_avx(ZEXT416(local_7110),ZEXT416(local_7110),0x10);
      auVar219 = vinsertps_avx(auVar219,ZEXT416(local_7110),0x20);
      auStack_4190 = vinsertps_avx(auVar219,ZEXT416(local_7110),0x30);
      local_7240 = local_41a0._0_8_;
      uStack_7238 = local_41a0._8_8_;
      uStack_7230 = auStack_4190._0_8_;
      uStack_7228 = auStack_4190._8_8_;
      local_3aa0 = local_7720;
      uStack_3a98 = uStack_7718;
      uStack_3a90 = uStack_7710;
      uStack_3a88 = uStack_7708;
      local_3ac0 = local_4160._0_8_;
      uStack_3ab8 = local_4160._8_8_;
      uStack_3ab0 = auStack_4150._0_8_;
      uStack_3aa8 = auStack_4150._8_8_;
      local_3a64 = 0x3f800000;
      local_3964 = 0x3f800000;
      local_3968 = 0x3f800000;
      local_396c = 0x3f800000;
      local_3970 = 0x3f800000;
      local_3974 = 0x3f800000;
      local_3978 = 0x3f800000;
      local_397c = 0x3f800000;
      local_3980 = 0x3f800000;
      auVar219 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar219 = vinsertps_avx(auVar219,ZEXT416(0x3f800000),0x20);
      local_39a0 = vinsertps_avx(auVar219,ZEXT416(0x3f800000),0x30);
      auVar219 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar219 = vinsertps_avx(auVar219,ZEXT416(0x3f800000),0x20);
      auStack_3990 = vinsertps_avx(auVar219,ZEXT416(0x3f800000),0x30);
      uStack_3b00 = local_39a0._0_8_;
      uStack_3af8 = local_39a0._8_8_;
      uStack_3af0 = auStack_3990._0_8_;
      uStack_3ae8 = auStack_3990._8_8_;
      local_3a20 = local_7720;
      uStack_3a18 = uStack_7718;
      uStack_3a10 = uStack_7710;
      uStack_3a08 = uStack_7708;
      local_3a40 = local_4160._0_8_;
      uStack_3a38 = local_4160._8_8_;
      uStack_3a30 = auStack_4150._0_8_;
      uStack_3a28 = auStack_4150._8_8_;
      local_3a60 = local_41a0._0_8_;
      uStack_3a58 = local_41a0._8_8_;
      uStack_3a50 = auStack_4190._0_8_;
      uStack_3a48 = auStack_4190._8_8_;
      local_39c0 = local_7720;
      uStack_39b8 = uStack_7718;
      uStack_39b0 = uStack_7710;
      uStack_39a8 = uStack_7708;
      local_39e0 = local_4160._0_8_;
      uStack_39d8 = local_4160._8_8_;
      uStack_39d0 = auStack_4150._0_8_;
      uStack_39c8 = auStack_4150._8_8_;
      local_3a00 = local_41a0._0_8_;
      uStack_39f8 = local_41a0._8_8_;
      uStack_39f0 = auStack_4190._0_8_;
      uStack_39e8 = auStack_4190._8_8_;
      auVar222._8_8_ = uStack_7718;
      auVar222._0_8_ = local_7720;
      auVar222._16_8_ = uStack_7710;
      auVar222._24_8_ = uStack_7708;
      auVar221._16_8_ = auStack_4150._0_8_;
      auVar221._0_16_ = local_4160;
      auVar221._24_8_ = auStack_4150._8_8_;
      auVar220._16_8_ = auStack_4190._0_8_;
      auVar220._0_16_ = local_41a0;
      auVar220._24_8_ = auStack_4190._8_8_;
      auVar219 = vfmadd213ps_fma(auVar221,auVar222,auVar220);
      local_3ae0._0_8_ = auVar219._0_8_;
      local_3ae0._8_8_ = auVar219._8_8_;
      local_3920 = 0;
      uStack_3918 = 0;
      uStack_3910 = 0;
      uStack_3908 = 0;
      local_3940 = local_3ae0._0_8_;
      uStack_3938 = local_3ae0._8_8_;
      uStack_3930 = 0;
      uStack_3928 = 0;
      local_3960 = 0;
      uStack_3958 = 0;
      uStack_3950 = 0;
      uStack_3948 = 0;
      auVar220 = vmaxps_avx(ZEXT1632(auVar219),ZEXT1632(ZEXT816(0)));
      local_3ae0._0_8_ = auVar220._0_8_;
      local_3ae0._8_8_ = auVar220._8_8_;
      local_3ae0._16_8_ = auVar220._16_8_;
      local_3ae0._24_8_ = auVar220._24_8_;
      local_38e0 = local_3ae0._0_8_;
      uStack_38d8 = local_3ae0._8_8_;
      uStack_38d0 = local_3ae0._16_8_;
      uStack_38c8 = local_3ae0._24_8_;
      local_3900 = local_39a0._0_8_;
      uStack_38f8 = local_39a0._8_8_;
      uStack_38f0 = auStack_3990._0_8_;
      uStack_38e8 = auStack_3990._8_8_;
      auVar106._16_8_ = auStack_3990._0_8_;
      auVar106._0_16_ = local_39a0;
      auVar106._24_8_ = auStack_3990._8_8_;
      local_3ae0 = vminps_avx(auVar220,auVar106);
      local_38a0 = local_3ae0._0_8_;
      uVar177 = local_38a0;
      uStack_3898 = local_3ae0._8_8_;
      uVar178 = uStack_3898;
      uStack_3890 = local_3ae0._16_8_;
      uVar179 = uStack_3890;
      uStack_3888 = local_3ae0._24_8_;
      uVar180 = uStack_3888;
      local_38c0 = local_7720;
      uStack_38b8 = uStack_7718;
      uStack_38b0 = uStack_7710;
      uStack_38a8 = uStack_7708;
      local_38a0._0_4_ = local_3ae0._0_4_;
      local_38a0._4_4_ = local_3ae0._4_4_;
      uStack_3898._0_4_ = local_3ae0._8_4_;
      uStack_3898._4_4_ = local_3ae0._12_4_;
      uStack_3890._0_4_ = local_3ae0._16_4_;
      uStack_3890._4_4_ = local_3ae0._20_4_;
      uStack_3888._0_4_ = local_3ae0._24_4_;
      uStack_3888._4_4_ = local_3ae0._28_4_;
      local_7180._4_4_ = local_38a0._4_4_ * fVar223;
      local_7180._0_4_ = (float)local_38a0 * fVar224;
      uStack_7178._0_4_ = (float)uStack_3898 * fVar233;
      uStack_7178._4_4_ = uStack_3898._4_4_ * fVar234;
      uStack_7170._0_4_ = (float)uStack_3890 * fVar235;
      uStack_7170._4_4_ = uStack_3890._4_4_ * fVar236;
      uStack_7168._0_4_ = (float)uStack_3888 * fVar237;
      uStack_7168._4_4_ = (float)uStack_3888._4_4_;
      local_4180 = local_7110;
      local_417c = local_7110;
      local_4178 = local_7110;
      local_4174 = local_7110;
      local_4170 = local_7110;
      local_416c = local_7110;
      local_4168 = local_7110;
      local_4164 = local_7110;
      local_4140 = local_710c;
      local_413c = local_710c;
      local_4138 = local_710c;
      local_4134 = local_710c;
      local_4130 = local_710c;
      local_412c = local_710c;
      local_4128 = local_710c;
      local_4124 = local_710c;
      local_38a0 = uVar177;
      uStack_3898 = uVar178;
      uStack_3890 = uVar179;
      uStack_3888 = uVar180;
      break;
    default:
      uStack_7178 = uStack_7718;
      local_7180 = (undefined1  [8])local_7720;
      uStack_7170 = uStack_7710;
      uStack_7168 = uStack_7708;
    }
    local_7720 = local_7180;
    uStack_7718 = uStack_7178;
    uStack_7710 = uStack_7170;
    uStack_7708 = uStack_7168;
    local_7748 = *local_7408;
    local_70c8 = (undefined8 *)(local_7748 + (long)local_7448 * 4);
    local_7100 = local_7180;
    uStack_70f8 = uStack_7178;
    uStack_70f0 = uStack_7170;
    uStack_70e8 = uStack_7168;
    *local_70c8 = local_7180;
    local_70c8[1] = uStack_7178;
    local_70c8[2] = uStack_7170;
    local_70c8[3] = uStack_7168;
    local_6500 = local_7740;
    uStack_64f8 = uStack_7738;
    uStack_64f0 = uStack_7730;
    uStack_64e8 = uStack_7728;
    local_6160 = local_62a0._0_8_;
    uStack_6158 = local_62a0._8_8_;
    uStack_6150 = local_62a0._16_8_;
    uStack_6148 = local_62a0._24_8_;
    local_6140 = local_6280._0_8_;
    uStack_6138 = local_6280._8_8_;
    uStack_6130 = local_6280._16_8_;
    uStack_6128 = local_6280._24_8_;
  }
  local_743c = local_7440 * 8 + local_743c;
  local_7440 = local_7430 - local_743c >> 2;
  for (local_774c = 0; local_774c < local_7440; local_774c = local_774c + 1) {
    local_7750 = local_743c + local_774c * 4;
    memset(&local_7760,0,0x10);
    if (local_7438 != 0) {
      local_7760 = *(float *)(local_7438 + (long)local_7750 * 4);
      fStack_775c = *(float *)(local_7438 + (long)(local_7750 + 1) * 4);
      fStack_7758 = *(float *)(local_7438 + (long)(local_7750 + 2) * 4);
      fStack_7754 = *(float *)(local_7438 + (long)(local_7750 + 3) * 4);
    }
    local_248 = local_7410;
    local_24c = local_7750;
    local_7768 = (undefined1 (*) [16])
                 (*local_7410 +
                 (long)*(int *)((long)local_7410 + 0x2c) * (long)local_7750 * local_7410[2]);
    local_25c = local_7750 + 1;
    local_258 = local_7410;
    local_7770 = (undefined1 (*) [16])
                 (*local_7410 +
                 (long)*(int *)((long)local_7410 + 0x2c) * (long)local_25c * local_7410[2]);
    local_26c = local_7750 + 2;
    local_268 = local_7410;
    local_7778 = (undefined1 (*) [16])
                 (*local_7410 +
                 (long)*(int *)((long)local_7410 + 0x2c) * (long)local_26c * local_7410[2]);
    local_27c = local_7750 + 3;
    local_278 = local_7410;
    local_7780 = (undefined1 (*) [16])
                 (*local_7410 +
                 (long)*(int *)((long)local_7410 + 0x2c) * (long)local_27c * local_7410[2]);
    local_73f0 = local_7400;
    local_7788 = (undefined1 (*) [32])*local_7400;
    local_778c = 0;
    local_4000 = 0;
    uStack_3ff8 = 0;
    uStack_3ff0 = 0;
    uStack_3fe8 = 0;
    local_77c0._0_16_ = ZEXT816(0);
    local_4020 = 0;
    uStack_4018 = 0;
    uStack_4010 = 0;
    uStack_4008 = 0;
    local_77e0._0_16_ = ZEXT816(0);
    local_4040 = 0;
    uStack_4038 = 0;
    uStack_4030 = 0;
    uStack_4028 = 0;
    local_7800._0_16_ = ZEXT816(0);
    local_4060 = 0;
    uStack_4058 = 0;
    uStack_4050 = 0;
    uStack_4048 = 0;
    local_7820._0_16_ = ZEXT816(0);
    auVar6 = local_7820._0_16_;
    auVar5 = local_7800._0_16_;
    auVar218 = local_77e0._0_16_;
    auVar219 = local_77c0._0_16_;
    while( true ) {
      local_77c0 = ZEXT1632(auVar219);
      auVar106 = local_77c0;
      local_77e0 = ZEXT1632(auVar218);
      auVar222 = local_77e0;
      local_7800 = ZEXT1632(auVar5);
      auVar221 = local_7800;
      local_7820 = ZEXT1632(auVar6);
      auVar220 = local_7820;
      if (local_742c <= local_778c + 7) break;
      local_7258 = local_7788;
      local_6fc0 = *(undefined8 *)*local_7788;
      uStack_6fb8 = *(undefined8 *)(*local_7788 + 8);
      uStack_6fb0 = *(undefined8 *)(*local_7788 + 0x10);
      uStack_6fa8 = *(undefined8 *)(*local_7788 + 0x18);
      local_78 = local_7768;
      local_130 = vlddqu_avx(*local_7768);
      auVar1 = vcvtph2ps_f16c(local_130);
      local_80 = local_7770;
      local_140 = vlddqu_avx(*local_7770);
      auVar2 = vcvtph2ps_f16c(local_140);
      local_88 = local_7778;
      local_150 = vlddqu_avx(*local_7778);
      auVar3 = vcvtph2ps_f16c(local_150);
      local_90 = local_7780;
      local_160 = vlddqu_avx(*local_7780);
      auVar4 = vcvtph2ps_f16c(local_160);
      local_7860 = auVar1._0_8_;
      local_6da0 = local_7860;
      uStack_7858 = auVar1._8_8_;
      uStack_6d98 = uStack_7858;
      uStack_7850 = auVar1._16_8_;
      uStack_6d90 = uStack_7850;
      uStack_7848 = auVar1._24_8_;
      uStack_6d88 = uStack_7848;
      local_77c0._0_8_ = auVar219._0_8_;
      local_6dc0 = local_77c0._0_8_;
      local_77c0._8_8_ = auVar219._8_8_;
      uStack_6db8 = local_77c0._8_8_;
      uStack_6db0 = 0;
      uStack_6da8 = 0;
      local_6d40 = local_7860;
      uStack_6d38 = uStack_7858;
      uStack_6d30 = uStack_7850;
      uStack_6d28 = uStack_7848;
      local_6d60 = local_77c0._0_8_;
      uStack_6d58 = local_77c0._8_8_;
      uStack_6d50 = 0;
      uStack_6d48 = 0;
      auVar219 = vfmadd213ps_fma(auVar1,*local_7788,auVar106);
      local_7880 = auVar2._0_8_;
      local_6e60 = local_7880;
      uStack_7878 = auVar2._8_8_;
      uStack_6e58 = uStack_7878;
      uStack_7870 = auVar2._16_8_;
      uStack_6e50 = uStack_7870;
      uStack_7868 = auVar2._24_8_;
      uStack_6e48 = uStack_7868;
      local_77e0._0_8_ = auVar218._0_8_;
      local_6e80 = local_77e0._0_8_;
      local_77e0._8_8_ = auVar218._8_8_;
      uStack_6e78 = local_77e0._8_8_;
      uStack_6e70 = 0;
      uStack_6e68 = 0;
      local_6e00 = local_7880;
      uStack_6df8 = uStack_7878;
      uStack_6df0 = uStack_7870;
      uStack_6de8 = uStack_7868;
      local_6e20 = local_77e0._0_8_;
      uStack_6e18 = local_77e0._8_8_;
      uStack_6e10 = 0;
      uStack_6e08 = 0;
      auVar218 = vfmadd213ps_fma(auVar2,*local_7788,auVar222);
      local_78a0 = auVar3._0_8_;
      local_6f20 = local_78a0;
      uStack_7898 = auVar3._8_8_;
      uStack_6f18 = uStack_7898;
      uStack_7890 = auVar3._16_8_;
      uStack_6f10 = uStack_7890;
      uStack_7888 = auVar3._24_8_;
      uStack_6f08 = uStack_7888;
      local_7800._0_8_ = auVar5._0_8_;
      local_6f40 = local_7800._0_8_;
      local_7800._8_8_ = auVar5._8_8_;
      uStack_6f38 = local_7800._8_8_;
      uStack_6f30 = 0;
      uStack_6f28 = 0;
      local_6ec0 = local_78a0;
      uStack_6eb8 = uStack_7898;
      uStack_6eb0 = uStack_7890;
      uStack_6ea8 = uStack_7888;
      local_6ee0 = local_7800._0_8_;
      uStack_6ed8 = local_7800._8_8_;
      uStack_6ed0 = 0;
      uStack_6ec8 = 0;
      auVar5 = vfmadd213ps_fma(auVar3,*local_7788,auVar221);
      local_78c0 = auVar4._0_8_;
      local_6fe0 = local_78c0;
      uStack_78b8 = auVar4._8_8_;
      uStack_6fd8 = uStack_78b8;
      uStack_78b0 = auVar4._16_8_;
      uStack_6fd0 = uStack_78b0;
      uStack_78a8 = auVar4._24_8_;
      uStack_6fc8 = uStack_78a8;
      local_7820._0_8_ = auVar6._0_8_;
      local_7000 = local_7820._0_8_;
      local_7820._8_8_ = auVar6._8_8_;
      uStack_6ff8 = local_7820._8_8_;
      uStack_6ff0 = 0;
      uStack_6fe8 = 0;
      local_6f80 = local_78c0;
      uStack_6f78 = uStack_78b8;
      uStack_6f70 = uStack_78b0;
      uStack_6f68 = uStack_78a8;
      local_6fa0 = local_7820._0_8_;
      uStack_6f98 = local_7820._8_8_;
      uStack_6f90 = 0;
      uStack_6f88 = 0;
      auVar6 = vfmadd213ps_fma(auVar4,*local_7788,auVar220);
      local_7788 = local_7788 + 1;
      local_7768 = local_7768 + 1;
      local_7770 = local_7770 + 1;
      local_7778 = local_7778 + 1;
      local_7780 = local_7780 + 1;
      local_778c = local_778c + 8;
      local_6f60 = local_6fc0;
      uStack_6f58 = uStack_6fb8;
      uStack_6f50 = uStack_6fb0;
      uStack_6f48 = uStack_6fa8;
      local_6f00 = local_6fc0;
      uStack_6ef8 = uStack_6fb8;
      uStack_6ef0 = uStack_6fb0;
      uStack_6ee8 = uStack_6fa8;
      local_6ea0 = local_6fc0;
      uStack_6e98 = uStack_6fb8;
      uStack_6e90 = uStack_6fb0;
      uStack_6e88 = uStack_6fa8;
      local_6e40 = local_6fc0;
      uStack_6e38 = uStack_6fb8;
      uStack_6e30 = uStack_6fb0;
      uStack_6e28 = uStack_6fa8;
      local_6de0 = local_6fc0;
      uStack_6dd8 = uStack_6fb8;
      uStack_6dd0 = uStack_6fb0;
      uStack_6dc8 = uStack_6fa8;
      local_6d80 = local_6fc0;
      uStack_6d78 = uStack_6fb8;
      uStack_6d70 = uStack_6fb0;
      uStack_6d68 = uStack_6fa8;
      local_6d20 = local_6fc0;
      uStack_6d18 = uStack_6fb8;
      uStack_6d10 = uStack_6fb0;
      uStack_6d08 = uStack_6fa8;
    }
    local_5e10 = (undefined1  [16])0x0;
    local_78d0 = ZEXT816(0);
    local_5e20 = (undefined1  [16])0x0;
    local_78e0 = ZEXT816(0);
    local_5e30 = (undefined1  [16])0x0;
    local_78f0 = ZEXT816(0);
    local_5e40 = (undefined1  [16])0x0;
    local_7900 = ZEXT816(0);
    while( true ) {
      if (local_742c <= local_778c + 3) break;
      local_73c8 = local_7788;
      local_6680 = *(undefined8 *)*local_7788;
      uStack_6678 = *(undefined8 *)(*local_7788 + 8);
      local_5ea8 = local_7768;
      local_5ec0 = *(ulong *)*local_7768;
      uStack_5eb8 = 0;
      uStack_178 = 0;
      auVar226._8_8_ = 0;
      auVar226._0_8_ = local_5ec0;
      auVar219 = vcvtph2ps_f16c(auVar226);
      local_5ec8 = local_7770;
      local_5ee0 = *(ulong *)*local_7770;
      uStack_5ed8 = 0;
      uStack_188 = 0;
      auVar227._8_8_ = 0;
      auVar227._0_8_ = local_5ee0;
      auVar218 = vcvtph2ps_f16c(auVar227);
      local_5ee8 = local_7778;
      local_5f00 = *(ulong *)*local_7778;
      uStack_5ef8 = 0;
      uStack_198 = 0;
      auVar228._8_8_ = 0;
      auVar228._0_8_ = local_5f00;
      auVar5 = vcvtph2ps_f16c(auVar228);
      local_5f08 = local_7780;
      local_5f20 = *(ulong *)*local_7780;
      uStack_5f18 = 0;
      uStack_1a8 = 0;
      auVar229._8_8_ = 0;
      auVar229._0_8_ = local_5f20;
      auVar6 = vcvtph2ps_f16c(auVar229);
      local_7920 = auVar219._0_8_;
      local_6570 = local_7920;
      uStack_7918 = auVar219._8_8_;
      uStack_6568 = uStack_7918;
      local_6580 = local_78d0._0_8_;
      uStack_6578 = local_78d0._8_8_;
      local_6540 = local_7920;
      uStack_6538 = uStack_7918;
      local_6550 = local_78d0._0_8_;
      uStack_6548 = local_78d0._8_8_;
      local_78d0 = vfmadd213ps_fma(auVar219,*(undefined1 (*) [16])*local_7788,local_78d0);
      local_7930 = auVar218._0_8_;
      local_65d0 = local_7930;
      uStack_7928 = auVar218._8_8_;
      uStack_65c8 = uStack_7928;
      local_65e0 = local_78e0._0_8_;
      uStack_65d8 = local_78e0._8_8_;
      local_65a0 = local_7930;
      uStack_6598 = uStack_7928;
      local_65b0 = local_78e0._0_8_;
      uStack_65a8 = local_78e0._8_8_;
      local_78e0 = vfmadd213ps_fma(auVar218,*(undefined1 (*) [16])*local_7788,local_78e0);
      local_7940 = auVar5._0_8_;
      local_6630 = local_7940;
      uStack_7938 = auVar5._8_8_;
      uStack_6628 = uStack_7938;
      local_6640 = local_78f0._0_8_;
      uStack_6638 = local_78f0._8_8_;
      local_6600 = local_7940;
      uStack_65f8 = uStack_7938;
      local_6610 = local_78f0._0_8_;
      uStack_6608 = local_78f0._8_8_;
      local_78f0 = vfmadd213ps_fma(auVar5,*(undefined1 (*) [16])*local_7788,local_78f0);
      local_7950 = auVar6._0_8_;
      local_6690 = local_7950;
      uStack_7948 = auVar6._8_8_;
      uStack_6688 = uStack_7948;
      local_66a0 = local_7900._0_8_;
      uStack_6698 = local_7900._8_8_;
      local_6660 = local_7950;
      uStack_6658 = uStack_7948;
      local_6670 = local_7900._0_8_;
      uStack_6668 = local_7900._8_8_;
      local_7900 = vfmadd213ps_fma(auVar6,*(undefined1 (*) [16])*local_7788,local_7900);
      local_7788 = (undefined1 (*) [32])(*local_7788 + 0x10);
      local_7768 = (undefined1 (*) [16])(*local_7768 + 8);
      local_7770 = (undefined1 (*) [16])(*local_7770 + 8);
      local_7778 = (undefined1 (*) [16])(*local_7778 + 8);
      local_7780 = (undefined1 (*) [16])(*local_7780 + 8);
      local_778c = local_778c + 4;
      local_6650 = local_6680;
      uStack_6648 = uStack_6678;
      local_6620 = local_6680;
      uStack_6618 = uStack_6678;
      local_65f0 = local_6680;
      uStack_65e8 = uStack_6678;
      local_65c0 = local_6680;
      uStack_65b8 = uStack_6678;
      local_6590 = local_6680;
      uStack_6588 = uStack_6678;
      local_6560 = local_6680;
      uStack_6558 = uStack_6678;
      local_6530 = local_6680;
      uStack_6528 = uStack_6678;
      local_1b0 = local_5f20;
      local_1a0 = local_5f00;
      local_190 = local_5ee0;
      local_180 = local_5ec0;
    }
    for (; local_778c < local_742c; local_778c = local_778c + 1) {
      fVar224 = *(float *)*local_7788;
      fVar223 = float16_to_float32(*(unsigned_short *)*local_7768);
      local_7760 = fVar224 * fVar223 + local_7760;
      fVar224 = *(float *)*local_7788;
      fVar223 = float16_to_float32(*(unsigned_short *)*local_7770);
      fStack_775c = fVar224 * fVar223 + fStack_775c;
      fVar224 = *(float *)*local_7788;
      fVar223 = float16_to_float32(*(unsigned_short *)*local_7778);
      fStack_7758 = fVar224 * fVar223 + fStack_7758;
      fVar224 = *(float *)*local_7788;
      fVar223 = float16_to_float32(*(unsigned_short *)*local_7780);
      fStack_7754 = fVar224 * fVar223 + fStack_7754;
      local_7788 = (undefined1 (*) [32])(*local_7788 + 4);
      local_7768 = (undefined1 (*) [16])(*local_7768 + 2);
      local_7770 = (undefined1 (*) [16])(*local_7770 + 2);
      local_7778 = (undefined1 (*) [16])(*local_7778 + 2);
      local_7780 = (undefined1 (*) [16])(*local_7780 + 2);
    }
    local_73d0 = &local_7760;
    local_6450 = CONCAT44(fStack_775c,local_7760);
    uStack_6448 = CONCAT44(fStack_7754,fStack_7758);
    local_60a8 = local_77c0;
    local_60b0 = local_77e0;
    local_60b8 = local_7800;
    local_60c0 = local_7820;
    local_440 = local_77c0._0_8_;
    uStack_438 = local_77c0._8_8_;
    uStack_430 = local_77c0._16_8_;
    uStack_428 = local_77c0._24_8_;
    local_460 = local_77e0._0_8_;
    uStack_458 = local_77e0._8_8_;
    uStack_450 = local_77e0._16_8_;
    uStack_448 = local_77e0._24_8_;
    local_60e0 = vhaddps_avx(local_77c0,local_77e0);
    local_480 = local_7800._0_8_;
    uStack_478 = local_7800._8_8_;
    uStack_470 = local_7800._16_8_;
    uStack_468 = local_7800._24_8_;
    local_4a0 = local_7820._0_8_;
    uStack_498 = local_7820._8_8_;
    uStack_490 = local_7820._16_8_;
    uStack_488 = local_7820._24_8_;
    local_6100 = vhaddps_avx(local_7800,local_7820);
    local_4c0 = local_60e0._0_8_;
    uStack_4b8 = local_60e0._8_8_;
    uStack_4b0 = local_60e0._16_8_;
    uStack_4a8 = local_60e0._24_8_;
    local_4e0 = local_6100._0_8_;
    uStack_4d8 = local_6100._8_8_;
    uStack_4d0 = local_6100._16_8_;
    uStack_4c8 = local_6100._24_8_;
    local_6120 = vhaddps_avx(local_60e0,local_6100);
    local_580 = local_6120._0_8_;
    uStack_578 = local_6120._8_8_;
    uStack_570 = local_6120._16_8_;
    uStack_568 = local_6120._24_8_;
    local_6090._0_4_ = local_6120._16_4_;
    local_6090._4_4_ = local_6120._20_4_;
    uStack_6088._0_4_ = local_6120._24_4_;
    uStack_6088._4_4_ = local_6120._28_4_;
    local_60a0._0_4_ = local_6120._0_4_;
    local_60a0._4_4_ = local_6120._4_4_;
    uStack_6098._0_4_ = local_6120._8_4_;
    uStack_6098._4_4_ = local_6120._12_4_;
    local_6440 = (float)local_6090 + (float)local_60a0;
    fStack_643c = local_6090._4_4_ + local_60a0._4_4_;
    fStack_6438 = (float)uStack_6088 + (float)uStack_6098;
    fStack_6434 = uStack_6088._4_4_ + uStack_6098._4_4_;
    local_7960 = CONCAT44(fStack_643c + fStack_775c,local_6440 + local_7760);
    uStack_7958 = CONCAT44(fStack_6434 + fStack_7754,fStack_6438 + fStack_7758);
    local_6050 = local_78d0._0_8_;
    uStack_6048 = local_78d0._8_8_;
    local_6060 = local_78e0._0_8_;
    uStack_6058 = local_78e0._8_8_;
    auVar219 = vunpcklps_avx(local_78d0,local_78e0);
    local_6070 = local_78f0._0_8_;
    uStack_6068 = local_78f0._8_8_;
    local_6080 = local_7900._0_8_;
    uStack_6078 = local_7900._8_8_;
    auVar7 = vunpcklps_avx(local_78f0,local_7900);
    local_6010 = local_78d0._0_8_;
    uStack_6008 = local_78d0._8_8_;
    local_6020 = local_78e0._0_8_;
    uStack_6018 = local_78e0._8_8_;
    auVar218 = vunpckhps_avx(local_78d0,local_78e0);
    local_6030 = local_78f0._0_8_;
    uStack_6028 = local_78f0._8_8_;
    local_6040 = local_7900._0_8_;
    uStack_6038 = local_7900._8_8_;
    auVar5 = vunpckhps_avx(local_78f0,local_7900);
    local_79a0 = auVar219._0_8_;
    local_5fd0 = local_79a0;
    uStack_7998 = auVar219._8_8_;
    uStack_5fc8 = uStack_7998;
    local_7980 = auVar7._0_8_;
    local_5fe0 = local_7980;
    uStack_7978 = auVar7._8_8_;
    uStack_5fd8 = uStack_7978;
    auVar6 = vunpcklpd_avx(auVar219,auVar7);
    local_5f50 = local_7980;
    uStack_5f48 = uStack_7978;
    local_5f60 = local_79a0;
    uStack_5f58 = uStack_7998;
    auVar219 = vunpckhpd_avx(auVar219,auVar7);
    local_7990 = auVar218._0_8_;
    local_5ff0 = local_7990;
    uStack_7988 = auVar218._8_8_;
    uStack_5fe8 = uStack_7988;
    local_7970 = auVar5._0_8_;
    local_6000 = local_7970;
    uStack_7968 = auVar5._8_8_;
    uStack_5ff8 = uStack_7968;
    auVar7 = vunpcklpd_avx(auVar218,auVar5);
    local_5f70 = local_7970;
    uStack_5f68 = uStack_7968;
    local_5f80 = local_7990;
    uStack_5f78 = uStack_7988;
    auVar218 = vunpckhpd_avx(auVar218,auVar5);
    local_78d0._0_8_ = auVar6._0_8_;
    local_78d0._8_8_ = auVar6._8_8_;
    local_6470 = local_7960;
    uStack_6468 = uStack_7958;
    local_6460._0_4_ = auVar6._0_4_;
    local_6460._4_4_ = auVar6._4_4_;
    uStack_6458._0_4_ = auVar6._8_4_;
    uStack_6458._4_4_ = auVar6._12_4_;
    local_6460._0_4_ = (float)local_6460 + local_6440 + local_7760;
    local_6460._4_4_ = local_6460._4_4_ + fStack_643c + fStack_775c;
    uStack_6458._0_4_ = (float)uStack_6458 + fStack_6438 + fStack_7758;
    uStack_6458._4_4_ = uStack_6458._4_4_ + fStack_6434 + fStack_7754;
    local_7960 = CONCAT44(local_6460._4_4_,(float)local_6460);
    uStack_7958 = CONCAT44(uStack_6458._4_4_,(float)uStack_6458);
    local_78e0._0_8_ = auVar219._0_8_;
    local_78e0._8_8_ = auVar219._8_8_;
    local_6490 = local_7960;
    uStack_6488 = uStack_7958;
    local_6480._0_4_ = auVar219._0_4_;
    local_6480._4_4_ = auVar219._4_4_;
    uStack_6478._0_4_ = auVar219._8_4_;
    uStack_6478._4_4_ = auVar219._12_4_;
    local_6480._0_4_ = (float)local_6480 + (float)local_6460;
    local_6480._4_4_ = local_6480._4_4_ + local_6460._4_4_;
    uStack_6478._0_4_ = (float)uStack_6478 + (float)uStack_6458;
    uStack_6478._4_4_ = uStack_6478._4_4_ + uStack_6458._4_4_;
    local_7960 = CONCAT44(local_6480._4_4_,(float)local_6480);
    uStack_7958 = CONCAT44(uStack_6478._4_4_,(float)uStack_6478);
    local_78f0._0_8_ = auVar7._0_8_;
    local_78f0._8_8_ = auVar7._8_8_;
    local_64b0 = local_7960;
    uStack_64a8 = uStack_7958;
    local_64a0._0_4_ = auVar7._0_4_;
    local_64a0._4_4_ = auVar7._4_4_;
    uStack_6498._0_4_ = auVar7._8_4_;
    uStack_6498._4_4_ = auVar7._12_4_;
    local_64a0._0_4_ = (float)local_64a0 + (float)local_6480;
    local_64a0._4_4_ = local_64a0._4_4_ + local_6480._4_4_;
    uStack_6498._0_4_ = (float)uStack_6498 + (float)uStack_6478;
    uStack_6498._4_4_ = uStack_6498._4_4_ + uStack_6478._4_4_;
    local_7960 = CONCAT44(local_64a0._4_4_,(float)local_64a0);
    uStack_7958 = CONCAT44(uStack_6498._4_4_,(float)uStack_6498);
    local_7900._0_8_ = auVar218._0_8_;
    local_7900._8_8_ = auVar218._8_8_;
    local_64d0 = local_7960;
    uStack_64c8 = uStack_7958;
    local_64c0._0_4_ = auVar218._0_4_;
    local_64c0._4_4_ = auVar218._4_4_;
    uStack_64b8._0_4_ = auVar218._8_4_;
    uStack_64b8._4_4_ = auVar218._12_4_;
    local_64c0._0_4_ = (float)local_64c0 + (float)local_64a0;
    local_64c0._4_4_ = local_64c0._4_4_ + local_64a0._4_4_;
    uStack_64b8._0_4_ = (float)uStack_64b8 + (float)uStack_6498;
    uStack_64b8._4_4_ = uStack_64b8._4_4_ + uStack_6498._4_4_;
    local_7960 = CONCAT44(local_64c0._4_4_,(float)local_64c0);
    uStack_7958 = CONCAT44(uStack_64b8._4_4_,(float)uStack_64b8);
    local_7370 = local_7960;
    uStack_7368 = uStack_7958;
    switch(local_741c) {
    case 1:
      local_5e60 = (undefined1  [16])0x0;
      local_5e90 = local_7960;
      uStack_5e88 = uStack_7958;
      local_5ea0 = 0;
      uStack_5e98 = 0;
      auVar13._8_8_ = uStack_7958;
      auVar13._0_8_ = local_7960;
      _local_7360 = vmaxps_avx(auVar13,ZEXT816(0));
      break;
    case 2:
      local_7308 = local_7428;
      local_7310 = 0;
      local_5dd4 = *(float *)*local_7428;
      local_5dd0 = local_7960;
      uStack_5dc8 = uStack_7958;
      local_5d30 = (undefined1  [16])0x0;
      local_5d50 = 0;
      uStack_5d48 = 0;
      local_5d60 = local_7960;
      uStack_5d58 = uStack_7958;
      auVar16._8_8_ = uStack_7958;
      auVar16._0_8_ = local_7960;
      local_5df0 = vmaxps_avx(ZEXT816(0),auVar16);
      local_5d40 = (undefined1  [16])0x0;
      local_5d10 = 0;
      uStack_5d08 = 0;
      local_5d20 = local_7960;
      uStack_5d18 = uStack_7958;
      auVar17._8_8_ = uStack_7958;
      auVar17._0_8_ = local_7960;
      local_5e00 = vminps_avx(ZEXT816(0),auVar17);
      local_5d70._4_4_ = local_5dd4;
      local_5d70._0_4_ = local_5dd4;
      local_5d70._8_4_ = local_5dd4;
      local_5d70._12_4_ = local_5dd4;
      local_5d80 = local_5e00._0_8_;
      uVar179 = local_5d80;
      uStack_5d78 = local_5e00._8_8_;
      uVar180 = uStack_5d78;
      local_5d80._0_4_ = local_5e00._0_4_;
      local_5d80._4_4_ = local_5e00._4_4_;
      uStack_5d78._0_4_ = local_5e00._8_4_;
      uStack_5d78._4_4_ = local_5e00._12_4_;
      local_5da0 = local_5dd4 * (float)local_5d80;
      fStack_5d9c = local_5dd4 * local_5d80._4_4_;
      fStack_5d98 = local_5dd4 * (float)uStack_5d78;
      fStack_5d94 = local_5dd4 * uStack_5d78._4_4_;
      local_5d90 = local_5df0._0_8_;
      uVar177 = local_5d90;
      uStack_5d88 = local_5df0._8_8_;
      uVar178 = uStack_5d88;
      local_5d90._0_4_ = local_5df0._0_4_;
      local_5d90._4_4_ = local_5df0._4_4_;
      uStack_5d88._0_4_ = local_5df0._8_4_;
      uStack_5d88._4_4_ = local_5df0._12_4_;
      local_7360._4_4_ = local_5d90._4_4_ + fStack_5d9c;
      local_7360._0_4_ = (float)local_5d90 + local_5da0;
      uStack_7358._0_4_ = (float)uStack_5d88 + fStack_5d98;
      uStack_7358._4_4_ = uStack_5d88._4_4_ + fStack_5d94;
      local_5dc0 = local_5dd4;
      fStack_5dbc = local_5dd4;
      fStack_5db8 = local_5dd4;
      fStack_5db4 = local_5dd4;
      local_5da4 = local_5dd4;
      local_5d90 = uVar177;
      uStack_5d88 = uVar178;
      local_5d80 = uVar179;
      uStack_5d78 = uVar180;
      break;
    case 3:
      local_7318 = local_7428;
      local_7320 = 0;
      local_72a0 = *(undefined4 *)*local_7428;
      local_7390 = CONCAT44(local_72a0,local_72a0);
      uStack_7388 = CONCAT44(local_72a0,local_72a0);
      local_7328 = local_7428;
      local_7330 = 1;
      local_72c0 = *(undefined4 *)(*local_7428 + 4);
      local_73a0 = CONCAT44(local_72c0,local_72c0);
      uStack_7398 = CONCAT44(local_72c0,local_72c0);
      local_5e70 = local_7960;
      uStack_5e68 = uStack_7958;
      auVar15._8_8_ = uStack_7958;
      auVar15._0_8_ = local_7960;
      auVar14._8_8_ = uStack_7388;
      auVar14._0_8_ = local_7390;
      local_5cf0 = vmaxps_avx(auVar15,auVar14);
      auVar18._8_8_ = uStack_7398;
      auVar18._0_8_ = local_73a0;
      _local_7360 = vminps_avx(local_5cf0,auVar18);
      uStack_72bc = local_72c0;
      uStack_72b8 = local_72c0;
      uStack_72b4 = local_72c0;
      local_72a4 = local_72c0;
      uStack_729c = local_72a0;
      uStack_7298 = local_72a0;
      uStack_7294 = local_72a0;
      local_7284 = local_72a0;
      local_5e80 = local_7390;
      uStack_5e78 = uStack_7388;
      local_5d00 = local_73a0;
      uStack_5cf8 = uStack_7398;
      break;
    case 4:
      local_5cd0 = local_7960;
      uStack_5cc8 = uStack_7958;
      local_5ca4 = 0x3f800000;
      local_5cc0 = 0x3f800000;
      uStack_5cbc = 0x3f800000;
      uStack_5cb8 = 0x3f800000;
      uStack_5cb4 = 0x3f800000;
      local_5ce0 = 0x3f8000003f800000;
      uStack_5cd8 = 0x3f8000003f800000;
      local_5c90._8_8_ = 0x3f8000003f800000;
      local_5c90._0_8_ = 0x3f8000003f800000;
      local_5c80 = (undefined1  [16])0x0;
      local_52c0 = 0;
      uStack_52b8 = 0;
      local_52d0 = local_7960;
      uStack_52c8 = uStack_7958;
      auVar39._8_8_ = uStack_7958;
      auVar39._0_8_ = local_7960;
      auVar219 = vsubps_avx(ZEXT816(0),auVar39);
      local_5340 = (undefined1  [16])0x0;
      local_56c0 = 0x3f800000;
      uStack_56bc = 0x3f800000;
      uStack_56b8 = 0x3f800000;
      uStack_56b4 = 0x3f800000;
      local_5680._0_8_ = auVar219._0_8_;
      local_5680._8_8_ = auVar219._8_8_;
      local_5320 = local_5680._0_8_;
      uStack_5318 = local_5680._8_8_;
      local_5330 = 0x42b0c0a5;
      uStack_532c = 0x42b0c0a5;
      uStack_5328 = 0x42b0c0a5;
      uStack_5324 = 0x42b0c0a5;
      auVar38._8_4_ = 0x42b0c0a5;
      auVar38._0_8_ = 0x42b0c0a542b0c0a5;
      auVar38._12_4_ = 0x42b0c0a5;
      auVar219 = vminps_avx(auVar219,auVar38);
      local_5680._0_8_ = auVar219._0_8_;
      local_5680._8_8_ = auVar219._8_8_;
      local_5350 = local_5680._0_8_;
      uStack_5348 = local_5680._8_8_;
      local_5360 = 0xc2b0c0a5;
      uStack_535c = 0xc2b0c0a5;
      uStack_5358 = 0xc2b0c0a5;
      uStack_5354 = 0xc2b0c0a5;
      auVar37._8_4_ = 0xc2b0c0a5;
      auVar37._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar37._12_4_ = 0xc2b0c0a5;
      auVar5 = vmaxps_avx(auVar219,auVar37);
      local_5680._0_8_ = auVar5._0_8_;
      local_5680._8_8_ = auVar5._8_8_;
      local_53a0 = local_5680._0_8_;
      uVar183 = local_53a0;
      uStack_5398 = local_5680._8_8_;
      uVar184 = uStack_5398;
      local_53b0 = 0x3fb8aa3b;
      uStack_53ac = 0x3fb8aa3b;
      uStack_53a8 = 0x3fb8aa3b;
      uStack_53a4 = 0x3fb8aa3b;
      local_53a0._0_4_ = auVar5._0_4_;
      local_53a0._4_4_ = auVar5._4_4_;
      uStack_5398._0_4_ = auVar5._8_4_;
      uStack_5398._4_4_ = auVar5._12_4_;
      local_56a0._4_4_ = local_53a0._4_4_ * 1.442695;
      local_56a0._0_4_ = (float)local_53a0 * 1.442695;
      uStack_5698._0_4_ = (float)uStack_5398 * 1.442695;
      uStack_5698._4_4_ = uStack_5398._4_4_ * 1.442695;
      local_5400 = local_56a0;
      uStack_53f8 = uStack_5698;
      local_5410 = 0x3f000000;
      uStack_540c = 0x3f000000;
      uStack_5408 = 0x3f000000;
      uStack_5404 = 0x3f000000;
      local_56a0._0_4_ = (float)local_53a0 * 1.442695 + 0.5;
      local_56a0._4_4_ = local_53a0._4_4_ * 1.442695 + 0.5;
      fVar224 = (float)uStack_5398 * 1.442695 + 0.5;
      fVar223 = uStack_5398._4_4_ * 1.442695 + 0.5;
      uStack_5698._0_4_ = fVar224;
      uStack_5698._4_4_ = fVar223;
      local_52a0 = local_56a0;
      uStack_5298 = uStack_5698;
      local_56b0._4_4_ = (int)(float)local_56a0._4_4_;
      local_56b0._0_4_ = (int)(float)local_56a0._0_4_;
      local_56b0._8_4_ = (int)fVar224;
      local_56b0._12_4_ = (int)fVar223;
      local_5370 = local_56b0._0_8_;
      uStack_5368 = local_56b0._8_8_;
      auVar36._8_8_ = local_56b0._8_8_;
      auVar36._0_8_ = local_56b0._0_8_;
      auVar218 = vcvtdq2ps_avx(auVar36);
      local_5690 = auVar218._0_8_;
      uStack_5688 = auVar218._8_8_;
      local_5260 = local_5690;
      uStack_5258 = uStack_5688;
      local_5270 = local_56a0;
      uStack_5268 = uStack_5698;
      auVar40._8_8_ = uStack_5698;
      auVar40._0_8_ = local_56a0;
      auVar219 = vcmpps_avx(auVar40,auVar218,1);
      local_56d0._0_8_ = auVar219._0_8_;
      local_56d0._8_8_ = auVar219._8_8_;
      local_5230 = 0x3f8000003f800000;
      uStack_5228 = 0x3f8000003f800000;
      local_5220 = local_56d0._0_8_;
      uStack_5218 = local_56d0._8_8_;
      auVar42._8_8_ = 0x3f8000003f800000;
      auVar42._0_8_ = 0x3f8000003f800000;
      local_56d0 = vpand_avx(auVar219,auVar42);
      local_5300 = local_5690;
      uStack_52f8 = uStack_5688;
      local_5310 = local_56d0._0_8_;
      uStack_5308 = local_56d0._8_8_;
      _local_56a0 = vsubps_avx(auVar218,local_56d0);
      local_51a0 = local_56a0;
      uStack_5198 = uStack_5698;
      local_51b0 = 0x3f318000;
      uStack_51ac = 0x3f318000;
      uStack_51a8 = 0x3f318000;
      uStack_51a4 = 0x3f318000;
      local_51c0 = local_5680._0_8_;
      uStack_51b8 = local_5680._8_8_;
      local_5060 = 0x3f3180003f318000;
      uStack_5058 = 0x3f3180003f318000;
      local_5050 = local_56a0;
      uStack_5048 = uStack_5698;
      local_5070 = local_5680._0_8_;
      uStack_5068 = local_5680._8_8_;
      auVar46._8_8_ = 0x3f3180003f318000;
      auVar46._0_8_ = 0x3f3180003f318000;
      auVar219 = vfnmadd213ps_fma(auVar46,_local_56a0,auVar5);
      local_5680._0_8_ = auVar219._0_8_;
      local_5680._8_8_ = auVar219._8_8_;
      local_51d0 = local_56a0;
      uStack_51c8 = uStack_5698;
      local_51e0 = 0xb95e8083;
      uStack_51dc = 0xb95e8083;
      uStack_51d8 = 0xb95e8083;
      uStack_51d4 = 0xb95e8083;
      local_51f0 = local_5680._0_8_;
      uStack_51e8 = local_5680._8_8_;
      local_5030 = 0xb95e8083b95e8083;
      uStack_5028 = 0xb95e8083b95e8083;
      local_5020 = local_56a0;
      uStack_5018 = uStack_5698;
      local_5040 = local_5680._0_8_;
      uStack_5038 = local_5680._8_8_;
      auVar47._8_8_ = 0xb95e8083b95e8083;
      auVar47._0_8_ = 0xb95e8083b95e8083;
      local_5680 = vfnmadd213ps_fma(auVar47,_local_56a0,auVar219);
      local_53c0 = local_5680._0_8_;
      uVar181 = local_53c0;
      uStack_53b8 = local_5680._8_8_;
      uVar182 = uStack_53b8;
      local_53d0 = local_5680._0_8_;
      uStack_53c8 = local_5680._8_8_;
      local_53c0._0_4_ = local_5680._0_4_;
      local_53c0._4_4_ = local_5680._4_4_;
      uStack_53b8._0_4_ = local_5680._8_4_;
      uStack_53b8._4_4_ = local_5680._12_4_;
      local_5690 = CONCAT44(local_53c0._4_4_ * local_53c0._4_4_,
                            (float)local_53c0 * (float)local_53c0);
      uStack_5688._0_4_ = (float)uStack_53b8 * (float)uStack_53b8;
      uStack_5688._4_4_ = uStack_53b8._4_4_ * uStack_53b8._4_4_;
      uStack_56d8._0_4_ = 0x39506967;
      local_56e0 = (undefined1  [8])0x3950696739506967;
      uStack_56d8._4_4_ = 0x39506967;
      local_5470 = 0x3950696739506967;
      uStack_5468 = uStack_56d8;
      local_5480 = local_5680._0_8_;
      uStack_5478 = local_5680._8_8_;
      local_5490 = 0x3ab743ce;
      uStack_548c = 0x3ab743ce;
      uStack_5488 = 0x3ab743ce;
      uStack_5484 = 0x3ab743ce;
      local_5460 = 0x3ab743ce3ab743ce;
      uStack_5458 = 0x3ab743ce3ab743ce;
      local_5440 = 0x3950696739506967;
      uStack_5438 = uStack_56d8;
      local_5450 = local_5680._0_8_;
      uStack_5448 = local_5680._8_8_;
      auVar33._8_8_ = uStack_56d8;
      auVar33._0_8_ = 0x3950696739506967;
      auVar32._8_8_ = 0x3ab743ce3ab743ce;
      auVar32._0_8_ = 0x3ab743ce3ab743ce;
      auVar219 = vfmadd213ps_fma(local_5680,auVar33,auVar32);
      local_56e0 = auVar219._0_8_;
      uStack_56d8 = auVar219._8_8_;
      local_54d0 = local_56e0;
      uStack_54c8 = uStack_56d8;
      local_54e0 = local_5680._0_8_;
      uStack_54d8 = local_5680._8_8_;
      local_54f0 = 0x3c088908;
      uStack_54ec = 0x3c088908;
      uStack_54e8 = 0x3c088908;
      uStack_54e4 = 0x3c088908;
      local_54c0 = 0x3c0889083c088908;
      uStack_54b8 = 0x3c0889083c088908;
      local_54a0 = local_56e0;
      uStack_5498 = uStack_56d8;
      local_54b0 = local_5680._0_8_;
      uStack_54a8 = local_5680._8_8_;
      auVar31._8_8_ = 0x3c0889083c088908;
      auVar31._0_8_ = 0x3c0889083c088908;
      auVar219 = vfmadd213ps_fma(local_5680,auVar219,auVar31);
      local_56e0 = auVar219._0_8_;
      uStack_56d8 = auVar219._8_8_;
      local_5530 = local_56e0;
      uStack_5528 = uStack_56d8;
      local_5540 = local_5680._0_8_;
      uStack_5538 = local_5680._8_8_;
      local_5550 = 0x3d2aa9c1;
      uStack_554c = 0x3d2aa9c1;
      uStack_5548 = 0x3d2aa9c1;
      uStack_5544 = 0x3d2aa9c1;
      local_5520 = 0x3d2aa9c13d2aa9c1;
      uStack_5518 = 0x3d2aa9c13d2aa9c1;
      local_5500 = local_56e0;
      uStack_54f8 = uStack_56d8;
      local_5510 = local_5680._0_8_;
      uStack_5508 = local_5680._8_8_;
      auVar30._8_8_ = 0x3d2aa9c13d2aa9c1;
      auVar30._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar219 = vfmadd213ps_fma(local_5680,auVar219,auVar30);
      local_56e0 = auVar219._0_8_;
      uStack_56d8 = auVar219._8_8_;
      local_5590 = local_56e0;
      uStack_5588 = uStack_56d8;
      local_55a0 = local_5680._0_8_;
      uStack_5598 = local_5680._8_8_;
      local_55b0 = 0x3e2aaaaa;
      uStack_55ac = 0x3e2aaaaa;
      uStack_55a8 = 0x3e2aaaaa;
      uStack_55a4 = 0x3e2aaaaa;
      local_5580 = 0x3e2aaaaa3e2aaaaa;
      uStack_5578 = 0x3e2aaaaa3e2aaaaa;
      local_5560 = local_56e0;
      uStack_5558 = uStack_56d8;
      local_5570 = local_5680._0_8_;
      uStack_5568 = local_5680._8_8_;
      auVar29._8_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar29._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar219 = vfmadd213ps_fma(local_5680,auVar219,auVar29);
      local_56e0 = auVar219._0_8_;
      uStack_56d8 = auVar219._8_8_;
      local_55f0 = local_56e0;
      uStack_55e8 = uStack_56d8;
      local_5600 = local_5680._0_8_;
      uStack_55f8 = local_5680._8_8_;
      local_5610 = 0x3f000000;
      uStack_560c = 0x3f000000;
      uStack_5608 = 0x3f000000;
      uStack_5604 = 0x3f000000;
      local_55e0 = 0x3f0000003f000000;
      uStack_55d8 = 0x3f0000003f000000;
      local_55c0 = local_56e0;
      uStack_55b8 = uStack_56d8;
      local_55d0 = local_5680._0_8_;
      uStack_55c8 = local_5680._8_8_;
      auVar28._8_8_ = 0x3f0000003f000000;
      auVar28._0_8_ = 0x3f0000003f000000;
      auVar219 = vfmadd213ps_fma(local_5680,auVar219,auVar28);
      local_56e0 = auVar219._0_8_;
      uStack_56d8 = auVar219._8_8_;
      local_5650 = local_56e0;
      uStack_5648 = uStack_56d8;
      local_5660 = local_5690;
      uStack_5658 = uStack_5688;
      local_5670 = local_5680._0_8_;
      uStack_5668 = local_5680._8_8_;
      local_5620 = local_56e0;
      uStack_5618 = uStack_56d8;
      local_5630 = local_5690;
      uStack_5628 = uStack_5688;
      local_5640 = local_5680._0_8_;
      uStack_5638 = local_5680._8_8_;
      auVar27._8_8_ = uStack_5688;
      auVar27._0_8_ = local_5690;
      auVar219 = vfmadd213ps_fma(auVar27,auVar219,local_5680);
      local_56e0 = auVar219._0_8_;
      uStack_56d8 = auVar219._8_8_;
      local_5430 = 0x3f8000003f800000;
      uStack_5428 = 0x3f8000003f800000;
      local_5420 = local_56e0;
      uVar177 = local_5420;
      uStack_5418 = uStack_56d8;
      uVar178 = uStack_5418;
      local_5420._0_4_ = auVar219._0_4_;
      local_5420._4_4_ = auVar219._4_4_;
      uStack_5418._0_4_ = auVar219._8_4_;
      uStack_5418._4_4_ = auVar219._12_4_;
      local_56e0._4_4_ = local_5420._4_4_ + 1.0;
      local_56e0._0_4_ = (float)local_5420 + 1.0;
      uStack_56d8._0_4_ = (float)uStack_5418 + 1.0;
      uStack_56d8._4_4_ = uStack_5418._4_4_ + 1.0;
      local_52b0 = local_56a0;
      uVar185 = local_52b0;
      uStack_52a8 = uStack_5698;
      uVar186 = uStack_52a8;
      local_52b0._0_4_ = local_56a0._0_4_;
      local_52b0._4_4_ = local_56a0._4_4_;
      uStack_52a8._0_4_ = local_56a0._8_4_;
      uStack_52a8._4_4_ = local_56a0._12_4_;
      local_56b0._4_4_ = (int)local_52b0._4_4_;
      local_56b0._0_4_ = (int)(float)local_52b0;
      local_56b0._8_4_ = (int)(float)uStack_52a8;
      local_56b0._12_4_ = (int)uStack_52a8._4_4_;
      local_5380 = local_56b0._0_8_;
      uStack_5378 = local_56b0._8_8_;
      local_5390 = 0x7f0000007f;
      uStack_5388 = 0x7f0000007f;
      auVar35._8_8_ = local_56b0._8_8_;
      auVar35._0_8_ = local_56b0._0_8_;
      auVar34._8_8_ = 0x7f0000007f;
      auVar34._0_8_ = 0x7f0000007f;
      auVar219 = vpaddd_avx(auVar35,auVar34);
      local_56b0._0_8_ = auVar219._0_8_;
      local_56b0._8_8_ = auVar219._8_8_;
      local_5120 = local_56b0._0_8_;
      uStack_5118 = local_56b0._8_8_;
      local_5124 = 0x17;
      local_56b0 = vpslld_avx(auVar219,ZEXT416(0x17));
      local_50f0 = local_56b0._0_8_;
      uStack_50e8 = local_56b0._8_8_;
      local_56f0 = local_56b0._0_8_;
      uStack_56e8 = local_56b0._8_8_;
      local_53e0 = _local_56e0;
      local_53f0 = local_56b0._0_8_;
      uVar179 = local_53f0;
      uStack_53e8 = local_56b0._8_8_;
      uVar180 = uStack_53e8;
      local_53f0._0_4_ = local_56b0._0_4_;
      local_53f0._4_4_ = local_56b0._4_4_;
      uStack_53e8._0_4_ = local_56b0._8_4_;
      uStack_53e8._4_4_ = local_56b0._12_4_;
      local_56e0._0_4_ = ((float)local_5420 + 1.0) * (float)local_53f0;
      local_56e0._4_4_ = (local_5420._4_4_ + 1.0) * local_53f0._4_4_;
      uStack_53e8._0_4_ = ((float)uStack_5418 + 1.0) * (float)uStack_53e8;
      uStack_53e8._4_4_ = (uStack_5418._4_4_ + 1.0) * uStack_53e8._4_4_;
      uStack_56d8._0_4_ = (float)uStack_53e8;
      uStack_56d8._4_4_ = uStack_53e8._4_4_;
      local_5ca0 = local_56e0;
      uStack_5c98 = uStack_56d8;
      local_5af0 = (float)local_56e0._0_4_ + 1.0;
      fStack_5aec = (float)local_56e0._4_4_ + 1.0;
      fStack_5ae8 = (float)uStack_53e8 + 1.0;
      fStack_5ae4 = uStack_53e8._4_4_ + 1.0;
      auVar19._4_4_ = fStack_5aec;
      auVar19._0_4_ = local_5af0;
      auVar19._8_4_ = fStack_5ae8;
      auVar19._12_4_ = fStack_5ae4;
      _local_7360 = vdivps_avx(local_5c90,auVar19);
      local_5ae0 = local_5c90;
      local_5420 = uVar177;
      uStack_5418 = uVar178;
      local_53f0 = uVar179;
      uStack_53e8 = uVar180;
      local_53c0 = uVar181;
      uStack_53b8 = uVar182;
      local_53a0 = uVar183;
      uStack_5398 = uVar184;
      local_52b0 = uVar185;
      uStack_52a8 = uVar186;
      break;
    case 5:
      local_5c70 = local_7960;
      uStack_5c68 = uStack_7958;
      local_5720 = vpxord_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
      local_5aa0 = 0x3f800000;
      uStack_5a9c = 0x3f800000;
      uStack_5a98 = 0x3f800000;
      uStack_5a94 = 0x3f800000;
      local_5700 = local_7960;
      uStack_56f8 = uStack_7958;
      local_5710 = 0x42b0c0a5;
      uStack_570c = 0x42b0c0a5;
      uStack_5708 = 0x42b0c0a5;
      uStack_5704 = 0x42b0c0a5;
      auVar26._8_8_ = uStack_7958;
      auVar26._0_8_ = local_7960;
      auVar25._8_4_ = 0x42b0c0a5;
      auVar25._0_8_ = 0x42b0c0a542b0c0a5;
      auVar25._12_4_ = 0x42b0c0a5;
      auVar219 = vminps_avx(auVar26,auVar25);
      local_5a60._0_8_ = auVar219._0_8_;
      local_5a60._8_8_ = auVar219._8_8_;
      local_5730 = local_5a60._0_8_;
      uStack_5728 = local_5a60._8_8_;
      local_5740 = 0xc2b0c0a5;
      uStack_573c = 0xc2b0c0a5;
      uStack_5738 = 0xc2b0c0a5;
      uStack_5734 = 0xc2b0c0a5;
      auVar24._8_4_ = 0xc2b0c0a5;
      auVar24._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar24._12_4_ = 0xc2b0c0a5;
      auVar5 = vmaxps_avx(auVar219,auVar24);
      local_5a60._0_8_ = auVar5._0_8_;
      local_5a60._8_8_ = auVar5._8_8_;
      local_5780 = local_5a60._0_8_;
      uVar183 = local_5780;
      uStack_5778 = local_5a60._8_8_;
      uVar184 = uStack_5778;
      local_5790 = 0x3fb8aa3b;
      uStack_578c = 0x3fb8aa3b;
      uStack_5788 = 0x3fb8aa3b;
      uStack_5784 = 0x3fb8aa3b;
      local_5780._0_4_ = auVar5._0_4_;
      local_5780._4_4_ = auVar5._4_4_;
      uStack_5778._0_4_ = auVar5._8_4_;
      uStack_5778._4_4_ = auVar5._12_4_;
      local_5a80._4_4_ = local_5780._4_4_ * 1.442695;
      local_5a80._0_4_ = (float)local_5780 * 1.442695;
      uStack_5a78._0_4_ = (float)uStack_5778 * 1.442695;
      uStack_5a78._4_4_ = uStack_5778._4_4_ * 1.442695;
      local_57e0 = local_5a80;
      uStack_57d8 = uStack_5a78;
      local_57f0 = 0x3f000000;
      uStack_57ec = 0x3f000000;
      uStack_57e8 = 0x3f000000;
      uStack_57e4 = 0x3f000000;
      local_5a80._0_4_ = (float)local_5780 * 1.442695 + 0.5;
      local_5a80._4_4_ = local_5780._4_4_ * 1.442695 + 0.5;
      fVar224 = (float)uStack_5778 * 1.442695 + 0.5;
      fVar223 = uStack_5778._4_4_ * 1.442695 + 0.5;
      uStack_5a78._0_4_ = fVar224;
      uStack_5a78._4_4_ = fVar223;
      local_5280 = local_5a80;
      uStack_5278 = uStack_5a78;
      local_5a90._4_4_ = (int)(float)local_5a80._4_4_;
      local_5a90._0_4_ = (int)(float)local_5a80._0_4_;
      local_5a90._8_4_ = (int)fVar224;
      local_5a90._12_4_ = (int)fVar223;
      local_5750 = local_5a90._0_8_;
      uStack_5748 = local_5a90._8_8_;
      auVar23._8_8_ = local_5a90._8_8_;
      auVar23._0_8_ = local_5a90._0_8_;
      auVar218 = vcvtdq2ps_avx(auVar23);
      local_5a70 = auVar218._0_8_;
      uStack_5a68 = auVar218._8_8_;
      local_5240 = local_5a70;
      uStack_5238 = uStack_5a68;
      local_5250 = local_5a80;
      uStack_5248 = uStack_5a78;
      auVar41._8_8_ = uStack_5a78;
      auVar41._0_8_ = local_5a80;
      auVar219 = vcmpps_avx(auVar41,auVar218,1);
      local_5ab0._0_8_ = auVar219._0_8_;
      local_5ab0._8_8_ = auVar219._8_8_;
      local_5210 = 0x3f8000003f800000;
      uStack_5208 = 0x3f8000003f800000;
      local_5200 = local_5ab0._0_8_;
      uStack_51f8 = local_5ab0._8_8_;
      auVar43._8_8_ = 0x3f8000003f800000;
      auVar43._0_8_ = 0x3f8000003f800000;
      local_5ab0 = vpand_avx(auVar219,auVar43);
      local_52e0 = local_5a70;
      uStack_52d8 = uStack_5a68;
      local_52f0 = local_5ab0._0_8_;
      uStack_52e8 = local_5ab0._8_8_;
      _local_5a80 = vsubps_avx(auVar218,local_5ab0);
      local_5140 = local_5a80;
      uStack_5138 = uStack_5a78;
      local_5150 = 0x3f318000;
      uStack_514c = 0x3f318000;
      uStack_5148 = 0x3f318000;
      uStack_5144 = 0x3f318000;
      local_5160 = local_5a60._0_8_;
      uStack_5158 = local_5a60._8_8_;
      local_50c0 = 0x3f3180003f318000;
      uStack_50b8 = 0x3f3180003f318000;
      local_50b0 = local_5a80;
      uStack_50a8 = uStack_5a78;
      local_50d0 = local_5a60._0_8_;
      uStack_50c8 = local_5a60._8_8_;
      auVar44._8_8_ = 0x3f3180003f318000;
      auVar44._0_8_ = 0x3f3180003f318000;
      auVar219 = vfnmadd213ps_fma(auVar44,_local_5a80,auVar5);
      local_5a60._0_8_ = auVar219._0_8_;
      local_5a60._8_8_ = auVar219._8_8_;
      local_5170 = local_5a80;
      uStack_5168 = uStack_5a78;
      local_5180 = 0xb95e8083;
      uStack_517c = 0xb95e8083;
      uStack_5178 = 0xb95e8083;
      uStack_5174 = 0xb95e8083;
      local_5190 = local_5a60._0_8_;
      uStack_5188 = local_5a60._8_8_;
      local_5090 = 0xb95e8083b95e8083;
      uStack_5088 = 0xb95e8083b95e8083;
      local_5080 = local_5a80;
      uStack_5078 = uStack_5a78;
      local_50a0 = local_5a60._0_8_;
      uStack_5098 = local_5a60._8_8_;
      auVar45._8_8_ = 0xb95e8083b95e8083;
      auVar45._0_8_ = 0xb95e8083b95e8083;
      local_5a60 = vfnmadd213ps_fma(auVar45,_local_5a80,auVar219);
      local_57a0 = local_5a60._0_8_;
      uVar181 = local_57a0;
      uStack_5798 = local_5a60._8_8_;
      uVar182 = uStack_5798;
      local_57b0 = local_5a60._0_8_;
      uStack_57a8 = local_5a60._8_8_;
      local_57a0._0_4_ = local_5a60._0_4_;
      local_57a0._4_4_ = local_5a60._4_4_;
      uStack_5798._0_4_ = local_5a60._8_4_;
      uStack_5798._4_4_ = local_5a60._12_4_;
      local_5a70 = CONCAT44(local_57a0._4_4_ * local_57a0._4_4_,
                            (float)local_57a0 * (float)local_57a0);
      uStack_5a68._0_4_ = (float)uStack_5798 * (float)uStack_5798;
      uStack_5a68._4_4_ = uStack_5798._4_4_ * uStack_5798._4_4_;
      uStack_5ab8._0_4_ = 0x39506967;
      local_5ac0 = 0x3950696739506967;
      uStack_5ab8._4_4_ = 0x39506967;
      local_5850 = 0x3950696739506967;
      uStack_5848 = uStack_5ab8;
      local_5860 = local_5a60._0_8_;
      uStack_5858 = local_5a60._8_8_;
      local_5870 = 0x3ab743ce;
      uStack_586c = 0x3ab743ce;
      uStack_5868 = 0x3ab743ce;
      uStack_5864 = 0x3ab743ce;
      local_5840 = 0x3ab743ce3ab743ce;
      uStack_5838 = 0x3ab743ce3ab743ce;
      local_5820 = 0x3950696739506967;
      uStack_5818 = uStack_5ab8;
      local_5830 = local_5a60._0_8_;
      uStack_5828 = local_5a60._8_8_;
      auVar20._8_8_ = uStack_5ab8;
      auVar20._0_8_ = 0x3950696739506967;
      auVar10._8_8_ = 0x3ab743ce3ab743ce;
      auVar10._0_8_ = 0x3ab743ce3ab743ce;
      auVar219 = vfmadd213ps_fma(local_5a60,auVar20,auVar10);
      local_5ac0 = auVar219._0_8_;
      uStack_5ab8 = auVar219._8_8_;
      local_58b0 = local_5ac0;
      uStack_58a8 = uStack_5ab8;
      local_58c0 = local_5a60._0_8_;
      uStack_58b8 = local_5a60._8_8_;
      local_58d0 = 0x3c088908;
      uStack_58cc = 0x3c088908;
      uStack_58c8 = 0x3c088908;
      uStack_58c4 = 0x3c088908;
      local_58a0 = 0x3c0889083c088908;
      uStack_5898 = 0x3c0889083c088908;
      local_5880 = local_5ac0;
      uStack_5878 = uStack_5ab8;
      local_5890 = local_5a60._0_8_;
      uStack_5888 = local_5a60._8_8_;
      auVar9._8_8_ = 0x3c0889083c088908;
      auVar9._0_8_ = 0x3c0889083c088908;
      auVar219 = vfmadd213ps_fma(local_5a60,auVar219,auVar9);
      local_5ac0 = auVar219._0_8_;
      uStack_5ab8 = auVar219._8_8_;
      local_5910 = local_5ac0;
      uStack_5908 = uStack_5ab8;
      local_5920 = local_5a60._0_8_;
      uStack_5918 = local_5a60._8_8_;
      local_5930 = 0x3d2aa9c1;
      uStack_592c = 0x3d2aa9c1;
      uStack_5928 = 0x3d2aa9c1;
      uStack_5924 = 0x3d2aa9c1;
      local_5900 = 0x3d2aa9c13d2aa9c1;
      uStack_58f8 = 0x3d2aa9c13d2aa9c1;
      local_58e0 = local_5ac0;
      uStack_58d8 = uStack_5ab8;
      local_58f0 = local_5a60._0_8_;
      uStack_58e8 = local_5a60._8_8_;
      auVar8._8_8_ = 0x3d2aa9c13d2aa9c1;
      auVar8._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar219 = vfmadd213ps_fma(local_5a60,auVar219,auVar8);
      local_5ac0 = auVar219._0_8_;
      uStack_5ab8 = auVar219._8_8_;
      local_5970 = local_5ac0;
      uStack_5968 = uStack_5ab8;
      local_5980 = local_5a60._0_8_;
      uStack_5978 = local_5a60._8_8_;
      local_5990 = 0x3e2aaaaa;
      uStack_598c = 0x3e2aaaaa;
      uStack_5988 = 0x3e2aaaaa;
      uStack_5984 = 0x3e2aaaaa;
      local_5960 = 0x3e2aaaaa3e2aaaaa;
      uStack_5958 = 0x3e2aaaaa3e2aaaaa;
      local_5940 = local_5ac0;
      uStack_5938 = uStack_5ab8;
      local_5950 = local_5a60._0_8_;
      uStack_5948 = local_5a60._8_8_;
      auVar7._8_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar7._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar219 = vfmadd213ps_fma(local_5a60,auVar219,auVar7);
      local_5ac0 = auVar219._0_8_;
      uStack_5ab8 = auVar219._8_8_;
      local_59d0 = local_5ac0;
      uStack_59c8 = uStack_5ab8;
      local_59e0 = local_5a60._0_8_;
      uStack_59d8 = local_5a60._8_8_;
      local_59f0 = 0x3f000000;
      uStack_59ec = 0x3f000000;
      uStack_59e8 = 0x3f000000;
      uStack_59e4 = 0x3f000000;
      local_59c0 = 0x3f0000003f000000;
      uStack_59b8 = 0x3f0000003f000000;
      local_59a0 = local_5ac0;
      uStack_5998 = uStack_5ab8;
      local_59b0 = local_5a60._0_8_;
      uStack_59a8 = local_5a60._8_8_;
      auVar6._8_8_ = 0x3f0000003f000000;
      auVar6._0_8_ = 0x3f0000003f000000;
      auVar219 = vfmadd213ps_fma(local_5a60,auVar219,auVar6);
      local_5ac0 = auVar219._0_8_;
      uStack_5ab8 = auVar219._8_8_;
      local_5a30 = local_5ac0;
      uStack_5a28 = uStack_5ab8;
      local_5a40 = local_5a70;
      uStack_5a38 = uStack_5a68;
      local_5a50 = local_5a60._0_8_;
      uStack_5a48 = local_5a60._8_8_;
      local_5a00 = local_5ac0;
      uStack_59f8 = uStack_5ab8;
      local_5a10 = local_5a70;
      uStack_5a08 = uStack_5a68;
      local_5a20 = local_5a60._0_8_;
      uStack_5a18 = local_5a60._8_8_;
      auVar5._8_8_ = uStack_5a68;
      auVar5._0_8_ = local_5a70;
      auVar219 = vfmadd213ps_fma(auVar5,auVar219,local_5a60);
      local_5ac0 = auVar219._0_8_;
      uStack_5ab8 = auVar219._8_8_;
      local_5810 = 0x3f8000003f800000;
      uStack_5808 = 0x3f8000003f800000;
      local_5800 = local_5ac0;
      uVar177 = local_5800;
      uStack_57f8 = uStack_5ab8;
      uVar178 = uStack_57f8;
      local_5800._0_4_ = auVar219._0_4_;
      local_5800._4_4_ = auVar219._4_4_;
      uStack_57f8._0_4_ = auVar219._8_4_;
      uStack_57f8._4_4_ = auVar219._12_4_;
      local_5ac0 = CONCAT44(local_5800._4_4_ + 1.0,(float)local_5800 + 1.0);
      uStack_5ab8._0_4_ = (float)uStack_57f8 + 1.0;
      uStack_5ab8._4_4_ = uStack_57f8._4_4_ + 1.0;
      local_5290 = local_5a80;
      uVar185 = local_5290;
      uStack_5288 = uStack_5a78;
      uVar186 = uStack_5288;
      local_5290._0_4_ = local_5a80._0_4_;
      local_5290._4_4_ = local_5a80._4_4_;
      uStack_5288._0_4_ = local_5a80._8_4_;
      uStack_5288._4_4_ = local_5a80._12_4_;
      local_5a90._4_4_ = (int)local_5290._4_4_;
      local_5a90._0_4_ = (int)(float)local_5290;
      local_5a90._8_4_ = (int)(float)uStack_5288;
      local_5a90._12_4_ = (int)uStack_5288._4_4_;
      local_5760 = local_5a90._0_8_;
      uStack_5758 = local_5a90._8_8_;
      local_5770 = 0x7f0000007f;
      uStack_5768 = 0x7f0000007f;
      auVar22._8_8_ = local_5a90._8_8_;
      auVar22._0_8_ = local_5a90._0_8_;
      auVar21._8_8_ = 0x7f0000007f;
      auVar21._0_8_ = 0x7f0000007f;
      auVar219 = vpaddd_avx(auVar22,auVar21);
      local_5a90._0_8_ = auVar219._0_8_;
      local_5a90._8_8_ = auVar219._8_8_;
      local_5100 = local_5a90._0_8_;
      uStack_50f8 = local_5a90._8_8_;
      local_5104 = 0x17;
      local_5a90 = vpslld_avx(auVar219,ZEXT416(0x17));
      local_50e0 = local_5a90._0_8_;
      uStack_50d8 = local_5a90._8_8_;
      local_5ad0 = local_5a90._0_8_;
      uStack_5ac8 = local_5a90._8_8_;
      local_57c0 = local_5ac0;
      uStack_57b8 = uStack_5ab8;
      local_57d0 = local_5a90._0_8_;
      uVar179 = local_57d0;
      uStack_57c8 = local_5a90._8_8_;
      uVar180 = uStack_57c8;
      local_57d0._0_4_ = local_5a90._0_4_;
      local_57d0._4_4_ = local_5a90._4_4_;
      uStack_57c8._0_4_ = local_5a90._8_4_;
      uStack_57c8._4_4_ = local_5a90._12_4_;
      local_57d0._0_4_ = ((float)local_5800 + 1.0) * (float)local_57d0;
      local_57d0._4_4_ = (local_5800._4_4_ + 1.0) * local_57d0._4_4_;
      uStack_57c8._0_4_ = ((float)uStack_57f8 + 1.0) * (float)uStack_57c8;
      uStack_57c8._4_4_ = (uStack_57f8._4_4_ + 1.0) * uStack_57c8._4_4_;
      local_5ac0 = CONCAT44(local_57d0._4_4_,(float)local_57d0);
      uStack_5ab8._0_4_ = (float)uStack_57c8;
      uStack_5ab8._4_4_ = uStack_57c8._4_4_;
      local_5c44 = 0x3f800000;
      local_5c60 = 0x3f800000;
      uStack_5c5c = 0x3f800000;
      uStack_5c58 = 0x3f800000;
      uStack_5c54 = 0x3f800000;
      local_5c40 = 0x3f8000003f800000;
      uStack_5c38 = 0x3f8000003f800000;
      local_5c30 = local_5ac0;
      uStack_5c28 = uStack_5ab8;
      local_48c0._4_4_ = local_57d0._4_4_ + 1.0;
      local_48c0._0_4_ = (float)local_57d0 + 1.0;
      uStack_48b8._0_4_ = (float)uStack_57c8 + 1.0;
      uStack_48b8._4_4_ = uStack_57c8._4_4_ + 1.0;
      local_48e0 = 0x3f800000;
      uStack_48dc = 0x3f800000;
      uStack_48d8 = 0x3f800000;
      uStack_48d4 = 0x3f800000;
      local_42e0 = local_48c0;
      uStack_42d8 = uStack_48b8;
      local_42f0 = local_5720._0_8_;
      uStack_42e8 = local_5720._8_8_;
      auVar96._8_8_ = uStack_48b8;
      auVar96._0_8_ = local_48c0;
      local_48f0 = vcmpps_avx(auVar96,local_5720,2);
      local_4410 = local_48c0;
      uStack_4408 = uStack_48b8;
      local_4420 = 0x800000;
      uStack_441c = 0x800000;
      uStack_4418 = 0x800000;
      uStack_4414 = 0x800000;
      auVar89._8_8_ = uStack_48b8;
      auVar89._0_8_ = local_48c0;
      auVar88._8_4_ = 0x800000;
      auVar88._0_8_ = 0x80000000800000;
      auVar88._12_4_ = 0x800000;
      auVar219 = vmaxps_avx(auVar89,auVar88);
      local_48c0 = auVar219._0_8_;
      uStack_48b8 = auVar219._8_8_;
      local_42b0 = local_48c0;
      uStack_42a8 = uStack_48b8;
      local_42c0 = local_48c0;
      uStack_42b8 = uStack_48b8;
      local_42c4 = 0x17;
      auVar5 = vpsrld_avx(auVar219,ZEXT416(0x17));
      local_4360 = local_48c0;
      uStack_4358 = uStack_48b8;
      local_4370 = 0x807fffff;
      uStack_436c = 0x807fffff;
      uStack_4368 = 0x807fffff;
      uStack_4364 = 0x807fffff;
      auVar93._8_4_ = 0x807fffff;
      auVar93._0_8_ = 0x807fffff807fffff;
      auVar93._12_4_ = 0x807fffff;
      auVar219 = vpand_avx(auVar219,auVar93);
      local_48c0 = auVar219._0_8_;
      uStack_48b8 = auVar219._8_8_;
      local_4270 = local_48c0;
      uStack_4268 = uStack_48b8;
      local_4280 = 0x3f000000;
      uStack_427c = 0x3f000000;
      uStack_4278 = 0x3f000000;
      uStack_4274 = 0x3f000000;
      auVar97._8_4_ = 0x3f000000;
      auVar97._0_8_ = 0x3f0000003f000000;
      auVar97._12_4_ = 0x3f000000;
      auVar218 = vpor_avx(auVar219,auVar97);
      local_48d0._0_8_ = auVar5._0_8_;
      local_48d0._8_8_ = auVar5._8_8_;
      local_4250 = local_48d0._0_8_;
      uStack_4248 = local_48d0._8_8_;
      local_4260 = 0x7f0000007f;
      uStack_4258 = 0x7f0000007f;
      auVar98._8_8_ = 0x7f0000007f;
      auVar98._0_8_ = 0x7f0000007f;
      local_48d0 = vpsubd_avx(auVar5,auVar98);
      local_4430 = local_48d0._0_8_;
      uStack_4428 = local_48d0._8_8_;
      auVar219 = vcvtdq2ps_avx(local_48d0);
      local_4900 = auVar219._0_8_;
      uStack_48f8 = auVar219._8_8_;
      local_44b0 = 0x3f8000003f800000;
      uStack_44a8 = 0x3f8000003f800000;
      local_44a0 = local_4900;
      uVar205 = local_44a0;
      uStack_4498 = uStack_48f8;
      uVar206 = uStack_4498;
      local_44a0._0_4_ = auVar219._0_4_;
      local_44a0._4_4_ = auVar219._4_4_;
      uStack_4498._0_4_ = auVar219._8_4_;
      uStack_4498._4_4_ = auVar219._12_4_;
      local_4900._4_4_ = local_44a0._4_4_ + 1.0;
      local_4900._0_4_ = (float)local_44a0 + 1.0;
      uStack_48f8._0_4_ = (float)uStack_4498 + 1.0;
      uStack_48f8._4_4_ = uStack_4498._4_4_ + 1.0;
      local_48c0 = auVar218._0_8_;
      uStack_48b8 = auVar218._8_8_;
      local_4230 = local_48c0;
      uStack_4228 = uStack_48b8;
      local_4240 = 0x3f3504f3;
      uStack_423c = 0x3f3504f3;
      uStack_4238 = 0x3f3504f3;
      uStack_4234 = 0x3f3504f3;
      auVar99._8_4_ = 0x3f3504f3;
      auVar99._0_8_ = 0x3f3504f33f3504f3;
      auVar99._12_4_ = 0x3f3504f3;
      local_4910 = vcmpps_avx(auVar218,auVar99,1);
      local_4380 = local_48c0;
      uStack_4378 = uStack_48b8;
      local_4390 = local_4910._0_8_;
      uStack_4388 = local_4910._8_8_;
      local_4920 = vpand_avx(auVar218,local_4910);
      local_43d0 = 0x3f8000003f800000;
      uStack_43c8 = 0x3f8000003f800000;
      local_43c0 = local_48c0;
      uStack_43b8 = uStack_48b8;
      auVar91._8_8_ = 0x3f8000003f800000;
      auVar91._0_8_ = 0x3f8000003f800000;
      auVar219 = vsubps_avx(auVar218,auVar91);
      local_43a0 = 0x3f8000003f800000;
      uStack_4398 = 0x3f8000003f800000;
      local_43b0 = local_4910._0_8_;
      uStack_43a8 = local_4910._8_8_;
      auVar92._8_8_ = 0x3f8000003f800000;
      auVar92._0_8_ = 0x3f8000003f800000;
      auVar218 = vmovdqa64_avx512vl(local_4910);
      local_43f0 = vpandd_avx512vl(auVar92,auVar218);
      local_43e0 = local_4900;
      uStack_43d8 = uStack_48f8;
      auVar90._8_8_ = uStack_48f8;
      auVar90._0_8_ = local_4900;
      _local_4900 = vsubps_avx(auVar90,local_43f0);
      local_48c0 = auVar219._0_8_;
      uStack_48b8 = auVar219._8_8_;
      local_44c0 = local_48c0;
      uVar203 = local_44c0;
      uStack_44b8 = uStack_48b8;
      uVar204 = uStack_44b8;
      local_44d0 = local_4920._0_8_;
      uVar201 = local_44d0;
      uStack_44c8 = local_4920._8_8_;
      uVar202 = uStack_44c8;
      local_44c0._0_4_ = auVar219._0_4_;
      local_44c0._4_4_ = auVar219._4_4_;
      uStack_44b8._0_4_ = auVar219._8_4_;
      uStack_44b8._4_4_ = auVar219._12_4_;
      local_44d0._0_4_ = local_4920._0_4_;
      local_44d0._4_4_ = local_4920._4_4_;
      uStack_44c8._0_4_ = local_4920._8_4_;
      uStack_44c8._4_4_ = local_4920._12_4_;
      local_48c0._0_4_ = (float)local_44c0 + (float)local_44d0;
      local_48c0._4_4_ = local_44c0._4_4_ + local_44d0._4_4_;
      uStack_44b8._0_4_ = (float)uStack_44b8 + (float)uStack_44c8;
      uStack_44b8._4_4_ = uStack_44b8._4_4_ + uStack_44c8._4_4_;
      uStack_48b8._0_4_ = (float)uStack_44b8;
      uStack_48b8._4_4_ = uStack_44b8._4_4_;
      local_4440 = local_48c0;
      uStack_4438 = uStack_48b8;
      local_4450 = local_48c0;
      uStack_4448 = uStack_48b8;
      local_4930 = (float)local_48c0._0_4_ * (float)local_48c0._0_4_;
      fStack_492c = (float)local_48c0._4_4_ * (float)local_48c0._4_4_;
      fStack_4928 = (float)uStack_44b8 * (float)uStack_44b8;
      fStack_4924 = uStack_44b8._4_4_ * uStack_44b8._4_4_;
      uStack_4938._0_4_ = 0x3d9021bb;
      local_4940 = (undefined1  [8])0x3d9021bb3d9021bb;
      uStack_4938._4_4_ = 0x3d9021bb;
      local_4530 = 0x3d9021bb3d9021bb;
      uStack_4528 = uStack_4938;
      local_4540 = local_48c0;
      uStack_4538 = uStack_48b8;
      local_4550 = 0xbdebd1b8;
      uStack_454c = 0xbdebd1b8;
      uStack_4548 = 0xbdebd1b8;
      uStack_4544 = 0xbdebd1b8;
      local_4520 = 0xbdebd1b8bdebd1b8;
      uStack_4518 = 0xbdebd1b8bdebd1b8;
      local_4500 = 0x3d9021bb3d9021bb;
      uStack_44f8 = uStack_4938;
      local_4510 = local_48c0;
      uStack_4508 = uStack_48b8;
      auVar87._8_8_ = uStack_4938;
      auVar87._0_8_ = 0x3d9021bb3d9021bb;
      auVar86._8_8_ = uStack_48b8;
      auVar86._0_8_ = local_48c0;
      auVar85._8_8_ = 0xbdebd1b8bdebd1b8;
      auVar85._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar219 = vfmadd213ps_avx512vl(auVar86,auVar87,auVar85);
      local_4940 = auVar219._0_8_;
      uStack_4938 = auVar219._8_8_;
      local_4590 = local_4940;
      uStack_4588 = uStack_4938;
      local_45a0 = local_48c0;
      uStack_4598 = uStack_48b8;
      local_45b0 = 0x3def251a;
      uStack_45ac = 0x3def251a;
      uStack_45a8 = 0x3def251a;
      uStack_45a4 = 0x3def251a;
      local_4580 = 0x3def251a3def251a;
      uStack_4578 = 0x3def251a3def251a;
      local_4560 = local_4940;
      uStack_4558 = uStack_4938;
      local_4570 = local_48c0;
      uStack_4568 = uStack_48b8;
      auVar84._8_8_ = uStack_48b8;
      auVar84._0_8_ = local_48c0;
      auVar83._8_8_ = 0x3def251a3def251a;
      auVar83._0_8_ = 0x3def251a3def251a;
      auVar219 = vfmadd213ps_avx512vl(auVar84,auVar219,auVar83);
      local_4940 = auVar219._0_8_;
      uStack_4938 = auVar219._8_8_;
      local_45f0 = local_4940;
      uStack_45e8 = uStack_4938;
      local_4600 = local_48c0;
      uStack_45f8 = uStack_48b8;
      local_4610 = 0xbdfe5d4f;
      uStack_460c = 0xbdfe5d4f;
      uStack_4608 = 0xbdfe5d4f;
      uStack_4604 = 0xbdfe5d4f;
      local_45e0 = 0xbdfe5d4fbdfe5d4f;
      uStack_45d8 = 0xbdfe5d4fbdfe5d4f;
      local_45c0 = local_4940;
      uStack_45b8 = uStack_4938;
      local_45d0 = local_48c0;
      uStack_45c8 = uStack_48b8;
      auVar82._8_8_ = uStack_48b8;
      auVar82._0_8_ = local_48c0;
      auVar81._8_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar81._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar219 = vfmadd213ps_avx512vl(auVar82,auVar219,auVar81);
      local_4940 = auVar219._0_8_;
      uStack_4938 = auVar219._8_8_;
      local_4650 = local_4940;
      uStack_4648 = uStack_4938;
      local_4660 = local_48c0;
      uStack_4658 = uStack_48b8;
      local_4670 = 0x3e11e9bf;
      uStack_466c = 0x3e11e9bf;
      uStack_4668 = 0x3e11e9bf;
      uStack_4664 = 0x3e11e9bf;
      local_4640 = 0x3e11e9bf3e11e9bf;
      uStack_4638 = 0x3e11e9bf3e11e9bf;
      local_4620 = local_4940;
      uStack_4618 = uStack_4938;
      local_4630 = local_48c0;
      uStack_4628 = uStack_48b8;
      auVar80._8_8_ = uStack_48b8;
      auVar80._0_8_ = local_48c0;
      auVar79._8_8_ = 0x3e11e9bf3e11e9bf;
      auVar79._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar219 = vfmadd213ps_avx512vl(auVar80,auVar219,auVar79);
      local_4940 = auVar219._0_8_;
      uStack_4938 = auVar219._8_8_;
      local_46b0 = local_4940;
      uStack_46a8 = uStack_4938;
      local_46c0 = local_48c0;
      uStack_46b8 = uStack_48b8;
      local_46d0 = 0xbe2aae50;
      uStack_46cc = 0xbe2aae50;
      uStack_46c8 = 0xbe2aae50;
      uStack_46c4 = 0xbe2aae50;
      local_46a0 = 0xbe2aae50be2aae50;
      uStack_4698 = 0xbe2aae50be2aae50;
      local_4680 = local_4940;
      uStack_4678 = uStack_4938;
      local_4690 = local_48c0;
      uStack_4688 = uStack_48b8;
      auVar78._8_8_ = uStack_48b8;
      auVar78._0_8_ = local_48c0;
      auVar77._8_8_ = 0xbe2aae50be2aae50;
      auVar77._0_8_ = 0xbe2aae50be2aae50;
      auVar219 = vfmadd213ps_avx512vl(auVar78,auVar219,auVar77);
      local_4940 = auVar219._0_8_;
      uStack_4938 = auVar219._8_8_;
      local_4710 = local_4940;
      uStack_4708 = uStack_4938;
      local_4720 = local_48c0;
      uStack_4718 = uStack_48b8;
      local_4730 = 0x3e4cceac;
      uStack_472c = 0x3e4cceac;
      uStack_4728 = 0x3e4cceac;
      uStack_4724 = 0x3e4cceac;
      local_4700 = 0x3e4cceac3e4cceac;
      uStack_46f8 = 0x3e4cceac3e4cceac;
      local_46e0 = local_4940;
      uStack_46d8 = uStack_4938;
      local_46f0 = local_48c0;
      uStack_46e8 = uStack_48b8;
      auVar76._8_8_ = uStack_48b8;
      auVar76._0_8_ = local_48c0;
      auVar75._8_8_ = 0x3e4cceac3e4cceac;
      auVar75._0_8_ = 0x3e4cceac3e4cceac;
      auVar219 = vfmadd213ps_avx512vl(auVar76,auVar219,auVar75);
      local_4940 = auVar219._0_8_;
      uStack_4938 = auVar219._8_8_;
      local_4770 = local_4940;
      uStack_4768 = uStack_4938;
      local_4780 = local_48c0;
      uStack_4778 = uStack_48b8;
      local_4790 = 0xbe7ffffc;
      uStack_478c = 0xbe7ffffc;
      uStack_4788 = 0xbe7ffffc;
      uStack_4784 = 0xbe7ffffc;
      local_4760 = 0xbe7ffffcbe7ffffc;
      uStack_4758 = 0xbe7ffffcbe7ffffc;
      local_4740 = local_4940;
      uStack_4738 = uStack_4938;
      local_4750 = local_48c0;
      uStack_4748 = uStack_48b8;
      auVar74._8_8_ = uStack_48b8;
      auVar74._0_8_ = local_48c0;
      auVar73._8_8_ = 0xbe7ffffcbe7ffffc;
      auVar73._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar219 = vfmadd213ps_avx512vl(auVar74,auVar219,auVar73);
      local_4940 = auVar219._0_8_;
      uStack_4938 = auVar219._8_8_;
      local_47d0 = local_4940;
      uStack_47c8 = uStack_4938;
      local_47e0 = local_48c0;
      uStack_47d8 = uStack_48b8;
      local_47f0 = 0x3eaaaaaa;
      uStack_47ec = 0x3eaaaaaa;
      uStack_47e8 = 0x3eaaaaaa;
      uStack_47e4 = 0x3eaaaaaa;
      local_47c0 = 0x3eaaaaaa3eaaaaaa;
      uStack_47b8 = 0x3eaaaaaa3eaaaaaa;
      local_47a0 = local_4940;
      uStack_4798 = uStack_4938;
      local_47b0 = local_48c0;
      uStack_47a8 = uStack_48b8;
      auVar72._8_8_ = uStack_48b8;
      auVar72._0_8_ = local_48c0;
      auVar71._8_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar71._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar219 = vfmadd213ps_avx512vl(auVar72,auVar219,auVar71);
      local_4940 = auVar219._0_8_;
      uStack_4938 = auVar219._8_8_;
      local_4460 = local_4940;
      uVar207 = local_4460;
      uStack_4458 = uStack_4938;
      uVar208 = uStack_4458;
      local_4470 = local_48c0;
      uStack_4468 = uStack_48b8;
      local_4460._0_4_ = auVar219._0_4_;
      local_4460._4_4_ = auVar219._4_4_;
      uStack_4458._0_4_ = auVar219._8_4_;
      uStack_4458._4_4_ = auVar219._12_4_;
      local_4940._4_4_ = local_4460._4_4_ * (float)local_48c0._4_4_;
      local_4940._0_4_ = (float)local_4460 * (float)local_48c0._0_4_;
      uStack_4938._0_4_ = (float)uStack_4458 * (float)uStack_44b8;
      uStack_4938._4_4_ = uStack_4458._4_4_ * uStack_44b8._4_4_;
      local_4490 = CONCAT44(fStack_492c,local_4930);
      uStack_4488 = CONCAT44(fStack_4924,fStack_4928);
      local_4480 = local_4940;
      uStack_4478 = uStack_4938;
      local_4940._4_4_ = local_4460._4_4_ * (float)local_48c0._4_4_ * fStack_492c;
      local_4940._0_4_ = (float)local_4460 * (float)local_48c0._0_4_ * local_4930;
      uStack_4938._0_4_ = (float)uStack_4458 * (float)uStack_44b8 * fStack_4928;
      uStack_4938._4_4_ = uStack_4458._4_4_ * uStack_44b8._4_4_ * fStack_4924;
      local_4830 = local_4900;
      uStack_4828 = uStack_48f8;
      local_4840 = 0xb95e8083;
      uStack_483c = 0xb95e8083;
      uStack_4838 = 0xb95e8083;
      uStack_4834 = 0xb95e8083;
      local_4850 = local_4940;
      uStack_4848 = uStack_4938;
      local_4810 = 0xb95e8083b95e8083;
      uStack_4808 = 0xb95e8083b95e8083;
      local_4800 = local_4900;
      uStack_47f8 = uStack_48f8;
      local_4820 = local_4940;
      uStack_4818 = uStack_4938;
      auVar70._8_8_ = 0xb95e8083b95e8083;
      auVar70._0_8_ = 0xb95e8083b95e8083;
      auVar69._8_8_ = uStack_4938;
      auVar69._0_8_ = local_4940;
      auVar219 = vfmadd213ps_avx512vl(auVar70,_local_4900,auVar69);
      local_4330 = CONCAT44(fStack_492c,local_4930);
      uStack_4328 = CONCAT44(fStack_4924,fStack_4928);
      local_4940 = auVar219._0_8_;
      uStack_4938 = auVar219._8_8_;
      local_4340 = 0x3f000000;
      uStack_433c = 0x3f000000;
      uStack_4338 = 0x3f000000;
      uStack_4334 = 0x3f000000;
      local_4350 = local_4940;
      uStack_4348 = uStack_4938;
      local_4310 = 0x3f0000003f000000;
      uStack_4308 = 0x3f0000003f000000;
      local_4320 = local_4940;
      uStack_4318 = uStack_4938;
      auVar95._8_8_ = uStack_4328;
      auVar95._0_8_ = local_4330;
      auVar94._8_8_ = 0x3f0000003f000000;
      auVar94._0_8_ = 0x3f0000003f000000;
      _local_4940 = vfnmadd213ps_avx512vl(auVar94,auVar95,auVar219);
      local_44e0 = local_48c0;
      uStack_44d8 = uStack_48b8;
      local_44f0 = local_4940;
      uVar199 = local_44f0;
      uStack_44e8 = uStack_4938;
      uVar200 = uStack_44e8;
      local_44f0._0_4_ = local_4940._0_4_;
      local_44f0._4_4_ = local_4940._4_4_;
      uStack_44e8._0_4_ = local_4940._8_4_;
      uStack_44e8._4_4_ = local_4940._12_4_;
      local_48c0._4_4_ = (float)local_48c0._4_4_ + local_44f0._4_4_;
      local_48c0._0_4_ = (float)local_48c0._0_4_ + (float)local_44f0;
      uStack_48b8._0_4_ = (float)uStack_44b8 + (float)uStack_44e8;
      uStack_48b8._4_4_ = uStack_44b8._4_4_ + uStack_44e8._4_4_;
      local_4890 = local_4900;
      uStack_4888 = uStack_48f8;
      local_48a0 = 0x3f318000;
      uStack_489c = 0x3f318000;
      uStack_4898 = 0x3f318000;
      uStack_4894 = 0x3f318000;
      local_48b0 = local_48c0;
      uStack_48a8 = uStack_48b8;
      local_4870 = 0x3f3180003f318000;
      uStack_4868 = 0x3f3180003f318000;
      local_4860 = local_4900;
      uStack_4858 = uStack_48f8;
      local_4880 = local_48c0;
      uStack_4878 = uStack_48b8;
      auVar68._8_8_ = 0x3f3180003f318000;
      auVar68._0_8_ = 0x3f3180003f318000;
      auVar67._8_8_ = uStack_48b8;
      auVar67._0_8_ = local_48c0;
      auVar219 = vfmadd213ps_avx512vl(auVar68,_local_4900,auVar67);
      local_48c0 = auVar219._0_8_;
      uStack_48b8 = auVar219._8_8_;
      local_4290 = local_48c0;
      uStack_4288 = uStack_48b8;
      local_42a0 = local_48f0._0_8_;
      uStack_4298 = local_48f0._8_8_;
      _local_48c0 = vpor_avx(auVar219,local_48f0);
      local_4ff0 = local_48c0;
      uStack_4fe8 = uStack_48b8;
      local_4fa4 = 0x3f800000;
      local_4fc0 = 0x3f800000;
      uStack_4fbc = 0x3f800000;
      uStack_4fb8 = 0x3f800000;
      uStack_4fb4 = 0x3f800000;
      local_5000 = 0x3f8000003f800000;
      uStack_4ff8 = 0x3f8000003f800000;
      local_4fc4 = 0x40000000;
      local_4fe0 = 0x40000000;
      uStack_4fdc = 0x40000000;
      uStack_4fd8 = 0x40000000;
      uStack_4fd4 = 0x40000000;
      local_5010 = 0x4000000040000000;
      uStack_5008 = 0x4000000040000000;
      local_4f70 = local_48c0;
      uVar187 = local_4f70;
      uStack_4f68 = uStack_48b8;
      uVar188 = uStack_4f68;
      local_4f70._0_4_ = local_48c0._0_4_;
      local_4f70._4_4_ = local_48c0._4_4_;
      uStack_4f68._0_4_ = local_48c0._8_4_;
      uStack_4f68._4_4_ = local_48c0._12_4_;
      local_4f50 = (float)local_4f70 * 2.0;
      fStack_4f4c = local_4f70._4_4_ * 2.0;
      fStack_4f48 = (float)uStack_4f68 * 2.0;
      fStack_4f44 = uStack_4f68._4_4_ * 2.0;
      local_4f24 = 0x3f800000;
      local_4f40 = 0x3f800000;
      uStack_4f3c = 0x3f800000;
      uStack_4f38 = 0x3f800000;
      uStack_4f34 = 0x3f800000;
      local_4f60 = 0x3f8000003f800000;
      uStack_4f58 = 0x3f8000003f800000;
      local_4f10._8_8_ = 0x3f8000003f800000;
      local_4f10._0_8_ = 0x3f8000003f800000;
      local_4ad0 = CONCAT44(fStack_4f4c,local_4f50);
      uStack_4ac8 = CONCAT44(fStack_4f44,fStack_4f48);
      local_4ac0 = local_5720._0_8_;
      uStack_4ab8 = local_5720._8_8_;
      auVar61._8_8_ = uStack_4ac8;
      auVar61._0_8_ = local_4ad0;
      auVar219 = vsubps_avx512vl(local_5720,auVar61);
      in_ZMM16 = ZEXT1664(local_5720);
      local_4ea0 = 0x3f800000;
      uStack_4e9c = 0x3f800000;
      uStack_4e98 = 0x3f800000;
      uStack_4e94 = 0x3f800000;
      local_4e60._0_8_ = auVar219._0_8_;
      local_4e60._8_8_ = auVar219._8_8_;
      local_4b00 = local_4e60._0_8_;
      uStack_4af8 = local_4e60._8_8_;
      local_4b10 = 0x42b0c0a5;
      uStack_4b0c = 0x42b0c0a5;
      uStack_4b08 = 0x42b0c0a5;
      uStack_4b04 = 0x42b0c0a5;
      auVar60._8_4_ = 0x42b0c0a5;
      auVar60._0_8_ = 0x42b0c0a542b0c0a5;
      auVar60._12_4_ = 0x42b0c0a5;
      auVar219 = vminps_avx(auVar219,auVar60);
      local_4e60._0_8_ = auVar219._0_8_;
      local_4e60._8_8_ = auVar219._8_8_;
      local_4b30 = local_4e60._0_8_;
      uStack_4b28 = local_4e60._8_8_;
      local_4b40 = 0xc2b0c0a5;
      uStack_4b3c = 0xc2b0c0a5;
      uStack_4b38 = 0xc2b0c0a5;
      uStack_4b34 = 0xc2b0c0a5;
      auVar59._8_4_ = 0xc2b0c0a5;
      auVar59._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar59._12_4_ = 0xc2b0c0a5;
      auVar5 = vmaxps_avx(auVar219,auVar59);
      local_4e60._0_8_ = auVar5._0_8_;
      local_4e60._8_8_ = auVar5._8_8_;
      local_4b80 = local_4e60._0_8_;
      uVar195 = local_4b80;
      uStack_4b78 = local_4e60._8_8_;
      uVar196 = uStack_4b78;
      local_4b90 = 0x3fb8aa3b;
      uStack_4b8c = 0x3fb8aa3b;
      uStack_4b88 = 0x3fb8aa3b;
      uStack_4b84 = 0x3fb8aa3b;
      local_4b80._0_4_ = auVar5._0_4_;
      local_4b80._4_4_ = auVar5._4_4_;
      uStack_4b78._0_4_ = auVar5._8_4_;
      uStack_4b78._4_4_ = auVar5._12_4_;
      local_4e80._4_4_ = local_4b80._4_4_ * 1.442695;
      local_4e80._0_4_ = (float)local_4b80 * 1.442695;
      uStack_4e78._0_4_ = (float)uStack_4b78 * 1.442695;
      uStack_4e78._4_4_ = uStack_4b78._4_4_ * 1.442695;
      local_4be0 = local_4e80;
      uStack_4bd8 = uStack_4e78;
      local_4bf0 = 0x3f000000;
      uStack_4bec = 0x3f000000;
      uStack_4be8 = 0x3f000000;
      uStack_4be4 = 0x3f000000;
      local_4e80._0_4_ = (float)local_4b80 * 1.442695 + 0.5;
      local_4e80._4_4_ = local_4b80._4_4_ * 1.442695 + 0.5;
      fVar224 = (float)uStack_4b78 * 1.442695 + 0.5;
      fVar223 = uStack_4b78._4_4_ * 1.442695 + 0.5;
      uStack_4e78._0_4_ = fVar224;
      uStack_4e78._4_4_ = fVar223;
      local_4a80 = local_4e80;
      uStack_4a78 = uStack_4e78;
      local_4e90._4_4_ = (int)(float)local_4e80._4_4_;
      local_4e90._0_4_ = (int)(float)local_4e80._0_4_;
      local_4e90._8_4_ = (int)fVar224;
      local_4e90._12_4_ = (int)fVar223;
      local_4b50 = local_4e90._0_8_;
      uStack_4b48 = local_4e90._8_8_;
      auVar58._8_8_ = local_4e90._8_8_;
      auVar58._0_8_ = local_4e90._0_8_;
      auVar218 = vcvtdq2ps_avx(auVar58);
      local_4e70 = auVar218._0_8_;
      uStack_4e68 = auVar218._8_8_;
      local_4a60 = local_4e70;
      uStack_4a58 = uStack_4e68;
      local_4a70 = local_4e80;
      uStack_4a68 = uStack_4e78;
      auVar63._8_8_ = uStack_4e78;
      auVar63._0_8_ = local_4e80;
      auVar219 = vcmpps_avx(auVar63,auVar218,1);
      local_4eb0._0_8_ = auVar219._0_8_;
      local_4eb0._8_8_ = auVar219._8_8_;
      local_4a50 = 0x3f8000003f800000;
      uStack_4a48 = 0x3f8000003f800000;
      local_4a40 = local_4eb0._0_8_;
      uStack_4a38 = local_4eb0._8_8_;
      auVar64._8_8_ = 0x3f8000003f800000;
      auVar64._0_8_ = 0x3f8000003f800000;
      local_4eb0 = vpand_avx(auVar219,auVar64);
      local_4ae0 = local_4e70;
      uStack_4ad8 = uStack_4e68;
      local_4af0 = local_4eb0._0_8_;
      uStack_4ae8 = local_4eb0._8_8_;
      _local_4e80 = vsubps_avx(auVar218,local_4eb0);
      local_49e0 = local_4e80;
      uStack_49d8 = uStack_4e78;
      local_49f0 = 0x3f318000;
      uStack_49ec = 0x3f318000;
      uStack_49e8 = 0x3f318000;
      uStack_49e4 = 0x3f318000;
      local_4a00 = local_4e60._0_8_;
      uStack_49f8 = local_4e60._8_8_;
      local_4990 = 0x3f3180003f318000;
      uStack_4988 = 0x3f3180003f318000;
      local_4980 = local_4e80;
      uStack_4978 = uStack_4e78;
      local_49a0 = local_4e60._0_8_;
      uStack_4998 = local_4e60._8_8_;
      auVar65._8_8_ = 0x3f3180003f318000;
      auVar65._0_8_ = 0x3f3180003f318000;
      auVar219 = vfnmadd213ps_fma(auVar65,_local_4e80,auVar5);
      local_4e60._0_8_ = auVar219._0_8_;
      local_4e60._8_8_ = auVar219._8_8_;
      local_4a10 = local_4e80;
      uStack_4a08 = uStack_4e78;
      local_4a20 = 0xb95e8083;
      uStack_4a1c = 0xb95e8083;
      uStack_4a18 = 0xb95e8083;
      uStack_4a14 = 0xb95e8083;
      local_4a30 = local_4e60._0_8_;
      uStack_4a28 = local_4e60._8_8_;
      local_4960 = 0xb95e8083b95e8083;
      uStack_4958 = 0xb95e8083b95e8083;
      local_4950 = local_4e80;
      uStack_4948 = uStack_4e78;
      local_4970 = local_4e60._0_8_;
      uStack_4968 = local_4e60._8_8_;
      auVar66._8_8_ = 0xb95e8083b95e8083;
      auVar66._0_8_ = 0xb95e8083b95e8083;
      local_4e60 = vfnmadd213ps_fma(auVar66,_local_4e80,auVar219);
      local_4ba0 = local_4e60._0_8_;
      uVar193 = local_4ba0;
      uStack_4b98 = local_4e60._8_8_;
      uVar194 = uStack_4b98;
      local_4bb0 = local_4e60._0_8_;
      uStack_4ba8 = local_4e60._8_8_;
      local_4ba0._0_4_ = local_4e60._0_4_;
      local_4ba0._4_4_ = local_4e60._4_4_;
      uStack_4b98._0_4_ = local_4e60._8_4_;
      uStack_4b98._4_4_ = local_4e60._12_4_;
      local_4e70 = CONCAT44(local_4ba0._4_4_ * local_4ba0._4_4_,
                            (float)local_4ba0 * (float)local_4ba0);
      uStack_4e68._0_4_ = (float)uStack_4b98 * (float)uStack_4b98;
      uStack_4e68._4_4_ = uStack_4b98._4_4_ * uStack_4b98._4_4_;
      uStack_4eb8._0_4_ = 0x39506967;
      local_4ec0 = (undefined1  [8])0x3950696739506967;
      uStack_4eb8._4_4_ = 0x39506967;
      local_4c50 = 0x3950696739506967;
      uStack_4c48 = uStack_4eb8;
      local_4c60 = local_4e60._0_8_;
      uStack_4c58 = local_4e60._8_8_;
      local_4c70 = 0x3ab743ce;
      uStack_4c6c = 0x3ab743ce;
      uStack_4c68 = 0x3ab743ce;
      uStack_4c64 = 0x3ab743ce;
      local_4c40 = 0x3ab743ce3ab743ce;
      uStack_4c38 = 0x3ab743ce3ab743ce;
      local_4c20 = 0x3950696739506967;
      uStack_4c18 = uStack_4eb8;
      local_4c30 = local_4e60._0_8_;
      uStack_4c28 = local_4e60._8_8_;
      auVar55._8_8_ = uStack_4eb8;
      auVar55._0_8_ = 0x3950696739506967;
      auVar54._8_8_ = 0x3ab743ce3ab743ce;
      auVar54._0_8_ = 0x3ab743ce3ab743ce;
      auVar219 = vfmadd213ps_fma(local_4e60,auVar55,auVar54);
      local_4ec0 = auVar219._0_8_;
      uStack_4eb8 = auVar219._8_8_;
      local_4cb0 = local_4ec0;
      uStack_4ca8 = uStack_4eb8;
      local_4cc0 = local_4e60._0_8_;
      uStack_4cb8 = local_4e60._8_8_;
      local_4cd0 = 0x3c088908;
      uStack_4ccc = 0x3c088908;
      uStack_4cc8 = 0x3c088908;
      uStack_4cc4 = 0x3c088908;
      local_4ca0 = 0x3c0889083c088908;
      uStack_4c98 = 0x3c0889083c088908;
      local_4c80 = local_4ec0;
      uStack_4c78 = uStack_4eb8;
      local_4c90 = local_4e60._0_8_;
      uStack_4c88 = local_4e60._8_8_;
      auVar53._8_8_ = 0x3c0889083c088908;
      auVar53._0_8_ = 0x3c0889083c088908;
      auVar219 = vfmadd213ps_fma(local_4e60,auVar219,auVar53);
      local_4ec0 = auVar219._0_8_;
      uStack_4eb8 = auVar219._8_8_;
      local_4d10 = local_4ec0;
      uStack_4d08 = uStack_4eb8;
      local_4d20 = local_4e60._0_8_;
      uStack_4d18 = local_4e60._8_8_;
      local_4d30 = 0x3d2aa9c1;
      uStack_4d2c = 0x3d2aa9c1;
      uStack_4d28 = 0x3d2aa9c1;
      uStack_4d24 = 0x3d2aa9c1;
      local_4d00 = 0x3d2aa9c13d2aa9c1;
      uStack_4cf8 = 0x3d2aa9c13d2aa9c1;
      local_4ce0 = local_4ec0;
      uStack_4cd8 = uStack_4eb8;
      local_4cf0 = local_4e60._0_8_;
      uStack_4ce8 = local_4e60._8_8_;
      auVar52._8_8_ = 0x3d2aa9c13d2aa9c1;
      auVar52._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar219 = vfmadd213ps_fma(local_4e60,auVar219,auVar52);
      local_4ec0 = auVar219._0_8_;
      uStack_4eb8 = auVar219._8_8_;
      local_4d70 = local_4ec0;
      uStack_4d68 = uStack_4eb8;
      local_4d80 = local_4e60._0_8_;
      uStack_4d78 = local_4e60._8_8_;
      local_4d90 = 0x3e2aaaaa;
      uStack_4d8c = 0x3e2aaaaa;
      uStack_4d88 = 0x3e2aaaaa;
      uStack_4d84 = 0x3e2aaaaa;
      local_4d60 = 0x3e2aaaaa3e2aaaaa;
      uStack_4d58 = 0x3e2aaaaa3e2aaaaa;
      local_4d40 = local_4ec0;
      uStack_4d38 = uStack_4eb8;
      local_4d50 = local_4e60._0_8_;
      uStack_4d48 = local_4e60._8_8_;
      auVar51._8_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar51._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar219 = vfmadd213ps_fma(local_4e60,auVar219,auVar51);
      local_4ec0 = auVar219._0_8_;
      uStack_4eb8 = auVar219._8_8_;
      local_4dd0 = local_4ec0;
      uStack_4dc8 = uStack_4eb8;
      local_4de0 = local_4e60._0_8_;
      uStack_4dd8 = local_4e60._8_8_;
      local_4df0 = 0x3f000000;
      uStack_4dec = 0x3f000000;
      uStack_4de8 = 0x3f000000;
      uStack_4de4 = 0x3f000000;
      local_4dc0 = 0x3f0000003f000000;
      uStack_4db8 = 0x3f0000003f000000;
      local_4da0 = local_4ec0;
      uStack_4d98 = uStack_4eb8;
      local_4db0 = local_4e60._0_8_;
      uStack_4da8 = local_4e60._8_8_;
      auVar50._8_8_ = 0x3f0000003f000000;
      auVar50._0_8_ = 0x3f0000003f000000;
      auVar219 = vfmadd213ps_fma(local_4e60,auVar219,auVar50);
      local_4ec0 = auVar219._0_8_;
      uStack_4eb8 = auVar219._8_8_;
      local_4e30 = local_4ec0;
      uStack_4e28 = uStack_4eb8;
      local_4e40 = local_4e70;
      uStack_4e38 = uStack_4e68;
      local_4e50 = local_4e60._0_8_;
      uStack_4e48 = local_4e60._8_8_;
      local_4e00 = local_4ec0;
      uStack_4df8 = uStack_4eb8;
      local_4e10 = local_4e70;
      uStack_4e08 = uStack_4e68;
      local_4e20 = local_4e60._0_8_;
      uStack_4e18 = local_4e60._8_8_;
      auVar49._8_8_ = uStack_4e68;
      auVar49._0_8_ = local_4e70;
      auVar219 = vfmadd213ps_fma(auVar49,auVar219,local_4e60);
      local_4ec0 = auVar219._0_8_;
      uStack_4eb8 = auVar219._8_8_;
      local_4c10 = 0x3f8000003f800000;
      uStack_4c08 = 0x3f8000003f800000;
      local_4c00 = local_4ec0;
      uVar189 = local_4c00;
      uStack_4bf8 = uStack_4eb8;
      uVar190 = uStack_4bf8;
      local_4c00._0_4_ = auVar219._0_4_;
      local_4c00._4_4_ = auVar219._4_4_;
      uStack_4bf8._0_4_ = auVar219._8_4_;
      uStack_4bf8._4_4_ = auVar219._12_4_;
      local_4ec0._4_4_ = local_4c00._4_4_ + 1.0;
      local_4ec0._0_4_ = (float)local_4c00 + 1.0;
      uStack_4eb8._0_4_ = (float)uStack_4bf8 + 1.0;
      uStack_4eb8._4_4_ = uStack_4bf8._4_4_ + 1.0;
      local_4a90 = local_4e80;
      uVar197 = local_4a90;
      uStack_4a88 = uStack_4e78;
      uVar198 = uStack_4a88;
      local_4a90._0_4_ = local_4e80._0_4_;
      local_4a90._4_4_ = local_4e80._4_4_;
      uStack_4a88._0_4_ = local_4e80._8_4_;
      uStack_4a88._4_4_ = local_4e80._12_4_;
      local_4e90._4_4_ = (int)local_4a90._4_4_;
      local_4e90._0_4_ = (int)(float)local_4a90;
      local_4e90._8_4_ = (int)(float)uStack_4a88;
      local_4e90._12_4_ = (int)uStack_4a88._4_4_;
      local_4b60 = local_4e90._0_8_;
      uStack_4b58 = local_4e90._8_8_;
      local_4b70 = 0x7f0000007f;
      uStack_4b68 = 0x7f0000007f;
      auVar57._8_8_ = local_4e90._8_8_;
      auVar57._0_8_ = local_4e90._0_8_;
      auVar56._8_8_ = 0x7f0000007f;
      auVar56._0_8_ = 0x7f0000007f;
      auVar219 = vpaddd_avx(auVar57,auVar56);
      local_4e90._0_8_ = auVar219._0_8_;
      local_4e90._8_8_ = auVar219._8_8_;
      local_49c0 = local_4e90._0_8_;
      uStack_49b8 = local_4e90._8_8_;
      local_49c4 = 0x17;
      local_4e90 = vpslld_avx(auVar219,ZEXT416(0x17));
      local_49b0 = local_4e90._0_8_;
      uStack_49a8 = local_4e90._8_8_;
      local_4ed0 = local_4e90._0_8_;
      uStack_4ec8 = local_4e90._8_8_;
      local_4bc0 = _local_4ec0;
      local_4bd0 = local_4e90._0_8_;
      uVar191 = local_4bd0;
      uStack_4bc8 = local_4e90._8_8_;
      uVar192 = uStack_4bc8;
      local_4bd0._0_4_ = local_4e90._0_4_;
      local_4bd0._4_4_ = local_4e90._4_4_;
      uStack_4bc8._0_4_ = local_4e90._8_4_;
      uStack_4bc8._4_4_ = local_4e90._12_4_;
      local_4ec0._0_4_ = ((float)local_4c00 + 1.0) * (float)local_4bd0;
      local_4ec0._4_4_ = (local_4c00._4_4_ + 1.0) * local_4bd0._4_4_;
      uStack_4bc8._0_4_ = ((float)uStack_4bf8 + 1.0) * (float)uStack_4bc8;
      uStack_4bc8._4_4_ = (uStack_4bf8._4_4_ + 1.0) * uStack_4bc8._4_4_;
      uStack_4eb8._0_4_ = (float)uStack_4bc8;
      uStack_4eb8._4_4_ = uStack_4bc8._4_4_;
      local_4f20 = local_4ec0;
      uStack_4f18 = uStack_4eb8;
      local_4ef0 = (float)local_4ec0._0_4_ + 1.0;
      fStack_4eec = (float)local_4ec0._4_4_ + 1.0;
      fStack_4ee8 = (float)uStack_4bc8 + 1.0;
      fStack_4ee4 = uStack_4bc8._4_4_ + 1.0;
      auVar48._4_4_ = fStack_4eec;
      auVar48._0_4_ = local_4ef0;
      auVar48._8_4_ = fStack_4ee8;
      auVar48._12_4_ = fStack_4ee4;
      _local_4f90 = vdivps_avx(local_4f10,auVar48);
      local_4aa0._0_4_ = (float)local_4f90._0_4_ * 2.0;
      local_4aa0._4_4_ = (float)local_4f90._4_4_ * 2.0;
      local_4aa0._8_4_ = fStack_4f88 * 2.0;
      local_4aa0._12_4_ = fStack_4f84 * 2.0;
      auVar62._8_8_ = 0x3f8000003f800000;
      auVar62._0_8_ = 0x3f8000003f800000;
      _local_5c20 = vsubps_avx(local_4aa0,auVar62);
      local_5c10 = local_7960;
      uStack_5c08 = uStack_7958;
      local_7360._4_4_ = local_64c0._4_4_ * (float)local_5c20._4_4_;
      local_7360._0_4_ = (float)local_64c0 * (float)local_5c20._0_4_;
      uStack_7358._0_4_ = (float)uStack_64b8 * fStack_5c18;
      uStack_7358._4_4_ = uStack_64b8._4_4_ * fStack_5c14;
      local_5800 = uVar177;
      uStack_57f8 = uVar178;
      local_57d0 = uVar179;
      uStack_57c8 = uVar180;
      local_57a0 = uVar181;
      uStack_5798 = uVar182;
      local_5780 = uVar183;
      uStack_5778 = uVar184;
      local_5290 = uVar185;
      uStack_5288 = uVar186;
      local_4fa0 = local_5010;
      uStack_4f98 = uStack_5008;
      local_4f80 = local_5010;
      uStack_4f78 = uStack_5008;
      local_4f70 = uVar187;
      uStack_4f68 = uVar188;
      local_4f00 = local_5720;
      local_4ee0 = local_4f10;
      local_4c00 = uVar189;
      uStack_4bf8 = uVar190;
      local_4bd0 = uVar191;
      uStack_4bc8 = uVar192;
      local_4ba0 = uVar193;
      uStack_4b98 = uVar194;
      local_4b80 = uVar195;
      uStack_4b78 = uVar196;
      local_4b20 = local_5720;
      local_4ab0 = local_5000;
      uStack_4aa8 = uStack_4ff8;
      local_4a90 = uVar197;
      uStack_4a88 = uVar198;
      local_44f0 = uVar199;
      uStack_44e8 = uVar200;
      local_44d0 = uVar201;
      uStack_44c8 = uVar202;
      local_44c0 = uVar203;
      uStack_44b8 = uVar204;
      local_44a0 = uVar205;
      uStack_4498 = uVar206;
      local_4460 = uVar207;
      uStack_4458 = uVar208;
      local_4400 = local_5720;
      local_4300 = local_4330;
      uStack_42f8 = uStack_4328;
      break;
    case 6:
      local_7338 = local_7428;
      local_7340 = 0;
      local_72e0 = *(float *)*local_7428;
      local_73b0 = CONCAT44(local_72e0,local_72e0);
      uStack_73a8 = CONCAT44(local_72e0,local_72e0);
      local_7348 = local_7428;
      local_7350 = 1;
      local_7300 = *(float *)(*local_7428 + 4);
      local_73c0 = CONCAT44(local_7300,local_7300);
      uStack_73b8 = CONCAT44(local_7300,local_7300);
      local_5bd0._8_8_ = uStack_7958;
      local_5bd0._0_8_ = local_7960;
      local_5ba4 = 0x3f800000;
      local_5bc0 = 0x3f800000;
      uStack_5bbc = 0x3f800000;
      uStack_5bb8 = 0x3f800000;
      uStack_5bb4 = 0x3f800000;
      local_5c00 = 0x3f8000003f800000;
      uStack_5bf8 = 0x3f8000003f800000;
      local_5b50 = local_7960;
      uStack_5b48 = uStack_7958;
      local_5b90 = (float)local_64c0 * local_72e0;
      fStack_5b8c = local_64c0._4_4_ * local_72e0;
      fStack_5b88 = (float)uStack_64b8 * local_72e0;
      fStack_5b84 = uStack_64b8._4_4_ * local_72e0;
      local_5bf0._4_4_ = fStack_5b8c + local_7300;
      local_5bf0._0_4_ = local_5b90 + local_7300;
      uStack_5be8._0_4_ = fStack_5b88 + local_7300;
      uStack_5be8._4_4_ = fStack_5b84 + local_7300;
      local_5b20 = (undefined1  [16])0x0;
      local_5b30 = local_5bf0;
      uStack_5b28 = uStack_5be8;
      local_5b40 = 0;
      uStack_5b38 = 0;
      auVar219._8_8_ = uStack_5be8;
      auVar219._0_8_ = local_5bf0;
      auVar219 = vmaxps_avx(auVar219,ZEXT816(0));
      local_5bf0 = auVar219._0_8_;
      uStack_5be8 = auVar219._8_8_;
      local_5b00 = local_5bf0;
      uStack_5af8 = uStack_5be8;
      auVar218._8_8_ = 0x3f8000003f800000;
      auVar218._0_8_ = 0x3f8000003f800000;
      _local_5bf0 = vminps_avx(auVar219,auVar218);
      local_5b70 = local_5bf0;
      uVar177 = local_5b70;
      uStack_5b68 = uStack_5be8;
      uVar178 = uStack_5b68;
      local_5b80 = local_7960;
      uStack_5b78 = uStack_7958;
      local_5b70._0_4_ = local_5bf0._0_4_;
      local_5b70._4_4_ = local_5bf0._4_4_;
      uStack_5b68._0_4_ = local_5bf0._8_4_;
      uStack_5b68._4_4_ = local_5bf0._12_4_;
      local_7360._4_4_ = local_5b70._4_4_ * local_64c0._4_4_;
      local_7360._0_4_ = (float)local_5b70 * (float)local_64c0;
      uStack_7358._0_4_ = (float)uStack_5b68 * (float)uStack_64b8;
      uStack_7358._4_4_ = uStack_5b68._4_4_ * uStack_64b8._4_4_;
      fStack_72fc = local_7300;
      fStack_72f8 = local_7300;
      fStack_72f4 = local_7300;
      local_72e4 = local_7300;
      fStack_72dc = local_72e0;
      fStack_72d8 = local_72e0;
      fStack_72d4 = local_72e0;
      local_72c4 = local_72e0;
      local_5be0 = local_73b0;
      uStack_5bd8 = uStack_73a8;
      local_5ba0 = local_73c0;
      uStack_5b98 = uStack_73b8;
      local_5b70 = uVar177;
      uStack_5b68 = uVar178;
      local_5b60 = local_73b0;
      uStack_5b58 = uStack_73a8;
      local_5b10 = local_5c00;
      uStack_5b08 = uStack_5bf8;
      break;
    default:
      uStack_7358 = uStack_7958;
      local_7360 = (undefined1  [8])local_7960;
    }
    local_7268 = (undefined8 *)(*local_7408 + (long)local_7750 * 4);
    local_7280 = local_7360;
    uStack_7278 = uStack_7358;
    *local_7268 = local_7360;
    local_7268[1] = uStack_7358;
    local_64c0 = local_7900._0_8_;
    uStack_64b8 = local_7900._8_8_;
    local_64a0 = local_78f0._0_8_;
    uStack_6498 = local_78f0._8_8_;
    local_6480 = local_78e0._0_8_;
    uStack_6478 = local_78e0._8_8_;
    local_6460 = local_78d0._0_8_;
    uStack_6458 = local_78d0._8_8_;
    local_60a0 = local_6120._0_8_;
    uStack_6098 = local_6120._8_8_;
    local_6090 = local_6120._16_8_;
    uStack_6088 = local_6120._24_8_;
  }
  local_79ac = local_7440 * 4 + local_743c;
  local_743c = local_79ac;
  for (; local_79ac < local_7430; local_79ac = local_79ac + 1) {
    local_79b0 = 0.0;
    if (local_7438 != 0) {
      local_79b0 = *(float *)(local_7438 + (long)local_79ac * 4);
    }
    local_288 = local_7410;
    local_28c = local_79ac;
    local_79b8 = (undefined1 (*) [16])
                 (*local_7410 +
                 (long)*(int *)((long)local_7410 + 0x2c) * (long)local_79ac * local_7410[2]);
    local_73f8 = local_7400;
    local_79c0 = (undefined1 (*) [32])*local_7400;
    local_79c4 = 0;
    local_4080 = 0;
    uStack_4078 = 0;
    uStack_4070 = 0;
    uStack_4068 = 0;
    local_7a00._0_16_ = ZEXT816(0);
    auVar219 = local_7a00._0_16_;
    while( true ) {
      local_7a00 = ZEXT1632(auVar219);
      auVar220 = local_7a00;
      local_7a00._0_8_ = auVar219._0_8_;
      local_7a00._8_8_ = auVar219._8_8_;
      if (local_742c <= local_79c4 + 7) break;
      local_7260 = local_79c0;
      local_7080 = *(undefined8 *)*local_79c0;
      uStack_7078 = *(undefined8 *)(*local_79c0 + 8);
      uStack_7070 = *(undefined8 *)(*local_79c0 + 0x10);
      uStack_7068 = *(undefined8 *)(*local_79c0 + 0x18);
      local_98 = local_79b8;
      local_170 = vlddqu_avx(*local_79b8);
      auVar221 = vcvtph2ps_f16c(local_170);
      local_7a40 = auVar221._0_8_;
      local_70a0 = local_7a40;
      uStack_7a38 = auVar221._8_8_;
      uStack_7098 = uStack_7a38;
      uStack_7a30 = auVar221._16_8_;
      uStack_7090 = uStack_7a30;
      uStack_7a28 = auVar221._24_8_;
      uStack_7088 = uStack_7a28;
      local_70c0 = local_7a00._0_8_;
      uStack_70b8 = local_7a00._8_8_;
      uStack_70b0 = 0;
      uStack_70a8 = 0;
      local_7040 = local_7a40;
      uStack_7038 = uStack_7a38;
      uStack_7030 = uStack_7a30;
      uStack_7028 = uStack_7a28;
      local_7060 = local_7a00._0_8_;
      uStack_7058 = local_7a00._8_8_;
      uStack_7050 = 0;
      uStack_7048 = 0;
      auVar219 = vfmadd213ps_fma(auVar221,*local_79c0,auVar220);
      local_79c0 = local_79c0 + 1;
      local_79b8 = local_79b8 + 1;
      local_79c4 = local_79c4 + 8;
      local_7020 = local_7080;
      uStack_7018 = uStack_7078;
      uStack_7010 = uStack_7070;
      uStack_7008 = uStack_7068;
    }
    local_5e50 = (undefined1  [16])0x0;
    local_7a50 = ZEXT816(0);
    while( true ) {
      if (local_742c <= local_79c4 + 3) break;
      local_73d8 = local_79c0;
      local_66e0 = *(undefined8 *)*local_79c0;
      uStack_66d8 = *(undefined8 *)(*local_79c0 + 8);
      local_5f28 = local_79b8;
      local_5f40 = *(ulong *)*local_79b8;
      uStack_5f38 = 0;
      uStack_1b8 = 0;
      auVar230._8_8_ = 0;
      auVar230._0_8_ = local_5f40;
      auVar218 = vcvtph2ps_f16c(auVar230);
      local_7a70 = auVar218._0_8_;
      local_66f0 = local_7a70;
      uStack_7a68 = auVar218._8_8_;
      uStack_66e8 = uStack_7a68;
      local_6700 = local_7a50._0_8_;
      uStack_66f8 = local_7a50._8_8_;
      local_66c0 = local_7a70;
      uStack_66b8 = uStack_7a68;
      local_66d0 = local_7a50._0_8_;
      uStack_66c8 = local_7a50._8_8_;
      local_7a50 = vfmadd213ps_fma(auVar218,*(undefined1 (*) [16])*local_79c0,local_7a50);
      local_79c0 = (undefined1 (*) [32])(*local_79c0 + 0x10);
      local_79b8 = (undefined1 (*) [16])(*local_79b8 + 8);
      local_79c4 = local_79c4 + 4;
      local_66b0 = local_66e0;
      uStack_66a8 = uStack_66d8;
      local_1c0 = local_5f40;
    }
    for (; local_79c4 < local_742c; local_79c4 = local_79c4 + 1) {
      fVar224 = *(float *)*local_79c0;
      fVar223 = float16_to_float32(*(unsigned_short *)*local_79b8);
      local_79b0 = fVar224 * fVar223 + local_79b0;
      local_79c0 = (undefined1 (*) [32])(*local_79c0 + 4);
      local_79b8 = (undefined1 (*) [16])(*local_79b8 + 2);
    }
    local_6400 = local_7a00._0_8_;
    uStack_63f8 = local_7a00._8_8_;
    uStack_63f0 = 0;
    uStack_63e8 = 0;
    local_560 = local_7a00._0_8_;
    uStack_558 = local_7a00._8_8_;
    uStack_550 = 0;
    uStack_548 = 0;
    local_63a0 = 0;
    uStack_6398 = 0;
    local_63b0 = local_7a00._0_8_;
    uVar177 = local_63b0;
    uStack_63a8 = local_7a00._8_8_;
    uVar178 = uStack_63a8;
    local_63b0._0_4_ = auVar219._0_4_;
    local_63b0._4_4_ = auVar219._4_4_;
    uStack_63a8._0_4_ = auVar219._8_4_;
    uStack_63a8._4_4_ = auVar219._12_4_;
    local_6410 = (float)local_63b0 + 0.0;
    fStack_640c = local_63b0._4_4_ + 0.0;
    fStack_6408 = (float)uStack_63a8 + 0.0;
    fStack_6404 = uStack_63a8._4_4_ + 0.0;
    local_63c0 = CONCAT44(fStack_640c,local_6410);
    uStack_63b8 = CONCAT44(fStack_6404,fStack_6408);
    auVar12._8_8_ = uStack_63b8;
    auVar12._0_8_ = local_63c0;
    auVar11._8_8_ = uStack_63b8;
    auVar11._0_8_ = local_63c0;
    _local_63d0 = vunpckhpd_avx(auVar11,auVar12);
    local_6420 = local_6410 + (float)local_63d0._0_4_;
    fStack_641c = fStack_640c + (float)local_63d0._4_4_;
    fStack_6418 = fStack_6408 + fStack_63c8;
    fStack_6414 = fStack_6404 + fStack_63c4;
    local_510._0_4_ = local_6420 + fStack_641c;
    auVar219 = ZEXT416((uint)local_510._0_4_);
    local_510._4_4_ = 0;
    local_6430 = local_510._0_8_;
    uStack_6428 = 0;
    local_4f0 = local_510._0_8_;
    uStack_4e8 = 0;
    local_6370 = local_7a50._0_8_;
    uStack_6368 = local_7a50._8_8_;
    local_5fb0 = local_7a50._0_8_;
    uStack_5fa8 = local_7a50._8_8_;
    local_5fc0 = local_7a50._0_8_;
    uStack_5fb8 = local_7a50._8_8_;
    _local_6360 = vunpckhpd_avx(local_7a50,local_7a50);
    local_6350 = local_7a50._0_8_;
    uVar179 = local_6350;
    uStack_6348 = local_7a50._8_8_;
    uVar180 = uStack_6348;
    local_6350._0_4_ = local_7a50._0_4_;
    local_6350._4_4_ = local_7a50._4_4_;
    uStack_6348._0_4_ = local_7a50._8_4_;
    uStack_6348._4_4_ = local_7a50._12_4_;
    local_6380 = (float)local_6350 + (float)local_6360._0_4_;
    fStack_637c = local_6350._4_4_ + (float)local_6360._4_4_;
    fStack_6378 = (float)uStack_6348 + fStack_6358;
    fStack_6374 = uStack_6348._4_4_ + fStack_6354;
    local_530._0_4_ = local_6380 + fStack_637c;
    auVar218 = ZEXT416((uint)local_530._0_4_);
    local_530._4_4_ = 0;
    local_6390 = local_530._0_8_;
    uStack_6388 = 0;
    local_500 = local_530._0_8_;
    uStack_4f8 = 0;
    local_7b5c = local_79b0 + (float)local_510._0_4_ + (float)local_530._0_4_;
    local_6310 = local_741c;
    local_6318 = local_7428;
    local_63b0 = uVar177;
    uStack_63a8 = uVar178;
    local_6350 = uVar179;
    uStack_6348 = uVar180;
    local_630c[0] = local_7b5c;
    local_5fa0 = local_63c0;
    uStack_5f98 = uStack_63b8;
    local_5f90 = local_63c0;
    uStack_5f88 = uStack_63b8;
    local_540 = fStack_637c;
    fStack_53c = fStack_637c;
    fStack_538 = fStack_637c;
    fStack_534 = fStack_637c;
    local_530 = auVar218;
    local_520 = fStack_641c;
    fStack_51c = fStack_641c;
    fStack_518 = fStack_641c;
    fStack_514 = fStack_641c;
    local_510 = auVar219;
    switch(local_741c) {
    case 1:
      dVar225 = std::fmax((double)(ulong)(uint)local_7b5c,0.0);
      local_630c[0] = SUB84(dVar225,0);
      break;
    case 2:
      local_62c0 = local_7428;
      local_62c8 = 0;
      local_631c = *(float *)*local_7428;
      if (local_7b5c <= 0.0) {
        local_7b5c = local_7b5c * local_631c;
      }
      local_630c[0] = local_7b5c;
      break;
    case 3:
      local_62d0 = local_7428;
      local_62d8 = 0;
      local_6320 = *(float *)*local_7428;
      local_62e0 = local_7428;
      local_62e8 = 1;
      local_6324 = *(float *)(*local_7428 + 4);
      if (local_7b5c < local_6320) {
        local_630c[0] = local_6320;
      }
      if (local_6324 < local_630c[0]) {
        local_630c[0] = local_6324;
      }
      break;
    case 4:
      local_6328 = 88.37626;
      pfVar217 = std::min<float>(local_630c,&local_6328);
      local_630c[0] = *pfVar217;
      local_632c = -88.37626;
      pfVar217 = std::max<float>(local_630c,&local_632c);
      local_630c[0] = *pfVar217;
      dVar225 = std::exp((double)(ulong)(uint)-local_630c[0]);
      local_630c[0] = 1.0 / (SUB84(dVar225,0) + 1.0);
      break;
    case 5:
      dVar225 = std::exp((double)(ulong)(uint)local_7b5c);
      dVar225 = std::log((double)(ulong)(uint)(SUB84(dVar225,0) + 1.0));
      dVar225 = std::tanh(dVar225);
      local_630c[0] = local_7b5c * SUB84(dVar225,0);
      break;
    case 6:
      local_62f0 = local_7428;
      local_62f8 = 0;
      local_6330 = *(float *)*local_7428;
      local_6300 = local_7428;
      local_630c[1] = 1.4013e-45;
      local_630c[2] = 0.0;
      local_6334 = *(float *)(*local_7428 + 4);
      local_6338 = -local_6334 / local_6330;
      local_633c = 1.0 / local_6330 + local_6338;
      if (local_6338 <= local_7b5c) {
        if (local_7b5c <= local_633c) {
          local_630c[0] = local_7b5c * (local_7b5c * local_6330 + local_6334);
        }
      }
      else {
        local_630c[0] = 0.0;
      }
    }
    *(float *)(*local_7408 + (long)local_79ac * 4) = local_630c[0];
  }
  return;
}

Assistant:

static void innerproduct_fp16s_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_fp16, const Mat& bias_data, int activation_type, const Mat& activation_params, const Option& opt)
{
#if NCNN_RUNTIME_CPU && NCNN_F16C && __AVX__ && !__F16C__
    if (ncnn::cpu_support_x86_f16c())
    {
        innerproduct_fp16s_sse_f16c(bottom_blob, top_blob, weight_data_fp16, bias_data, activation_type, activation_params, opt);
        return;
    }
#endif

#if __F16C__
    const int num_input = bottom_blob.w * bottom_blob.elempack;
    const int num_output = top_blob.w;

    const float* bias_data_ptr = bias_data;

    int remain_num_output_start = 0;
    int nn_num_output = num_output >> 3;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_num_output; pp++)
    {
        int p = pp * 8;

        float sums[8] = {0.0f};
        if (bias_data_ptr)
        {
            sums[0] = bias_data_ptr[p];
            sums[1] = bias_data_ptr[p + 1];
            sums[2] = bias_data_ptr[p + 2];
            sums[3] = bias_data_ptr[p + 3];
            sums[4] = bias_data_ptr[p + 4];
            sums[5] = bias_data_ptr[p + 5];
            sums[6] = bias_data_ptr[p + 6];
            sums[7] = bias_data_ptr[p + 7];
        }

        const unsigned short* w0 = weight_data_fp16.row<const unsigned short>(p);
        const unsigned short* w1 = weight_data_fp16.row<const unsigned short>(p + 1);
        const unsigned short* w2 = weight_data_fp16.row<const unsigned short>(p + 2);
        const unsigned short* w3 = weight_data_fp16.row<const unsigned short>(p + 3);
        const unsigned short* w4 = weight_data_fp16.row<const unsigned short>(p + 4);
        const unsigned short* w5 = weight_data_fp16.row<const unsigned short>(p + 5);
        const unsigned short* w6 = weight_data_fp16.row<const unsigned short>(p + 6);
        const unsigned short* w7 = weight_data_fp16.row<const unsigned short>(p + 7);

        const float* m = bottom_blob;

        __m256 _sum0 = _mm256_setzero_ps();
        __m256 _sum1 = _mm256_setzero_ps();
        __m256 _sum2 = _mm256_setzero_ps();
        __m256 _sum3 = _mm256_setzero_ps();
        __m256 _sum4 = _mm256_setzero_ps();
        __m256 _sum5 = _mm256_setzero_ps();
        __m256 _sum6 = _mm256_setzero_ps();
        __m256 _sum7 = _mm256_setzero_ps();

        int i = 0;
        for (; i + 7 < num_input; i += 8)
        {
            __m256 _m = _mm256_loadu_ps(m);

            __m256 _w0 = _mm256_cvtph_ps(_mm_lddqu_si128((const __m128i*)w0));
            __m256 _w1 = _mm256_cvtph_ps(_mm_lddqu_si128((const __m128i*)w1));
            __m256 _w2 = _mm256_cvtph_ps(_mm_lddqu_si128((const __m128i*)w2));
            __m256 _w3 = _mm256_cvtph_ps(_mm_lddqu_si128((const __m128i*)w3));
            __m256 _w4 = _mm256_cvtph_ps(_mm_lddqu_si128((const __m128i*)w4));
            __m256 _w5 = _mm256_cvtph_ps(_mm_lddqu_si128((const __m128i*)w5));
            __m256 _w6 = _mm256_cvtph_ps(_mm_lddqu_si128((const __m128i*)w6));
            __m256 _w7 = _mm256_cvtph_ps(_mm_lddqu_si128((const __m128i*)w7));

            _sum0 = _mm256_comp_fmadd_ps(_m, _w0, _sum0);
            _sum1 = _mm256_comp_fmadd_ps(_m, _w1, _sum1);
            _sum2 = _mm256_comp_fmadd_ps(_m, _w2, _sum2);
            _sum3 = _mm256_comp_fmadd_ps(_m, _w3, _sum3);
            _sum4 = _mm256_comp_fmadd_ps(_m, _w4, _sum4);
            _sum5 = _mm256_comp_fmadd_ps(_m, _w5, _sum5);
            _sum6 = _mm256_comp_fmadd_ps(_m, _w6, _sum6);
            _sum7 = _mm256_comp_fmadd_ps(_m, _w7, _sum7);

            m += 8;
            w0 += 8;
            w1 += 8;
            w2 += 8;
            w3 += 8;
            w4 += 8;
            w5 += 8;
            w6 += 8;
            w7 += 8;
        }
        for (; i < num_input; i++)
        {
            sums[0] += *m * float16_to_float32(*w0);
            sums[1] += *m * float16_to_float32(*w1);
            sums[2] += *m * float16_to_float32(*w2);
            sums[3] += *m * float16_to_float32(*w3);
            sums[4] += *m * float16_to_float32(*w4);
            sums[5] += *m * float16_to_float32(*w5);
            sums[6] += *m * float16_to_float32(*w6);
            sums[7] += *m * float16_to_float32(*w7);

            m++;
            w0++;
            w1++;
            w2++;
            w3++;
            w4++;
            w5++;
            w6++;
            w7++;
        }

        __m256 _sums = HorizontalSums(_sum0, _sum1, _sum2, _sum3, _sum4, _sum5, _sum6, _sum7);
        __m256 _sums_f = _mm256_loadu_ps(sums);
        _sums = _mm256_add_ps(_sums_f, _sums);
        _sums = activation_avx(_sums, activation_type, activation_params);

        float* outptr = top_blob;
        _mm256_storeu_ps(outptr + p, _sums);
    }

    remain_num_output_start += (nn_num_output << 3);
    nn_num_output = (num_output - remain_num_output_start) >> 2;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_num_output; pp++)
    {
        int p = remain_num_output_start + (pp * 4);

        float sums[4] = {0.0f};
        if (bias_data_ptr)
        {
            sums[0] = bias_data_ptr[p];
            sums[1] = bias_data_ptr[p + 1];
            sums[2] = bias_data_ptr[p + 2];
            sums[3] = bias_data_ptr[p + 3];
        }

        const unsigned short* w0 = weight_data_fp16.row<const unsigned short>(p);
        const unsigned short* w1 = weight_data_fp16.row<const unsigned short>(p + 1);
        const unsigned short* w2 = weight_data_fp16.row<const unsigned short>(p + 2);
        const unsigned short* w3 = weight_data_fp16.row<const unsigned short>(p + 3);

        const float* m = bottom_blob;

        int i = 0;

        __m256 _sum0 = _mm256_setzero_ps();
        __m256 _sum1 = _mm256_setzero_ps();
        __m256 _sum2 = _mm256_setzero_ps();
        __m256 _sum3 = _mm256_setzero_ps();
        for (; i + 7 < num_input; i += 8)
        {
            __m256 _m = _mm256_loadu_ps(m);

            __m256 _w0 = _mm256_cvtph_ps(_mm_lddqu_si128((const __m128i*)w0));
            __m256 _w1 = _mm256_cvtph_ps(_mm_lddqu_si128((const __m128i*)w1));
            __m256 _w2 = _mm256_cvtph_ps(_mm_lddqu_si128((const __m128i*)w2));
            __m256 _w3 = _mm256_cvtph_ps(_mm_lddqu_si128((const __m128i*)w3));

            _sum0 = _mm256_comp_fmadd_ps(_m, _w0, _sum0);
            _sum1 = _mm256_comp_fmadd_ps(_m, _w1, _sum1);
            _sum2 = _mm256_comp_fmadd_ps(_m, _w2, _sum2);
            _sum3 = _mm256_comp_fmadd_ps(_m, _w3, _sum3);

            m += 8;
            w0 += 8;
            w1 += 8;
            w2 += 8;
            w3 += 8;
        }

        __m128 _sum0l = _mm_setzero_ps();
        __m128 _sum1l = _mm_setzero_ps();
        __m128 _sum2l = _mm_setzero_ps();
        __m128 _sum3l = _mm_setzero_ps();
        for (; i + 3 < num_input; i += 4)
        {
            __m128 _m = _mm_loadu_ps(m);

            __m128 _w0 = _mm_cvtph_ps(_mm_loadl_epi64((const __m128i*)w0));
            __m128 _w1 = _mm_cvtph_ps(_mm_loadl_epi64((const __m128i*)w1));
            __m128 _w2 = _mm_cvtph_ps(_mm_loadl_epi64((const __m128i*)w2));
            __m128 _w3 = _mm_cvtph_ps(_mm_loadl_epi64((const __m128i*)w3));

            _sum0l = _mm_comp_fmadd_ps(_m, _w0, _sum0l);
            _sum1l = _mm_comp_fmadd_ps(_m, _w1, _sum1l);
            _sum2l = _mm_comp_fmadd_ps(_m, _w2, _sum2l);
            _sum3l = _mm_comp_fmadd_ps(_m, _w3, _sum3l);

            m += 4;
            w0 += 4;
            w1 += 4;
            w2 += 4;
            w3 += 4;
        }
        for (; i < num_input; i++)
        {
            sums[0] += *m * float16_to_float32(*w0);
            sums[1] += *m * float16_to_float32(*w1);
            sums[2] += *m * float16_to_float32(*w2);
            sums[3] += *m * float16_to_float32(*w3);

            m++;
            w0++;
            w1++;
            w2++;
            w3++;
        }

        __m128 _sums = _mm_loadu_ps(sums);

        _sums = _mm_add_ps(HorizontalSums(_sum0, _sum1, _sum2, _sum3), _sums);

        _MM_TRANSPOSE4_PS(_sum0l, _sum1l, _sum2l, _sum3l);
        _sums = _mm_add_ps(_sum0l, _sums);
        _sums = _mm_add_ps(_sum1l, _sums);
        _sums = _mm_add_ps(_sum2l, _sums);
        _sums = _mm_add_ps(_sum3l, _sums);
        _sums = activation_sse(_sums, activation_type, activation_params);

        float* outptr = top_blob;
        _mm_storeu_ps(outptr + p, _sums);
    }

    remain_num_output_start += (nn_num_output << 2);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_num_output_start; p < num_output; p++)
    {
        float sum = 0.f;

        if (bias_data_ptr)
            sum = bias_data_ptr[p];

        const unsigned short* w = weight_data_fp16.row<const unsigned short>(p);

        const float* m = bottom_blob;

        int i = 0;

        __m256 _sum = _mm256_setzero_ps();
        for (; i + 7 < num_input; i += 8)
        {
            __m256 _m = _mm256_loadu_ps(m);
            __m256 _w = _mm256_cvtph_ps(_mm_lddqu_si128((const __m128i*)w));
            _sum = _mm256_comp_fmadd_ps(_m, _w, _sum);

            m += 8;
            w += 8;
        }

        __m128 _suml = _mm_setzero_ps();
        for (; i + 3 < num_input; i += 4)
        {
            __m128 _m = _mm_loadu_ps(m);
            __m128 _w = _mm_cvtph_ps(_mm_loadl_epi64((const __m128i*)w));
            _suml = _mm_comp_fmadd_ps(_m, _w, _suml);

            m += 4;
            w += 4;
        }
        for (; i < num_input; i++)
        {
            sum += *m * float16_to_float32(*w);
            m++;
            w++;
        }

        sum += _mm256_reduce_add_ps(_sum);

        sum += _mm_reduce_add_ps(_suml);

        sum = activation_ss(sum, activation_type, activation_params);

        float* outptr = top_blob;
        outptr[p] = sum;
    }
#else  // __F16C__
    (void)bottom_blob;
    (void)top_blob;
    (void)weight_data_fp16;
    (void)bias_data;
    (void)activation_type;
    (void)activation_params;
    (void)opt;
#endif // __F16C__
}